

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# is_distinct_from.cpp
# Opt level: O1

idx_t duckdb::TemplatedDistinctSelectOperation<duckdb::DistinctFrom>
                (Vector *left,Vector *right,optional_ptr<const_duckdb::SelectionVector,_true> sel,
                idx_t count,optional_ptr<duckdb::SelectionVector,_true> true_sel,
                optional_ptr<duckdb::SelectionVector,_true> false_sel,
                optional_ptr<duckdb::ValidityMask,_true> null_mask)

{
  ulong *puVar1;
  PhysicalType PVar2;
  VectorType VVar3;
  VectorType VVar4;
  unsigned_long *puVar5;
  data_t *pdVar6;
  short *psVar7;
  data_ptr_t pdVar8;
  _Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_> _Var9;
  sel_t *psVar10;
  sel_t *psVar11;
  sel_t *psVar12;
  data_ptr_t pdVar13;
  unsigned_long *puVar14;
  byte bVar15;
  undefined1 auVar16 [16];
  undefined8 uVar17;
  undefined1 auVar18 [8];
  undefined8 uVar19;
  SelectionVector *pSVar20;
  list_entry_t *data;
  ulong uVar21;
  Vector *pVVar22;
  idx_t iVar23;
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true> *this;
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
  *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var24;
  TemplatedValidityData<unsigned_long> *pTVar25;
  reference pvVar26;
  type pVVar27;
  idx_t iVar28;
  element_type *peVar29;
  element_type *peVar30;
  NotImplementedException *this_01;
  InternalException *this_02;
  ulong uVar31;
  optional_ptr<duckdb::SelectionVector,_true> oVar32;
  ulong uVar33;
  idx_t iVar34;
  idx_t iVar35;
  int iVar36;
  idx_t idx_in_entry;
  float *pfVar37;
  double *pdVar38;
  string_t *psVar39;
  uhugeint_t *puVar40;
  optional_ptr<const_duckdb::SelectionVector,_true> oVar41;
  optional_ptr<duckdb::ValidityMask,_true> oVar42;
  element_type *peVar43;
  sel_t sVar44;
  size_type __n;
  int *piVar45;
  long lVar46;
  ulong uVar47;
  long lVar48;
  ulong uVar49;
  long lVar50;
  int *piVar51;
  int iVar52;
  idx_t pos_1;
  long *plVar53;
  long *plVar54;
  float *pfVar55;
  double *pdVar56;
  string_t *psVar57;
  uhugeint_t *puVar58;
  long lVar59;
  ulong uVar60;
  bool bVar61;
  bool bVar62;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  interval_t *left_1;
  UnifiedVectorFormat lvdata;
  UnifiedVectorFormat rvdata;
  SelectionVector rcursor;
  SelectionVector lcursor;
  SelectionVector slice_sel;
  ValidityMask child_validity;
  SelectionVector maybe_vec;
  Vector rchild;
  SelectionVector true_sel_1;
  Vector lchild;
  SelectionVector false_sel_1;
  UnifiedVectorFormat rvdata_1;
  OptionalSelection false_opt;
  UnifiedVectorFormat lvdata_1;
  OptionalSelection true_opt;
  SelectionVector false_vec;
  SelectionVector true_vec;
  Vector l_not_null;
  Vector r_not_null;
  element_type *local_4c8;
  long local_4b8;
  undefined1 local_4a8 [8];
  LogicalType LStack_4a0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_488;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_470;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_468;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_458;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_448;
  optional_ptr<duckdb::ValidityMask,_true> local_438;
  element_type *local_430;
  undefined1 local_428 [8];
  LogicalType LStack_420;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_408;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_3f0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_3e8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_3d8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_3c8;
  optional_ptr<duckdb::ValidityMask,_true> local_3c0;
  element_type *local_3b8;
  SelectionVector local_3b0;
  SelectionVector local_398;
  SelectionVector local_380;
  undefined1 local_368 [56];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_330;
  undefined1 local_328 [8];
  LogicalType aLStack_320 [2];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_2f0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_2d8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_2c8;
  SelectionVector local_2c0;
  Vector local_2a8;
  optional_ptr<duckdb::SelectionVector,_true> local_240;
  optional_ptr<duckdb::SelectionVector,_true> local_238;
  optional_ptr<const_duckdb::SelectionVector,_true> local_230;
  SelectionVector local_228;
  UnifiedVectorFormat local_210;
  OptionalSelection local_1c8;
  UnifiedVectorFormat local_1a8;
  OptionalSelection local_158;
  long local_138;
  SelectionVector local_130;
  SelectionVector local_118;
  Vector local_100;
  Vector local_98;
  
  PVar2 = (left->type).physical_type_;
  if (199 < PVar2) {
    if (PVar2 == VARCHAR) {
      local_328 = (undefined1  [8])null_mask.ptr;
      if (sel.ptr == (SelectionVector *)0x0) {
        sel.ptr = FlatVector::IncrementalSelectionVector();
      }
      if (local_328 != (undefined1  [8])0x0) {
        optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                  ((optional_ptr<duckdb::ValidityMask,_true> *)local_328);
        UpdateNullMask(left,sel.ptr,count,(ValidityMask *)local_328);
        optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                  ((optional_ptr<duckdb::ValidityMask,_true> *)local_328);
        UpdateNullMask(right,sel.ptr,count,(ValidityMask *)local_328);
      }
      VVar3 = left->vector_type;
      VVar4 = right->vector_type;
      if ((VVar3 ^ CONSTANT_VECTOR) == FLAT_VECTOR && (VVar4 ^ CONSTANT_VECTOR) == FLAT_VECTOR) {
        puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (puVar5 == (unsigned_long *)0x0) {
          bVar61 = false;
        }
        else {
          bVar61 = (*puVar5 & 1) == 0;
        }
        puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (puVar5 == (unsigned_long *)0x0) {
          bVar62 = false;
        }
        else {
          bVar62 = (*puVar5 & 1) == 0;
        }
        if ((bool)(bVar61 | bVar62)) {
          bVar61 = (bool)(bVar61 ^ bVar62);
        }
        else {
          bVar61 = string_t::operator==((string_t *)left->data,(string_t *)right->data);
          bVar61 = !bVar61;
        }
        if (!bVar61) {
          if (false_sel.ptr == (SelectionVector *)0x0 || count == 0) {
            return (idx_t)(element_type *)0x0;
          }
          psVar11 = (sel.ptr)->sel_vector;
          psVar12 = (false_sel.ptr)->sel_vector;
          iVar34 = 0;
          do {
            sVar44 = (sel_t)iVar34;
            if (psVar11 != (sel_t *)0x0) {
              sVar44 = psVar11[iVar34];
            }
            psVar12[iVar34] = sVar44;
            iVar34 = iVar34 + 1;
          } while (count != iVar34);
          return (idx_t)(element_type *)0x0;
        }
        if (true_sel.ptr != (SelectionVector *)0x0 && count != 0) {
          psVar11 = (sel.ptr)->sel_vector;
          psVar12 = (true_sel.ptr)->sel_vector;
          iVar34 = 0;
          do {
            sVar44 = (sel_t)iVar34;
            if (psVar11 != (sel_t *)0x0) {
              sVar44 = psVar11[iVar34];
            }
            psVar12[iVar34] = sVar44;
            iVar34 = iVar34 + 1;
          } while (count != iVar34);
          return count;
        }
        return count;
      }
      if ((VVar3 ^ CONSTANT_VECTOR) == FLAT_VECTOR && VVar4 == FLAT_VECTOR) {
        psVar39 = (string_t *)left->data;
        psVar57 = (string_t *)right->data;
        _local_4a8 = (undefined1  [16])0x0;
        LStack_4a0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        LStack_4a0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
        puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if ((puVar5 != (unsigned_long *)0x0) && ((*puVar5 & 1) == 0)) {
          local_2a8._0_8_ = 0x800;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)local_428,(unsigned_long *)&local_2a8);
          peVar29 = LStack_4a0.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          auVar18 = local_428;
          LStack_4a0.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)LStack_420._0_8_;
          _local_428 = (undefined1  [16])0x0;
          LStack_4a0._0_8_ = auVar18;
          if (peVar29 != (element_type *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar29);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_);
          }
          pTVar25 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                               (local_4a8 + 8));
          _Var9.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
               (pTVar25->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>;
          local_4a8 = (undefined1  [8])
                      _Var9.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
          *(undefined8 *)_Var9.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
               0xfffffffffffffffe;
        }
        FlatVector::VerifyFlatVector(right);
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            if (count == 0) goto LAB_00b412cc;
            lVar46 = 0;
            uVar47 = 0;
            do {
              uVar33 = uVar47;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                uVar33 = (ulong)(sel.ptr)->sel_vector[uVar47];
              }
              if (local_4a8 == (undefined1  [8])0x0) {
                bVar61 = false;
              }
              else {
                bVar61 = (*(byte *)local_4a8 & 1) == 0;
              }
              puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
              if (puVar5 == (unsigned_long *)0x0) {
                bVar62 = false;
              }
              else {
                bVar62 = (puVar5[uVar47 >> 6] >> (uVar47 & 0x3f) & 1) == 0;
              }
              if ((bVar61 | bVar62) == 1) {
                bVar61 = (bool)(bVar61 ^ bVar62 ^ 1);
              }
              else {
                bVar61 = string_t::operator==(psVar39,psVar57);
              }
              (false_sel.ptr)->sel_vector[lVar46] = (sel_t)uVar33;
              lVar46 = lVar46 + (ulong)bVar61;
              uVar47 = uVar47 + 1;
              psVar57 = psVar57 + 1;
            } while (count != uVar47);
            goto LAB_00b412d7;
          }
          if (count != 0) {
            uVar47 = 0;
            local_4c8 = (element_type *)0x0;
            do {
              uVar33 = uVar47;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                uVar33 = (ulong)(sel.ptr)->sel_vector[uVar47];
              }
              if (local_4a8 == (undefined1  [8])0x0) {
                bVar61 = false;
              }
              else {
                bVar61 = (*(byte *)local_4a8 & 1) == 0;
              }
              puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
              if (puVar5 == (unsigned_long *)0x0) {
                bVar62 = false;
              }
              else {
                bVar62 = (puVar5[uVar47 >> 6] >> (uVar47 & 0x3f) & 1) == 0;
              }
              if ((bVar61 | bVar62) == 1) {
                bVar61 = (bool)(bVar61 ^ bVar62);
              }
              else {
                bVar61 = string_t::operator==(psVar39,psVar57);
                bVar61 = !bVar61;
              }
              (true_sel.ptr)->sel_vector[(long)local_4c8] = (sel_t)uVar33;
              local_4c8 = (element_type *)((long)&local_4c8->_vptr_ExtraTypeInfo + (ulong)bVar61);
              uVar47 = uVar47 + 1;
              psVar57 = psVar57 + 1;
              local_488._M_pi =
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   LStack_4a0.type_info_.internal.
                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            } while (count != uVar47);
            goto LAB_00b412e1;
          }
        }
        else if (count != 0) {
          lVar46 = 0;
          local_4c8 = (element_type *)0x0;
          uVar47 = 0;
          do {
            uVar33 = uVar47;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              uVar33 = (ulong)(sel.ptr)->sel_vector[uVar47];
            }
            if (local_4a8 == (undefined1  [8])0x0) {
              bVar61 = false;
            }
            else {
              bVar61 = (*(byte *)local_4a8 & 1) == 0;
            }
            puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (puVar5 == (unsigned_long *)0x0) {
              bVar62 = false;
            }
            else {
              bVar62 = (puVar5[uVar47 >> 6] >> (uVar47 & 0x3f) & 1) == 0;
            }
            if ((bVar61 | bVar62) == 1) {
              bVar61 = (bool)(bVar61 ^ bVar62);
            }
            else {
              bVar61 = string_t::operator==(psVar39,psVar57);
              bVar61 = !bVar61;
            }
            (true_sel.ptr)->sel_vector[(long)local_4c8] = (sel_t)uVar33;
            local_4c8 = (element_type *)((long)&local_4c8->_vptr_ExtraTypeInfo + (ulong)bVar61);
            (false_sel.ptr)->sel_vector[lVar46] = (sel_t)uVar33;
            lVar46 = lVar46 + (ulong)(bVar61 ^ 1);
            uVar47 = uVar47 + 1;
            psVar57 = psVar57 + 1;
            local_488._M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 LStack_4a0.type_info_.internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          } while (count != uVar47);
          goto LAB_00b412e1;
        }
      }
      else {
        if ((VVar4 ^ CONSTANT_VECTOR) != FLAT_VECTOR || VVar3 != FLAT_VECTOR) {
          if (VVar3 == FLAT_VECTOR && VVar4 == FLAT_VECTOR) {
            psVar39 = (string_t *)left->data;
            psVar57 = (string_t *)right->data;
            FlatVector::VerifyFlatVector(left);
            FlatVector::VerifyFlatVector(right);
            if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
              if (count == 0) {
                return (idx_t)(element_type *)0x0;
              }
              lVar46 = 0;
              local_4c8 = (element_type *)0x0;
              uVar47 = 0;
              do {
                uVar33 = uVar47;
                if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                  uVar33 = (ulong)(sel.ptr)->sel_vector[uVar47];
                }
                puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
                if (puVar5 == (unsigned_long *)0x0) {
                  bVar61 = false;
                }
                else {
                  bVar61 = (puVar5[uVar47 >> 6] >> (uVar47 & 0x3f) & 1) == 0;
                }
                puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
                if (puVar5 == (unsigned_long *)0x0) {
                  bVar62 = false;
                }
                else {
                  bVar62 = (puVar5[uVar47 >> 6] >> (uVar47 & 0x3f) & 1) == 0;
                }
                if ((bVar61 | bVar62) == 1) {
                  bVar61 = (bool)(bVar61 ^ bVar62);
                }
                else {
                  bVar61 = string_t::operator==(psVar39,psVar57);
                  bVar61 = !bVar61;
                }
                (true_sel.ptr)->sel_vector[(long)local_4c8] = (sel_t)uVar33;
                local_4c8 = (element_type *)((long)&local_4c8->_vptr_ExtraTypeInfo + (ulong)bVar61);
                (false_sel.ptr)->sel_vector[lVar46] = (sel_t)uVar33;
                lVar46 = lVar46 + (ulong)(bVar61 ^ 1);
                uVar47 = uVar47 + 1;
                psVar39 = psVar39 + 1;
                psVar57 = psVar57 + 1;
              } while (count != uVar47);
              return (idx_t)local_4c8;
            }
            if (true_sel.ptr != (SelectionVector *)0x0) {
              if (count == 0) {
                return (idx_t)(element_type *)0x0;
              }
              uVar47 = 0;
              local_4c8 = (element_type *)0x0;
              do {
                uVar33 = uVar47;
                if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                  uVar33 = (ulong)(sel.ptr)->sel_vector[uVar47];
                }
                puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
                if (puVar5 == (unsigned_long *)0x0) {
                  bVar61 = false;
                }
                else {
                  bVar61 = (puVar5[uVar47 >> 6] >> (uVar47 & 0x3f) & 1) == 0;
                }
                puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
                if (puVar5 == (unsigned_long *)0x0) {
                  bVar62 = false;
                }
                else {
                  bVar62 = (puVar5[uVar47 >> 6] >> (uVar47 & 0x3f) & 1) == 0;
                }
                if ((bVar61 | bVar62) == 1) {
                  bVar61 = (bool)(bVar61 ^ bVar62);
                }
                else {
                  bVar61 = string_t::operator==(psVar39,psVar57);
                  bVar61 = !bVar61;
                }
                (true_sel.ptr)->sel_vector[(long)local_4c8] = (sel_t)uVar33;
                local_4c8 = (element_type *)((long)&local_4c8->_vptr_ExtraTypeInfo + (ulong)bVar61);
                uVar47 = uVar47 + 1;
                psVar39 = psVar39 + 1;
                psVar57 = psVar57 + 1;
              } while (count != uVar47);
              return (idx_t)local_4c8;
            }
            if (count != 0) {
              lVar46 = 0;
              uVar47 = 0;
              do {
                uVar33 = uVar47;
                if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                  uVar33 = (ulong)(sel.ptr)->sel_vector[uVar47];
                }
                puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
                if (puVar5 == (unsigned_long *)0x0) {
                  bVar61 = false;
                }
                else {
                  bVar61 = (puVar5[uVar47 >> 6] >> (uVar47 & 0x3f) & 1) == 0;
                }
                puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
                if (puVar5 == (unsigned_long *)0x0) {
                  bVar62 = false;
                }
                else {
                  bVar62 = (puVar5[uVar47 >> 6] >> (uVar47 & 0x3f) & 1) == 0;
                }
                if ((bVar61 | bVar62) == 1) {
                  bVar61 = (bool)(bVar61 ^ bVar62 ^ 1);
                }
                else {
                  bVar61 = string_t::operator==(psVar39,psVar57);
                }
                (false_sel.ptr)->sel_vector[lVar46] = (sel_t)uVar33;
                lVar46 = lVar46 + (ulong)bVar61;
                uVar47 = uVar47 + 1;
                psVar39 = psVar39 + 1;
                psVar57 = psVar57 + 1;
              } while (count != uVar47);
              goto LAB_00b43248;
            }
            goto LAB_00b43245;
          }
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_4a8);
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_428);
          Vector::ToUnifiedFormat(left,count,(UnifiedVectorFormat *)local_4a8);
          Vector::ToUnifiedFormat(right,count,(UnifiedVectorFormat *)local_428);
          uVar17 = LStack_4a0._0_8_;
          uVar19 = LStack_420._0_8_;
          if (LStack_420.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
              (element_type *)0x0 &&
              LStack_4a0.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
              (element_type *)0x0) {
            if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
              if (true_sel.ptr == (SelectionVector *)0x0) {
                if (count == 0) goto LAB_00b44617;
                psVar11 = (sel.ptr)->sel_vector;
                lVar46 = *(long *)local_4a8;
                psVar12 = *(sel_t **)local_428;
                lVar48 = 0;
                iVar34 = 0;
                do {
                  iVar23 = iVar34;
                  if (psVar11 != (sel_t *)0x0) {
                    iVar23 = (idx_t)psVar11[iVar34];
                  }
                  iVar28 = iVar34;
                  if (lVar46 != 0) {
                    iVar28 = (idx_t)*(uint *)(lVar46 + iVar34 * 4);
                  }
                  iVar35 = iVar34;
                  if (psVar12 != (sel_t *)0x0) {
                    iVar35 = (idx_t)psVar12[iVar34];
                  }
                  bVar61 = string_t::operator==
                                     ((string_t *)(uVar17 + iVar28 * 0x10),
                                      (string_t *)(uVar19 + iVar35 * 0x10));
                  if (bVar61) {
                    (false_sel.ptr)->sel_vector[lVar48] = (sel_t)iVar23;
                    lVar48 = lVar48 + 1;
                  }
                  iVar34 = iVar34 + 1;
                } while (count != iVar34);
                goto LAB_00b44619;
              }
              if (count == 0) goto LAB_00b4271b;
              psVar11 = (sel.ptr)->sel_vector;
              lVar46 = *(long *)local_4a8;
              psVar12 = *(sel_t **)local_428;
              iVar34 = 0;
              local_4c8 = (element_type *)0x0;
              do {
                iVar23 = iVar34;
                if (psVar11 != (sel_t *)0x0) {
                  iVar23 = (idx_t)psVar11[iVar34];
                }
                iVar28 = iVar34;
                if (lVar46 != 0) {
                  iVar28 = (idx_t)*(uint *)(lVar46 + iVar34 * 4);
                }
                iVar35 = iVar34;
                if (psVar12 != (sel_t *)0x0) {
                  iVar35 = (idx_t)psVar12[iVar34];
                }
                bVar61 = string_t::operator==
                                   ((string_t *)(uVar17 + iVar28 * 0x10),
                                    (string_t *)(uVar19 + iVar35 * 0x10));
                if (!bVar61) {
                  (true_sel.ptr)->sel_vector[(long)local_4c8] = (sel_t)iVar23;
                  local_4c8 = (element_type *)((long)&local_4c8->_vptr_ExtraTypeInfo + 1);
                }
                iVar34 = iVar34 + 1;
              } while (count != iVar34);
            }
            else {
              if (count == 0) goto LAB_00b4271b;
              psVar11 = (sel.ptr)->sel_vector;
              lVar46 = *(long *)local_4a8;
              psVar12 = *(sel_t **)local_428;
              peVar29 = (element_type *)0x0;
              local_4c8 = (element_type *)0x0;
              iVar34 = 0;
              do {
                iVar23 = iVar34;
                if (psVar11 != (sel_t *)0x0) {
                  iVar23 = (idx_t)psVar11[iVar34];
                }
                iVar28 = iVar34;
                if (lVar46 != 0) {
                  iVar28 = (idx_t)*(uint *)(lVar46 + iVar34 * 4);
                }
                iVar35 = iVar34;
                if (psVar12 != (sel_t *)0x0) {
                  iVar35 = (idx_t)psVar12[iVar34];
                }
                bVar61 = string_t::operator==
                                   ((string_t *)(uVar17 + iVar28 * 0x10),
                                    (string_t *)(uVar19 + iVar35 * 0x10));
                if (bVar61) {
                  peVar30 = peVar29;
                  oVar32.ptr = false_sel.ptr;
                  peVar29 = (element_type *)((long)&peVar29->_vptr_ExtraTypeInfo + 1);
                }
                else {
                  peVar30 = local_4c8;
                  oVar32.ptr = true_sel.ptr;
                  local_4c8 = (element_type *)((long)&local_4c8->_vptr_ExtraTypeInfo + 1);
                }
                (oVar32.ptr)->sel_vector[(long)peVar30] = (sel_t)iVar23;
                iVar34 = iVar34 + 1;
              } while (count != iVar34);
            }
          }
          else if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0
                  ) {
            if (true_sel.ptr == (SelectionVector *)0x0) {
              if (count == 0) goto LAB_00b44617;
              psVar11 = (sel.ptr)->sel_vector;
              lVar46 = *(long *)local_4a8;
              psVar12 = *(sel_t **)local_428;
              lVar48 = 0;
              iVar34 = 0;
              do {
                iVar23 = iVar34;
                if (psVar11 != (sel_t *)0x0) {
                  iVar23 = (idx_t)psVar11[iVar34];
                }
                iVar28 = iVar34;
                if (lVar46 != 0) {
                  iVar28 = (idx_t)*(uint *)(lVar46 + iVar34 * 4);
                }
                iVar35 = iVar34;
                if (psVar12 != (sel_t *)0x0) {
                  iVar35 = (idx_t)psVar12[iVar34];
                }
                if (LStack_4a0.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                    (element_type *)0x0) {
                  bVar61 = false;
                }
                else {
                  bVar61 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                             ._M_ptr + (iVar28 >> 6) * 8) >> (iVar28 & 0x3f) & 1) ==
                           0;
                }
                if (LStack_420.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                    (element_type *)0x0) {
                  bVar62 = false;
                }
                else {
                  bVar62 = ((ulong)(&(LStack_420.type_info_.internal.
                                      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr)->_vptr_ExtraTypeInfo)[iVar35 >> 6] >> (iVar35 & 0x3f)
                           & 1) == 0;
                }
                if ((bool)(bVar61 | bVar62)) {
                  bVar61 = (bool)(bVar61 ^ bVar62);
                }
                else {
                  bVar61 = string_t::operator==
                                     ((string_t *)(uVar17 + iVar28 * 0x10),
                                      (string_t *)(uVar19 + iVar35 * 0x10));
                  bVar61 = !bVar61;
                }
                if (!bVar61) {
                  (false_sel.ptr)->sel_vector[lVar48] = (sel_t)iVar23;
                  lVar48 = lVar48 + 1;
                }
                iVar34 = iVar34 + 1;
              } while (count != iVar34);
              goto LAB_00b44619;
            }
            if (count == 0) goto LAB_00b4271b;
            psVar11 = (sel.ptr)->sel_vector;
            lVar46 = *(long *)local_4a8;
            psVar12 = *(sel_t **)local_428;
            iVar34 = 0;
            local_4c8 = (element_type *)0x0;
            do {
              iVar23 = iVar34;
              if (psVar11 != (sel_t *)0x0) {
                iVar23 = (idx_t)psVar11[iVar34];
              }
              iVar28 = iVar34;
              if (lVar46 != 0) {
                iVar28 = (idx_t)*(uint *)(lVar46 + iVar34 * 4);
              }
              iVar35 = iVar34;
              if (psVar12 != (sel_t *)0x0) {
                iVar35 = (idx_t)psVar12[iVar34];
              }
              if (LStack_4a0.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                  (element_type *)0x0) {
                bVar61 = false;
              }
              else {
                bVar61 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_ptr + (iVar28 >> 6) * 8) >> (iVar28 & 0x3f) & 1) == 0
                ;
              }
              if (LStack_420.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                  (element_type *)0x0) {
                bVar62 = false;
              }
              else {
                bVar62 = ((ulong)(&(LStack_420.type_info_.internal.
                                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr)->_vptr_ExtraTypeInfo)[iVar35 >> 6] >> (iVar35 & 0x3f) &
                         1) == 0;
              }
              if ((bool)(bVar61 | bVar62)) {
                bVar61 = (bool)(bVar61 ^ bVar62);
              }
              else {
                bVar61 = string_t::operator==
                                   ((string_t *)(uVar17 + iVar28 * 0x10),
                                    (string_t *)(uVar19 + iVar35 * 0x10));
                bVar61 = !bVar61;
              }
              if (bVar61) {
                (true_sel.ptr)->sel_vector[(long)local_4c8] = (sel_t)iVar23;
                local_4c8 = (element_type *)((long)&local_4c8->_vptr_ExtraTypeInfo + 1);
              }
              iVar34 = iVar34 + 1;
            } while (count != iVar34);
          }
          else {
            if (count == 0) goto LAB_00b4271b;
            psVar11 = (sel.ptr)->sel_vector;
            lVar46 = *(long *)local_4a8;
            psVar12 = *(sel_t **)local_428;
            local_4c8 = (element_type *)0x0;
            iVar34 = 0;
            peVar29 = (element_type *)0x0;
            do {
              iVar23 = iVar34;
              if (psVar11 != (sel_t *)0x0) {
                iVar23 = (idx_t)psVar11[iVar34];
              }
              iVar28 = iVar34;
              if (lVar46 != 0) {
                iVar28 = (idx_t)*(uint *)(lVar46 + iVar34 * 4);
              }
              iVar35 = iVar34;
              if (psVar12 != (sel_t *)0x0) {
                iVar35 = (idx_t)psVar12[iVar34];
              }
              if (LStack_4a0.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                  (element_type *)0x0) {
                bVar61 = false;
              }
              else {
                bVar61 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_ptr + (iVar28 >> 6) * 8) >> (iVar28 & 0x3f) & 1) == 0
                ;
              }
              if (LStack_420.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                  (element_type *)0x0) {
                bVar62 = false;
              }
              else {
                bVar62 = ((ulong)(&(LStack_420.type_info_.internal.
                                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr)->_vptr_ExtraTypeInfo)[iVar35 >> 6] >> (iVar35 & 0x3f) &
                         1) == 0;
              }
              if ((bool)(bVar61 | bVar62)) {
                bVar61 = (bool)(bVar61 ^ bVar62);
              }
              else {
                bVar61 = string_t::operator==
                                   ((string_t *)(uVar17 + iVar28 * 0x10),
                                    (string_t *)(uVar19 + iVar35 * 0x10));
                bVar61 = !bVar61;
              }
              if (bVar61) {
                peVar30 = local_4c8;
                oVar32.ptr = true_sel.ptr;
                peVar43 = peVar29;
                local_4c8 = (element_type *)((long)&local_4c8->_vptr_ExtraTypeInfo + 1);
              }
              else {
                peVar43 = (element_type *)((long)&peVar29->_vptr_ExtraTypeInfo + 1);
                peVar30 = peVar29;
                oVar32.ptr = false_sel.ptr;
              }
              (oVar32.ptr)->sel_vector[(long)peVar30] = (sel_t)iVar23;
              iVar34 = iVar34 + 1;
              peVar29 = peVar43;
            } while (count != iVar34);
          }
          goto LAB_00b44626;
        }
        psVar39 = (string_t *)left->data;
        psVar57 = (string_t *)right->data;
        _local_4a8 = (undefined1  [16])0x0;
        LStack_4a0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        LStack_4a0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
        puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if ((puVar5 != (unsigned_long *)0x0) && ((*puVar5 & 1) == 0)) {
          local_2a8._0_8_ = 0x800;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)local_428,(unsigned_long *)&local_2a8);
          peVar29 = LStack_4a0.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          auVar18 = local_428;
          LStack_4a0.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)LStack_420._0_8_;
          _local_428 = (undefined1  [16])0x0;
          LStack_4a0._0_8_ = auVar18;
          if (peVar29 != (element_type *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar29);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_);
          }
          pTVar25 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                               (local_4a8 + 8));
          _Var9.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
               (pTVar25->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>;
          local_4a8 = (undefined1  [8])
                      _Var9.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
          *(undefined8 *)_Var9.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
               0xfffffffffffffffe;
        }
        FlatVector::VerifyFlatVector(left);
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            if (count == 0) goto LAB_00b412cc;
            lVar46 = 0;
            uVar47 = 0;
            do {
              uVar33 = uVar47;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                uVar33 = (ulong)(sel.ptr)->sel_vector[uVar47];
              }
              puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
              if (puVar5 == (unsigned_long *)0x0) {
                bVar61 = false;
              }
              else {
                bVar61 = (puVar5[uVar47 >> 6] >> (uVar47 & 0x3f) & 1) == 0;
              }
              if (local_4a8 == (undefined1  [8])0x0) {
                bVar62 = false;
              }
              else {
                bVar62 = (*(byte *)local_4a8 & 1) == 0;
              }
              if ((bVar61 | bVar62) == 1) {
                bVar61 = (bool)(bVar61 ^ bVar62 ^ 1);
              }
              else {
                bVar61 = string_t::operator==(psVar39,psVar57);
              }
              (false_sel.ptr)->sel_vector[lVar46] = (sel_t)uVar33;
              lVar46 = lVar46 + (ulong)bVar61;
              uVar47 = uVar47 + 1;
              psVar39 = psVar39 + 1;
            } while (count != uVar47);
            goto LAB_00b412d7;
          }
          if (count != 0) {
            uVar47 = 0;
            local_4c8 = (element_type *)0x0;
            do {
              uVar33 = uVar47;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                uVar33 = (ulong)(sel.ptr)->sel_vector[uVar47];
              }
              puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
              if (puVar5 == (unsigned_long *)0x0) {
                bVar61 = false;
              }
              else {
                bVar61 = (puVar5[uVar47 >> 6] >> (uVar47 & 0x3f) & 1) == 0;
              }
              if (local_4a8 == (undefined1  [8])0x0) {
                bVar62 = false;
              }
              else {
                bVar62 = (*(byte *)local_4a8 & 1) == 0;
              }
              if ((bVar61 | bVar62) == 1) {
                bVar61 = (bool)(bVar61 ^ bVar62);
              }
              else {
                bVar61 = string_t::operator==(psVar39,psVar57);
                bVar61 = !bVar61;
              }
              (true_sel.ptr)->sel_vector[(long)local_4c8] = (sel_t)uVar33;
              local_4c8 = (element_type *)((long)&local_4c8->_vptr_ExtraTypeInfo + (ulong)bVar61);
              uVar47 = uVar47 + 1;
              psVar39 = psVar39 + 1;
              local_488._M_pi =
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   LStack_4a0.type_info_.internal.
                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            } while (count != uVar47);
            goto LAB_00b412e1;
          }
        }
        else if (count != 0) {
          lVar46 = 0;
          local_4c8 = (element_type *)0x0;
          uVar47 = 0;
          do {
            uVar33 = uVar47;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              uVar33 = (ulong)(sel.ptr)->sel_vector[uVar47];
            }
            puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (puVar5 == (unsigned_long *)0x0) {
              bVar61 = false;
            }
            else {
              bVar61 = (puVar5[uVar47 >> 6] >> (uVar47 & 0x3f) & 1) == 0;
            }
            if (local_4a8 == (undefined1  [8])0x0) {
              bVar62 = false;
            }
            else {
              bVar62 = (*(byte *)local_4a8 & 1) == 0;
            }
            if ((bVar61 | bVar62) == 1) {
              bVar61 = (bool)(bVar61 ^ bVar62);
            }
            else {
              bVar61 = string_t::operator==(psVar39,psVar57);
              bVar61 = !bVar61;
            }
            (true_sel.ptr)->sel_vector[(long)local_4c8] = (sel_t)uVar33;
            local_4c8 = (element_type *)((long)&local_4c8->_vptr_ExtraTypeInfo + (ulong)bVar61);
            (false_sel.ptr)->sel_vector[lVar46] = (sel_t)uVar33;
            lVar46 = lVar46 + (ulong)(bVar61 ^ 1);
            uVar47 = uVar47 + 1;
            psVar39 = psVar39 + 1;
            local_488._M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 LStack_4a0.type_info_.internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          } while (count != uVar47);
          goto LAB_00b412e1;
        }
      }
    }
    else {
      if (PVar2 != UINT128) {
        if (PVar2 != INT128) goto switchD_00b348e8_caseD_a;
        local_328 = (undefined1  [8])null_mask.ptr;
        if (sel.ptr == (SelectionVector *)0x0) {
          sel.ptr = FlatVector::IncrementalSelectionVector();
        }
        if (local_328 != (undefined1  [8])0x0) {
          optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                    ((optional_ptr<duckdb::ValidityMask,_true> *)local_328);
          UpdateNullMask(left,sel.ptr,count,(ValidityMask *)local_328);
          optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                    ((optional_ptr<duckdb::ValidityMask,_true> *)local_328);
          UpdateNullMask(right,sel.ptr,count,(ValidityMask *)local_328);
        }
        VVar3 = left->vector_type;
        VVar4 = right->vector_type;
        if ((VVar3 ^ CONSTANT_VECTOR) == FLAT_VECTOR && (VVar4 ^ CONSTANT_VECTOR) == FLAT_VECTOR) {
          puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if (puVar5 == (unsigned_long *)0x0) {
            bVar61 = false;
          }
          else {
            bVar61 = (*puVar5 & 1) == 0;
          }
          puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if (puVar5 == (unsigned_long *)0x0) {
            bVar62 = false;
          }
          else {
            bVar62 = (*puVar5 & 1) == 0;
          }
          if ((bool)(bVar61 | bVar62)) {
            bVar61 = (bool)(bVar61 ^ bVar62);
          }
          else {
            bVar61 = *(long *)((long)left->data + 8) != *(long *)((long)right->data + 8) ||
                     *(long *)left->data != *(long *)right->data;
          }
          if (!bVar61) {
            if (false_sel.ptr == (SelectionVector *)0x0 || count == 0) {
              return (idx_t)(element_type *)0x0;
            }
            psVar11 = (sel.ptr)->sel_vector;
            psVar12 = (false_sel.ptr)->sel_vector;
            iVar34 = 0;
            do {
              sVar44 = (sel_t)iVar34;
              if (psVar11 != (sel_t *)0x0) {
                sVar44 = psVar11[iVar34];
              }
              psVar12[iVar34] = sVar44;
              iVar34 = iVar34 + 1;
            } while (count != iVar34);
            return (idx_t)(element_type *)0x0;
          }
          if (true_sel.ptr != (SelectionVector *)0x0 && count != 0) {
            psVar11 = (sel.ptr)->sel_vector;
            psVar12 = (true_sel.ptr)->sel_vector;
            iVar34 = 0;
            do {
              sVar44 = (sel_t)iVar34;
              if (psVar11 != (sel_t *)0x0) {
                sVar44 = psVar11[iVar34];
              }
              psVar12[iVar34] = sVar44;
              iVar34 = iVar34 + 1;
            } while (count != iVar34);
            return count;
          }
          return count;
        }
        if ((VVar3 ^ CONSTANT_VECTOR) == FLAT_VECTOR && VVar4 == FLAT_VECTOR) {
          plVar53 = (long *)left->data;
          pdVar8 = right->data;
          _local_4a8 = (undefined1  [16])0x0;
          LStack_4a0.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          LStack_4a0.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
          puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if ((puVar5 != (unsigned_long *)0x0) && ((*puVar5 & 1) == 0)) {
            local_2a8._0_8_ = 0x800;
            make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                      ((duckdb *)local_428,(unsigned_long *)&local_2a8);
            peVar29 = LStack_4a0.type_info_.internal.
                      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            auVar18 = local_428;
            LStack_4a0.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)LStack_420._0_8_;
            _local_428 = (undefined1  [16])0x0;
            LStack_4a0._0_8_ = auVar18;
            if (peVar29 != (element_type *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar29);
            }
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_);
            }
            pTVar25 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                                 (local_4a8 + 8));
            _Var9.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
                 (pTVar25->owned_data).
                 super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                 super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                 super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                 super__Head_base<0UL,_unsigned_long_*,_false>;
            local_4a8 = (undefined1  [8])
                        _Var9.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
            *(undefined8 *)_Var9.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
                 0xfffffffffffffffe;
          }
          FlatVector::VerifyFlatVector(right);
          local_118.selection_data.internal.
          super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               LStack_4a0.type_info_.internal.
               super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
            if (true_sel.ptr == (SelectionVector *)0x0) {
              if (count == 0) goto LAB_00b413a4;
              psVar11 = (sel.ptr)->sel_vector;
              puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
              psVar12 = (false_sel.ptr)->sel_vector;
              plVar54 = (long *)(pdVar8 + 8);
              lVar46 = 0;
              uVar47 = 0;
              do {
                uVar33 = uVar47;
                if (psVar11 != (sel_t *)0x0) {
                  uVar33 = (ulong)psVar11[uVar47];
                }
                if (local_4a8 == (undefined1  [8])0x0) {
                  bVar61 = false;
                }
                else {
                  bVar61 = (*(byte *)local_4a8 & 1) == 0;
                }
                if (puVar5 == (unsigned_long *)0x0) {
                  bVar62 = false;
                }
                else {
                  bVar62 = (puVar5[uVar47 >> 6] >> (uVar47 & 0x3f) & 1) == 0;
                }
                if ((bVar61 | bVar62) == 1) {
                  bVar61 = (bool)(bVar61 ^ bVar62);
                }
                else {
                  bVar61 = plVar53[1] != *plVar54 || *plVar53 != plVar54[-1];
                }
                psVar12[lVar46] = (sel_t)uVar33;
                lVar46 = lVar46 + (ulong)(bVar61 ^ 1);
                uVar47 = uVar47 + 1;
                plVar54 = plVar54 + 2;
              } while (count != uVar47);
              goto LAB_00b413a6;
            }
            if (count != 0) {
              psVar11 = (sel.ptr)->sel_vector;
              puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
              psVar12 = (true_sel.ptr)->sel_vector;
              plVar54 = (long *)(pdVar8 + 8);
              uVar47 = 0;
              local_4c8 = (element_type *)0x0;
              do {
                uVar33 = uVar47;
                if (psVar11 != (sel_t *)0x0) {
                  uVar33 = (ulong)psVar11[uVar47];
                }
                if (local_4a8 == (undefined1  [8])0x0) {
                  bVar61 = false;
                }
                else {
                  bVar61 = (*(byte *)local_4a8 & 1) == 0;
                }
                if (puVar5 == (unsigned_long *)0x0) {
                  bVar62 = false;
                }
                else {
                  bVar62 = (puVar5[uVar47 >> 6] >> (uVar47 & 0x3f) & 1) == 0;
                }
                if ((bVar61 | bVar62) == 1) {
                  bVar61 = (bool)(bVar61 ^ bVar62);
                }
                else {
                  bVar61 = plVar53[1] != *plVar54 || *plVar53 != plVar54[-1];
                }
                psVar12[(long)local_4c8] = (sel_t)uVar33;
                local_4c8 = (element_type *)((long)&local_4c8->_vptr_ExtraTypeInfo + (ulong)bVar61);
                uVar47 = uVar47 + 1;
                plVar54 = plVar54 + 2;
              } while (count != uVar47);
              goto LAB_00b413b3;
            }
          }
          else if (count != 0) {
            psVar11 = (sel.ptr)->sel_vector;
            puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            psVar12 = (true_sel.ptr)->sel_vector;
            psVar10 = (false_sel.ptr)->sel_vector;
            plVar54 = (long *)(pdVar8 + 8);
            lVar46 = 0;
            local_4c8 = (element_type *)0x0;
            uVar47 = 0;
            do {
              uVar33 = uVar47;
              if (psVar11 != (sel_t *)0x0) {
                uVar33 = (ulong)psVar11[uVar47];
              }
              if (local_4a8 == (undefined1  [8])0x0) {
                bVar61 = false;
              }
              else {
                bVar61 = (*(byte *)local_4a8 & 1) == 0;
              }
              if (puVar5 == (unsigned_long *)0x0) {
                bVar62 = false;
              }
              else {
                bVar62 = (puVar5[uVar47 >> 6] >> (uVar47 & 0x3f) & 1) == 0;
              }
              if ((bVar61 | bVar62) == 1) {
                bVar61 = (bool)(bVar61 ^ bVar62);
              }
              else {
                bVar61 = plVar53[1] != *plVar54 || *plVar53 != plVar54[-1];
              }
              psVar12[(long)local_4c8] = (sel_t)uVar33;
              local_4c8 = (element_type *)((long)&local_4c8->_vptr_ExtraTypeInfo + (ulong)bVar61);
              psVar10[lVar46] = (sel_t)uVar33;
              lVar46 = lVar46 + (ulong)(bVar61 ^ 1);
              uVar47 = uVar47 + 1;
              plVar54 = plVar54 + 2;
            } while (count != uVar47);
            goto LAB_00b413b3;
          }
        }
        else {
          if ((VVar4 ^ CONSTANT_VECTOR) != FLAT_VECTOR || VVar3 != FLAT_VECTOR) {
            if (VVar3 == FLAT_VECTOR && VVar4 == FLAT_VECTOR) {
              pdVar8 = left->data;
              pdVar13 = right->data;
              FlatVector::VerifyFlatVector(left);
              FlatVector::VerifyFlatVector(right);
              if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0)
              {
                if (count == 0) {
                  return (idx_t)(element_type *)0x0;
                }
                psVar11 = (sel.ptr)->sel_vector;
                puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
                puVar14 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask
                ;
                psVar12 = (true_sel.ptr)->sel_vector;
                psVar10 = (false_sel.ptr)->sel_vector;
                lVar46 = 8;
                lVar48 = 0;
                peVar29 = (element_type *)0x0;
                uVar47 = 0;
                do {
                  uVar33 = uVar47;
                  if (psVar11 != (sel_t *)0x0) {
                    uVar33 = (ulong)psVar11[uVar47];
                  }
                  if (puVar5 == (unsigned_long *)0x0) {
                    bVar61 = false;
                  }
                  else {
                    bVar61 = (puVar5[uVar47 >> 6] >> (uVar47 & 0x3f) & 1) == 0;
                  }
                  if (puVar14 == (unsigned_long *)0x0) {
                    bVar62 = false;
                  }
                  else {
                    bVar62 = (puVar14[uVar47 >> 6] >> (uVar47 & 0x3f) & 1) == 0;
                  }
                  if ((bVar61 | bVar62) == 1) {
                    bVar61 = (bool)(bVar61 ^ bVar62);
                  }
                  else {
                    bVar61 = *(long *)(pdVar8 + lVar46) != *(long *)(pdVar13 + lVar46) ||
                             *(long *)(pdVar8 + lVar46 + -8) != *(long *)(pdVar13 + lVar46 + -8);
                  }
                  psVar12[(long)peVar29] = (sel_t)uVar33;
                  peVar29 = (element_type *)((long)&peVar29->_vptr_ExtraTypeInfo + (ulong)bVar61);
                  psVar10[lVar48] = (sel_t)uVar33;
                  lVar48 = lVar48 + (ulong)(bVar61 ^ 1);
                  uVar47 = uVar47 + 1;
                  lVar46 = lVar46 + 0x10;
                } while (count != uVar47);
                return (idx_t)peVar29;
              }
              if (true_sel.ptr != (SelectionVector *)0x0) {
                if (count == 0) {
                  return (idx_t)(element_type *)0x0;
                }
                psVar11 = (sel.ptr)->sel_vector;
                puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
                puVar14 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask
                ;
                psVar12 = (true_sel.ptr)->sel_vector;
                lVar46 = 8;
                uVar47 = 0;
                peVar29 = (element_type *)0x0;
                do {
                  uVar33 = uVar47;
                  if (psVar11 != (sel_t *)0x0) {
                    uVar33 = (ulong)psVar11[uVar47];
                  }
                  if (puVar5 == (unsigned_long *)0x0) {
                    bVar61 = false;
                  }
                  else {
                    bVar61 = (puVar5[uVar47 >> 6] >> (uVar47 & 0x3f) & 1) == 0;
                  }
                  if (puVar14 == (unsigned_long *)0x0) {
                    bVar62 = false;
                  }
                  else {
                    bVar62 = (puVar14[uVar47 >> 6] >> (uVar47 & 0x3f) & 1) == 0;
                  }
                  if ((bVar61 | bVar62) == 1) {
                    bVar61 = (bool)(bVar61 ^ bVar62);
                  }
                  else {
                    bVar61 = *(long *)(pdVar8 + lVar46) != *(long *)(pdVar13 + lVar46) ||
                             *(long *)(pdVar8 + lVar46 + -8) != *(long *)(pdVar13 + lVar46 + -8);
                  }
                  psVar12[(long)peVar29] = (sel_t)uVar33;
                  peVar29 = (element_type *)((long)&peVar29->_vptr_ExtraTypeInfo + (ulong)bVar61);
                  uVar47 = uVar47 + 1;
                  lVar46 = lVar46 + 0x10;
                } while (count != uVar47);
                return (idx_t)peVar29;
              }
              if (count != 0) {
                psVar11 = (sel.ptr)->sel_vector;
                puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
                puVar14 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask
                ;
                psVar12 = (false_sel.ptr)->sel_vector;
                lVar48 = 8;
                lVar46 = 0;
                uVar47 = 0;
                do {
                  uVar33 = uVar47;
                  if (psVar11 != (sel_t *)0x0) {
                    uVar33 = (ulong)psVar11[uVar47];
                  }
                  if (puVar5 == (unsigned_long *)0x0) {
                    bVar61 = false;
                  }
                  else {
                    bVar61 = (puVar5[uVar47 >> 6] >> (uVar47 & 0x3f) & 1) == 0;
                  }
                  if (puVar14 == (unsigned_long *)0x0) {
                    bVar62 = false;
                  }
                  else {
                    bVar62 = (puVar14[uVar47 >> 6] >> (uVar47 & 0x3f) & 1) == 0;
                  }
                  if ((bVar61 | bVar62) == 1) {
                    bVar61 = (bool)(bVar61 ^ bVar62);
                  }
                  else {
                    bVar61 = *(long *)(pdVar8 + lVar48) != *(long *)(pdVar13 + lVar48) ||
                             *(long *)(pdVar8 + lVar48 + -8) != *(long *)(pdVar13 + lVar48 + -8);
                  }
                  psVar12[lVar46] = (sel_t)uVar33;
                  lVar46 = lVar46 + (ulong)(bVar61 ^ 1);
                  uVar47 = uVar47 + 1;
                  lVar48 = lVar48 + 0x10;
                } while (count != uVar47);
                goto LAB_00b4331a;
              }
              goto LAB_00b43318;
            }
            UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_4a8);
            UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_428);
            Vector::ToUnifiedFormat(left,count,(UnifiedVectorFormat *)local_4a8);
            Vector::ToUnifiedFormat(right,count,(UnifiedVectorFormat *)local_428);
            if (LStack_4a0.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0 &&
                LStack_420.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0)
              {
                if (true_sel.ptr == (SelectionVector *)0x0) {
                  if (count == 0) goto LAB_00b446da;
                  psVar11 = (sel.ptr)->sel_vector;
                  lVar46 = *(long *)local_4a8;
                  psVar12 = *(sel_t **)local_428;
                  lVar48 = 0;
                  iVar34 = 0;
                  do {
                    iVar23 = iVar34;
                    if (psVar11 != (sel_t *)0x0) {
                      iVar23 = (idx_t)psVar11[iVar34];
                    }
                    iVar28 = iVar34;
                    if (lVar46 != 0) {
                      iVar28 = (idx_t)*(uint *)(lVar46 + iVar34 * 4);
                    }
                    iVar35 = iVar34;
                    if (psVar12 != (sel_t *)0x0) {
                      iVar35 = (idx_t)psVar12[iVar34];
                    }
                    if ((*(long *)(LStack_4a0._0_8_ + iVar28 * 0x10) ==
                         *(long *)(LStack_420._0_8_ + iVar35 * 0x10)) &&
                       (*(long *)(LStack_4a0._0_8_ + (iVar28 * 2 + 1) * 8) ==
                        *(long *)(LStack_420._0_8_ + iVar35 * 0x10 + 8))) {
                      (false_sel.ptr)->sel_vector[lVar48] = (sel_t)iVar23;
                      lVar48 = lVar48 + 1;
                    }
                    iVar34 = iVar34 + 1;
                  } while (count != iVar34);
                  goto LAB_00b446dc;
                }
                if (count == 0) goto LAB_00b428a4;
                psVar11 = (sel.ptr)->sel_vector;
                lVar46 = *(long *)local_4a8;
                psVar12 = *(sel_t **)local_428;
                iVar34 = 0;
                local_4c8 = (element_type *)0x0;
                do {
                  iVar23 = iVar34;
                  if (psVar11 != (sel_t *)0x0) {
                    iVar23 = (idx_t)psVar11[iVar34];
                  }
                  iVar28 = iVar34;
                  if (lVar46 != 0) {
                    iVar28 = (idx_t)*(uint *)(lVar46 + iVar34 * 4);
                  }
                  iVar35 = iVar34;
                  if (psVar12 != (sel_t *)0x0) {
                    iVar35 = (idx_t)psVar12[iVar34];
                  }
                  if ((*(long *)(LStack_4a0._0_8_ + iVar28 * 0x10) !=
                       *(long *)(LStack_420._0_8_ + iVar35 * 0x10)) ||
                     (*(long *)(LStack_4a0._0_8_ + (iVar28 * 2 + 1) * 8) !=
                      *(long *)(LStack_420._0_8_ + iVar35 * 0x10 + 8))) {
                    (true_sel.ptr)->sel_vector[(long)local_4c8] = (sel_t)iVar23;
                    local_4c8 = (element_type *)((long)&local_4c8->_vptr_ExtraTypeInfo + 1);
                  }
                  iVar34 = iVar34 + 1;
                } while (count != iVar34);
              }
              else {
                if (count == 0) goto LAB_00b428a4;
                psVar11 = (sel.ptr)->sel_vector;
                lVar46 = *(long *)local_4a8;
                psVar12 = *(sel_t **)local_428;
                iVar34 = 0;
                peVar29 = (element_type *)0x0;
                peVar30 = (element_type *)0x0;
                do {
                  iVar23 = iVar34;
                  if (psVar11 != (sel_t *)0x0) {
                    iVar23 = (idx_t)psVar11[iVar34];
                  }
                  iVar28 = iVar34;
                  if (lVar46 != 0) {
                    iVar28 = (idx_t)*(uint *)(lVar46 + iVar34 * 4);
                  }
                  iVar35 = iVar34;
                  if (psVar12 != (sel_t *)0x0) {
                    iVar35 = (idx_t)psVar12[iVar34];
                  }
                  if ((*(long *)(LStack_4a0._0_8_ + iVar28 * 0x10) ==
                       *(long *)(LStack_420._0_8_ + iVar35 * 0x10)) &&
                     (*(long *)(LStack_4a0._0_8_ + (iVar28 * 2 + 1) * 8) ==
                      *(long *)(LStack_420._0_8_ + iVar35 * 0x10 + 8))) {
                    oVar32.ptr = false_sel.ptr;
                    peVar43 = (element_type *)((long)&peVar29->_vptr_ExtraTypeInfo + 1);
                    local_4c8 = peVar30;
                  }
                  else {
                    local_4c8 = (element_type *)((long)&peVar30->_vptr_ExtraTypeInfo + 1);
                    oVar32.ptr = true_sel.ptr;
                    peVar43 = peVar29;
                    peVar29 = peVar30;
                  }
                  (oVar32.ptr)->sel_vector[(long)peVar29] = (sel_t)iVar23;
                  iVar34 = iVar34 + 1;
                  peVar29 = peVar43;
                  peVar30 = local_4c8;
                } while (count != iVar34);
              }
            }
            else if (false_sel.ptr == (SelectionVector *)0x0 ||
                     true_sel.ptr == (SelectionVector *)0x0) {
              if (true_sel.ptr == (SelectionVector *)0x0) {
                if (count == 0) goto LAB_00b447cb;
                psVar11 = (sel.ptr)->sel_vector;
                lVar46 = *(long *)local_4a8;
                psVar12 = *(sel_t **)local_428;
                lVar48 = 0;
                iVar34 = 0;
                do {
                  iVar23 = iVar34;
                  if (psVar11 != (sel_t *)0x0) {
                    iVar23 = (idx_t)psVar11[iVar34];
                  }
                  iVar28 = iVar34;
                  if (lVar46 != 0) {
                    iVar28 = (idx_t)*(uint *)(lVar46 + iVar34 * 4);
                  }
                  iVar35 = iVar34;
                  if (psVar12 != (sel_t *)0x0) {
                    iVar35 = (idx_t)psVar12[iVar34];
                  }
                  if (LStack_4a0.type_info_.internal.
                      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                      == (element_type *)0x0) {
                    bVar61 = false;
                  }
                  else {
                    bVar61 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                               super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                               ._M_ptr + (iVar28 >> 6) * 8) >> (iVar28 & 0x3f) & 1)
                             == 0;
                  }
                  if (LStack_420.type_info_.internal.
                      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                      == (element_type *)0x0) {
                    bVar62 = false;
                  }
                  else {
                    bVar62 = ((ulong)(&(LStack_420.type_info_.internal.
                                        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr)->_vptr_ExtraTypeInfo)[iVar35 >> 6] >>
                              (iVar35 & 0x3f) & 1) == 0;
                  }
                  if ((bool)(bVar61 | bVar62)) {
                    bVar61 = (bool)(bVar61 ^ bVar62);
                  }
                  else {
                    bVar61 = ((long *)(LStack_4a0._0_8_ + iVar28 * 0x10))[1] !=
                             ((long *)(LStack_420._0_8_ + iVar35 * 0x10))[1] ||
                             *(long *)(LStack_4a0._0_8_ + iVar28 * 0x10) !=
                             *(long *)(LStack_420._0_8_ + iVar35 * 0x10);
                  }
                  if (!bVar61) {
                    (false_sel.ptr)->sel_vector[lVar48] = (sel_t)iVar23;
                    lVar48 = lVar48 + 1;
                  }
                  iVar34 = iVar34 + 1;
                } while (count != iVar34);
                goto LAB_00b447cd;
              }
              if (count == 0) goto LAB_00b428a4;
              psVar11 = (sel.ptr)->sel_vector;
              lVar46 = *(long *)local_4a8;
              psVar12 = *(sel_t **)local_428;
              iVar34 = 0;
              local_4c8 = (element_type *)0x0;
              do {
                iVar23 = iVar34;
                if (psVar11 != (sel_t *)0x0) {
                  iVar23 = (idx_t)psVar11[iVar34];
                }
                iVar28 = iVar34;
                if (lVar46 != 0) {
                  iVar28 = (idx_t)*(uint *)(lVar46 + iVar34 * 4);
                }
                iVar35 = iVar34;
                if (psVar12 != (sel_t *)0x0) {
                  iVar35 = (idx_t)psVar12[iVar34];
                }
                if (LStack_4a0.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                    (element_type *)0x0) {
                  bVar61 = false;
                }
                else {
                  bVar61 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                             ._M_ptr + (iVar28 >> 6) * 8) >> (iVar28 & 0x3f) & 1) ==
                           0;
                }
                if (LStack_420.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                    (element_type *)0x0) {
                  bVar62 = false;
                }
                else {
                  bVar62 = ((ulong)(&(LStack_420.type_info_.internal.
                                      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr)->_vptr_ExtraTypeInfo)[iVar35 >> 6] >> (iVar35 & 0x3f)
                           & 1) == 0;
                }
                if ((bool)(bVar61 | bVar62)) {
                  bVar61 = (bool)(bVar61 ^ bVar62);
                }
                else {
                  bVar61 = ((long *)(LStack_4a0._0_8_ + iVar28 * 0x10))[1] !=
                           ((long *)(LStack_420._0_8_ + iVar35 * 0x10))[1] ||
                           *(long *)(LStack_4a0._0_8_ + iVar28 * 0x10) !=
                           *(long *)(LStack_420._0_8_ + iVar35 * 0x10);
                }
                if (bVar61) {
                  (true_sel.ptr)->sel_vector[(long)local_4c8] = (sel_t)iVar23;
                  local_4c8 = (element_type *)((long)&local_4c8->_vptr_ExtraTypeInfo + 1);
                }
                iVar34 = iVar34 + 1;
              } while (count != iVar34);
            }
            else {
              if (count == 0) goto LAB_00b428a4;
              psVar11 = (sel.ptr)->sel_vector;
              lVar46 = *(long *)local_4a8;
              psVar12 = *(sel_t **)local_428;
              uVar47 = 0;
              peVar29 = (element_type *)0x0;
              peVar30 = (element_type *)0x0;
              do {
                uVar33 = uVar47;
                if (psVar11 != (sel_t *)0x0) {
                  uVar33 = (ulong)psVar11[uVar47];
                }
                uVar60 = uVar47;
                if (lVar46 != 0) {
                  uVar60 = (ulong)*(uint *)(lVar46 + uVar47 * 4);
                }
                uVar31 = uVar47;
                if (psVar12 != (sel_t *)0x0) {
                  uVar31 = (ulong)psVar12[uVar47];
                }
                if (LStack_4a0.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                    (element_type *)0x0) {
                  bVar61 = false;
                }
                else {
                  bVar61 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                             ._M_ptr + (uVar60 >> 6) * 8) >> (uVar60 & 0x3f) & 1) ==
                           0;
                }
                if (LStack_420.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                    (element_type *)0x0) {
                  bVar62 = false;
                }
                else {
                  bVar62 = ((ulong)(&(LStack_420.type_info_.internal.
                                      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr)->_vptr_ExtraTypeInfo)[uVar31 >> 6] >> (uVar31 & 0x3f)
                           & 1) == 0;
                }
                if ((bool)(bVar61 | bVar62)) {
                  bVar61 = (bool)(bVar61 ^ bVar62);
                }
                else {
                  bVar61 = ((long *)(LStack_4a0._0_8_ + uVar60 * 0x10))[1] !=
                           ((long *)(LStack_420._0_8_ + uVar31 * 0x10))[1] ||
                           *(long *)(LStack_4a0._0_8_ + uVar60 * 0x10) !=
                           *(long *)(LStack_420._0_8_ + uVar31 * 0x10);
                }
                if (bVar61) {
                  local_4c8 = (element_type *)((long)&peVar30->_vptr_ExtraTypeInfo + 1);
                  peVar43 = peVar29;
                  peVar29 = peVar30;
                  oVar32.ptr = true_sel.ptr;
                }
                else {
                  peVar43 = (element_type *)((long)&peVar29->_vptr_ExtraTypeInfo + 1);
                  local_4c8 = peVar30;
                  oVar32.ptr = false_sel.ptr;
                }
                (oVar32.ptr)->sel_vector[(long)peVar29] = (sel_t)uVar33;
                uVar47 = uVar47 + 1;
                peVar29 = peVar43;
                peVar30 = local_4c8;
              } while (count != uVar47);
            }
            goto LAB_00b447d5;
          }
          pdVar8 = left->data;
          plVar53 = (long *)right->data;
          _local_4a8 = (undefined1  [16])0x0;
          LStack_4a0.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          LStack_4a0.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
          puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if ((puVar5 != (unsigned_long *)0x0) && ((*puVar5 & 1) == 0)) {
            local_2a8._0_8_ = 0x800;
            make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                      ((duckdb *)local_428,(unsigned_long *)&local_2a8);
            peVar29 = LStack_4a0.type_info_.internal.
                      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            auVar18 = local_428;
            LStack_4a0.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)LStack_420._0_8_;
            _local_428 = (undefined1  [16])0x0;
            LStack_4a0._0_8_ = auVar18;
            if (peVar29 != (element_type *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar29);
            }
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_);
            }
            pTVar25 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                                 (local_4a8 + 8));
            _Var9.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
                 (pTVar25->owned_data).
                 super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                 super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                 super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                 super__Head_base<0UL,_unsigned_long_*,_false>;
            local_4a8 = (undefined1  [8])
                        _Var9.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
            *(undefined8 *)_Var9.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
                 0xfffffffffffffffe;
          }
          FlatVector::VerifyFlatVector(left);
          local_118.selection_data.internal.
          super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               LStack_4a0.type_info_.internal.
               super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
            if (true_sel.ptr == (SelectionVector *)0x0) {
              if (count == 0) goto LAB_00b413a4;
              psVar11 = (sel.ptr)->sel_vector;
              puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
              psVar12 = (false_sel.ptr)->sel_vector;
              plVar54 = (long *)(pdVar8 + 8);
              lVar46 = 0;
              uVar47 = 0;
              do {
                uVar33 = uVar47;
                if (psVar11 != (sel_t *)0x0) {
                  uVar33 = (ulong)psVar11[uVar47];
                }
                if (puVar5 == (unsigned_long *)0x0) {
                  bVar61 = false;
                }
                else {
                  bVar61 = (puVar5[uVar47 >> 6] >> (uVar47 & 0x3f) & 1) == 0;
                }
                if (local_4a8 == (undefined1  [8])0x0) {
                  bVar62 = false;
                }
                else {
                  bVar62 = (*(byte *)local_4a8 & 1) == 0;
                }
                if ((bVar61 | bVar62) == 1) {
                  bVar61 = (bool)(bVar61 ^ bVar62);
                }
                else {
                  bVar61 = *plVar54 != plVar53[1] || plVar54[-1] != *plVar53;
                }
                psVar12[lVar46] = (sel_t)uVar33;
                lVar46 = lVar46 + (ulong)(bVar61 ^ 1);
                uVar47 = uVar47 + 1;
                plVar54 = plVar54 + 2;
              } while (count != uVar47);
              goto LAB_00b413a6;
            }
            if (count != 0) {
              psVar11 = (sel.ptr)->sel_vector;
              puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
              psVar12 = (true_sel.ptr)->sel_vector;
              plVar54 = (long *)(pdVar8 + 8);
              uVar47 = 0;
              local_4c8 = (element_type *)0x0;
              do {
                uVar33 = uVar47;
                if (psVar11 != (sel_t *)0x0) {
                  uVar33 = (ulong)psVar11[uVar47];
                }
                if (puVar5 == (unsigned_long *)0x0) {
                  bVar61 = false;
                }
                else {
                  bVar61 = (puVar5[uVar47 >> 6] >> (uVar47 & 0x3f) & 1) == 0;
                }
                if (local_4a8 == (undefined1  [8])0x0) {
                  bVar62 = false;
                }
                else {
                  bVar62 = (*(byte *)local_4a8 & 1) == 0;
                }
                if ((bVar61 | bVar62) == 1) {
                  bVar61 = (bool)(bVar61 ^ bVar62);
                }
                else {
                  bVar61 = *plVar54 != plVar53[1] || plVar54[-1] != *plVar53;
                }
                psVar12[(long)local_4c8] = (sel_t)uVar33;
                local_4c8 = (element_type *)((long)&local_4c8->_vptr_ExtraTypeInfo + (ulong)bVar61);
                uVar47 = uVar47 + 1;
                plVar54 = plVar54 + 2;
              } while (count != uVar47);
              goto LAB_00b413b3;
            }
          }
          else if (count != 0) {
            psVar11 = (sel.ptr)->sel_vector;
            puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            psVar12 = (true_sel.ptr)->sel_vector;
            psVar10 = (false_sel.ptr)->sel_vector;
            plVar54 = (long *)(pdVar8 + 8);
            lVar46 = 0;
            local_4c8 = (element_type *)0x0;
            uVar47 = 0;
            do {
              uVar33 = uVar47;
              if (psVar11 != (sel_t *)0x0) {
                uVar33 = (ulong)psVar11[uVar47];
              }
              if (puVar5 == (unsigned_long *)0x0) {
                bVar61 = false;
              }
              else {
                bVar61 = (puVar5[uVar47 >> 6] >> (uVar47 & 0x3f) & 1) == 0;
              }
              if (local_4a8 == (undefined1  [8])0x0) {
                bVar62 = false;
              }
              else {
                bVar62 = (*(byte *)local_4a8 & 1) == 0;
              }
              if ((bVar61 | bVar62) == 1) {
                bVar61 = (bool)(bVar61 ^ bVar62);
              }
              else {
                bVar61 = *plVar54 != plVar53[1] || plVar54[-1] != *plVar53;
              }
              psVar12[(long)local_4c8] = (sel_t)uVar33;
              local_4c8 = (element_type *)((long)&local_4c8->_vptr_ExtraTypeInfo + (ulong)bVar61);
              psVar10[lVar46] = (sel_t)uVar33;
              lVar46 = lVar46 + (ulong)(bVar61 ^ 1);
              uVar47 = uVar47 + 1;
              plVar54 = plVar54 + 2;
            } while (count != uVar47);
            goto LAB_00b413b3;
          }
        }
        goto LAB_00b3e322;
      }
      local_328 = (undefined1  [8])null_mask.ptr;
      if (sel.ptr == (SelectionVector *)0x0) {
        sel.ptr = FlatVector::IncrementalSelectionVector();
      }
      if (local_328 != (undefined1  [8])0x0) {
        optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                  ((optional_ptr<duckdb::ValidityMask,_true> *)local_328);
        UpdateNullMask(left,sel.ptr,count,(ValidityMask *)local_328);
        optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                  ((optional_ptr<duckdb::ValidityMask,_true> *)local_328);
        UpdateNullMask(right,sel.ptr,count,(ValidityMask *)local_328);
      }
      VVar3 = left->vector_type;
      VVar4 = right->vector_type;
      if ((VVar3 ^ CONSTANT_VECTOR) == FLAT_VECTOR && (VVar4 ^ CONSTANT_VECTOR) == FLAT_VECTOR) {
        puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (puVar5 == (unsigned_long *)0x0) {
          bVar61 = false;
        }
        else {
          bVar61 = (*puVar5 & 1) == 0;
        }
        puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (puVar5 == (unsigned_long *)0x0) {
          bVar62 = false;
        }
        else {
          bVar62 = (*puVar5 & 1) == 0;
        }
        if ((bool)(bVar61 | bVar62)) {
          bVar61 = (bool)(bVar61 ^ bVar62);
        }
        else {
          bVar61 = uhugeint_t::operator==((uhugeint_t *)left->data,(uhugeint_t *)right->data);
          bVar61 = !bVar61;
        }
        if (!bVar61) {
          if (false_sel.ptr == (SelectionVector *)0x0 || count == 0) {
            return (idx_t)(element_type *)0x0;
          }
          psVar11 = (sel.ptr)->sel_vector;
          psVar12 = (false_sel.ptr)->sel_vector;
          iVar34 = 0;
          do {
            sVar44 = (sel_t)iVar34;
            if (psVar11 != (sel_t *)0x0) {
              sVar44 = psVar11[iVar34];
            }
            psVar12[iVar34] = sVar44;
            iVar34 = iVar34 + 1;
          } while (count != iVar34);
          return (idx_t)(element_type *)0x0;
        }
        if (true_sel.ptr != (SelectionVector *)0x0 && count != 0) {
          psVar11 = (sel.ptr)->sel_vector;
          psVar12 = (true_sel.ptr)->sel_vector;
          iVar34 = 0;
          do {
            sVar44 = (sel_t)iVar34;
            if (psVar11 != (sel_t *)0x0) {
              sVar44 = psVar11[iVar34];
            }
            psVar12[iVar34] = sVar44;
            iVar34 = iVar34 + 1;
          } while (count != iVar34);
          return count;
        }
        return count;
      }
      if ((VVar3 ^ CONSTANT_VECTOR) == FLAT_VECTOR && VVar4 == FLAT_VECTOR) {
        puVar40 = (uhugeint_t *)left->data;
        puVar58 = (uhugeint_t *)right->data;
        _local_4a8 = (undefined1  [16])0x0;
        LStack_4a0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        LStack_4a0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
        puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if ((puVar5 != (unsigned_long *)0x0) && ((*puVar5 & 1) == 0)) {
          local_2a8._0_8_ = 0x800;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)local_428,(unsigned_long *)&local_2a8);
          peVar29 = LStack_4a0.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          auVar18 = local_428;
          LStack_4a0.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)LStack_420._0_8_;
          _local_428 = (undefined1  [16])0x0;
          LStack_4a0._0_8_ = auVar18;
          if (peVar29 != (element_type *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar29);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_);
          }
          pTVar25 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                               (local_4a8 + 8));
          _Var9.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
               (pTVar25->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>;
          local_4a8 = (undefined1  [8])
                      _Var9.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
          *(undefined8 *)_Var9.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
               0xfffffffffffffffe;
        }
        FlatVector::VerifyFlatVector(right);
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            if (count == 0) goto LAB_00b412cc;
            lVar46 = 0;
            uVar47 = 0;
            do {
              uVar33 = uVar47;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                uVar33 = (ulong)(sel.ptr)->sel_vector[uVar47];
              }
              if (local_4a8 == (undefined1  [8])0x0) {
                bVar61 = false;
              }
              else {
                bVar61 = (*(byte *)local_4a8 & 1) == 0;
              }
              puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
              if (puVar5 == (unsigned_long *)0x0) {
                bVar62 = false;
              }
              else {
                bVar62 = (puVar5[uVar47 >> 6] >> (uVar47 & 0x3f) & 1) == 0;
              }
              if ((bVar61 | bVar62) == 1) {
                bVar61 = (bool)(bVar61 ^ bVar62 ^ 1);
              }
              else {
                bVar61 = uhugeint_t::operator==(puVar40,puVar58);
              }
              (false_sel.ptr)->sel_vector[lVar46] = (sel_t)uVar33;
              lVar46 = lVar46 + (ulong)bVar61;
              uVar47 = uVar47 + 1;
              puVar58 = puVar58 + 1;
            } while (count != uVar47);
            goto LAB_00b412d7;
          }
          if (count != 0) {
            uVar47 = 0;
            local_4c8 = (element_type *)0x0;
            do {
              uVar33 = uVar47;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                uVar33 = (ulong)(sel.ptr)->sel_vector[uVar47];
              }
              if (local_4a8 == (undefined1  [8])0x0) {
                bVar61 = false;
              }
              else {
                bVar61 = (*(byte *)local_4a8 & 1) == 0;
              }
              puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
              if (puVar5 == (unsigned_long *)0x0) {
                bVar62 = false;
              }
              else {
                bVar62 = (puVar5[uVar47 >> 6] >> (uVar47 & 0x3f) & 1) == 0;
              }
              if ((bVar61 | bVar62) == 1) {
                bVar61 = (bool)(bVar61 ^ bVar62);
              }
              else {
                bVar61 = uhugeint_t::operator==(puVar40,puVar58);
                bVar61 = !bVar61;
              }
              (true_sel.ptr)->sel_vector[(long)local_4c8] = (sel_t)uVar33;
              local_4c8 = (element_type *)((long)&local_4c8->_vptr_ExtraTypeInfo + (ulong)bVar61);
              uVar47 = uVar47 + 1;
              puVar58 = puVar58 + 1;
              local_488._M_pi =
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   LStack_4a0.type_info_.internal.
                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            } while (count != uVar47);
            goto LAB_00b412e1;
          }
        }
        else if (count != 0) {
          lVar46 = 0;
          local_4c8 = (element_type *)0x0;
          uVar47 = 0;
          do {
            uVar33 = uVar47;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              uVar33 = (ulong)(sel.ptr)->sel_vector[uVar47];
            }
            if (local_4a8 == (undefined1  [8])0x0) {
              bVar61 = false;
            }
            else {
              bVar61 = (*(byte *)local_4a8 & 1) == 0;
            }
            puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (puVar5 == (unsigned_long *)0x0) {
              bVar62 = false;
            }
            else {
              bVar62 = (puVar5[uVar47 >> 6] >> (uVar47 & 0x3f) & 1) == 0;
            }
            if ((bVar61 | bVar62) == 1) {
              bVar61 = (bool)(bVar61 ^ bVar62);
            }
            else {
              bVar61 = uhugeint_t::operator==(puVar40,puVar58);
              bVar61 = !bVar61;
            }
            (true_sel.ptr)->sel_vector[(long)local_4c8] = (sel_t)uVar33;
            local_4c8 = (element_type *)((long)&local_4c8->_vptr_ExtraTypeInfo + (ulong)bVar61);
            (false_sel.ptr)->sel_vector[lVar46] = (sel_t)uVar33;
            lVar46 = lVar46 + (ulong)(bVar61 ^ 1);
            uVar47 = uVar47 + 1;
            puVar58 = puVar58 + 1;
            local_488._M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 LStack_4a0.type_info_.internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          } while (count != uVar47);
          goto LAB_00b412e1;
        }
      }
      else {
        if ((VVar4 ^ CONSTANT_VECTOR) != FLAT_VECTOR || VVar3 != FLAT_VECTOR) {
          if (VVar3 == FLAT_VECTOR && VVar4 == FLAT_VECTOR) {
            puVar40 = (uhugeint_t *)left->data;
            puVar58 = (uhugeint_t *)right->data;
            FlatVector::VerifyFlatVector(left);
            FlatVector::VerifyFlatVector(right);
            if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
              if (count == 0) {
                return (idx_t)(element_type *)0x0;
              }
              lVar46 = 0;
              local_4c8 = (element_type *)0x0;
              uVar47 = 0;
              do {
                uVar33 = uVar47;
                if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                  uVar33 = (ulong)(sel.ptr)->sel_vector[uVar47];
                }
                puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
                if (puVar5 == (unsigned_long *)0x0) {
                  bVar61 = false;
                }
                else {
                  bVar61 = (puVar5[uVar47 >> 6] >> (uVar47 & 0x3f) & 1) == 0;
                }
                puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
                if (puVar5 == (unsigned_long *)0x0) {
                  bVar62 = false;
                }
                else {
                  bVar62 = (puVar5[uVar47 >> 6] >> (uVar47 & 0x3f) & 1) == 0;
                }
                if ((bVar61 | bVar62) == 1) {
                  bVar61 = (bool)(bVar61 ^ bVar62);
                }
                else {
                  bVar61 = uhugeint_t::operator==(puVar40,puVar58);
                  bVar61 = !bVar61;
                }
                (true_sel.ptr)->sel_vector[(long)local_4c8] = (sel_t)uVar33;
                local_4c8 = (element_type *)((long)&local_4c8->_vptr_ExtraTypeInfo + (ulong)bVar61);
                (false_sel.ptr)->sel_vector[lVar46] = (sel_t)uVar33;
                lVar46 = lVar46 + (ulong)(bVar61 ^ 1);
                uVar47 = uVar47 + 1;
                puVar40 = puVar40 + 1;
                puVar58 = puVar58 + 1;
              } while (count != uVar47);
              return (idx_t)local_4c8;
            }
            if (true_sel.ptr != (SelectionVector *)0x0) {
              if (count == 0) {
                return (idx_t)(element_type *)0x0;
              }
              uVar47 = 0;
              local_4c8 = (element_type *)0x0;
              do {
                uVar33 = uVar47;
                if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                  uVar33 = (ulong)(sel.ptr)->sel_vector[uVar47];
                }
                puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
                if (puVar5 == (unsigned_long *)0x0) {
                  bVar61 = false;
                }
                else {
                  bVar61 = (puVar5[uVar47 >> 6] >> (uVar47 & 0x3f) & 1) == 0;
                }
                puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
                if (puVar5 == (unsigned_long *)0x0) {
                  bVar62 = false;
                }
                else {
                  bVar62 = (puVar5[uVar47 >> 6] >> (uVar47 & 0x3f) & 1) == 0;
                }
                if ((bVar61 | bVar62) == 1) {
                  bVar61 = (bool)(bVar61 ^ bVar62);
                }
                else {
                  bVar61 = uhugeint_t::operator==(puVar40,puVar58);
                  bVar61 = !bVar61;
                }
                (true_sel.ptr)->sel_vector[(long)local_4c8] = (sel_t)uVar33;
                local_4c8 = (element_type *)((long)&local_4c8->_vptr_ExtraTypeInfo + (ulong)bVar61);
                uVar47 = uVar47 + 1;
                puVar40 = puVar40 + 1;
                puVar58 = puVar58 + 1;
              } while (count != uVar47);
              return (idx_t)local_4c8;
            }
            if (count != 0) {
              lVar46 = 0;
              uVar47 = 0;
              do {
                uVar33 = uVar47;
                if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                  uVar33 = (ulong)(sel.ptr)->sel_vector[uVar47];
                }
                puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
                if (puVar5 == (unsigned_long *)0x0) {
                  bVar61 = false;
                }
                else {
                  bVar61 = (puVar5[uVar47 >> 6] >> (uVar47 & 0x3f) & 1) == 0;
                }
                puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
                if (puVar5 == (unsigned_long *)0x0) {
                  bVar62 = false;
                }
                else {
                  bVar62 = (puVar5[uVar47 >> 6] >> (uVar47 & 0x3f) & 1) == 0;
                }
                if ((bVar61 | bVar62) == 1) {
                  bVar61 = (bool)(bVar61 ^ bVar62 ^ 1);
                }
                else {
                  bVar61 = uhugeint_t::operator==(puVar40,puVar58);
                }
                (false_sel.ptr)->sel_vector[lVar46] = (sel_t)uVar33;
                lVar46 = lVar46 + (ulong)bVar61;
                uVar47 = uVar47 + 1;
                puVar40 = puVar40 + 1;
                puVar58 = puVar58 + 1;
              } while (count != uVar47);
              goto LAB_00b43248;
            }
            goto LAB_00b43245;
          }
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_4a8);
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_428);
          Vector::ToUnifiedFormat(left,count,(UnifiedVectorFormat *)local_4a8);
          Vector::ToUnifiedFormat(right,count,(UnifiedVectorFormat *)local_428);
          uVar17 = LStack_4a0._0_8_;
          uVar19 = LStack_420._0_8_;
          if (LStack_420.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
              (element_type *)0x0 &&
              LStack_4a0.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
              (element_type *)0x0) {
            if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
              if (true_sel.ptr == (SelectionVector *)0x0) {
                if (count == 0) goto LAB_00b44617;
                psVar11 = (sel.ptr)->sel_vector;
                lVar46 = *(long *)local_4a8;
                psVar12 = *(sel_t **)local_428;
                lVar48 = 0;
                iVar34 = 0;
                do {
                  iVar23 = iVar34;
                  if (psVar11 != (sel_t *)0x0) {
                    iVar23 = (idx_t)psVar11[iVar34];
                  }
                  iVar28 = iVar34;
                  if (lVar46 != 0) {
                    iVar28 = (idx_t)*(uint *)(lVar46 + iVar34 * 4);
                  }
                  iVar35 = iVar34;
                  if (psVar12 != (sel_t *)0x0) {
                    iVar35 = (idx_t)psVar12[iVar34];
                  }
                  bVar61 = uhugeint_t::operator==
                                     ((uhugeint_t *)(uVar17 + iVar28 * 0x10),
                                      (uhugeint_t *)(uVar19 + iVar35 * 0x10));
                  if (bVar61) {
                    (false_sel.ptr)->sel_vector[lVar48] = (sel_t)iVar23;
                    lVar48 = lVar48 + 1;
                  }
                  iVar34 = iVar34 + 1;
                } while (count != iVar34);
                goto LAB_00b44619;
              }
              if (count == 0) goto LAB_00b4271b;
              psVar11 = (sel.ptr)->sel_vector;
              lVar46 = *(long *)local_4a8;
              psVar12 = *(sel_t **)local_428;
              iVar34 = 0;
              local_4c8 = (element_type *)0x0;
              do {
                iVar23 = iVar34;
                if (psVar11 != (sel_t *)0x0) {
                  iVar23 = (idx_t)psVar11[iVar34];
                }
                iVar28 = iVar34;
                if (lVar46 != 0) {
                  iVar28 = (idx_t)*(uint *)(lVar46 + iVar34 * 4);
                }
                iVar35 = iVar34;
                if (psVar12 != (sel_t *)0x0) {
                  iVar35 = (idx_t)psVar12[iVar34];
                }
                bVar61 = uhugeint_t::operator==
                                   ((uhugeint_t *)(uVar17 + iVar28 * 0x10),
                                    (uhugeint_t *)(uVar19 + iVar35 * 0x10));
                if (!bVar61) {
                  (true_sel.ptr)->sel_vector[(long)local_4c8] = (sel_t)iVar23;
                  local_4c8 = (element_type *)((long)&local_4c8->_vptr_ExtraTypeInfo + 1);
                }
                iVar34 = iVar34 + 1;
              } while (count != iVar34);
            }
            else {
              if (count == 0) goto LAB_00b4271b;
              psVar11 = (sel.ptr)->sel_vector;
              lVar46 = *(long *)local_4a8;
              psVar12 = *(sel_t **)local_428;
              peVar29 = (element_type *)0x0;
              local_4c8 = (element_type *)0x0;
              iVar34 = 0;
              do {
                iVar23 = iVar34;
                if (psVar11 != (sel_t *)0x0) {
                  iVar23 = (idx_t)psVar11[iVar34];
                }
                iVar28 = iVar34;
                if (lVar46 != 0) {
                  iVar28 = (idx_t)*(uint *)(lVar46 + iVar34 * 4);
                }
                iVar35 = iVar34;
                if (psVar12 != (sel_t *)0x0) {
                  iVar35 = (idx_t)psVar12[iVar34];
                }
                bVar61 = uhugeint_t::operator==
                                   ((uhugeint_t *)(uVar17 + iVar28 * 0x10),
                                    (uhugeint_t *)(uVar19 + iVar35 * 0x10));
                if (bVar61) {
                  peVar30 = peVar29;
                  oVar32.ptr = false_sel.ptr;
                  peVar29 = (element_type *)((long)&peVar29->_vptr_ExtraTypeInfo + 1);
                }
                else {
                  peVar30 = local_4c8;
                  oVar32.ptr = true_sel.ptr;
                  local_4c8 = (element_type *)((long)&local_4c8->_vptr_ExtraTypeInfo + 1);
                }
                (oVar32.ptr)->sel_vector[(long)peVar30] = (sel_t)iVar23;
                iVar34 = iVar34 + 1;
              } while (count != iVar34);
            }
          }
          else if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0
                  ) {
            if (true_sel.ptr == (SelectionVector *)0x0) {
              if (count == 0) goto LAB_00b44617;
              psVar11 = (sel.ptr)->sel_vector;
              lVar46 = *(long *)local_4a8;
              psVar12 = *(sel_t **)local_428;
              lVar48 = 0;
              iVar34 = 0;
              do {
                iVar23 = iVar34;
                if (psVar11 != (sel_t *)0x0) {
                  iVar23 = (idx_t)psVar11[iVar34];
                }
                iVar28 = iVar34;
                if (lVar46 != 0) {
                  iVar28 = (idx_t)*(uint *)(lVar46 + iVar34 * 4);
                }
                iVar35 = iVar34;
                if (psVar12 != (sel_t *)0x0) {
                  iVar35 = (idx_t)psVar12[iVar34];
                }
                if (LStack_4a0.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                    (element_type *)0x0) {
                  bVar61 = false;
                }
                else {
                  bVar61 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                             ._M_ptr + (iVar28 >> 6) * 8) >> (iVar28 & 0x3f) & 1) ==
                           0;
                }
                if (LStack_420.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                    (element_type *)0x0) {
                  bVar62 = false;
                }
                else {
                  bVar62 = ((ulong)(&(LStack_420.type_info_.internal.
                                      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr)->_vptr_ExtraTypeInfo)[iVar35 >> 6] >> (iVar35 & 0x3f)
                           & 1) == 0;
                }
                if ((bool)(bVar61 | bVar62)) {
                  bVar61 = (bool)(bVar61 ^ bVar62);
                }
                else {
                  bVar61 = uhugeint_t::operator==
                                     ((uhugeint_t *)(uVar17 + iVar28 * 0x10),
                                      (uhugeint_t *)(uVar19 + iVar35 * 0x10));
                  bVar61 = !bVar61;
                }
                if (!bVar61) {
                  (false_sel.ptr)->sel_vector[lVar48] = (sel_t)iVar23;
                  lVar48 = lVar48 + 1;
                }
                iVar34 = iVar34 + 1;
              } while (count != iVar34);
              goto LAB_00b44619;
            }
            if (count == 0) goto LAB_00b4271b;
            psVar11 = (sel.ptr)->sel_vector;
            lVar46 = *(long *)local_4a8;
            psVar12 = *(sel_t **)local_428;
            iVar34 = 0;
            local_4c8 = (element_type *)0x0;
            do {
              iVar23 = iVar34;
              if (psVar11 != (sel_t *)0x0) {
                iVar23 = (idx_t)psVar11[iVar34];
              }
              iVar28 = iVar34;
              if (lVar46 != 0) {
                iVar28 = (idx_t)*(uint *)(lVar46 + iVar34 * 4);
              }
              iVar35 = iVar34;
              if (psVar12 != (sel_t *)0x0) {
                iVar35 = (idx_t)psVar12[iVar34];
              }
              if (LStack_4a0.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                  (element_type *)0x0) {
                bVar61 = false;
              }
              else {
                bVar61 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_ptr + (iVar28 >> 6) * 8) >> (iVar28 & 0x3f) & 1) == 0
                ;
              }
              if (LStack_420.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                  (element_type *)0x0) {
                bVar62 = false;
              }
              else {
                bVar62 = ((ulong)(&(LStack_420.type_info_.internal.
                                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr)->_vptr_ExtraTypeInfo)[iVar35 >> 6] >> (iVar35 & 0x3f) &
                         1) == 0;
              }
              if ((bool)(bVar61 | bVar62)) {
                bVar61 = (bool)(bVar61 ^ bVar62);
              }
              else {
                bVar61 = uhugeint_t::operator==
                                   ((uhugeint_t *)(uVar17 + iVar28 * 0x10),
                                    (uhugeint_t *)(uVar19 + iVar35 * 0x10));
                bVar61 = !bVar61;
              }
              if (bVar61) {
                (true_sel.ptr)->sel_vector[(long)local_4c8] = (sel_t)iVar23;
                local_4c8 = (element_type *)((long)&local_4c8->_vptr_ExtraTypeInfo + 1);
              }
              iVar34 = iVar34 + 1;
            } while (count != iVar34);
          }
          else {
            if (count == 0) goto LAB_00b4271b;
            psVar11 = (sel.ptr)->sel_vector;
            lVar46 = *(long *)local_4a8;
            psVar12 = *(sel_t **)local_428;
            local_4c8 = (element_type *)0x0;
            iVar34 = 0;
            peVar29 = (element_type *)0x0;
            do {
              iVar23 = iVar34;
              if (psVar11 != (sel_t *)0x0) {
                iVar23 = (idx_t)psVar11[iVar34];
              }
              iVar28 = iVar34;
              if (lVar46 != 0) {
                iVar28 = (idx_t)*(uint *)(lVar46 + iVar34 * 4);
              }
              iVar35 = iVar34;
              if (psVar12 != (sel_t *)0x0) {
                iVar35 = (idx_t)psVar12[iVar34];
              }
              if (LStack_4a0.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                  (element_type *)0x0) {
                bVar61 = false;
              }
              else {
                bVar61 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_ptr + (iVar28 >> 6) * 8) >> (iVar28 & 0x3f) & 1) == 0
                ;
              }
              if (LStack_420.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                  (element_type *)0x0) {
                bVar62 = false;
              }
              else {
                bVar62 = ((ulong)(&(LStack_420.type_info_.internal.
                                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr)->_vptr_ExtraTypeInfo)[iVar35 >> 6] >> (iVar35 & 0x3f) &
                         1) == 0;
              }
              if ((bool)(bVar61 | bVar62)) {
                bVar61 = (bool)(bVar61 ^ bVar62);
              }
              else {
                bVar61 = uhugeint_t::operator==
                                   ((uhugeint_t *)(uVar17 + iVar28 * 0x10),
                                    (uhugeint_t *)(uVar19 + iVar35 * 0x10));
                bVar61 = !bVar61;
              }
              if (bVar61) {
                peVar30 = local_4c8;
                oVar32.ptr = true_sel.ptr;
                peVar43 = peVar29;
                local_4c8 = (element_type *)((long)&local_4c8->_vptr_ExtraTypeInfo + 1);
              }
              else {
                peVar43 = (element_type *)((long)&peVar29->_vptr_ExtraTypeInfo + 1);
                peVar30 = peVar29;
                oVar32.ptr = false_sel.ptr;
              }
              (oVar32.ptr)->sel_vector[(long)peVar30] = (sel_t)iVar23;
              iVar34 = iVar34 + 1;
              peVar29 = peVar43;
            } while (count != iVar34);
          }
          goto LAB_00b44626;
        }
        puVar40 = (uhugeint_t *)left->data;
        puVar58 = (uhugeint_t *)right->data;
        _local_4a8 = (undefined1  [16])0x0;
        LStack_4a0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        LStack_4a0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
        puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if ((puVar5 != (unsigned_long *)0x0) && ((*puVar5 & 1) == 0)) {
          local_2a8._0_8_ = 0x800;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)local_428,(unsigned_long *)&local_2a8);
          peVar29 = LStack_4a0.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          auVar18 = local_428;
          LStack_4a0.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)LStack_420._0_8_;
          _local_428 = (undefined1  [16])0x0;
          LStack_4a0._0_8_ = auVar18;
          if (peVar29 != (element_type *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar29);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_);
          }
          pTVar25 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                               (local_4a8 + 8));
          _Var9.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
               (pTVar25->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>;
          local_4a8 = (undefined1  [8])
                      _Var9.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
          *(undefined8 *)_Var9.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
               0xfffffffffffffffe;
        }
        FlatVector::VerifyFlatVector(left);
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            if (count == 0) goto LAB_00b412cc;
            lVar46 = 0;
            uVar47 = 0;
            do {
              uVar33 = uVar47;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                uVar33 = (ulong)(sel.ptr)->sel_vector[uVar47];
              }
              puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
              if (puVar5 == (unsigned_long *)0x0) {
                bVar61 = false;
              }
              else {
                bVar61 = (puVar5[uVar47 >> 6] >> (uVar47 & 0x3f) & 1) == 0;
              }
              if (local_4a8 == (undefined1  [8])0x0) {
                bVar62 = false;
              }
              else {
                bVar62 = (*(byte *)local_4a8 & 1) == 0;
              }
              if ((bVar61 | bVar62) == 1) {
                bVar61 = (bool)(bVar61 ^ bVar62 ^ 1);
              }
              else {
                bVar61 = uhugeint_t::operator==(puVar40,puVar58);
              }
              (false_sel.ptr)->sel_vector[lVar46] = (sel_t)uVar33;
              lVar46 = lVar46 + (ulong)bVar61;
              uVar47 = uVar47 + 1;
              puVar40 = puVar40 + 1;
            } while (count != uVar47);
            goto LAB_00b412d7;
          }
          if (count != 0) {
            uVar47 = 0;
            local_4c8 = (element_type *)0x0;
            do {
              uVar33 = uVar47;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                uVar33 = (ulong)(sel.ptr)->sel_vector[uVar47];
              }
              puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
              if (puVar5 == (unsigned_long *)0x0) {
                bVar61 = false;
              }
              else {
                bVar61 = (puVar5[uVar47 >> 6] >> (uVar47 & 0x3f) & 1) == 0;
              }
              if (local_4a8 == (undefined1  [8])0x0) {
                bVar62 = false;
              }
              else {
                bVar62 = (*(byte *)local_4a8 & 1) == 0;
              }
              if ((bVar61 | bVar62) == 1) {
                bVar61 = (bool)(bVar61 ^ bVar62);
              }
              else {
                bVar61 = uhugeint_t::operator==(puVar40,puVar58);
                bVar61 = !bVar61;
              }
              (true_sel.ptr)->sel_vector[(long)local_4c8] = (sel_t)uVar33;
              local_4c8 = (element_type *)((long)&local_4c8->_vptr_ExtraTypeInfo + (ulong)bVar61);
              uVar47 = uVar47 + 1;
              puVar40 = puVar40 + 1;
              local_488._M_pi =
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   LStack_4a0.type_info_.internal.
                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            } while (count != uVar47);
            goto LAB_00b412e1;
          }
        }
        else if (count != 0) {
          lVar46 = 0;
          local_4c8 = (element_type *)0x0;
          uVar47 = 0;
          do {
            uVar33 = uVar47;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              uVar33 = (ulong)(sel.ptr)->sel_vector[uVar47];
            }
            puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (puVar5 == (unsigned_long *)0x0) {
              bVar61 = false;
            }
            else {
              bVar61 = (puVar5[uVar47 >> 6] >> (uVar47 & 0x3f) & 1) == 0;
            }
            if (local_4a8 == (undefined1  [8])0x0) {
              bVar62 = false;
            }
            else {
              bVar62 = (*(byte *)local_4a8 & 1) == 0;
            }
            if ((bVar61 | bVar62) == 1) {
              bVar61 = (bool)(bVar61 ^ bVar62);
            }
            else {
              bVar61 = uhugeint_t::operator==(puVar40,puVar58);
              bVar61 = !bVar61;
            }
            (true_sel.ptr)->sel_vector[(long)local_4c8] = (sel_t)uVar33;
            local_4c8 = (element_type *)((long)&local_4c8->_vptr_ExtraTypeInfo + (ulong)bVar61);
            (false_sel.ptr)->sel_vector[lVar46] = (sel_t)uVar33;
            lVar46 = lVar46 + (ulong)(bVar61 ^ 1);
            uVar47 = uVar47 + 1;
            puVar40 = puVar40 + 1;
            local_488._M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 LStack_4a0.type_info_.internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          } while (count != uVar47);
          goto LAB_00b412e1;
        }
      }
    }
    goto LAB_00b3e25c;
  }
  switch(PVar2) {
  case BOOL:
  case INT8:
    local_328 = (undefined1  [8])null_mask.ptr;
    if (sel.ptr == (SelectionVector *)0x0) {
      sel.ptr = FlatVector::IncrementalSelectionVector();
    }
    if (local_328 != (undefined1  [8])0x0) {
      optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                ((optional_ptr<duckdb::ValidityMask,_true> *)local_328);
      UpdateNullMask(left,sel.ptr,count,(ValidityMask *)local_328);
      optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                ((optional_ptr<duckdb::ValidityMask,_true> *)local_328);
      UpdateNullMask(right,sel.ptr,count,(ValidityMask *)local_328);
    }
    VVar3 = left->vector_type;
    VVar4 = right->vector_type;
    if ((VVar3 ^ CONSTANT_VECTOR) == FLAT_VECTOR && (VVar4 ^ CONSTANT_VECTOR) == FLAT_VECTOR) {
      puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if (puVar5 == (unsigned_long *)0x0) {
        bVar61 = false;
      }
      else {
        bVar61 = (*puVar5 & 1) == 0;
      }
      puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if (puVar5 == (unsigned_long *)0x0) {
        bVar62 = false;
      }
      else {
        bVar62 = (*puVar5 & 1) == 0;
      }
      if ((bool)(bVar61 | bVar62)) {
        bVar61 = (bool)(bVar61 ^ bVar62);
      }
      else {
        bVar61 = *left->data != *right->data;
      }
      if (!bVar61) {
        if (false_sel.ptr == (SelectionVector *)0x0 || count == 0) {
          return (idx_t)(element_type *)0x0;
        }
        psVar11 = (sel.ptr)->sel_vector;
        psVar12 = (false_sel.ptr)->sel_vector;
        iVar34 = 0;
        do {
          sVar44 = (sel_t)iVar34;
          if (psVar11 != (sel_t *)0x0) {
            sVar44 = psVar11[iVar34];
          }
          psVar12[iVar34] = sVar44;
          iVar34 = iVar34 + 1;
        } while (count != iVar34);
        return (idx_t)(element_type *)0x0;
      }
      if (true_sel.ptr != (SelectionVector *)0x0 && count != 0) {
        psVar11 = (sel.ptr)->sel_vector;
        psVar12 = (true_sel.ptr)->sel_vector;
        iVar34 = 0;
        do {
          sVar44 = (sel_t)iVar34;
          if (psVar11 != (sel_t *)0x0) {
            sVar44 = psVar11[iVar34];
          }
          psVar12[iVar34] = sVar44;
          iVar34 = iVar34 + 1;
        } while (count != iVar34);
        return count;
      }
      return count;
    }
    if ((VVar3 ^ CONSTANT_VECTOR) == FLAT_VECTOR && VVar4 == FLAT_VECTOR) {
      pdVar6 = left->data;
      pdVar8 = right->data;
      _local_4a8 = (undefined1  [16])0x0;
      LStack_4a0.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      LStack_4a0.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
      puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar5 != (unsigned_long *)0x0) && ((*puVar5 & 1) == 0)) {
        local_2a8._0_8_ = 0x800;
        make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                  ((duckdb *)local_428,(unsigned_long *)&local_2a8);
        peVar29 = LStack_4a0.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        auVar18 = local_428;
        LStack_4a0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)LStack_420._0_8_;
        _local_428 = (undefined1  [16])0x0;
        LStack_4a0._0_8_ = auVar18;
        if (peVar29 != (element_type *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar29);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_);
        }
        pTVar25 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                            ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                             (local_4a8 + 8));
        _Var9.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
             (pTVar25->owned_data).
             super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
             super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
             super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
             super__Head_base<0UL,_unsigned_long_*,_false>;
        local_4a8 = (undefined1  [8])
                    _Var9.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
        *(undefined8 *)_Var9.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
             0xfffffffffffffffe;
      }
      FlatVector::VerifyFlatVector(right);
      local_118.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           LStack_4a0.type_info_.internal.
           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
        if (true_sel.ptr == (SelectionVector *)0x0) {
          if (count == 0) {
LAB_00b413a4:
            lVar46 = 0;
          }
          else {
            psVar11 = (sel.ptr)->sel_vector;
            puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            psVar12 = (false_sel.ptr)->sel_vector;
            lVar46 = 0;
            uVar47 = 0;
            do {
              uVar33 = uVar47;
              if (psVar11 != (sel_t *)0x0) {
                uVar33 = (ulong)psVar11[uVar47];
              }
              if (local_4a8 == (undefined1  [8])0x0) {
                bVar61 = false;
              }
              else {
                bVar61 = (*(byte *)local_4a8 & 1) == 0;
              }
              if (puVar5 == (unsigned_long *)0x0) {
                bVar62 = false;
              }
              else {
                bVar62 = (puVar5[uVar47 >> 6] >> (uVar47 & 0x3f) & 1) == 0;
              }
              if ((bVar61 | bVar62) == 1) {
                bVar61 = (bool)(bVar61 ^ bVar62);
              }
              else {
                bVar61 = *pdVar6 != pdVar8[uVar47];
              }
              psVar12[lVar46] = (sel_t)uVar33;
              lVar46 = lVar46 + (ulong)(bVar61 ^ 1);
              uVar47 = uVar47 + 1;
            } while (count != uVar47);
          }
LAB_00b413a6:
          local_4c8 = (element_type *)(count - lVar46);
          local_118.selection_data.internal.
          super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               LStack_4a0.type_info_.internal.
               super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          goto LAB_00b413b3;
        }
        if (count != 0) {
          psVar11 = (sel.ptr)->sel_vector;
          puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          psVar12 = (true_sel.ptr)->sel_vector;
          local_4c8 = (element_type *)0x0;
          uVar47 = 0;
          do {
            uVar33 = uVar47;
            if (psVar11 != (sel_t *)0x0) {
              uVar33 = (ulong)psVar11[uVar47];
            }
            if (local_4a8 == (undefined1  [8])0x0) {
              bVar61 = false;
            }
            else {
              bVar61 = (*(byte *)local_4a8 & 1) == 0;
            }
            if (puVar5 == (unsigned_long *)0x0) {
              bVar62 = false;
            }
            else {
              bVar62 = (puVar5[uVar47 >> 6] >> (uVar47 & 0x3f) & 1) == 0;
            }
            if ((bVar61 | bVar62) == 1) {
              bVar61 = (bool)(bVar61 ^ bVar62);
            }
            else {
              bVar61 = *pdVar6 != pdVar8[uVar47];
            }
            psVar12[(long)local_4c8] = (sel_t)uVar33;
            local_4c8 = (element_type *)((long)&local_4c8->_vptr_ExtraTypeInfo + (ulong)bVar61);
            uVar47 = uVar47 + 1;
          } while (count != uVar47);
          goto LAB_00b413b3;
        }
      }
      else if (count != 0) {
        psVar11 = (sel.ptr)->sel_vector;
        puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        psVar12 = (true_sel.ptr)->sel_vector;
        psVar10 = (false_sel.ptr)->sel_vector;
        local_4c8 = (element_type *)0x0;
        lVar46 = 0;
        uVar47 = 0;
        do {
          uVar33 = uVar47;
          if (psVar11 != (sel_t *)0x0) {
            uVar33 = (ulong)psVar11[uVar47];
          }
          if (local_4a8 == (undefined1  [8])0x0) {
            bVar61 = false;
          }
          else {
            bVar61 = (*(byte *)local_4a8 & 1) == 0;
          }
          if (puVar5 == (unsigned_long *)0x0) {
            bVar62 = false;
          }
          else {
            bVar62 = (puVar5[uVar47 >> 6] >> (uVar47 & 0x3f) & 1) == 0;
          }
          if ((bVar61 | bVar62) == 1) {
            bVar61 = (bool)(bVar61 ^ bVar62);
          }
          else {
            bVar61 = *pdVar6 != pdVar8[uVar47];
          }
          psVar12[(long)local_4c8] = (sel_t)uVar33;
          local_4c8 = (element_type *)((long)&local_4c8->_vptr_ExtraTypeInfo + (ulong)bVar61);
          psVar10[lVar46] = (sel_t)uVar33;
          lVar46 = lVar46 + (ulong)(bVar61 ^ 1);
          uVar47 = uVar47 + 1;
        } while (count != uVar47);
        goto LAB_00b413b3;
      }
    }
    else {
      if ((VVar4 ^ CONSTANT_VECTOR) != FLAT_VECTOR || VVar3 != FLAT_VECTOR) {
        if (VVar3 == FLAT_VECTOR && VVar4 == FLAT_VECTOR) {
          pdVar8 = left->data;
          pdVar13 = right->data;
          FlatVector::VerifyFlatVector(left);
          FlatVector::VerifyFlatVector(right);
          if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
            if (count == 0) {
              return (idx_t)(element_type *)0x0;
            }
            psVar11 = (sel.ptr)->sel_vector;
            puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            puVar14 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            psVar12 = (true_sel.ptr)->sel_vector;
            psVar10 = (false_sel.ptr)->sel_vector;
            peVar29 = (element_type *)0x0;
            lVar46 = 0;
            uVar47 = 0;
            do {
              uVar33 = uVar47;
              if (psVar11 != (sel_t *)0x0) {
                uVar33 = (ulong)psVar11[uVar47];
              }
              if (puVar5 == (unsigned_long *)0x0) {
                bVar61 = false;
              }
              else {
                bVar61 = (puVar5[uVar47 >> 6] >> (uVar47 & 0x3f) & 1) == 0;
              }
              if (puVar14 == (unsigned_long *)0x0) {
                bVar62 = false;
              }
              else {
                bVar62 = (puVar14[uVar47 >> 6] >> (uVar47 & 0x3f) & 1) == 0;
              }
              if ((bVar61 | bVar62) == 1) {
                bVar61 = (bool)(bVar61 ^ bVar62);
              }
              else {
                bVar61 = pdVar8[uVar47] != pdVar13[uVar47];
              }
              psVar12[(long)peVar29] = (sel_t)uVar33;
              peVar29 = (element_type *)((long)&peVar29->_vptr_ExtraTypeInfo + (ulong)bVar61);
              psVar10[lVar46] = (sel_t)uVar33;
              lVar46 = lVar46 + (ulong)(bVar61 ^ 1);
              uVar47 = uVar47 + 1;
            } while (count != uVar47);
            return (idx_t)peVar29;
          }
          if (true_sel.ptr != (SelectionVector *)0x0) {
            if (count == 0) {
              return (idx_t)(element_type *)0x0;
            }
            psVar11 = (sel.ptr)->sel_vector;
            puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            puVar14 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            psVar12 = (true_sel.ptr)->sel_vector;
            peVar29 = (element_type *)0x0;
            uVar47 = 0;
            do {
              uVar33 = uVar47;
              if (psVar11 != (sel_t *)0x0) {
                uVar33 = (ulong)psVar11[uVar47];
              }
              if (puVar5 == (unsigned_long *)0x0) {
                bVar61 = false;
              }
              else {
                bVar61 = (puVar5[uVar47 >> 6] >> (uVar47 & 0x3f) & 1) == 0;
              }
              if (puVar14 == (unsigned_long *)0x0) {
                bVar62 = false;
              }
              else {
                bVar62 = (puVar14[uVar47 >> 6] >> (uVar47 & 0x3f) & 1) == 0;
              }
              if ((bVar61 | bVar62) == 1) {
                bVar61 = (bool)(bVar61 ^ bVar62);
              }
              else {
                bVar61 = pdVar8[uVar47] != pdVar13[uVar47];
              }
              psVar12[(long)peVar29] = (sel_t)uVar33;
              peVar29 = (element_type *)((long)&peVar29->_vptr_ExtraTypeInfo + (ulong)bVar61);
              uVar47 = uVar47 + 1;
            } while (count != uVar47);
            return (idx_t)peVar29;
          }
          if (count != 0) {
            psVar11 = (sel.ptr)->sel_vector;
            puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            puVar14 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            psVar12 = (false_sel.ptr)->sel_vector;
            lVar46 = 0;
            uVar47 = 0;
            do {
              uVar33 = uVar47;
              if (psVar11 != (sel_t *)0x0) {
                uVar33 = (ulong)psVar11[uVar47];
              }
              if (puVar5 == (unsigned_long *)0x0) {
                bVar61 = false;
              }
              else {
                bVar61 = (puVar5[uVar47 >> 6] >> (uVar47 & 0x3f) & 1) == 0;
              }
              if (puVar14 == (unsigned_long *)0x0) {
                bVar62 = false;
              }
              else {
                bVar62 = (puVar14[uVar47 >> 6] >> (uVar47 & 0x3f) & 1) == 0;
              }
              if ((bVar61 | bVar62) == 1) {
                bVar61 = (bool)(bVar61 ^ bVar62);
              }
              else {
                bVar61 = pdVar8[uVar47] != pdVar13[uVar47];
              }
              psVar12[lVar46] = (sel_t)uVar33;
              lVar46 = lVar46 + (ulong)(bVar61 ^ 1);
              uVar47 = uVar47 + 1;
            } while (count != uVar47);
            goto LAB_00b4331a;
          }
LAB_00b43318:
          lVar46 = 0;
LAB_00b4331a:
          return (idx_t)(element_type *)(count - lVar46);
        }
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_4a8);
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_428);
        Vector::ToUnifiedFormat(left,count,(UnifiedVectorFormat *)local_4a8);
        Vector::ToUnifiedFormat(right,count,(UnifiedVectorFormat *)local_428);
        if (LStack_4a0.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0 &&
            LStack_420.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
            if (true_sel.ptr == (SelectionVector *)0x0) {
              if (count == 0) {
LAB_00b446da:
                lVar48 = 0;
              }
              else {
                psVar11 = (sel.ptr)->sel_vector;
                lVar46 = *(long *)local_4a8;
                psVar12 = *(sel_t **)local_428;
                lVar48 = 0;
                iVar34 = 0;
                do {
                  iVar23 = iVar34;
                  if (psVar11 != (sel_t *)0x0) {
                    iVar23 = (idx_t)psVar11[iVar34];
                  }
                  iVar28 = iVar34;
                  if (lVar46 != 0) {
                    iVar28 = (idx_t)*(uint *)(lVar46 + iVar34 * 4);
                  }
                  iVar35 = iVar34;
                  if (psVar12 != (sel_t *)0x0) {
                    iVar35 = (idx_t)psVar12[iVar34];
                  }
                  if (*(data_ptr_t)(LStack_4a0._0_8_ + iVar28) ==
                      *(data_t *)(LStack_420._0_8_ + iVar35)) {
                    (false_sel.ptr)->sel_vector[lVar48] = (sel_t)iVar23;
                    lVar48 = lVar48 + 1;
                  }
                  iVar34 = iVar34 + 1;
                } while (count != iVar34);
              }
LAB_00b446dc:
              local_4c8 = (element_type *)(count - lVar48);
            }
            else {
              if (count == 0) goto LAB_00b428a4;
              psVar11 = (sel.ptr)->sel_vector;
              lVar46 = *(long *)local_4a8;
              psVar12 = *(sel_t **)local_428;
              local_4c8 = (element_type *)0x0;
              iVar34 = 0;
              do {
                iVar23 = iVar34;
                if (psVar11 != (sel_t *)0x0) {
                  iVar23 = (idx_t)psVar11[iVar34];
                }
                iVar28 = iVar34;
                if (lVar46 != 0) {
                  iVar28 = (idx_t)*(uint *)(lVar46 + iVar34 * 4);
                }
                iVar35 = iVar34;
                if (psVar12 != (sel_t *)0x0) {
                  iVar35 = (idx_t)psVar12[iVar34];
                }
                if (*(data_ptr_t)(LStack_4a0._0_8_ + iVar28) !=
                    *(data_t *)(LStack_420._0_8_ + iVar35)) {
                  (true_sel.ptr)->sel_vector[(long)local_4c8] = (sel_t)iVar23;
                  local_4c8 = (element_type *)((long)&local_4c8->_vptr_ExtraTypeInfo + 1);
                }
                iVar34 = iVar34 + 1;
              } while (count != iVar34);
            }
          }
          else if (count == 0) {
LAB_00b428a4:
            local_4c8 = (element_type *)0x0;
          }
          else {
            psVar11 = (sel.ptr)->sel_vector;
            lVar46 = *(long *)local_4a8;
            psVar12 = *(sel_t **)local_428;
            iVar34 = 0;
            peVar29 = (element_type *)0x0;
            peVar30 = (element_type *)0x0;
            do {
              iVar23 = iVar34;
              if (psVar11 != (sel_t *)0x0) {
                iVar23 = (idx_t)psVar11[iVar34];
              }
              iVar28 = iVar34;
              if (lVar46 != 0) {
                iVar28 = (idx_t)*(uint *)(lVar46 + iVar34 * 4);
              }
              iVar35 = iVar34;
              if (psVar12 != (sel_t *)0x0) {
                iVar35 = (idx_t)psVar12[iVar34];
              }
              if (*(data_ptr_t)(LStack_4a0._0_8_ + iVar28) == *(data_t *)(LStack_420._0_8_ + iVar35)
                 ) {
                oVar32.ptr = false_sel.ptr;
                peVar43 = (element_type *)((long)&peVar29->_vptr_ExtraTypeInfo + 1);
                local_4c8 = peVar30;
              }
              else {
                local_4c8 = (element_type *)((long)&peVar30->_vptr_ExtraTypeInfo + 1);
                oVar32.ptr = true_sel.ptr;
                peVar43 = peVar29;
                peVar29 = peVar30;
              }
              (oVar32.ptr)->sel_vector[(long)peVar29] = (sel_t)iVar23;
              iVar34 = iVar34 + 1;
              peVar29 = peVar43;
              peVar30 = local_4c8;
            } while (count != iVar34);
          }
        }
        else if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0)
        {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            if (count == 0) {
LAB_00b447cb:
              lVar48 = 0;
            }
            else {
              psVar11 = (sel.ptr)->sel_vector;
              lVar46 = *(long *)local_4a8;
              psVar12 = *(sel_t **)local_428;
              lVar48 = 0;
              iVar34 = 0;
              do {
                iVar23 = iVar34;
                if (psVar11 != (sel_t *)0x0) {
                  iVar23 = (idx_t)psVar11[iVar34];
                }
                iVar28 = iVar34;
                if (lVar46 != 0) {
                  iVar28 = (idx_t)*(uint *)(lVar46 + iVar34 * 4);
                }
                iVar35 = iVar34;
                if (psVar12 != (sel_t *)0x0) {
                  iVar35 = (idx_t)psVar12[iVar34];
                }
                if (LStack_4a0.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                    (element_type *)0x0) {
                  bVar61 = false;
                }
                else {
                  bVar61 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                             ._M_ptr + (iVar28 >> 6) * 8) >> (iVar28 & 0x3f) & 1) ==
                           0;
                }
                if (LStack_420.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                    (element_type *)0x0) {
                  bVar62 = false;
                }
                else {
                  bVar62 = ((ulong)(&(LStack_420.type_info_.internal.
                                      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr)->_vptr_ExtraTypeInfo)[iVar35 >> 6] >> (iVar35 & 0x3f)
                           & 1) == 0;
                }
                if ((bool)(bVar61 | bVar62)) {
                  bVar61 = (bool)(bVar61 ^ bVar62);
                }
                else {
                  bVar61 = *(data_ptr_t)(LStack_4a0._0_8_ + iVar28) !=
                           *(data_t *)(LStack_420._0_8_ + iVar35);
                }
                if (!bVar61) {
                  (false_sel.ptr)->sel_vector[lVar48] = (sel_t)iVar23;
                  lVar48 = lVar48 + 1;
                }
                iVar34 = iVar34 + 1;
              } while (count != iVar34);
            }
LAB_00b447cd:
            local_4c8 = (element_type *)(count - lVar48);
          }
          else {
            if (count == 0) goto LAB_00b428a4;
            psVar11 = (sel.ptr)->sel_vector;
            lVar46 = *(long *)local_4a8;
            psVar12 = *(sel_t **)local_428;
            local_4c8 = (element_type *)0x0;
            iVar34 = 0;
            do {
              iVar23 = iVar34;
              if (psVar11 != (sel_t *)0x0) {
                iVar23 = (idx_t)psVar11[iVar34];
              }
              iVar28 = iVar34;
              if (lVar46 != 0) {
                iVar28 = (idx_t)*(uint *)(lVar46 + iVar34 * 4);
              }
              iVar35 = iVar34;
              if (psVar12 != (sel_t *)0x0) {
                iVar35 = (idx_t)psVar12[iVar34];
              }
              if (LStack_4a0.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                  (element_type *)0x0) {
                bVar61 = false;
              }
              else {
                bVar61 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_ptr + (iVar28 >> 6) * 8) >> (iVar28 & 0x3f) & 1) == 0
                ;
              }
              if (LStack_420.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                  (element_type *)0x0) {
                bVar62 = false;
              }
              else {
                bVar62 = ((ulong)(&(LStack_420.type_info_.internal.
                                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr)->_vptr_ExtraTypeInfo)[iVar35 >> 6] >> (iVar35 & 0x3f) &
                         1) == 0;
              }
              if ((bool)(bVar61 | bVar62)) {
                bVar61 = (bool)(bVar61 ^ bVar62);
              }
              else {
                bVar61 = *(data_ptr_t)(LStack_4a0._0_8_ + iVar28) !=
                         *(data_t *)(LStack_420._0_8_ + iVar35);
              }
              if (bVar61) {
                (true_sel.ptr)->sel_vector[(long)local_4c8] = (sel_t)iVar23;
                local_4c8 = (element_type *)((long)&local_4c8->_vptr_ExtraTypeInfo + 1);
              }
              iVar34 = iVar34 + 1;
            } while (count != iVar34);
          }
        }
        else {
          if (count == 0) goto LAB_00b428a4;
          psVar11 = (sel.ptr)->sel_vector;
          lVar46 = *(long *)local_4a8;
          psVar12 = *(sel_t **)local_428;
          iVar34 = 0;
          peVar29 = (element_type *)0x0;
          peVar30 = (element_type *)0x0;
          do {
            iVar23 = iVar34;
            if (psVar11 != (sel_t *)0x0) {
              iVar23 = (idx_t)psVar11[iVar34];
            }
            iVar28 = iVar34;
            if (lVar46 != 0) {
              iVar28 = (idx_t)*(uint *)(lVar46 + iVar34 * 4);
            }
            iVar35 = iVar34;
            if (psVar12 != (sel_t *)0x0) {
              iVar35 = (idx_t)psVar12[iVar34];
            }
            if (LStack_4a0.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar61 = false;
            }
            else {
              bVar61 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                         super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr + (iVar28 >> 6) * 8) >> (iVar28 & 0x3f) & 1) == 0;
            }
            if (LStack_420.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar62 = false;
            }
            else {
              bVar62 = ((ulong)(&(LStack_420.type_info_.internal.
                                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->_vptr_ExtraTypeInfo)[iVar35 >> 6] >> (iVar35 & 0x3f) & 1)
                       == 0;
            }
            if ((bool)(bVar61 | bVar62)) {
              bVar61 = (bool)(bVar61 ^ bVar62);
            }
            else {
              bVar61 = *(data_ptr_t)(LStack_4a0._0_8_ + iVar28) !=
                       *(data_t *)(LStack_420._0_8_ + iVar35);
            }
            if (bVar61) {
              local_4c8 = (element_type *)((long)&peVar30->_vptr_ExtraTypeInfo + 1);
              peVar43 = peVar29;
              peVar29 = peVar30;
              oVar32.ptr = true_sel.ptr;
            }
            else {
              peVar43 = (element_type *)((long)&peVar29->_vptr_ExtraTypeInfo + 1);
              local_4c8 = peVar30;
              oVar32.ptr = false_sel.ptr;
            }
            (oVar32.ptr)->sel_vector[(long)peVar29] = (sel_t)iVar23;
            iVar34 = iVar34 + 1;
            peVar29 = peVar43;
            peVar30 = local_4c8;
          } while (count != iVar34);
        }
LAB_00b447d5:
        if (local_3e8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3e8._M_pi);
        }
        if (local_408._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_408._M_pi);
        }
        local_118.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             local_488._M_pi;
        if (local_468._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_468._M_pi);
          local_118.selection_data.internal.
          super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               local_488._M_pi;
        }
        goto LAB_00b413b3;
      }
      pdVar8 = left->data;
      pdVar13 = right->data;
      _local_4a8 = (undefined1  [16])0x0;
      LStack_4a0.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      LStack_4a0.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
      puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar5 != (unsigned_long *)0x0) && ((*puVar5 & 1) == 0)) {
        local_2a8._0_8_ = 0x800;
        make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                  ((duckdb *)local_428,(unsigned_long *)&local_2a8);
        peVar29 = LStack_4a0.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        auVar18 = local_428;
        LStack_4a0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)LStack_420._0_8_;
        _local_428 = (undefined1  [16])0x0;
        LStack_4a0._0_8_ = auVar18;
        if (peVar29 != (element_type *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar29);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_);
        }
        pTVar25 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                            ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                             (local_4a8 + 8));
        _Var9.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
             (pTVar25->owned_data).
             super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
             super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
             super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
             super__Head_base<0UL,_unsigned_long_*,_false>;
        local_4a8 = (undefined1  [8])
                    _Var9.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
        *(undefined8 *)_Var9.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
             0xfffffffffffffffe;
      }
      FlatVector::VerifyFlatVector(left);
      local_118.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           LStack_4a0.type_info_.internal.
           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
        if (true_sel.ptr == (SelectionVector *)0x0) {
          if (count == 0) goto LAB_00b413a4;
          psVar11 = (sel.ptr)->sel_vector;
          puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          psVar12 = (false_sel.ptr)->sel_vector;
          lVar46 = 0;
          uVar47 = 0;
          do {
            uVar33 = uVar47;
            if (psVar11 != (sel_t *)0x0) {
              uVar33 = (ulong)psVar11[uVar47];
            }
            if (puVar5 == (unsigned_long *)0x0) {
              bVar61 = false;
            }
            else {
              bVar61 = (puVar5[uVar47 >> 6] >> (uVar47 & 0x3f) & 1) == 0;
            }
            if (local_4a8 == (undefined1  [8])0x0) {
              bVar62 = false;
            }
            else {
              bVar62 = (*(byte *)local_4a8 & 1) == 0;
            }
            if ((bVar61 | bVar62) == 1) {
              bVar61 = (bool)(bVar61 ^ bVar62);
            }
            else {
              bVar61 = pdVar8[uVar47] != *pdVar13;
            }
            psVar12[lVar46] = (sel_t)uVar33;
            lVar46 = lVar46 + (ulong)(bVar61 ^ 1);
            uVar47 = uVar47 + 1;
          } while (count != uVar47);
          goto LAB_00b413a6;
        }
        if (count != 0) {
          psVar11 = (sel.ptr)->sel_vector;
          puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          psVar12 = (true_sel.ptr)->sel_vector;
          local_4c8 = (element_type *)0x0;
          uVar47 = 0;
          do {
            uVar33 = uVar47;
            if (psVar11 != (sel_t *)0x0) {
              uVar33 = (ulong)psVar11[uVar47];
            }
            if (puVar5 == (unsigned_long *)0x0) {
              bVar61 = false;
            }
            else {
              bVar61 = (puVar5[uVar47 >> 6] >> (uVar47 & 0x3f) & 1) == 0;
            }
            if (local_4a8 == (undefined1  [8])0x0) {
              bVar62 = false;
            }
            else {
              bVar62 = (*(byte *)local_4a8 & 1) == 0;
            }
            if ((bVar61 | bVar62) == 1) {
              bVar61 = (bool)(bVar61 ^ bVar62);
            }
            else {
              bVar61 = pdVar8[uVar47] != *pdVar13;
            }
            psVar12[(long)local_4c8] = (sel_t)uVar33;
            local_4c8 = (element_type *)((long)&local_4c8->_vptr_ExtraTypeInfo + (ulong)bVar61);
            uVar47 = uVar47 + 1;
          } while (count != uVar47);
          goto LAB_00b413b3;
        }
      }
      else if (count != 0) {
        psVar11 = (sel.ptr)->sel_vector;
        puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        psVar12 = (true_sel.ptr)->sel_vector;
        psVar10 = (false_sel.ptr)->sel_vector;
        local_4c8 = (element_type *)0x0;
        lVar46 = 0;
        uVar47 = 0;
        do {
          uVar33 = uVar47;
          if (psVar11 != (sel_t *)0x0) {
            uVar33 = (ulong)psVar11[uVar47];
          }
          if (puVar5 == (unsigned_long *)0x0) {
            bVar61 = false;
          }
          else {
            bVar61 = (puVar5[uVar47 >> 6] >> (uVar47 & 0x3f) & 1) == 0;
          }
          if (local_4a8 == (undefined1  [8])0x0) {
            bVar62 = false;
          }
          else {
            bVar62 = (*(byte *)local_4a8 & 1) == 0;
          }
          if ((bVar61 | bVar62) == 1) {
            bVar61 = (bool)(bVar61 ^ bVar62);
          }
          else {
            bVar61 = pdVar8[uVar47] != *pdVar13;
          }
          psVar12[(long)local_4c8] = (sel_t)uVar33;
          local_4c8 = (element_type *)((long)&local_4c8->_vptr_ExtraTypeInfo + (ulong)bVar61);
          psVar10[lVar46] = (sel_t)uVar33;
          lVar46 = lVar46 + (ulong)(bVar61 ^ 1);
          uVar47 = uVar47 + 1;
        } while (count != uVar47);
        goto LAB_00b413b3;
      }
    }
    break;
  case UINT8:
    local_328 = (undefined1  [8])null_mask.ptr;
    if (sel.ptr == (SelectionVector *)0x0) {
      sel.ptr = FlatVector::IncrementalSelectionVector();
    }
    if (local_328 != (undefined1  [8])0x0) {
      optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                ((optional_ptr<duckdb::ValidityMask,_true> *)local_328);
      UpdateNullMask(left,sel.ptr,count,(ValidityMask *)local_328);
      optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                ((optional_ptr<duckdb::ValidityMask,_true> *)local_328);
      UpdateNullMask(right,sel.ptr,count,(ValidityMask *)local_328);
    }
    VVar3 = left->vector_type;
    VVar4 = right->vector_type;
    if ((VVar3 ^ CONSTANT_VECTOR) == FLAT_VECTOR && (VVar4 ^ CONSTANT_VECTOR) == FLAT_VECTOR) {
      puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if (puVar5 == (unsigned_long *)0x0) {
        bVar61 = false;
      }
      else {
        bVar61 = (*puVar5 & 1) == 0;
      }
      puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if (puVar5 == (unsigned_long *)0x0) {
        bVar62 = false;
      }
      else {
        bVar62 = (*puVar5 & 1) == 0;
      }
      if ((bool)(bVar61 | bVar62)) {
        bVar61 = (bool)(bVar61 ^ bVar62);
      }
      else {
        bVar61 = *left->data != *right->data;
      }
      if (!bVar61) {
        if (false_sel.ptr == (SelectionVector *)0x0 || count == 0) {
          return (idx_t)(element_type *)0x0;
        }
        psVar11 = (sel.ptr)->sel_vector;
        psVar12 = (false_sel.ptr)->sel_vector;
        iVar34 = 0;
        do {
          sVar44 = (sel_t)iVar34;
          if (psVar11 != (sel_t *)0x0) {
            sVar44 = psVar11[iVar34];
          }
          psVar12[iVar34] = sVar44;
          iVar34 = iVar34 + 1;
        } while (count != iVar34);
        return (idx_t)(element_type *)0x0;
      }
      if (true_sel.ptr != (SelectionVector *)0x0 && count != 0) {
        psVar11 = (sel.ptr)->sel_vector;
        psVar12 = (true_sel.ptr)->sel_vector;
        iVar34 = 0;
        do {
          sVar44 = (sel_t)iVar34;
          if (psVar11 != (sel_t *)0x0) {
            sVar44 = psVar11[iVar34];
          }
          psVar12[iVar34] = sVar44;
          iVar34 = iVar34 + 1;
        } while (count != iVar34);
        return count;
      }
      return count;
    }
    if ((VVar3 ^ CONSTANT_VECTOR) == FLAT_VECTOR && VVar4 == FLAT_VECTOR) {
      pdVar6 = left->data;
      pdVar8 = right->data;
      _local_4a8 = (undefined1  [16])0x0;
      LStack_4a0.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      LStack_4a0.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
      puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar5 != (unsigned_long *)0x0) && ((*puVar5 & 1) == 0)) {
        local_2a8._0_8_ = 0x800;
        make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                  ((duckdb *)local_428,(unsigned_long *)&local_2a8);
        peVar29 = LStack_4a0.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        auVar18 = local_428;
        LStack_4a0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)LStack_420._0_8_;
        _local_428 = (undefined1  [16])0x0;
        LStack_4a0._0_8_ = auVar18;
        if (peVar29 != (element_type *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar29);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_);
        }
        pTVar25 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                            ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                             (local_4a8 + 8));
        _Var9.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
             (pTVar25->owned_data).
             super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
             super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
             super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
             super__Head_base<0UL,_unsigned_long_*,_false>;
        local_4a8 = (undefined1  [8])
                    _Var9.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
        *(undefined8 *)_Var9.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
             0xfffffffffffffffe;
      }
      FlatVector::VerifyFlatVector(right);
      local_118.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           LStack_4a0.type_info_.internal.
           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
        if (true_sel.ptr == (SelectionVector *)0x0) {
          if (count == 0) goto LAB_00b413a4;
          psVar11 = (sel.ptr)->sel_vector;
          puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          psVar12 = (false_sel.ptr)->sel_vector;
          lVar46 = 0;
          uVar47 = 0;
          do {
            uVar33 = uVar47;
            if (psVar11 != (sel_t *)0x0) {
              uVar33 = (ulong)psVar11[uVar47];
            }
            if (local_4a8 == (undefined1  [8])0x0) {
              bVar61 = false;
            }
            else {
              bVar61 = (*(byte *)local_4a8 & 1) == 0;
            }
            if (puVar5 == (unsigned_long *)0x0) {
              bVar62 = false;
            }
            else {
              bVar62 = (puVar5[uVar47 >> 6] >> (uVar47 & 0x3f) & 1) == 0;
            }
            if ((bVar61 | bVar62) == 1) {
              bVar61 = (bool)(bVar61 ^ bVar62);
            }
            else {
              bVar61 = *pdVar6 != pdVar8[uVar47];
            }
            psVar12[lVar46] = (sel_t)uVar33;
            lVar46 = lVar46 + (ulong)(bVar61 ^ 1);
            uVar47 = uVar47 + 1;
          } while (count != uVar47);
          goto LAB_00b413a6;
        }
        if (count != 0) {
          psVar11 = (sel.ptr)->sel_vector;
          puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          psVar12 = (true_sel.ptr)->sel_vector;
          local_4c8 = (element_type *)0x0;
          uVar47 = 0;
          do {
            uVar33 = uVar47;
            if (psVar11 != (sel_t *)0x0) {
              uVar33 = (ulong)psVar11[uVar47];
            }
            if (local_4a8 == (undefined1  [8])0x0) {
              bVar61 = false;
            }
            else {
              bVar61 = (*(byte *)local_4a8 & 1) == 0;
            }
            if (puVar5 == (unsigned_long *)0x0) {
              bVar62 = false;
            }
            else {
              bVar62 = (puVar5[uVar47 >> 6] >> (uVar47 & 0x3f) & 1) == 0;
            }
            if ((bVar61 | bVar62) == 1) {
              bVar61 = (bool)(bVar61 ^ bVar62);
            }
            else {
              bVar61 = *pdVar6 != pdVar8[uVar47];
            }
            psVar12[(long)local_4c8] = (sel_t)uVar33;
            local_4c8 = (element_type *)((long)&local_4c8->_vptr_ExtraTypeInfo + (ulong)bVar61);
            uVar47 = uVar47 + 1;
          } while (count != uVar47);
          goto LAB_00b413b3;
        }
      }
      else if (count != 0) {
        psVar11 = (sel.ptr)->sel_vector;
        puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        psVar12 = (true_sel.ptr)->sel_vector;
        psVar10 = (false_sel.ptr)->sel_vector;
        local_4c8 = (element_type *)0x0;
        lVar46 = 0;
        uVar47 = 0;
        do {
          uVar33 = uVar47;
          if (psVar11 != (sel_t *)0x0) {
            uVar33 = (ulong)psVar11[uVar47];
          }
          if (local_4a8 == (undefined1  [8])0x0) {
            bVar61 = false;
          }
          else {
            bVar61 = (*(byte *)local_4a8 & 1) == 0;
          }
          if (puVar5 == (unsigned_long *)0x0) {
            bVar62 = false;
          }
          else {
            bVar62 = (puVar5[uVar47 >> 6] >> (uVar47 & 0x3f) & 1) == 0;
          }
          if ((bVar61 | bVar62) == 1) {
            bVar61 = (bool)(bVar61 ^ bVar62);
          }
          else {
            bVar61 = *pdVar6 != pdVar8[uVar47];
          }
          psVar12[(long)local_4c8] = (sel_t)uVar33;
          local_4c8 = (element_type *)((long)&local_4c8->_vptr_ExtraTypeInfo + (ulong)bVar61);
          psVar10[lVar46] = (sel_t)uVar33;
          lVar46 = lVar46 + (ulong)(bVar61 ^ 1);
          uVar47 = uVar47 + 1;
        } while (count != uVar47);
        goto LAB_00b413b3;
      }
    }
    else {
      if ((VVar4 ^ CONSTANT_VECTOR) != FLAT_VECTOR || VVar3 != FLAT_VECTOR) {
        if (VVar3 == FLAT_VECTOR && VVar4 == FLAT_VECTOR) {
          pdVar8 = left->data;
          pdVar13 = right->data;
          FlatVector::VerifyFlatVector(left);
          FlatVector::VerifyFlatVector(right);
          if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
            if (count == 0) {
              return (idx_t)(element_type *)0x0;
            }
            psVar11 = (sel.ptr)->sel_vector;
            puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            puVar14 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            psVar12 = (true_sel.ptr)->sel_vector;
            psVar10 = (false_sel.ptr)->sel_vector;
            peVar29 = (element_type *)0x0;
            lVar46 = 0;
            uVar47 = 0;
            do {
              uVar33 = uVar47;
              if (psVar11 != (sel_t *)0x0) {
                uVar33 = (ulong)psVar11[uVar47];
              }
              if (puVar5 == (unsigned_long *)0x0) {
                bVar61 = false;
              }
              else {
                bVar61 = (puVar5[uVar47 >> 6] >> (uVar47 & 0x3f) & 1) == 0;
              }
              if (puVar14 == (unsigned_long *)0x0) {
                bVar62 = false;
              }
              else {
                bVar62 = (puVar14[uVar47 >> 6] >> (uVar47 & 0x3f) & 1) == 0;
              }
              if ((bVar61 | bVar62) == 1) {
                bVar61 = (bool)(bVar61 ^ bVar62);
              }
              else {
                bVar61 = pdVar8[uVar47] != pdVar13[uVar47];
              }
              psVar12[(long)peVar29] = (sel_t)uVar33;
              peVar29 = (element_type *)((long)&peVar29->_vptr_ExtraTypeInfo + (ulong)bVar61);
              psVar10[lVar46] = (sel_t)uVar33;
              lVar46 = lVar46 + (ulong)(bVar61 ^ 1);
              uVar47 = uVar47 + 1;
            } while (count != uVar47);
            return (idx_t)peVar29;
          }
          if (true_sel.ptr != (SelectionVector *)0x0) {
            if (count == 0) {
              return (idx_t)(element_type *)0x0;
            }
            psVar11 = (sel.ptr)->sel_vector;
            puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            puVar14 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            psVar12 = (true_sel.ptr)->sel_vector;
            peVar29 = (element_type *)0x0;
            uVar47 = 0;
            do {
              uVar33 = uVar47;
              if (psVar11 != (sel_t *)0x0) {
                uVar33 = (ulong)psVar11[uVar47];
              }
              if (puVar5 == (unsigned_long *)0x0) {
                bVar61 = false;
              }
              else {
                bVar61 = (puVar5[uVar47 >> 6] >> (uVar47 & 0x3f) & 1) == 0;
              }
              if (puVar14 == (unsigned_long *)0x0) {
                bVar62 = false;
              }
              else {
                bVar62 = (puVar14[uVar47 >> 6] >> (uVar47 & 0x3f) & 1) == 0;
              }
              if ((bVar61 | bVar62) == 1) {
                bVar61 = (bool)(bVar61 ^ bVar62);
              }
              else {
                bVar61 = pdVar8[uVar47] != pdVar13[uVar47];
              }
              psVar12[(long)peVar29] = (sel_t)uVar33;
              peVar29 = (element_type *)((long)&peVar29->_vptr_ExtraTypeInfo + (ulong)bVar61);
              uVar47 = uVar47 + 1;
            } while (count != uVar47);
            return (idx_t)peVar29;
          }
          if (count != 0) {
            psVar11 = (sel.ptr)->sel_vector;
            puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            puVar14 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            psVar12 = (false_sel.ptr)->sel_vector;
            lVar46 = 0;
            uVar47 = 0;
            do {
              uVar33 = uVar47;
              if (psVar11 != (sel_t *)0x0) {
                uVar33 = (ulong)psVar11[uVar47];
              }
              if (puVar5 == (unsigned_long *)0x0) {
                bVar61 = false;
              }
              else {
                bVar61 = (puVar5[uVar47 >> 6] >> (uVar47 & 0x3f) & 1) == 0;
              }
              if (puVar14 == (unsigned_long *)0x0) {
                bVar62 = false;
              }
              else {
                bVar62 = (puVar14[uVar47 >> 6] >> (uVar47 & 0x3f) & 1) == 0;
              }
              if ((bVar61 | bVar62) == 1) {
                bVar61 = (bool)(bVar61 ^ bVar62);
              }
              else {
                bVar61 = pdVar8[uVar47] != pdVar13[uVar47];
              }
              psVar12[lVar46] = (sel_t)uVar33;
              lVar46 = lVar46 + (ulong)(bVar61 ^ 1);
              uVar47 = uVar47 + 1;
            } while (count != uVar47);
            goto LAB_00b4331a;
          }
          goto LAB_00b43318;
        }
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_4a8);
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_428);
        Vector::ToUnifiedFormat(left,count,(UnifiedVectorFormat *)local_4a8);
        Vector::ToUnifiedFormat(right,count,(UnifiedVectorFormat *)local_428);
        if (LStack_4a0.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0 &&
            LStack_420.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
            if (true_sel.ptr == (SelectionVector *)0x0) {
              if (count == 0) goto LAB_00b446da;
              psVar11 = (sel.ptr)->sel_vector;
              lVar46 = *(long *)local_4a8;
              psVar12 = *(sel_t **)local_428;
              lVar48 = 0;
              iVar34 = 0;
              do {
                iVar23 = iVar34;
                if (psVar11 != (sel_t *)0x0) {
                  iVar23 = (idx_t)psVar11[iVar34];
                }
                iVar28 = iVar34;
                if (lVar46 != 0) {
                  iVar28 = (idx_t)*(uint *)(lVar46 + iVar34 * 4);
                }
                iVar35 = iVar34;
                if (psVar12 != (sel_t *)0x0) {
                  iVar35 = (idx_t)psVar12[iVar34];
                }
                if (*(data_ptr_t)(LStack_4a0._0_8_ + iVar28) ==
                    *(data_t *)(LStack_420._0_8_ + iVar35)) {
                  (false_sel.ptr)->sel_vector[lVar48] = (sel_t)iVar23;
                  lVar48 = lVar48 + 1;
                }
                iVar34 = iVar34 + 1;
              } while (count != iVar34);
              goto LAB_00b446dc;
            }
            if (count == 0) goto LAB_00b428a4;
            psVar11 = (sel.ptr)->sel_vector;
            lVar46 = *(long *)local_4a8;
            psVar12 = *(sel_t **)local_428;
            iVar34 = 0;
            local_4c8 = (element_type *)0x0;
            do {
              iVar23 = iVar34;
              if (psVar11 != (sel_t *)0x0) {
                iVar23 = (idx_t)psVar11[iVar34];
              }
              iVar28 = iVar34;
              if (lVar46 != 0) {
                iVar28 = (idx_t)*(uint *)(lVar46 + iVar34 * 4);
              }
              iVar35 = iVar34;
              if (psVar12 != (sel_t *)0x0) {
                iVar35 = (idx_t)psVar12[iVar34];
              }
              if (*(data_ptr_t)(LStack_4a0._0_8_ + iVar28) != *(data_t *)(LStack_420._0_8_ + iVar35)
                 ) {
                (true_sel.ptr)->sel_vector[(long)local_4c8] = (sel_t)iVar23;
                local_4c8 = (element_type *)((long)&local_4c8->_vptr_ExtraTypeInfo + 1);
              }
              iVar34 = iVar34 + 1;
            } while (count != iVar34);
          }
          else {
            if (count == 0) goto LAB_00b428a4;
            psVar11 = (sel.ptr)->sel_vector;
            lVar46 = *(long *)local_4a8;
            psVar12 = *(sel_t **)local_428;
            iVar34 = 0;
            peVar29 = (element_type *)0x0;
            peVar30 = (element_type *)0x0;
            do {
              iVar23 = iVar34;
              if (psVar11 != (sel_t *)0x0) {
                iVar23 = (idx_t)psVar11[iVar34];
              }
              iVar28 = iVar34;
              if (lVar46 != 0) {
                iVar28 = (idx_t)*(uint *)(lVar46 + iVar34 * 4);
              }
              iVar35 = iVar34;
              if (psVar12 != (sel_t *)0x0) {
                iVar35 = (idx_t)psVar12[iVar34];
              }
              if (*(data_ptr_t)(LStack_4a0._0_8_ + iVar28) == *(data_t *)(LStack_420._0_8_ + iVar35)
                 ) {
                oVar32.ptr = false_sel.ptr;
                peVar43 = (element_type *)((long)&peVar29->_vptr_ExtraTypeInfo + 1);
                local_4c8 = peVar30;
              }
              else {
                local_4c8 = (element_type *)((long)&peVar30->_vptr_ExtraTypeInfo + 1);
                oVar32.ptr = true_sel.ptr;
                peVar43 = peVar29;
                peVar29 = peVar30;
              }
              (oVar32.ptr)->sel_vector[(long)peVar29] = (sel_t)iVar23;
              iVar34 = iVar34 + 1;
              peVar29 = peVar43;
              peVar30 = local_4c8;
            } while (count != iVar34);
          }
        }
        else if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0)
        {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            if (count == 0) goto LAB_00b447cb;
            psVar11 = (sel.ptr)->sel_vector;
            lVar46 = *(long *)local_4a8;
            psVar12 = *(sel_t **)local_428;
            lVar48 = 0;
            iVar34 = 0;
            do {
              iVar23 = iVar34;
              if (psVar11 != (sel_t *)0x0) {
                iVar23 = (idx_t)psVar11[iVar34];
              }
              iVar28 = iVar34;
              if (lVar46 != 0) {
                iVar28 = (idx_t)*(uint *)(lVar46 + iVar34 * 4);
              }
              iVar35 = iVar34;
              if (psVar12 != (sel_t *)0x0) {
                iVar35 = (idx_t)psVar12[iVar34];
              }
              if (LStack_4a0.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                  (element_type *)0x0) {
                bVar61 = false;
              }
              else {
                bVar61 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_ptr + (iVar28 >> 6) * 8) >> (iVar28 & 0x3f) & 1) == 0
                ;
              }
              if (LStack_420.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                  (element_type *)0x0) {
                bVar62 = false;
              }
              else {
                bVar62 = ((ulong)(&(LStack_420.type_info_.internal.
                                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr)->_vptr_ExtraTypeInfo)[iVar35 >> 6] >> (iVar35 & 0x3f) &
                         1) == 0;
              }
              if ((bool)(bVar61 | bVar62)) {
                bVar61 = (bool)(bVar61 ^ bVar62);
              }
              else {
                bVar61 = *(data_ptr_t)(LStack_4a0._0_8_ + iVar28) !=
                         *(data_t *)(LStack_420._0_8_ + iVar35);
              }
              if (!bVar61) {
                (false_sel.ptr)->sel_vector[lVar48] = (sel_t)iVar23;
                lVar48 = lVar48 + 1;
              }
              iVar34 = iVar34 + 1;
            } while (count != iVar34);
            goto LAB_00b447cd;
          }
          if (count == 0) goto LAB_00b428a4;
          psVar11 = (sel.ptr)->sel_vector;
          lVar46 = *(long *)local_4a8;
          psVar12 = *(sel_t **)local_428;
          iVar34 = 0;
          local_4c8 = (element_type *)0x0;
          do {
            iVar23 = iVar34;
            if (psVar11 != (sel_t *)0x0) {
              iVar23 = (idx_t)psVar11[iVar34];
            }
            iVar28 = iVar34;
            if (lVar46 != 0) {
              iVar28 = (idx_t)*(uint *)(lVar46 + iVar34 * 4);
            }
            iVar35 = iVar34;
            if (psVar12 != (sel_t *)0x0) {
              iVar35 = (idx_t)psVar12[iVar34];
            }
            if (LStack_4a0.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar61 = false;
            }
            else {
              bVar61 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                         super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr + (iVar28 >> 6) * 8) >> (iVar28 & 0x3f) & 1) == 0;
            }
            if (LStack_420.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar62 = false;
            }
            else {
              bVar62 = ((ulong)(&(LStack_420.type_info_.internal.
                                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->_vptr_ExtraTypeInfo)[iVar35 >> 6] >> (iVar35 & 0x3f) & 1)
                       == 0;
            }
            if ((bool)(bVar61 | bVar62)) {
              bVar61 = (bool)(bVar61 ^ bVar62);
            }
            else {
              bVar61 = *(data_ptr_t)(LStack_4a0._0_8_ + iVar28) !=
                       *(data_t *)(LStack_420._0_8_ + iVar35);
            }
            if (bVar61) {
              (true_sel.ptr)->sel_vector[(long)local_4c8] = (sel_t)iVar23;
              local_4c8 = (element_type *)((long)&local_4c8->_vptr_ExtraTypeInfo + 1);
            }
            iVar34 = iVar34 + 1;
          } while (count != iVar34);
        }
        else {
          if (count == 0) goto LAB_00b428a4;
          psVar11 = (sel.ptr)->sel_vector;
          lVar46 = *(long *)local_4a8;
          psVar12 = *(sel_t **)local_428;
          iVar34 = 0;
          peVar29 = (element_type *)0x0;
          peVar30 = (element_type *)0x0;
          do {
            iVar23 = iVar34;
            if (psVar11 != (sel_t *)0x0) {
              iVar23 = (idx_t)psVar11[iVar34];
            }
            iVar28 = iVar34;
            if (lVar46 != 0) {
              iVar28 = (idx_t)*(uint *)(lVar46 + iVar34 * 4);
            }
            iVar35 = iVar34;
            if (psVar12 != (sel_t *)0x0) {
              iVar35 = (idx_t)psVar12[iVar34];
            }
            if (LStack_4a0.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar61 = false;
            }
            else {
              bVar61 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                         super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr + (iVar28 >> 6) * 8) >> (iVar28 & 0x3f) & 1) == 0;
            }
            if (LStack_420.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar62 = false;
            }
            else {
              bVar62 = ((ulong)(&(LStack_420.type_info_.internal.
                                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->_vptr_ExtraTypeInfo)[iVar35 >> 6] >> (iVar35 & 0x3f) & 1)
                       == 0;
            }
            if ((bool)(bVar61 | bVar62)) {
              bVar61 = (bool)(bVar61 ^ bVar62);
            }
            else {
              bVar61 = *(data_ptr_t)(LStack_4a0._0_8_ + iVar28) !=
                       *(data_t *)(LStack_420._0_8_ + iVar35);
            }
            if (bVar61) {
              local_4c8 = (element_type *)((long)&peVar30->_vptr_ExtraTypeInfo + 1);
              peVar43 = peVar29;
              peVar29 = peVar30;
              oVar32.ptr = true_sel.ptr;
            }
            else {
              peVar43 = (element_type *)((long)&peVar29->_vptr_ExtraTypeInfo + 1);
              local_4c8 = peVar30;
              oVar32.ptr = false_sel.ptr;
            }
            (oVar32.ptr)->sel_vector[(long)peVar29] = (sel_t)iVar23;
            iVar34 = iVar34 + 1;
            peVar29 = peVar43;
            peVar30 = local_4c8;
          } while (count != iVar34);
        }
        goto LAB_00b447d5;
      }
      pdVar8 = left->data;
      pdVar13 = right->data;
      _local_4a8 = (undefined1  [16])0x0;
      LStack_4a0.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      LStack_4a0.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
      puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar5 != (unsigned_long *)0x0) && ((*puVar5 & 1) == 0)) {
        local_2a8._0_8_ = 0x800;
        make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                  ((duckdb *)local_428,(unsigned_long *)&local_2a8);
        peVar29 = LStack_4a0.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        auVar18 = local_428;
        LStack_4a0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)LStack_420._0_8_;
        _local_428 = (undefined1  [16])0x0;
        LStack_4a0._0_8_ = auVar18;
        if (peVar29 != (element_type *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar29);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_);
        }
        pTVar25 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                            ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                             (local_4a8 + 8));
        _Var9.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
             (pTVar25->owned_data).
             super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
             super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
             super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
             super__Head_base<0UL,_unsigned_long_*,_false>;
        local_4a8 = (undefined1  [8])
                    _Var9.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
        *(undefined8 *)_Var9.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
             0xfffffffffffffffe;
      }
      FlatVector::VerifyFlatVector(left);
      local_118.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           LStack_4a0.type_info_.internal.
           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
        if (true_sel.ptr == (SelectionVector *)0x0) {
          if (count == 0) goto LAB_00b413a4;
          psVar11 = (sel.ptr)->sel_vector;
          puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          psVar12 = (false_sel.ptr)->sel_vector;
          lVar46 = 0;
          uVar47 = 0;
          do {
            uVar33 = uVar47;
            if (psVar11 != (sel_t *)0x0) {
              uVar33 = (ulong)psVar11[uVar47];
            }
            if (puVar5 == (unsigned_long *)0x0) {
              bVar61 = false;
            }
            else {
              bVar61 = (puVar5[uVar47 >> 6] >> (uVar47 & 0x3f) & 1) == 0;
            }
            if (local_4a8 == (undefined1  [8])0x0) {
              bVar62 = false;
            }
            else {
              bVar62 = (*(byte *)local_4a8 & 1) == 0;
            }
            if ((bVar61 | bVar62) == 1) {
              bVar61 = (bool)(bVar61 ^ bVar62);
            }
            else {
              bVar61 = pdVar8[uVar47] != *pdVar13;
            }
            psVar12[lVar46] = (sel_t)uVar33;
            lVar46 = lVar46 + (ulong)(bVar61 ^ 1);
            uVar47 = uVar47 + 1;
          } while (count != uVar47);
          goto LAB_00b413a6;
        }
        if (count != 0) {
          psVar11 = (sel.ptr)->sel_vector;
          puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          psVar12 = (true_sel.ptr)->sel_vector;
          local_4c8 = (element_type *)0x0;
          uVar47 = 0;
          do {
            uVar33 = uVar47;
            if (psVar11 != (sel_t *)0x0) {
              uVar33 = (ulong)psVar11[uVar47];
            }
            if (puVar5 == (unsigned_long *)0x0) {
              bVar61 = false;
            }
            else {
              bVar61 = (puVar5[uVar47 >> 6] >> (uVar47 & 0x3f) & 1) == 0;
            }
            if (local_4a8 == (undefined1  [8])0x0) {
              bVar62 = false;
            }
            else {
              bVar62 = (*(byte *)local_4a8 & 1) == 0;
            }
            if ((bVar61 | bVar62) == 1) {
              bVar61 = (bool)(bVar61 ^ bVar62);
            }
            else {
              bVar61 = pdVar8[uVar47] != *pdVar13;
            }
            psVar12[(long)local_4c8] = (sel_t)uVar33;
            local_4c8 = (element_type *)((long)&local_4c8->_vptr_ExtraTypeInfo + (ulong)bVar61);
            uVar47 = uVar47 + 1;
          } while (count != uVar47);
          goto LAB_00b413b3;
        }
      }
      else if (count != 0) {
        psVar11 = (sel.ptr)->sel_vector;
        puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        psVar12 = (true_sel.ptr)->sel_vector;
        psVar10 = (false_sel.ptr)->sel_vector;
        local_4c8 = (element_type *)0x0;
        lVar46 = 0;
        uVar47 = 0;
        do {
          uVar33 = uVar47;
          if (psVar11 != (sel_t *)0x0) {
            uVar33 = (ulong)psVar11[uVar47];
          }
          if (puVar5 == (unsigned_long *)0x0) {
            bVar61 = false;
          }
          else {
            bVar61 = (puVar5[uVar47 >> 6] >> (uVar47 & 0x3f) & 1) == 0;
          }
          if (local_4a8 == (undefined1  [8])0x0) {
            bVar62 = false;
          }
          else {
            bVar62 = (*(byte *)local_4a8 & 1) == 0;
          }
          if ((bVar61 | bVar62) == 1) {
            bVar61 = (bool)(bVar61 ^ bVar62);
          }
          else {
            bVar61 = pdVar8[uVar47] != *pdVar13;
          }
          psVar12[(long)local_4c8] = (sel_t)uVar33;
          local_4c8 = (element_type *)((long)&local_4c8->_vptr_ExtraTypeInfo + (ulong)bVar61);
          psVar10[lVar46] = (sel_t)uVar33;
          lVar46 = lVar46 + (ulong)(bVar61 ^ 1);
          uVar47 = uVar47 + 1;
        } while (count != uVar47);
        goto LAB_00b413b3;
      }
    }
    break;
  case UINT16:
    local_328 = (undefined1  [8])null_mask.ptr;
    if (sel.ptr == (SelectionVector *)0x0) {
      sel.ptr = FlatVector::IncrementalSelectionVector();
    }
    if (local_328 != (undefined1  [8])0x0) {
      optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                ((optional_ptr<duckdb::ValidityMask,_true> *)local_328);
      UpdateNullMask(left,sel.ptr,count,(ValidityMask *)local_328);
      optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                ((optional_ptr<duckdb::ValidityMask,_true> *)local_328);
      UpdateNullMask(right,sel.ptr,count,(ValidityMask *)local_328);
    }
    VVar3 = left->vector_type;
    VVar4 = right->vector_type;
    if ((VVar3 ^ CONSTANT_VECTOR) == FLAT_VECTOR && (VVar4 ^ CONSTANT_VECTOR) == FLAT_VECTOR) {
      puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if (puVar5 == (unsigned_long *)0x0) {
        bVar61 = false;
      }
      else {
        bVar61 = (*puVar5 & 1) == 0;
      }
      puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if (puVar5 == (unsigned_long *)0x0) {
        bVar62 = false;
      }
      else {
        bVar62 = (*puVar5 & 1) == 0;
      }
      if ((bool)(bVar61 | bVar62)) {
        bVar61 = (bool)(bVar61 ^ bVar62);
      }
      else {
        bVar61 = *(short *)left->data != *(short *)right->data;
      }
      if (!bVar61) {
        if (false_sel.ptr == (SelectionVector *)0x0 || count == 0) {
          return (idx_t)(element_type *)0x0;
        }
        psVar11 = (sel.ptr)->sel_vector;
        psVar12 = (false_sel.ptr)->sel_vector;
        iVar34 = 0;
        do {
          sVar44 = (sel_t)iVar34;
          if (psVar11 != (sel_t *)0x0) {
            sVar44 = psVar11[iVar34];
          }
          psVar12[iVar34] = sVar44;
          iVar34 = iVar34 + 1;
        } while (count != iVar34);
        return (idx_t)(element_type *)0x0;
      }
      if (true_sel.ptr != (SelectionVector *)0x0 && count != 0) {
        psVar11 = (sel.ptr)->sel_vector;
        psVar12 = (true_sel.ptr)->sel_vector;
        iVar34 = 0;
        do {
          sVar44 = (sel_t)iVar34;
          if (psVar11 != (sel_t *)0x0) {
            sVar44 = psVar11[iVar34];
          }
          psVar12[iVar34] = sVar44;
          iVar34 = iVar34 + 1;
        } while (count != iVar34);
        return count;
      }
      return count;
    }
    if ((VVar3 ^ CONSTANT_VECTOR) == FLAT_VECTOR && VVar4 == FLAT_VECTOR) {
      psVar7 = (short *)left->data;
      pdVar8 = right->data;
      _local_4a8 = (undefined1  [16])0x0;
      LStack_4a0.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      LStack_4a0.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
      puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar5 != (unsigned_long *)0x0) && ((*puVar5 & 1) == 0)) {
        local_2a8._0_8_ = 0x800;
        make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                  ((duckdb *)local_428,(unsigned_long *)&local_2a8);
        peVar29 = LStack_4a0.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        auVar18 = local_428;
        LStack_4a0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)LStack_420._0_8_;
        _local_428 = (undefined1  [16])0x0;
        LStack_4a0._0_8_ = auVar18;
        if (peVar29 != (element_type *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar29);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_);
        }
        pTVar25 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                            ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                             (local_4a8 + 8));
        _Var9.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
             (pTVar25->owned_data).
             super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
             super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
             super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
             super__Head_base<0UL,_unsigned_long_*,_false>;
        local_4a8 = (undefined1  [8])
                    _Var9.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
        *(undefined8 *)_Var9.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
             0xfffffffffffffffe;
      }
      FlatVector::VerifyFlatVector(right);
      local_118.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           LStack_4a0.type_info_.internal.
           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
        if (true_sel.ptr == (SelectionVector *)0x0) {
          if (count == 0) goto LAB_00b413a4;
          psVar11 = (sel.ptr)->sel_vector;
          puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          psVar12 = (false_sel.ptr)->sel_vector;
          lVar46 = 0;
          uVar47 = 0;
          do {
            uVar33 = uVar47;
            if (psVar11 != (sel_t *)0x0) {
              uVar33 = (ulong)psVar11[uVar47];
            }
            if (local_4a8 == (undefined1  [8])0x0) {
              bVar61 = false;
            }
            else {
              bVar61 = (*(byte *)local_4a8 & 1) == 0;
            }
            if (puVar5 == (unsigned_long *)0x0) {
              bVar62 = false;
            }
            else {
              bVar62 = (puVar5[uVar47 >> 6] >> (uVar47 & 0x3f) & 1) == 0;
            }
            if ((bVar61 | bVar62) == 1) {
              bVar61 = (bool)(bVar61 ^ bVar62);
            }
            else {
              bVar61 = *psVar7 != *(short *)(pdVar8 + uVar47 * 2);
            }
            psVar12[lVar46] = (sel_t)uVar33;
            lVar46 = lVar46 + (ulong)(bVar61 ^ 1);
            uVar47 = uVar47 + 1;
          } while (count != uVar47);
          goto LAB_00b413a6;
        }
        if (count != 0) {
          psVar11 = (sel.ptr)->sel_vector;
          puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          psVar12 = (true_sel.ptr)->sel_vector;
          uVar47 = 0;
          local_4c8 = (element_type *)0x0;
          do {
            uVar33 = uVar47;
            if (psVar11 != (sel_t *)0x0) {
              uVar33 = (ulong)psVar11[uVar47];
            }
            if (local_4a8 == (undefined1  [8])0x0) {
              bVar61 = false;
            }
            else {
              bVar61 = (*(byte *)local_4a8 & 1) == 0;
            }
            if (puVar5 == (unsigned_long *)0x0) {
              bVar62 = false;
            }
            else {
              bVar62 = (puVar5[uVar47 >> 6] >> (uVar47 & 0x3f) & 1) == 0;
            }
            if ((bVar61 | bVar62) == 1) {
              bVar61 = (bool)(bVar61 ^ bVar62);
            }
            else {
              bVar61 = *psVar7 != *(short *)(pdVar8 + uVar47 * 2);
            }
            psVar12[(long)local_4c8] = (sel_t)uVar33;
            local_4c8 = (element_type *)((long)&local_4c8->_vptr_ExtraTypeInfo + (ulong)bVar61);
            uVar47 = uVar47 + 1;
          } while (count != uVar47);
          goto LAB_00b413b3;
        }
      }
      else if (count != 0) {
        psVar11 = (sel.ptr)->sel_vector;
        puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        psVar12 = (true_sel.ptr)->sel_vector;
        psVar10 = (false_sel.ptr)->sel_vector;
        lVar46 = 0;
        local_4c8 = (element_type *)0x0;
        uVar47 = 0;
        do {
          uVar33 = uVar47;
          if (psVar11 != (sel_t *)0x0) {
            uVar33 = (ulong)psVar11[uVar47];
          }
          if (local_4a8 == (undefined1  [8])0x0) {
            bVar61 = false;
          }
          else {
            bVar61 = (*(byte *)local_4a8 & 1) == 0;
          }
          if (puVar5 == (unsigned_long *)0x0) {
            bVar62 = false;
          }
          else {
            bVar62 = (puVar5[uVar47 >> 6] >> (uVar47 & 0x3f) & 1) == 0;
          }
          if ((bVar61 | bVar62) == 1) {
            bVar61 = (bool)(bVar61 ^ bVar62);
          }
          else {
            bVar61 = *psVar7 != *(short *)(pdVar8 + uVar47 * 2);
          }
          psVar12[(long)local_4c8] = (sel_t)uVar33;
          local_4c8 = (element_type *)((long)&local_4c8->_vptr_ExtraTypeInfo + (ulong)bVar61);
          psVar10[lVar46] = (sel_t)uVar33;
          lVar46 = lVar46 + (ulong)(bVar61 ^ 1);
          uVar47 = uVar47 + 1;
        } while (count != uVar47);
        goto LAB_00b413b3;
      }
    }
    else {
      if ((VVar4 ^ CONSTANT_VECTOR) != FLAT_VECTOR || VVar3 != FLAT_VECTOR) {
        if (VVar3 == FLAT_VECTOR && VVar4 == FLAT_VECTOR) {
          pdVar8 = left->data;
          pdVar13 = right->data;
          FlatVector::VerifyFlatVector(left);
          FlatVector::VerifyFlatVector(right);
          if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
            if (count == 0) {
              return (idx_t)(element_type *)0x0;
            }
            psVar11 = (sel.ptr)->sel_vector;
            puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            puVar14 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            psVar12 = (true_sel.ptr)->sel_vector;
            psVar10 = (false_sel.ptr)->sel_vector;
            lVar46 = 0;
            peVar29 = (element_type *)0x0;
            uVar47 = 0;
            do {
              uVar33 = uVar47;
              if (psVar11 != (sel_t *)0x0) {
                uVar33 = (ulong)psVar11[uVar47];
              }
              if (puVar5 == (unsigned_long *)0x0) {
                bVar61 = false;
              }
              else {
                bVar61 = (puVar5[uVar47 >> 6] >> (uVar47 & 0x3f) & 1) == 0;
              }
              if (puVar14 == (unsigned_long *)0x0) {
                bVar62 = false;
              }
              else {
                bVar62 = (puVar14[uVar47 >> 6] >> (uVar47 & 0x3f) & 1) == 0;
              }
              if ((bVar61 | bVar62) == 1) {
                bVar61 = (bool)(bVar61 ^ bVar62);
              }
              else {
                bVar61 = *(short *)(pdVar8 + uVar47 * 2) != *(short *)(pdVar13 + uVar47 * 2);
              }
              psVar12[(long)peVar29] = (sel_t)uVar33;
              peVar29 = (element_type *)((long)&peVar29->_vptr_ExtraTypeInfo + (ulong)bVar61);
              psVar10[lVar46] = (sel_t)uVar33;
              lVar46 = lVar46 + (ulong)(bVar61 ^ 1);
              uVar47 = uVar47 + 1;
            } while (count != uVar47);
            return (idx_t)peVar29;
          }
          if (true_sel.ptr != (SelectionVector *)0x0) {
            if (count == 0) {
              return (idx_t)(element_type *)0x0;
            }
            psVar11 = (sel.ptr)->sel_vector;
            puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            puVar14 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            psVar12 = (true_sel.ptr)->sel_vector;
            uVar47 = 0;
            peVar29 = (element_type *)0x0;
            do {
              uVar33 = uVar47;
              if (psVar11 != (sel_t *)0x0) {
                uVar33 = (ulong)psVar11[uVar47];
              }
              if (puVar5 == (unsigned_long *)0x0) {
                bVar61 = false;
              }
              else {
                bVar61 = (puVar5[uVar47 >> 6] >> (uVar47 & 0x3f) & 1) == 0;
              }
              if (puVar14 == (unsigned_long *)0x0) {
                bVar62 = false;
              }
              else {
                bVar62 = (puVar14[uVar47 >> 6] >> (uVar47 & 0x3f) & 1) == 0;
              }
              if ((bVar61 | bVar62) == 1) {
                bVar61 = (bool)(bVar61 ^ bVar62);
              }
              else {
                bVar61 = *(short *)(pdVar8 + uVar47 * 2) != *(short *)(pdVar13 + uVar47 * 2);
              }
              psVar12[(long)peVar29] = (sel_t)uVar33;
              peVar29 = (element_type *)((long)&peVar29->_vptr_ExtraTypeInfo + (ulong)bVar61);
              uVar47 = uVar47 + 1;
            } while (count != uVar47);
            return (idx_t)peVar29;
          }
          if (count != 0) {
            psVar11 = (sel.ptr)->sel_vector;
            puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            puVar14 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            psVar12 = (false_sel.ptr)->sel_vector;
            lVar46 = 0;
            uVar47 = 0;
            do {
              uVar33 = uVar47;
              if (psVar11 != (sel_t *)0x0) {
                uVar33 = (ulong)psVar11[uVar47];
              }
              if (puVar5 == (unsigned_long *)0x0) {
                bVar61 = false;
              }
              else {
                bVar61 = (puVar5[uVar47 >> 6] >> (uVar47 & 0x3f) & 1) == 0;
              }
              if (puVar14 == (unsigned_long *)0x0) {
                bVar62 = false;
              }
              else {
                bVar62 = (puVar14[uVar47 >> 6] >> (uVar47 & 0x3f) & 1) == 0;
              }
              if ((bVar61 | bVar62) == 1) {
                bVar61 = (bool)(bVar61 ^ bVar62);
              }
              else {
                bVar61 = *(short *)(pdVar8 + uVar47 * 2) != *(short *)(pdVar13 + uVar47 * 2);
              }
              psVar12[lVar46] = (sel_t)uVar33;
              lVar46 = lVar46 + (ulong)(bVar61 ^ 1);
              uVar47 = uVar47 + 1;
            } while (count != uVar47);
            goto LAB_00b4331a;
          }
          goto LAB_00b43318;
        }
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_4a8);
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_428);
        Vector::ToUnifiedFormat(left,count,(UnifiedVectorFormat *)local_4a8);
        Vector::ToUnifiedFormat(right,count,(UnifiedVectorFormat *)local_428);
        if (LStack_4a0.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0 &&
            LStack_420.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
            if (true_sel.ptr == (SelectionVector *)0x0) {
              if (count == 0) goto LAB_00b446da;
              psVar11 = (sel.ptr)->sel_vector;
              lVar46 = *(long *)local_4a8;
              psVar12 = *(sel_t **)local_428;
              lVar48 = 0;
              iVar34 = 0;
              do {
                iVar23 = iVar34;
                if (psVar11 != (sel_t *)0x0) {
                  iVar23 = (idx_t)psVar11[iVar34];
                }
                iVar28 = iVar34;
                if (lVar46 != 0) {
                  iVar28 = (idx_t)*(uint *)(lVar46 + iVar34 * 4);
                }
                iVar35 = iVar34;
                if (psVar12 != (sel_t *)0x0) {
                  iVar35 = (idx_t)psVar12[iVar34];
                }
                if (*(short *)(LStack_4a0._0_8_ + iVar28 * 2) ==
                    *(short *)(LStack_420._0_8_ + iVar35 * 2)) {
                  (false_sel.ptr)->sel_vector[lVar48] = (sel_t)iVar23;
                  lVar48 = lVar48 + 1;
                }
                iVar34 = iVar34 + 1;
              } while (count != iVar34);
              goto LAB_00b446dc;
            }
            if (count == 0) goto LAB_00b428a4;
            psVar11 = (sel.ptr)->sel_vector;
            lVar46 = *(long *)local_4a8;
            psVar12 = *(sel_t **)local_428;
            iVar34 = 0;
            local_4c8 = (element_type *)0x0;
            do {
              iVar23 = iVar34;
              if (psVar11 != (sel_t *)0x0) {
                iVar23 = (idx_t)psVar11[iVar34];
              }
              iVar28 = iVar34;
              if (lVar46 != 0) {
                iVar28 = (idx_t)*(uint *)(lVar46 + iVar34 * 4);
              }
              iVar35 = iVar34;
              if (psVar12 != (sel_t *)0x0) {
                iVar35 = (idx_t)psVar12[iVar34];
              }
              if (*(short *)(LStack_4a0._0_8_ + iVar28 * 2) !=
                  *(short *)(LStack_420._0_8_ + iVar35 * 2)) {
                (true_sel.ptr)->sel_vector[(long)local_4c8] = (sel_t)iVar23;
                local_4c8 = (element_type *)((long)&local_4c8->_vptr_ExtraTypeInfo + 1);
              }
              iVar34 = iVar34 + 1;
            } while (count != iVar34);
          }
          else {
            if (count == 0) goto LAB_00b428a4;
            psVar11 = (sel.ptr)->sel_vector;
            lVar46 = *(long *)local_4a8;
            psVar12 = *(sel_t **)local_428;
            iVar34 = 0;
            peVar29 = (element_type *)0x0;
            peVar30 = (element_type *)0x0;
            do {
              iVar23 = iVar34;
              if (psVar11 != (sel_t *)0x0) {
                iVar23 = (idx_t)psVar11[iVar34];
              }
              iVar28 = iVar34;
              if (lVar46 != 0) {
                iVar28 = (idx_t)*(uint *)(lVar46 + iVar34 * 4);
              }
              iVar35 = iVar34;
              if (psVar12 != (sel_t *)0x0) {
                iVar35 = (idx_t)psVar12[iVar34];
              }
              if (*(short *)(LStack_4a0._0_8_ + iVar28 * 2) ==
                  *(short *)(LStack_420._0_8_ + iVar35 * 2)) {
                oVar32.ptr = false_sel.ptr;
                peVar43 = (element_type *)((long)&peVar29->_vptr_ExtraTypeInfo + 1);
                local_4c8 = peVar30;
              }
              else {
                local_4c8 = (element_type *)((long)&peVar30->_vptr_ExtraTypeInfo + 1);
                oVar32.ptr = true_sel.ptr;
                peVar43 = peVar29;
                peVar29 = peVar30;
              }
              (oVar32.ptr)->sel_vector[(long)peVar29] = (sel_t)iVar23;
              iVar34 = iVar34 + 1;
              peVar29 = peVar43;
              peVar30 = local_4c8;
            } while (count != iVar34);
          }
        }
        else if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0)
        {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            if (count == 0) goto LAB_00b447cb;
            psVar11 = (sel.ptr)->sel_vector;
            lVar46 = *(long *)local_4a8;
            psVar12 = *(sel_t **)local_428;
            lVar48 = 0;
            iVar34 = 0;
            do {
              iVar23 = iVar34;
              if (psVar11 != (sel_t *)0x0) {
                iVar23 = (idx_t)psVar11[iVar34];
              }
              iVar28 = iVar34;
              if (lVar46 != 0) {
                iVar28 = (idx_t)*(uint *)(lVar46 + iVar34 * 4);
              }
              iVar35 = iVar34;
              if (psVar12 != (sel_t *)0x0) {
                iVar35 = (idx_t)psVar12[iVar34];
              }
              if (LStack_4a0.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                  (element_type *)0x0) {
                bVar61 = false;
              }
              else {
                bVar61 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_ptr + (iVar28 >> 6) * 8) >> (iVar28 & 0x3f) & 1) == 0
                ;
              }
              if (LStack_420.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                  (element_type *)0x0) {
                bVar62 = false;
              }
              else {
                bVar62 = ((ulong)(&(LStack_420.type_info_.internal.
                                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr)->_vptr_ExtraTypeInfo)[iVar35 >> 6] >> (iVar35 & 0x3f) &
                         1) == 0;
              }
              if ((bool)(bVar61 | bVar62)) {
                bVar61 = (bool)(bVar61 ^ bVar62);
              }
              else {
                bVar61 = *(short *)(LStack_4a0._0_8_ + iVar28 * 2) !=
                         *(short *)(LStack_420._0_8_ + iVar35 * 2);
              }
              if (!bVar61) {
                (false_sel.ptr)->sel_vector[lVar48] = (sel_t)iVar23;
                lVar48 = lVar48 + 1;
              }
              iVar34 = iVar34 + 1;
            } while (count != iVar34);
            goto LAB_00b447cd;
          }
          if (count == 0) goto LAB_00b428a4;
          psVar11 = (sel.ptr)->sel_vector;
          lVar46 = *(long *)local_4a8;
          psVar12 = *(sel_t **)local_428;
          iVar34 = 0;
          local_4c8 = (element_type *)0x0;
          do {
            iVar23 = iVar34;
            if (psVar11 != (sel_t *)0x0) {
              iVar23 = (idx_t)psVar11[iVar34];
            }
            iVar28 = iVar34;
            if (lVar46 != 0) {
              iVar28 = (idx_t)*(uint *)(lVar46 + iVar34 * 4);
            }
            iVar35 = iVar34;
            if (psVar12 != (sel_t *)0x0) {
              iVar35 = (idx_t)psVar12[iVar34];
            }
            if (LStack_4a0.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar61 = false;
            }
            else {
              bVar61 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                         super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr + (iVar28 >> 6) * 8) >> (iVar28 & 0x3f) & 1) == 0;
            }
            if (LStack_420.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar62 = false;
            }
            else {
              bVar62 = ((ulong)(&(LStack_420.type_info_.internal.
                                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->_vptr_ExtraTypeInfo)[iVar35 >> 6] >> (iVar35 & 0x3f) & 1)
                       == 0;
            }
            if ((bool)(bVar61 | bVar62)) {
              bVar61 = (bool)(bVar61 ^ bVar62);
            }
            else {
              bVar61 = *(short *)(LStack_4a0._0_8_ + iVar28 * 2) !=
                       *(short *)(LStack_420._0_8_ + iVar35 * 2);
            }
            if (bVar61) {
              (true_sel.ptr)->sel_vector[(long)local_4c8] = (sel_t)iVar23;
              local_4c8 = (element_type *)((long)&local_4c8->_vptr_ExtraTypeInfo + 1);
            }
            iVar34 = iVar34 + 1;
          } while (count != iVar34);
        }
        else {
          if (count == 0) goto LAB_00b428a4;
          psVar11 = (sel.ptr)->sel_vector;
          lVar46 = *(long *)local_4a8;
          psVar12 = *(sel_t **)local_428;
          iVar34 = 0;
          peVar29 = (element_type *)0x0;
          peVar30 = (element_type *)0x0;
          do {
            iVar23 = iVar34;
            if (psVar11 != (sel_t *)0x0) {
              iVar23 = (idx_t)psVar11[iVar34];
            }
            iVar28 = iVar34;
            if (lVar46 != 0) {
              iVar28 = (idx_t)*(uint *)(lVar46 + iVar34 * 4);
            }
            iVar35 = iVar34;
            if (psVar12 != (sel_t *)0x0) {
              iVar35 = (idx_t)psVar12[iVar34];
            }
            if (LStack_4a0.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar61 = false;
            }
            else {
              bVar61 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                         super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr + (iVar28 >> 6) * 8) >> (iVar28 & 0x3f) & 1) == 0;
            }
            if (LStack_420.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar62 = false;
            }
            else {
              bVar62 = ((ulong)(&(LStack_420.type_info_.internal.
                                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->_vptr_ExtraTypeInfo)[iVar35 >> 6] >> (iVar35 & 0x3f) & 1)
                       == 0;
            }
            if ((bool)(bVar61 | bVar62)) {
              bVar61 = (bool)(bVar61 ^ bVar62);
            }
            else {
              bVar61 = *(short *)(LStack_4a0._0_8_ + iVar28 * 2) !=
                       *(short *)(LStack_420._0_8_ + iVar35 * 2);
            }
            if (bVar61) {
              local_4c8 = (element_type *)((long)&peVar30->_vptr_ExtraTypeInfo + 1);
              peVar43 = peVar29;
              peVar29 = peVar30;
              oVar32.ptr = true_sel.ptr;
            }
            else {
              peVar43 = (element_type *)((long)&peVar29->_vptr_ExtraTypeInfo + 1);
              local_4c8 = peVar30;
              oVar32.ptr = false_sel.ptr;
            }
            (oVar32.ptr)->sel_vector[(long)peVar29] = (sel_t)iVar23;
            iVar34 = iVar34 + 1;
            peVar29 = peVar43;
            peVar30 = local_4c8;
          } while (count != iVar34);
        }
        goto LAB_00b447d5;
      }
      pdVar8 = left->data;
      psVar7 = (short *)right->data;
      _local_4a8 = (undefined1  [16])0x0;
      LStack_4a0.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      LStack_4a0.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
      puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar5 != (unsigned_long *)0x0) && ((*puVar5 & 1) == 0)) {
        local_2a8._0_8_ = 0x800;
        make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                  ((duckdb *)local_428,(unsigned_long *)&local_2a8);
        peVar29 = LStack_4a0.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        auVar18 = local_428;
        LStack_4a0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)LStack_420._0_8_;
        _local_428 = (undefined1  [16])0x0;
        LStack_4a0._0_8_ = auVar18;
        if (peVar29 != (element_type *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar29);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_);
        }
        pTVar25 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                            ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                             (local_4a8 + 8));
        _Var9.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
             (pTVar25->owned_data).
             super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
             super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
             super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
             super__Head_base<0UL,_unsigned_long_*,_false>;
        local_4a8 = (undefined1  [8])
                    _Var9.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
        *(undefined8 *)_Var9.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
             0xfffffffffffffffe;
      }
      FlatVector::VerifyFlatVector(left);
      local_118.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           LStack_4a0.type_info_.internal.
           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
        if (true_sel.ptr == (SelectionVector *)0x0) {
          if (count == 0) goto LAB_00b413a4;
          psVar11 = (sel.ptr)->sel_vector;
          puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          psVar12 = (false_sel.ptr)->sel_vector;
          lVar46 = 0;
          uVar47 = 0;
          do {
            uVar33 = uVar47;
            if (psVar11 != (sel_t *)0x0) {
              uVar33 = (ulong)psVar11[uVar47];
            }
            if (puVar5 == (unsigned_long *)0x0) {
              bVar61 = false;
            }
            else {
              bVar61 = (puVar5[uVar47 >> 6] >> (uVar47 & 0x3f) & 1) == 0;
            }
            if (local_4a8 == (undefined1  [8])0x0) {
              bVar62 = false;
            }
            else {
              bVar62 = (*(byte *)local_4a8 & 1) == 0;
            }
            if ((bVar61 | bVar62) == 1) {
              bVar61 = (bool)(bVar61 ^ bVar62);
            }
            else {
              bVar61 = *(short *)(pdVar8 + uVar47 * 2) != *psVar7;
            }
            psVar12[lVar46] = (sel_t)uVar33;
            lVar46 = lVar46 + (ulong)(bVar61 ^ 1);
            uVar47 = uVar47 + 1;
          } while (count != uVar47);
          goto LAB_00b413a6;
        }
        if (count != 0) {
          psVar11 = (sel.ptr)->sel_vector;
          puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          psVar12 = (true_sel.ptr)->sel_vector;
          uVar47 = 0;
          local_4c8 = (element_type *)0x0;
          do {
            uVar33 = uVar47;
            if (psVar11 != (sel_t *)0x0) {
              uVar33 = (ulong)psVar11[uVar47];
            }
            if (puVar5 == (unsigned_long *)0x0) {
              bVar61 = false;
            }
            else {
              bVar61 = (puVar5[uVar47 >> 6] >> (uVar47 & 0x3f) & 1) == 0;
            }
            if (local_4a8 == (undefined1  [8])0x0) {
              bVar62 = false;
            }
            else {
              bVar62 = (*(byte *)local_4a8 & 1) == 0;
            }
            if ((bVar61 | bVar62) == 1) {
              bVar61 = (bool)(bVar61 ^ bVar62);
            }
            else {
              bVar61 = *(short *)(pdVar8 + uVar47 * 2) != *psVar7;
            }
            psVar12[(long)local_4c8] = (sel_t)uVar33;
            local_4c8 = (element_type *)((long)&local_4c8->_vptr_ExtraTypeInfo + (ulong)bVar61);
            uVar47 = uVar47 + 1;
          } while (count != uVar47);
          goto LAB_00b413b3;
        }
      }
      else if (count != 0) {
        psVar11 = (sel.ptr)->sel_vector;
        puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        psVar12 = (true_sel.ptr)->sel_vector;
        psVar10 = (false_sel.ptr)->sel_vector;
        lVar46 = 0;
        local_4c8 = (element_type *)0x0;
        uVar47 = 0;
        do {
          uVar33 = uVar47;
          if (psVar11 != (sel_t *)0x0) {
            uVar33 = (ulong)psVar11[uVar47];
          }
          if (puVar5 == (unsigned_long *)0x0) {
            bVar61 = false;
          }
          else {
            bVar61 = (puVar5[uVar47 >> 6] >> (uVar47 & 0x3f) & 1) == 0;
          }
          if (local_4a8 == (undefined1  [8])0x0) {
            bVar62 = false;
          }
          else {
            bVar62 = (*(byte *)local_4a8 & 1) == 0;
          }
          if ((bVar61 | bVar62) == 1) {
            bVar61 = (bool)(bVar61 ^ bVar62);
          }
          else {
            bVar61 = *(short *)(pdVar8 + uVar47 * 2) != *psVar7;
          }
          psVar12[(long)local_4c8] = (sel_t)uVar33;
          local_4c8 = (element_type *)((long)&local_4c8->_vptr_ExtraTypeInfo + (ulong)bVar61);
          psVar10[lVar46] = (sel_t)uVar33;
          lVar46 = lVar46 + (ulong)(bVar61 ^ 1);
          uVar47 = uVar47 + 1;
        } while (count != uVar47);
        goto LAB_00b413b3;
      }
    }
    break;
  case INT16:
    local_328 = (undefined1  [8])null_mask.ptr;
    if (sel.ptr == (SelectionVector *)0x0) {
      sel.ptr = FlatVector::IncrementalSelectionVector();
    }
    if (local_328 != (undefined1  [8])0x0) {
      optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                ((optional_ptr<duckdb::ValidityMask,_true> *)local_328);
      UpdateNullMask(left,sel.ptr,count,(ValidityMask *)local_328);
      optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                ((optional_ptr<duckdb::ValidityMask,_true> *)local_328);
      UpdateNullMask(right,sel.ptr,count,(ValidityMask *)local_328);
    }
    VVar3 = left->vector_type;
    VVar4 = right->vector_type;
    if ((VVar3 ^ CONSTANT_VECTOR) == FLAT_VECTOR && (VVar4 ^ CONSTANT_VECTOR) == FLAT_VECTOR) {
      puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if (puVar5 == (unsigned_long *)0x0) {
        bVar61 = false;
      }
      else {
        bVar61 = (*puVar5 & 1) == 0;
      }
      puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if (puVar5 == (unsigned_long *)0x0) {
        bVar62 = false;
      }
      else {
        bVar62 = (*puVar5 & 1) == 0;
      }
      if ((bool)(bVar61 | bVar62)) {
        bVar61 = (bool)(bVar61 ^ bVar62);
      }
      else {
        bVar61 = *(short *)left->data != *(short *)right->data;
      }
      if (!bVar61) {
        if (false_sel.ptr == (SelectionVector *)0x0 || count == 0) {
          return (idx_t)(element_type *)0x0;
        }
        psVar11 = (sel.ptr)->sel_vector;
        psVar12 = (false_sel.ptr)->sel_vector;
        iVar34 = 0;
        do {
          sVar44 = (sel_t)iVar34;
          if (psVar11 != (sel_t *)0x0) {
            sVar44 = psVar11[iVar34];
          }
          psVar12[iVar34] = sVar44;
          iVar34 = iVar34 + 1;
        } while (count != iVar34);
        return (idx_t)(element_type *)0x0;
      }
      if (true_sel.ptr != (SelectionVector *)0x0 && count != 0) {
        psVar11 = (sel.ptr)->sel_vector;
        psVar12 = (true_sel.ptr)->sel_vector;
        iVar34 = 0;
        do {
          sVar44 = (sel_t)iVar34;
          if (psVar11 != (sel_t *)0x0) {
            sVar44 = psVar11[iVar34];
          }
          psVar12[iVar34] = sVar44;
          iVar34 = iVar34 + 1;
        } while (count != iVar34);
        return count;
      }
      return count;
    }
    if ((VVar3 ^ CONSTANT_VECTOR) == FLAT_VECTOR && VVar4 == FLAT_VECTOR) {
      psVar7 = (short *)left->data;
      pdVar8 = right->data;
      _local_4a8 = (undefined1  [16])0x0;
      LStack_4a0.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      LStack_4a0.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
      puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar5 != (unsigned_long *)0x0) && ((*puVar5 & 1) == 0)) {
        local_2a8._0_8_ = 0x800;
        make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                  ((duckdb *)local_428,(unsigned_long *)&local_2a8);
        peVar29 = LStack_4a0.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        auVar18 = local_428;
        LStack_4a0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)LStack_420._0_8_;
        _local_428 = (undefined1  [16])0x0;
        LStack_4a0._0_8_ = auVar18;
        if (peVar29 != (element_type *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar29);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_);
        }
        pTVar25 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                            ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                             (local_4a8 + 8));
        _Var9.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
             (pTVar25->owned_data).
             super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
             super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
             super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
             super__Head_base<0UL,_unsigned_long_*,_false>;
        local_4a8 = (undefined1  [8])
                    _Var9.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
        *(undefined8 *)_Var9.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
             0xfffffffffffffffe;
      }
      FlatVector::VerifyFlatVector(right);
      local_118.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           LStack_4a0.type_info_.internal.
           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
        if (true_sel.ptr == (SelectionVector *)0x0) {
          if (count == 0) goto LAB_00b413a4;
          psVar11 = (sel.ptr)->sel_vector;
          puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          psVar12 = (false_sel.ptr)->sel_vector;
          lVar46 = 0;
          uVar47 = 0;
          do {
            uVar33 = uVar47;
            if (psVar11 != (sel_t *)0x0) {
              uVar33 = (ulong)psVar11[uVar47];
            }
            if (local_4a8 == (undefined1  [8])0x0) {
              bVar61 = false;
            }
            else {
              bVar61 = (*(byte *)local_4a8 & 1) == 0;
            }
            if (puVar5 == (unsigned_long *)0x0) {
              bVar62 = false;
            }
            else {
              bVar62 = (puVar5[uVar47 >> 6] >> (uVar47 & 0x3f) & 1) == 0;
            }
            if ((bVar61 | bVar62) == 1) {
              bVar61 = (bool)(bVar61 ^ bVar62);
            }
            else {
              bVar61 = *psVar7 != *(short *)(pdVar8 + uVar47 * 2);
            }
            psVar12[lVar46] = (sel_t)uVar33;
            lVar46 = lVar46 + (ulong)(bVar61 ^ 1);
            uVar47 = uVar47 + 1;
          } while (count != uVar47);
          goto LAB_00b413a6;
        }
        if (count != 0) {
          psVar11 = (sel.ptr)->sel_vector;
          puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          psVar12 = (true_sel.ptr)->sel_vector;
          local_4c8 = (element_type *)0x0;
          uVar47 = 0;
          do {
            uVar33 = uVar47;
            if (psVar11 != (sel_t *)0x0) {
              uVar33 = (ulong)psVar11[uVar47];
            }
            if (local_4a8 == (undefined1  [8])0x0) {
              bVar61 = false;
            }
            else {
              bVar61 = (*(byte *)local_4a8 & 1) == 0;
            }
            if (puVar5 == (unsigned_long *)0x0) {
              bVar62 = false;
            }
            else {
              bVar62 = (puVar5[uVar47 >> 6] >> (uVar47 & 0x3f) & 1) == 0;
            }
            if ((bVar61 | bVar62) == 1) {
              bVar61 = (bool)(bVar61 ^ bVar62);
            }
            else {
              bVar61 = *psVar7 != *(short *)(pdVar8 + uVar47 * 2);
            }
            psVar12[(long)local_4c8] = (sel_t)uVar33;
            local_4c8 = (element_type *)((long)&local_4c8->_vptr_ExtraTypeInfo + (ulong)bVar61);
            uVar47 = uVar47 + 1;
          } while (count != uVar47);
          goto LAB_00b413b3;
        }
      }
      else if (count != 0) {
        psVar11 = (sel.ptr)->sel_vector;
        puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        psVar12 = (true_sel.ptr)->sel_vector;
        psVar10 = (false_sel.ptr)->sel_vector;
        local_4c8 = (element_type *)0x0;
        lVar46 = 0;
        uVar47 = 0;
        do {
          uVar33 = uVar47;
          if (psVar11 != (sel_t *)0x0) {
            uVar33 = (ulong)psVar11[uVar47];
          }
          if (local_4a8 == (undefined1  [8])0x0) {
            bVar61 = false;
          }
          else {
            bVar61 = (*(byte *)local_4a8 & 1) == 0;
          }
          if (puVar5 == (unsigned_long *)0x0) {
            bVar62 = false;
          }
          else {
            bVar62 = (puVar5[uVar47 >> 6] >> (uVar47 & 0x3f) & 1) == 0;
          }
          if ((bVar61 | bVar62) == 1) {
            bVar61 = (bool)(bVar61 ^ bVar62);
          }
          else {
            bVar61 = *psVar7 != *(short *)(pdVar8 + uVar47 * 2);
          }
          psVar12[(long)local_4c8] = (sel_t)uVar33;
          local_4c8 = (element_type *)((long)&local_4c8->_vptr_ExtraTypeInfo + (ulong)bVar61);
          psVar10[lVar46] = (sel_t)uVar33;
          lVar46 = lVar46 + (ulong)(bVar61 ^ 1);
          uVar47 = uVar47 + 1;
        } while (count != uVar47);
        goto LAB_00b413b3;
      }
    }
    else {
      if ((VVar4 ^ CONSTANT_VECTOR) != FLAT_VECTOR || VVar3 != FLAT_VECTOR) {
        if (VVar3 == FLAT_VECTOR && VVar4 == FLAT_VECTOR) {
          pdVar8 = left->data;
          pdVar13 = right->data;
          FlatVector::VerifyFlatVector(left);
          FlatVector::VerifyFlatVector(right);
          if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
            if (count == 0) {
              return (idx_t)(element_type *)0x0;
            }
            psVar11 = (sel.ptr)->sel_vector;
            puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            puVar14 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            psVar12 = (true_sel.ptr)->sel_vector;
            psVar10 = (false_sel.ptr)->sel_vector;
            peVar29 = (element_type *)0x0;
            lVar46 = 0;
            uVar47 = 0;
            do {
              uVar33 = uVar47;
              if (psVar11 != (sel_t *)0x0) {
                uVar33 = (ulong)psVar11[uVar47];
              }
              if (puVar5 == (unsigned_long *)0x0) {
                bVar61 = false;
              }
              else {
                bVar61 = (puVar5[uVar47 >> 6] >> (uVar47 & 0x3f) & 1) == 0;
              }
              if (puVar14 == (unsigned_long *)0x0) {
                bVar62 = false;
              }
              else {
                bVar62 = (puVar14[uVar47 >> 6] >> (uVar47 & 0x3f) & 1) == 0;
              }
              if ((bVar61 | bVar62) == 1) {
                bVar61 = (bool)(bVar61 ^ bVar62);
              }
              else {
                bVar61 = *(short *)(pdVar8 + uVar47 * 2) != *(short *)(pdVar13 + uVar47 * 2);
              }
              psVar12[(long)peVar29] = (sel_t)uVar33;
              peVar29 = (element_type *)((long)&peVar29->_vptr_ExtraTypeInfo + (ulong)bVar61);
              psVar10[lVar46] = (sel_t)uVar33;
              lVar46 = lVar46 + (ulong)(bVar61 ^ 1);
              uVar47 = uVar47 + 1;
            } while (count != uVar47);
            return (idx_t)peVar29;
          }
          if (true_sel.ptr != (SelectionVector *)0x0) {
            if (count == 0) {
              return (idx_t)(element_type *)0x0;
            }
            psVar11 = (sel.ptr)->sel_vector;
            puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            puVar14 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            psVar12 = (true_sel.ptr)->sel_vector;
            peVar29 = (element_type *)0x0;
            uVar47 = 0;
            do {
              uVar33 = uVar47;
              if (psVar11 != (sel_t *)0x0) {
                uVar33 = (ulong)psVar11[uVar47];
              }
              if (puVar5 == (unsigned_long *)0x0) {
                bVar61 = false;
              }
              else {
                bVar61 = (puVar5[uVar47 >> 6] >> (uVar47 & 0x3f) & 1) == 0;
              }
              if (puVar14 == (unsigned_long *)0x0) {
                bVar62 = false;
              }
              else {
                bVar62 = (puVar14[uVar47 >> 6] >> (uVar47 & 0x3f) & 1) == 0;
              }
              if ((bVar61 | bVar62) == 1) {
                bVar61 = (bool)(bVar61 ^ bVar62);
              }
              else {
                bVar61 = *(short *)(pdVar8 + uVar47 * 2) != *(short *)(pdVar13 + uVar47 * 2);
              }
              psVar12[(long)peVar29] = (sel_t)uVar33;
              peVar29 = (element_type *)((long)&peVar29->_vptr_ExtraTypeInfo + (ulong)bVar61);
              uVar47 = uVar47 + 1;
            } while (count != uVar47);
            return (idx_t)peVar29;
          }
          if (count != 0) {
            psVar11 = (sel.ptr)->sel_vector;
            puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            puVar14 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            psVar12 = (false_sel.ptr)->sel_vector;
            lVar46 = 0;
            uVar47 = 0;
            do {
              uVar33 = uVar47;
              if (psVar11 != (sel_t *)0x0) {
                uVar33 = (ulong)psVar11[uVar47];
              }
              if (puVar5 == (unsigned_long *)0x0) {
                bVar61 = false;
              }
              else {
                bVar61 = (puVar5[uVar47 >> 6] >> (uVar47 & 0x3f) & 1) == 0;
              }
              if (puVar14 == (unsigned_long *)0x0) {
                bVar62 = false;
              }
              else {
                bVar62 = (puVar14[uVar47 >> 6] >> (uVar47 & 0x3f) & 1) == 0;
              }
              if ((bVar61 | bVar62) == 1) {
                bVar61 = (bool)(bVar61 ^ bVar62);
              }
              else {
                bVar61 = *(short *)(pdVar8 + uVar47 * 2) != *(short *)(pdVar13 + uVar47 * 2);
              }
              psVar12[lVar46] = (sel_t)uVar33;
              lVar46 = lVar46 + (ulong)(bVar61 ^ 1);
              uVar47 = uVar47 + 1;
            } while (count != uVar47);
            goto LAB_00b4331a;
          }
          goto LAB_00b43318;
        }
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_4a8);
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_428);
        Vector::ToUnifiedFormat(left,count,(UnifiedVectorFormat *)local_4a8);
        Vector::ToUnifiedFormat(right,count,(UnifiedVectorFormat *)local_428);
        if (LStack_4a0.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0 &&
            LStack_420.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
            if (true_sel.ptr == (SelectionVector *)0x0) {
              if (count == 0) goto LAB_00b446da;
              psVar11 = (sel.ptr)->sel_vector;
              lVar46 = *(long *)local_4a8;
              psVar12 = *(sel_t **)local_428;
              lVar48 = 0;
              iVar34 = 0;
              do {
                iVar23 = iVar34;
                if (psVar11 != (sel_t *)0x0) {
                  iVar23 = (idx_t)psVar11[iVar34];
                }
                iVar28 = iVar34;
                if (lVar46 != 0) {
                  iVar28 = (idx_t)*(uint *)(lVar46 + iVar34 * 4);
                }
                iVar35 = iVar34;
                if (psVar12 != (sel_t *)0x0) {
                  iVar35 = (idx_t)psVar12[iVar34];
                }
                if (*(short *)(LStack_4a0._0_8_ + iVar28 * 2) ==
                    *(short *)(LStack_420._0_8_ + iVar35 * 2)) {
                  (false_sel.ptr)->sel_vector[lVar48] = (sel_t)iVar23;
                  lVar48 = lVar48 + 1;
                }
                iVar34 = iVar34 + 1;
              } while (count != iVar34);
              goto LAB_00b446dc;
            }
            if (count == 0) goto LAB_00b428a4;
            psVar11 = (sel.ptr)->sel_vector;
            lVar46 = *(long *)local_4a8;
            psVar12 = *(sel_t **)local_428;
            local_4c8 = (element_type *)0x0;
            iVar34 = 0;
            do {
              iVar23 = iVar34;
              if (psVar11 != (sel_t *)0x0) {
                iVar23 = (idx_t)psVar11[iVar34];
              }
              iVar28 = iVar34;
              if (lVar46 != 0) {
                iVar28 = (idx_t)*(uint *)(lVar46 + iVar34 * 4);
              }
              iVar35 = iVar34;
              if (psVar12 != (sel_t *)0x0) {
                iVar35 = (idx_t)psVar12[iVar34];
              }
              if (*(short *)(LStack_4a0._0_8_ + iVar28 * 2) !=
                  *(short *)(LStack_420._0_8_ + iVar35 * 2)) {
                (true_sel.ptr)->sel_vector[(long)local_4c8] = (sel_t)iVar23;
                local_4c8 = (element_type *)((long)&local_4c8->_vptr_ExtraTypeInfo + 1);
              }
              iVar34 = iVar34 + 1;
            } while (count != iVar34);
          }
          else {
            if (count == 0) goto LAB_00b428a4;
            psVar11 = (sel.ptr)->sel_vector;
            lVar46 = *(long *)local_4a8;
            psVar12 = *(sel_t **)local_428;
            iVar34 = 0;
            peVar29 = (element_type *)0x0;
            peVar30 = (element_type *)0x0;
            do {
              iVar23 = iVar34;
              if (psVar11 != (sel_t *)0x0) {
                iVar23 = (idx_t)psVar11[iVar34];
              }
              iVar28 = iVar34;
              if (lVar46 != 0) {
                iVar28 = (idx_t)*(uint *)(lVar46 + iVar34 * 4);
              }
              iVar35 = iVar34;
              if (psVar12 != (sel_t *)0x0) {
                iVar35 = (idx_t)psVar12[iVar34];
              }
              if (*(short *)(LStack_4a0._0_8_ + iVar28 * 2) ==
                  *(short *)(LStack_420._0_8_ + iVar35 * 2)) {
                oVar32.ptr = false_sel.ptr;
                peVar43 = (element_type *)((long)&peVar29->_vptr_ExtraTypeInfo + 1);
                local_4c8 = peVar30;
              }
              else {
                local_4c8 = (element_type *)((long)&peVar30->_vptr_ExtraTypeInfo + 1);
                oVar32.ptr = true_sel.ptr;
                peVar43 = peVar29;
                peVar29 = peVar30;
              }
              (oVar32.ptr)->sel_vector[(long)peVar29] = (sel_t)iVar23;
              iVar34 = iVar34 + 1;
              peVar29 = peVar43;
              peVar30 = local_4c8;
            } while (count != iVar34);
          }
        }
        else if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0)
        {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            if (count == 0) goto LAB_00b447cb;
            psVar11 = (sel.ptr)->sel_vector;
            lVar46 = *(long *)local_4a8;
            psVar12 = *(sel_t **)local_428;
            lVar48 = 0;
            iVar34 = 0;
            do {
              iVar23 = iVar34;
              if (psVar11 != (sel_t *)0x0) {
                iVar23 = (idx_t)psVar11[iVar34];
              }
              iVar28 = iVar34;
              if (lVar46 != 0) {
                iVar28 = (idx_t)*(uint *)(lVar46 + iVar34 * 4);
              }
              iVar35 = iVar34;
              if (psVar12 != (sel_t *)0x0) {
                iVar35 = (idx_t)psVar12[iVar34];
              }
              if (LStack_4a0.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                  (element_type *)0x0) {
                bVar61 = false;
              }
              else {
                bVar61 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_ptr + (iVar28 >> 6) * 8) >> (iVar28 & 0x3f) & 1) == 0
                ;
              }
              if (LStack_420.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                  (element_type *)0x0) {
                bVar62 = false;
              }
              else {
                bVar62 = ((ulong)(&(LStack_420.type_info_.internal.
                                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr)->_vptr_ExtraTypeInfo)[iVar35 >> 6] >> (iVar35 & 0x3f) &
                         1) == 0;
              }
              if ((bool)(bVar61 | bVar62)) {
                bVar61 = (bool)(bVar61 ^ bVar62);
              }
              else {
                bVar61 = *(short *)(LStack_4a0._0_8_ + iVar28 * 2) !=
                         *(short *)(LStack_420._0_8_ + iVar35 * 2);
              }
              if (!bVar61) {
                (false_sel.ptr)->sel_vector[lVar48] = (sel_t)iVar23;
                lVar48 = lVar48 + 1;
              }
              iVar34 = iVar34 + 1;
            } while (count != iVar34);
            goto LAB_00b447cd;
          }
          if (count == 0) goto LAB_00b428a4;
          psVar11 = (sel.ptr)->sel_vector;
          lVar46 = *(long *)local_4a8;
          psVar12 = *(sel_t **)local_428;
          local_4c8 = (element_type *)0x0;
          iVar34 = 0;
          do {
            iVar23 = iVar34;
            if (psVar11 != (sel_t *)0x0) {
              iVar23 = (idx_t)psVar11[iVar34];
            }
            iVar28 = iVar34;
            if (lVar46 != 0) {
              iVar28 = (idx_t)*(uint *)(lVar46 + iVar34 * 4);
            }
            iVar35 = iVar34;
            if (psVar12 != (sel_t *)0x0) {
              iVar35 = (idx_t)psVar12[iVar34];
            }
            if (LStack_4a0.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar61 = false;
            }
            else {
              bVar61 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                         super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr + (iVar28 >> 6) * 8) >> (iVar28 & 0x3f) & 1) == 0;
            }
            if (LStack_420.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar62 = false;
            }
            else {
              bVar62 = ((ulong)(&(LStack_420.type_info_.internal.
                                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->_vptr_ExtraTypeInfo)[iVar35 >> 6] >> (iVar35 & 0x3f) & 1)
                       == 0;
            }
            if ((bool)(bVar61 | bVar62)) {
              bVar61 = (bool)(bVar61 ^ bVar62);
            }
            else {
              bVar61 = *(short *)(LStack_4a0._0_8_ + iVar28 * 2) !=
                       *(short *)(LStack_420._0_8_ + iVar35 * 2);
            }
            if (bVar61) {
              (true_sel.ptr)->sel_vector[(long)local_4c8] = (sel_t)iVar23;
              local_4c8 = (element_type *)((long)&local_4c8->_vptr_ExtraTypeInfo + 1);
            }
            iVar34 = iVar34 + 1;
          } while (count != iVar34);
        }
        else {
          if (count == 0) goto LAB_00b428a4;
          psVar11 = (sel.ptr)->sel_vector;
          lVar46 = *(long *)local_4a8;
          psVar12 = *(sel_t **)local_428;
          iVar34 = 0;
          peVar29 = (element_type *)0x0;
          peVar30 = (element_type *)0x0;
          do {
            iVar23 = iVar34;
            if (psVar11 != (sel_t *)0x0) {
              iVar23 = (idx_t)psVar11[iVar34];
            }
            iVar28 = iVar34;
            if (lVar46 != 0) {
              iVar28 = (idx_t)*(uint *)(lVar46 + iVar34 * 4);
            }
            iVar35 = iVar34;
            if (psVar12 != (sel_t *)0x0) {
              iVar35 = (idx_t)psVar12[iVar34];
            }
            if (LStack_4a0.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar61 = false;
            }
            else {
              bVar61 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                         super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr + (iVar28 >> 6) * 8) >> (iVar28 & 0x3f) & 1) == 0;
            }
            if (LStack_420.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar62 = false;
            }
            else {
              bVar62 = ((ulong)(&(LStack_420.type_info_.internal.
                                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->_vptr_ExtraTypeInfo)[iVar35 >> 6] >> (iVar35 & 0x3f) & 1)
                       == 0;
            }
            if ((bool)(bVar61 | bVar62)) {
              bVar61 = (bool)(bVar61 ^ bVar62);
            }
            else {
              bVar61 = *(short *)(LStack_4a0._0_8_ + iVar28 * 2) !=
                       *(short *)(LStack_420._0_8_ + iVar35 * 2);
            }
            if (bVar61) {
              local_4c8 = (element_type *)((long)&peVar30->_vptr_ExtraTypeInfo + 1);
              peVar43 = peVar29;
              peVar29 = peVar30;
              oVar32.ptr = true_sel.ptr;
            }
            else {
              peVar43 = (element_type *)((long)&peVar29->_vptr_ExtraTypeInfo + 1);
              local_4c8 = peVar30;
              oVar32.ptr = false_sel.ptr;
            }
            (oVar32.ptr)->sel_vector[(long)peVar29] = (sel_t)iVar23;
            iVar34 = iVar34 + 1;
            peVar29 = peVar43;
            peVar30 = local_4c8;
          } while (count != iVar34);
        }
        goto LAB_00b447d5;
      }
      pdVar8 = left->data;
      psVar7 = (short *)right->data;
      _local_4a8 = (undefined1  [16])0x0;
      LStack_4a0.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      LStack_4a0.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
      puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar5 != (unsigned_long *)0x0) && ((*puVar5 & 1) == 0)) {
        local_2a8._0_8_ = 0x800;
        make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                  ((duckdb *)local_428,(unsigned_long *)&local_2a8);
        peVar29 = LStack_4a0.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        auVar18 = local_428;
        LStack_4a0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)LStack_420._0_8_;
        _local_428 = (undefined1  [16])0x0;
        LStack_4a0._0_8_ = auVar18;
        if (peVar29 != (element_type *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar29);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_);
        }
        pTVar25 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                            ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                             (local_4a8 + 8));
        _Var9.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
             (pTVar25->owned_data).
             super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
             super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
             super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
             super__Head_base<0UL,_unsigned_long_*,_false>;
        local_4a8 = (undefined1  [8])
                    _Var9.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
        *(undefined8 *)_Var9.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
             0xfffffffffffffffe;
      }
      FlatVector::VerifyFlatVector(left);
      local_118.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           LStack_4a0.type_info_.internal.
           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
        if (true_sel.ptr == (SelectionVector *)0x0) {
          if (count == 0) goto LAB_00b413a4;
          psVar11 = (sel.ptr)->sel_vector;
          puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          psVar12 = (false_sel.ptr)->sel_vector;
          lVar46 = 0;
          uVar47 = 0;
          do {
            uVar33 = uVar47;
            if (psVar11 != (sel_t *)0x0) {
              uVar33 = (ulong)psVar11[uVar47];
            }
            if (puVar5 == (unsigned_long *)0x0) {
              bVar61 = false;
            }
            else {
              bVar61 = (puVar5[uVar47 >> 6] >> (uVar47 & 0x3f) & 1) == 0;
            }
            if (local_4a8 == (undefined1  [8])0x0) {
              bVar62 = false;
            }
            else {
              bVar62 = (*(byte *)local_4a8 & 1) == 0;
            }
            if ((bVar61 | bVar62) == 1) {
              bVar61 = (bool)(bVar61 ^ bVar62);
            }
            else {
              bVar61 = *(short *)(pdVar8 + uVar47 * 2) != *psVar7;
            }
            psVar12[lVar46] = (sel_t)uVar33;
            lVar46 = lVar46 + (ulong)(bVar61 ^ 1);
            uVar47 = uVar47 + 1;
          } while (count != uVar47);
          goto LAB_00b413a6;
        }
        if (count != 0) {
          psVar11 = (sel.ptr)->sel_vector;
          puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          psVar12 = (true_sel.ptr)->sel_vector;
          local_4c8 = (element_type *)0x0;
          uVar47 = 0;
          do {
            uVar33 = uVar47;
            if (psVar11 != (sel_t *)0x0) {
              uVar33 = (ulong)psVar11[uVar47];
            }
            if (puVar5 == (unsigned_long *)0x0) {
              bVar61 = false;
            }
            else {
              bVar61 = (puVar5[uVar47 >> 6] >> (uVar47 & 0x3f) & 1) == 0;
            }
            if (local_4a8 == (undefined1  [8])0x0) {
              bVar62 = false;
            }
            else {
              bVar62 = (*(byte *)local_4a8 & 1) == 0;
            }
            if ((bVar61 | bVar62) == 1) {
              bVar61 = (bool)(bVar61 ^ bVar62);
            }
            else {
              bVar61 = *(short *)(pdVar8 + uVar47 * 2) != *psVar7;
            }
            psVar12[(long)local_4c8] = (sel_t)uVar33;
            local_4c8 = (element_type *)((long)&local_4c8->_vptr_ExtraTypeInfo + (ulong)bVar61);
            uVar47 = uVar47 + 1;
          } while (count != uVar47);
          goto LAB_00b413b3;
        }
      }
      else if (count != 0) {
        psVar11 = (sel.ptr)->sel_vector;
        puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        psVar12 = (true_sel.ptr)->sel_vector;
        psVar10 = (false_sel.ptr)->sel_vector;
        local_4c8 = (element_type *)0x0;
        lVar46 = 0;
        uVar47 = 0;
        do {
          uVar33 = uVar47;
          if (psVar11 != (sel_t *)0x0) {
            uVar33 = (ulong)psVar11[uVar47];
          }
          if (puVar5 == (unsigned_long *)0x0) {
            bVar61 = false;
          }
          else {
            bVar61 = (puVar5[uVar47 >> 6] >> (uVar47 & 0x3f) & 1) == 0;
          }
          if (local_4a8 == (undefined1  [8])0x0) {
            bVar62 = false;
          }
          else {
            bVar62 = (*(byte *)local_4a8 & 1) == 0;
          }
          if ((bVar61 | bVar62) == 1) {
            bVar61 = (bool)(bVar61 ^ bVar62);
          }
          else {
            bVar61 = *(short *)(pdVar8 + uVar47 * 2) != *psVar7;
          }
          psVar12[(long)local_4c8] = (sel_t)uVar33;
          local_4c8 = (element_type *)((long)&local_4c8->_vptr_ExtraTypeInfo + (ulong)bVar61);
          psVar10[lVar46] = (sel_t)uVar33;
          lVar46 = lVar46 + (ulong)(bVar61 ^ 1);
          uVar47 = uVar47 + 1;
        } while (count != uVar47);
        goto LAB_00b413b3;
      }
    }
    break;
  case UINT32:
    local_328 = (undefined1  [8])null_mask.ptr;
    if (sel.ptr == (SelectionVector *)0x0) {
      sel.ptr = FlatVector::IncrementalSelectionVector();
    }
    if (local_328 != (undefined1  [8])0x0) {
      optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                ((optional_ptr<duckdb::ValidityMask,_true> *)local_328);
      UpdateNullMask(left,sel.ptr,count,(ValidityMask *)local_328);
      optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                ((optional_ptr<duckdb::ValidityMask,_true> *)local_328);
      UpdateNullMask(right,sel.ptr,count,(ValidityMask *)local_328);
    }
    VVar3 = left->vector_type;
    VVar4 = right->vector_type;
    if ((VVar3 ^ CONSTANT_VECTOR) == FLAT_VECTOR && (VVar4 ^ CONSTANT_VECTOR) == FLAT_VECTOR) {
      puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if (puVar5 == (unsigned_long *)0x0) {
        bVar61 = false;
      }
      else {
        bVar61 = (*puVar5 & 1) == 0;
      }
      puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if (puVar5 == (unsigned_long *)0x0) {
        bVar62 = false;
      }
      else {
        bVar62 = (*puVar5 & 1) == 0;
      }
      if ((bool)(bVar61 | bVar62)) {
        bVar61 = (bool)(bVar61 ^ bVar62);
      }
      else {
        bVar61 = *(int *)left->data != *(int *)right->data;
      }
      if (!bVar61) {
        if (false_sel.ptr == (SelectionVector *)0x0 || count == 0) {
          return (idx_t)(element_type *)0x0;
        }
        psVar11 = (sel.ptr)->sel_vector;
        psVar12 = (false_sel.ptr)->sel_vector;
        iVar34 = 0;
        do {
          sVar44 = (sel_t)iVar34;
          if (psVar11 != (sel_t *)0x0) {
            sVar44 = psVar11[iVar34];
          }
          psVar12[iVar34] = sVar44;
          iVar34 = iVar34 + 1;
        } while (count != iVar34);
        return (idx_t)(element_type *)0x0;
      }
      if (true_sel.ptr != (SelectionVector *)0x0 && count != 0) {
        psVar11 = (sel.ptr)->sel_vector;
        psVar12 = (true_sel.ptr)->sel_vector;
        iVar34 = 0;
        do {
          sVar44 = (sel_t)iVar34;
          if (psVar11 != (sel_t *)0x0) {
            sVar44 = psVar11[iVar34];
          }
          psVar12[iVar34] = sVar44;
          iVar34 = iVar34 + 1;
        } while (count != iVar34);
        return count;
      }
      return count;
    }
    if ((VVar3 ^ CONSTANT_VECTOR) == FLAT_VECTOR && VVar4 == FLAT_VECTOR) {
      piVar45 = (int *)left->data;
      pdVar8 = right->data;
      _local_4a8 = (undefined1  [16])0x0;
      LStack_4a0.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      LStack_4a0.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
      puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar5 != (unsigned_long *)0x0) && ((*puVar5 & 1) == 0)) {
        local_2a8._0_8_ = 0x800;
        make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                  ((duckdb *)local_428,(unsigned_long *)&local_2a8);
        peVar29 = LStack_4a0.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        auVar18 = local_428;
        LStack_4a0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)LStack_420._0_8_;
        _local_428 = (undefined1  [16])0x0;
        LStack_4a0._0_8_ = auVar18;
        if (peVar29 != (element_type *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar29);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_);
        }
        pTVar25 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                            ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                             (local_4a8 + 8));
        _Var9.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
             (pTVar25->owned_data).
             super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
             super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
             super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
             super__Head_base<0UL,_unsigned_long_*,_false>;
        local_4a8 = (undefined1  [8])
                    _Var9.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
        *(undefined8 *)_Var9.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
             0xfffffffffffffffe;
      }
      FlatVector::VerifyFlatVector(right);
      local_118.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           LStack_4a0.type_info_.internal.
           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
        if (true_sel.ptr == (SelectionVector *)0x0) {
          if (count == 0) goto LAB_00b413a4;
          psVar11 = (sel.ptr)->sel_vector;
          puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          psVar12 = (false_sel.ptr)->sel_vector;
          lVar46 = 0;
          uVar47 = 0;
          do {
            uVar33 = uVar47;
            if (psVar11 != (sel_t *)0x0) {
              uVar33 = (ulong)psVar11[uVar47];
            }
            if (local_4a8 == (undefined1  [8])0x0) {
              bVar61 = false;
            }
            else {
              bVar61 = (*(byte *)local_4a8 & 1) == 0;
            }
            if (puVar5 == (unsigned_long *)0x0) {
              bVar62 = false;
            }
            else {
              bVar62 = (puVar5[uVar47 >> 6] >> (uVar47 & 0x3f) & 1) == 0;
            }
            if ((bVar61 | bVar62) == 1) {
              bVar61 = (bool)(bVar61 ^ bVar62);
            }
            else {
              bVar61 = *piVar45 != *(int *)(pdVar8 + uVar47 * 4);
            }
            psVar12[lVar46] = (sel_t)uVar33;
            lVar46 = lVar46 + (ulong)(bVar61 ^ 1);
            uVar47 = uVar47 + 1;
          } while (count != uVar47);
          goto LAB_00b413a6;
        }
        if (count != 0) {
          psVar11 = (sel.ptr)->sel_vector;
          puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          psVar12 = (true_sel.ptr)->sel_vector;
          uVar47 = 0;
          local_4c8 = (element_type *)0x0;
          do {
            uVar33 = uVar47;
            if (psVar11 != (sel_t *)0x0) {
              uVar33 = (ulong)psVar11[uVar47];
            }
            if (local_4a8 == (undefined1  [8])0x0) {
              bVar61 = false;
            }
            else {
              bVar61 = (*(byte *)local_4a8 & 1) == 0;
            }
            if (puVar5 == (unsigned_long *)0x0) {
              bVar62 = false;
            }
            else {
              bVar62 = (puVar5[uVar47 >> 6] >> (uVar47 & 0x3f) & 1) == 0;
            }
            if ((bVar61 | bVar62) == 1) {
              bVar61 = (bool)(bVar61 ^ bVar62);
            }
            else {
              bVar61 = *piVar45 != *(int *)(pdVar8 + uVar47 * 4);
            }
            psVar12[(long)local_4c8] = (sel_t)uVar33;
            local_4c8 = (element_type *)((long)&local_4c8->_vptr_ExtraTypeInfo + (ulong)bVar61);
            uVar47 = uVar47 + 1;
          } while (count != uVar47);
          goto LAB_00b413b3;
        }
      }
      else if (count != 0) {
        psVar11 = (sel.ptr)->sel_vector;
        puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        psVar12 = (true_sel.ptr)->sel_vector;
        psVar10 = (false_sel.ptr)->sel_vector;
        lVar46 = 0;
        local_4c8 = (element_type *)0x0;
        uVar47 = 0;
        do {
          uVar33 = uVar47;
          if (psVar11 != (sel_t *)0x0) {
            uVar33 = (ulong)psVar11[uVar47];
          }
          if (local_4a8 == (undefined1  [8])0x0) {
            bVar61 = false;
          }
          else {
            bVar61 = (*(byte *)local_4a8 & 1) == 0;
          }
          if (puVar5 == (unsigned_long *)0x0) {
            bVar62 = false;
          }
          else {
            bVar62 = (puVar5[uVar47 >> 6] >> (uVar47 & 0x3f) & 1) == 0;
          }
          if ((bVar61 | bVar62) == 1) {
            bVar61 = (bool)(bVar61 ^ bVar62);
          }
          else {
            bVar61 = *piVar45 != *(int *)(pdVar8 + uVar47 * 4);
          }
          psVar12[(long)local_4c8] = (sel_t)uVar33;
          local_4c8 = (element_type *)((long)&local_4c8->_vptr_ExtraTypeInfo + (ulong)bVar61);
          psVar10[lVar46] = (sel_t)uVar33;
          lVar46 = lVar46 + (ulong)(bVar61 ^ 1);
          uVar47 = uVar47 + 1;
        } while (count != uVar47);
        goto LAB_00b413b3;
      }
    }
    else {
      if ((VVar4 ^ CONSTANT_VECTOR) != FLAT_VECTOR || VVar3 != FLAT_VECTOR) {
        if (VVar3 == FLAT_VECTOR && VVar4 == FLAT_VECTOR) {
          pdVar8 = left->data;
          pdVar13 = right->data;
          FlatVector::VerifyFlatVector(left);
          FlatVector::VerifyFlatVector(right);
          if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
            if (count == 0) {
              return (idx_t)(element_type *)0x0;
            }
            psVar11 = (sel.ptr)->sel_vector;
            puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            puVar14 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            psVar12 = (true_sel.ptr)->sel_vector;
            psVar10 = (false_sel.ptr)->sel_vector;
            lVar46 = 0;
            peVar29 = (element_type *)0x0;
            uVar47 = 0;
            do {
              uVar33 = uVar47;
              if (psVar11 != (sel_t *)0x0) {
                uVar33 = (ulong)psVar11[uVar47];
              }
              if (puVar5 == (unsigned_long *)0x0) {
                bVar61 = false;
              }
              else {
                bVar61 = (puVar5[uVar47 >> 6] >> (uVar47 & 0x3f) & 1) == 0;
              }
              if (puVar14 == (unsigned_long *)0x0) {
                bVar62 = false;
              }
              else {
                bVar62 = (puVar14[uVar47 >> 6] >> (uVar47 & 0x3f) & 1) == 0;
              }
              if ((bVar61 | bVar62) == 1) {
                bVar61 = (bool)(bVar61 ^ bVar62);
              }
              else {
                bVar61 = *(int *)(pdVar8 + uVar47 * 4) != *(int *)(pdVar13 + uVar47 * 4);
              }
              psVar12[(long)peVar29] = (sel_t)uVar33;
              peVar29 = (element_type *)((long)&peVar29->_vptr_ExtraTypeInfo + (ulong)bVar61);
              psVar10[lVar46] = (sel_t)uVar33;
              lVar46 = lVar46 + (ulong)(bVar61 ^ 1);
              uVar47 = uVar47 + 1;
            } while (count != uVar47);
            return (idx_t)peVar29;
          }
          if (true_sel.ptr != (SelectionVector *)0x0) {
            if (count == 0) {
              return (idx_t)(element_type *)0x0;
            }
            psVar11 = (sel.ptr)->sel_vector;
            puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            puVar14 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            psVar12 = (true_sel.ptr)->sel_vector;
            uVar47 = 0;
            peVar29 = (element_type *)0x0;
            do {
              uVar33 = uVar47;
              if (psVar11 != (sel_t *)0x0) {
                uVar33 = (ulong)psVar11[uVar47];
              }
              if (puVar5 == (unsigned_long *)0x0) {
                bVar61 = false;
              }
              else {
                bVar61 = (puVar5[uVar47 >> 6] >> (uVar47 & 0x3f) & 1) == 0;
              }
              if (puVar14 == (unsigned_long *)0x0) {
                bVar62 = false;
              }
              else {
                bVar62 = (puVar14[uVar47 >> 6] >> (uVar47 & 0x3f) & 1) == 0;
              }
              if ((bVar61 | bVar62) == 1) {
                bVar61 = (bool)(bVar61 ^ bVar62);
              }
              else {
                bVar61 = *(int *)(pdVar8 + uVar47 * 4) != *(int *)(pdVar13 + uVar47 * 4);
              }
              psVar12[(long)peVar29] = (sel_t)uVar33;
              peVar29 = (element_type *)((long)&peVar29->_vptr_ExtraTypeInfo + (ulong)bVar61);
              uVar47 = uVar47 + 1;
            } while (count != uVar47);
            return (idx_t)peVar29;
          }
          if (count != 0) {
            psVar11 = (sel.ptr)->sel_vector;
            puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            puVar14 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            psVar12 = (false_sel.ptr)->sel_vector;
            lVar46 = 0;
            uVar47 = 0;
            do {
              uVar33 = uVar47;
              if (psVar11 != (sel_t *)0x0) {
                uVar33 = (ulong)psVar11[uVar47];
              }
              if (puVar5 == (unsigned_long *)0x0) {
                bVar61 = false;
              }
              else {
                bVar61 = (puVar5[uVar47 >> 6] >> (uVar47 & 0x3f) & 1) == 0;
              }
              if (puVar14 == (unsigned_long *)0x0) {
                bVar62 = false;
              }
              else {
                bVar62 = (puVar14[uVar47 >> 6] >> (uVar47 & 0x3f) & 1) == 0;
              }
              if ((bVar61 | bVar62) == 1) {
                bVar61 = (bool)(bVar61 ^ bVar62);
              }
              else {
                bVar61 = *(int *)(pdVar8 + uVar47 * 4) != *(int *)(pdVar13 + uVar47 * 4);
              }
              psVar12[lVar46] = (sel_t)uVar33;
              lVar46 = lVar46 + (ulong)(bVar61 ^ 1);
              uVar47 = uVar47 + 1;
            } while (count != uVar47);
            goto LAB_00b4331a;
          }
          goto LAB_00b43318;
        }
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_4a8);
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_428);
        Vector::ToUnifiedFormat(left,count,(UnifiedVectorFormat *)local_4a8);
        Vector::ToUnifiedFormat(right,count,(UnifiedVectorFormat *)local_428);
        if (LStack_4a0.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0 &&
            LStack_420.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
            if (true_sel.ptr == (SelectionVector *)0x0) {
              if (count == 0) goto LAB_00b446da;
              psVar11 = (sel.ptr)->sel_vector;
              lVar46 = *(long *)local_4a8;
              psVar12 = *(sel_t **)local_428;
              lVar48 = 0;
              iVar34 = 0;
              do {
                iVar23 = iVar34;
                if (psVar11 != (sel_t *)0x0) {
                  iVar23 = (idx_t)psVar11[iVar34];
                }
                iVar28 = iVar34;
                if (lVar46 != 0) {
                  iVar28 = (idx_t)*(uint *)(lVar46 + iVar34 * 4);
                }
                iVar35 = iVar34;
                if (psVar12 != (sel_t *)0x0) {
                  iVar35 = (idx_t)psVar12[iVar34];
                }
                if (*(int *)(LStack_4a0._0_8_ + iVar28 * 4) ==
                    *(int *)(LStack_420._0_8_ + iVar35 * 4)) {
                  (false_sel.ptr)->sel_vector[lVar48] = (sel_t)iVar23;
                  lVar48 = lVar48 + 1;
                }
                iVar34 = iVar34 + 1;
              } while (count != iVar34);
              goto LAB_00b446dc;
            }
            if (count == 0) goto LAB_00b428a4;
            psVar11 = (sel.ptr)->sel_vector;
            lVar46 = *(long *)local_4a8;
            psVar12 = *(sel_t **)local_428;
            iVar34 = 0;
            local_4c8 = (element_type *)0x0;
            do {
              iVar23 = iVar34;
              if (psVar11 != (sel_t *)0x0) {
                iVar23 = (idx_t)psVar11[iVar34];
              }
              iVar28 = iVar34;
              if (lVar46 != 0) {
                iVar28 = (idx_t)*(uint *)(lVar46 + iVar34 * 4);
              }
              iVar35 = iVar34;
              if (psVar12 != (sel_t *)0x0) {
                iVar35 = (idx_t)psVar12[iVar34];
              }
              if (*(int *)(LStack_4a0._0_8_ + iVar28 * 4) != *(int *)(LStack_420._0_8_ + iVar35 * 4)
                 ) {
                (true_sel.ptr)->sel_vector[(long)local_4c8] = (sel_t)iVar23;
                local_4c8 = (element_type *)((long)&local_4c8->_vptr_ExtraTypeInfo + 1);
              }
              iVar34 = iVar34 + 1;
            } while (count != iVar34);
          }
          else {
            if (count == 0) goto LAB_00b428a4;
            psVar11 = (sel.ptr)->sel_vector;
            lVar46 = *(long *)local_4a8;
            psVar12 = *(sel_t **)local_428;
            iVar34 = 0;
            peVar29 = (element_type *)0x0;
            peVar30 = (element_type *)0x0;
            do {
              iVar23 = iVar34;
              if (psVar11 != (sel_t *)0x0) {
                iVar23 = (idx_t)psVar11[iVar34];
              }
              iVar28 = iVar34;
              if (lVar46 != 0) {
                iVar28 = (idx_t)*(uint *)(lVar46 + iVar34 * 4);
              }
              iVar35 = iVar34;
              if (psVar12 != (sel_t *)0x0) {
                iVar35 = (idx_t)psVar12[iVar34];
              }
              if (*(int *)(LStack_4a0._0_8_ + iVar28 * 4) == *(int *)(LStack_420._0_8_ + iVar35 * 4)
                 ) {
                oVar32.ptr = false_sel.ptr;
                peVar43 = (element_type *)((long)&peVar29->_vptr_ExtraTypeInfo + 1);
                local_4c8 = peVar30;
              }
              else {
                local_4c8 = (element_type *)((long)&peVar30->_vptr_ExtraTypeInfo + 1);
                oVar32.ptr = true_sel.ptr;
                peVar43 = peVar29;
                peVar29 = peVar30;
              }
              (oVar32.ptr)->sel_vector[(long)peVar29] = (sel_t)iVar23;
              iVar34 = iVar34 + 1;
              peVar29 = peVar43;
              peVar30 = local_4c8;
            } while (count != iVar34);
          }
        }
        else if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0)
        {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            if (count == 0) goto LAB_00b447cb;
            psVar11 = (sel.ptr)->sel_vector;
            lVar46 = *(long *)local_4a8;
            psVar12 = *(sel_t **)local_428;
            lVar48 = 0;
            iVar34 = 0;
            do {
              iVar23 = iVar34;
              if (psVar11 != (sel_t *)0x0) {
                iVar23 = (idx_t)psVar11[iVar34];
              }
              iVar28 = iVar34;
              if (lVar46 != 0) {
                iVar28 = (idx_t)*(uint *)(lVar46 + iVar34 * 4);
              }
              iVar35 = iVar34;
              if (psVar12 != (sel_t *)0x0) {
                iVar35 = (idx_t)psVar12[iVar34];
              }
              if (LStack_4a0.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                  (element_type *)0x0) {
                bVar61 = false;
              }
              else {
                bVar61 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_ptr + (iVar28 >> 6) * 8) >> (iVar28 & 0x3f) & 1) == 0
                ;
              }
              if (LStack_420.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                  (element_type *)0x0) {
                bVar62 = false;
              }
              else {
                bVar62 = ((ulong)(&(LStack_420.type_info_.internal.
                                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr)->_vptr_ExtraTypeInfo)[iVar35 >> 6] >> (iVar35 & 0x3f) &
                         1) == 0;
              }
              if ((bool)(bVar61 | bVar62)) {
                bVar61 = (bool)(bVar61 ^ bVar62);
              }
              else {
                bVar61 = *(int *)(LStack_4a0._0_8_ + iVar28 * 4) !=
                         *(int *)(LStack_420._0_8_ + iVar35 * 4);
              }
              if (!bVar61) {
                (false_sel.ptr)->sel_vector[lVar48] = (sel_t)iVar23;
                lVar48 = lVar48 + 1;
              }
              iVar34 = iVar34 + 1;
            } while (count != iVar34);
            goto LAB_00b447cd;
          }
          if (count == 0) goto LAB_00b428a4;
          psVar11 = (sel.ptr)->sel_vector;
          lVar46 = *(long *)local_4a8;
          psVar12 = *(sel_t **)local_428;
          iVar34 = 0;
          local_4c8 = (element_type *)0x0;
          do {
            iVar23 = iVar34;
            if (psVar11 != (sel_t *)0x0) {
              iVar23 = (idx_t)psVar11[iVar34];
            }
            iVar28 = iVar34;
            if (lVar46 != 0) {
              iVar28 = (idx_t)*(uint *)(lVar46 + iVar34 * 4);
            }
            iVar35 = iVar34;
            if (psVar12 != (sel_t *)0x0) {
              iVar35 = (idx_t)psVar12[iVar34];
            }
            if (LStack_4a0.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar61 = false;
            }
            else {
              bVar61 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                         super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr + (iVar28 >> 6) * 8) >> (iVar28 & 0x3f) & 1) == 0;
            }
            if (LStack_420.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar62 = false;
            }
            else {
              bVar62 = ((ulong)(&(LStack_420.type_info_.internal.
                                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->_vptr_ExtraTypeInfo)[iVar35 >> 6] >> (iVar35 & 0x3f) & 1)
                       == 0;
            }
            if ((bool)(bVar61 | bVar62)) {
              bVar61 = (bool)(bVar61 ^ bVar62);
            }
            else {
              bVar61 = *(int *)(LStack_4a0._0_8_ + iVar28 * 4) !=
                       *(int *)(LStack_420._0_8_ + iVar35 * 4);
            }
            if (bVar61) {
              (true_sel.ptr)->sel_vector[(long)local_4c8] = (sel_t)iVar23;
              local_4c8 = (element_type *)((long)&local_4c8->_vptr_ExtraTypeInfo + 1);
            }
            iVar34 = iVar34 + 1;
          } while (count != iVar34);
        }
        else {
          if (count == 0) goto LAB_00b428a4;
          psVar11 = (sel.ptr)->sel_vector;
          lVar46 = *(long *)local_4a8;
          psVar12 = *(sel_t **)local_428;
          iVar34 = 0;
          peVar29 = (element_type *)0x0;
          peVar30 = (element_type *)0x0;
          do {
            iVar23 = iVar34;
            if (psVar11 != (sel_t *)0x0) {
              iVar23 = (idx_t)psVar11[iVar34];
            }
            iVar28 = iVar34;
            if (lVar46 != 0) {
              iVar28 = (idx_t)*(uint *)(lVar46 + iVar34 * 4);
            }
            iVar35 = iVar34;
            if (psVar12 != (sel_t *)0x0) {
              iVar35 = (idx_t)psVar12[iVar34];
            }
            if (LStack_4a0.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar61 = false;
            }
            else {
              bVar61 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                         super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr + (iVar28 >> 6) * 8) >> (iVar28 & 0x3f) & 1) == 0;
            }
            if (LStack_420.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar62 = false;
            }
            else {
              bVar62 = ((ulong)(&(LStack_420.type_info_.internal.
                                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->_vptr_ExtraTypeInfo)[iVar35 >> 6] >> (iVar35 & 0x3f) & 1)
                       == 0;
            }
            if ((bool)(bVar61 | bVar62)) {
              bVar61 = (bool)(bVar61 ^ bVar62);
            }
            else {
              bVar61 = *(int *)(LStack_4a0._0_8_ + iVar28 * 4) !=
                       *(int *)(LStack_420._0_8_ + iVar35 * 4);
            }
            if (bVar61) {
              local_4c8 = (element_type *)((long)&peVar30->_vptr_ExtraTypeInfo + 1);
              peVar43 = peVar29;
              peVar29 = peVar30;
              oVar32.ptr = true_sel.ptr;
            }
            else {
              peVar43 = (element_type *)((long)&peVar29->_vptr_ExtraTypeInfo + 1);
              local_4c8 = peVar30;
              oVar32.ptr = false_sel.ptr;
            }
            (oVar32.ptr)->sel_vector[(long)peVar29] = (sel_t)iVar23;
            iVar34 = iVar34 + 1;
            peVar29 = peVar43;
            peVar30 = local_4c8;
          } while (count != iVar34);
        }
        goto LAB_00b447d5;
      }
      pdVar8 = left->data;
      piVar45 = (int *)right->data;
      _local_4a8 = (undefined1  [16])0x0;
      LStack_4a0.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      LStack_4a0.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
      puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar5 != (unsigned_long *)0x0) && ((*puVar5 & 1) == 0)) {
        local_2a8._0_8_ = 0x800;
        make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                  ((duckdb *)local_428,(unsigned_long *)&local_2a8);
        peVar29 = LStack_4a0.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        auVar18 = local_428;
        LStack_4a0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)LStack_420._0_8_;
        _local_428 = (undefined1  [16])0x0;
        LStack_4a0._0_8_ = auVar18;
        if (peVar29 != (element_type *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar29);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_);
        }
        pTVar25 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                            ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                             (local_4a8 + 8));
        _Var9.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
             (pTVar25->owned_data).
             super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
             super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
             super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
             super__Head_base<0UL,_unsigned_long_*,_false>;
        local_4a8 = (undefined1  [8])
                    _Var9.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
        *(undefined8 *)_Var9.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
             0xfffffffffffffffe;
      }
      FlatVector::VerifyFlatVector(left);
      local_118.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           LStack_4a0.type_info_.internal.
           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
        if (true_sel.ptr == (SelectionVector *)0x0) {
          if (count == 0) goto LAB_00b413a4;
          psVar11 = (sel.ptr)->sel_vector;
          puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          psVar12 = (false_sel.ptr)->sel_vector;
          lVar46 = 0;
          uVar47 = 0;
          do {
            uVar33 = uVar47;
            if (psVar11 != (sel_t *)0x0) {
              uVar33 = (ulong)psVar11[uVar47];
            }
            if (puVar5 == (unsigned_long *)0x0) {
              bVar61 = false;
            }
            else {
              bVar61 = (puVar5[uVar47 >> 6] >> (uVar47 & 0x3f) & 1) == 0;
            }
            if (local_4a8 == (undefined1  [8])0x0) {
              bVar62 = false;
            }
            else {
              bVar62 = (*(byte *)local_4a8 & 1) == 0;
            }
            if ((bVar61 | bVar62) == 1) {
              bVar61 = (bool)(bVar61 ^ bVar62);
            }
            else {
              bVar61 = *(int *)(pdVar8 + uVar47 * 4) != *piVar45;
            }
            psVar12[lVar46] = (sel_t)uVar33;
            lVar46 = lVar46 + (ulong)(bVar61 ^ 1);
            uVar47 = uVar47 + 1;
          } while (count != uVar47);
          goto LAB_00b413a6;
        }
        if (count != 0) {
          psVar11 = (sel.ptr)->sel_vector;
          puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          psVar12 = (true_sel.ptr)->sel_vector;
          uVar47 = 0;
          local_4c8 = (element_type *)0x0;
          do {
            uVar33 = uVar47;
            if (psVar11 != (sel_t *)0x0) {
              uVar33 = (ulong)psVar11[uVar47];
            }
            if (puVar5 == (unsigned_long *)0x0) {
              bVar61 = false;
            }
            else {
              bVar61 = (puVar5[uVar47 >> 6] >> (uVar47 & 0x3f) & 1) == 0;
            }
            if (local_4a8 == (undefined1  [8])0x0) {
              bVar62 = false;
            }
            else {
              bVar62 = (*(byte *)local_4a8 & 1) == 0;
            }
            if ((bVar61 | bVar62) == 1) {
              bVar61 = (bool)(bVar61 ^ bVar62);
            }
            else {
              bVar61 = *(int *)(pdVar8 + uVar47 * 4) != *piVar45;
            }
            psVar12[(long)local_4c8] = (sel_t)uVar33;
            local_4c8 = (element_type *)((long)&local_4c8->_vptr_ExtraTypeInfo + (ulong)bVar61);
            uVar47 = uVar47 + 1;
          } while (count != uVar47);
          goto LAB_00b413b3;
        }
      }
      else if (count != 0) {
        psVar11 = (sel.ptr)->sel_vector;
        puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        psVar12 = (true_sel.ptr)->sel_vector;
        psVar10 = (false_sel.ptr)->sel_vector;
        lVar46 = 0;
        local_4c8 = (element_type *)0x0;
        uVar47 = 0;
        do {
          uVar33 = uVar47;
          if (psVar11 != (sel_t *)0x0) {
            uVar33 = (ulong)psVar11[uVar47];
          }
          if (puVar5 == (unsigned_long *)0x0) {
            bVar61 = false;
          }
          else {
            bVar61 = (puVar5[uVar47 >> 6] >> (uVar47 & 0x3f) & 1) == 0;
          }
          if (local_4a8 == (undefined1  [8])0x0) {
            bVar62 = false;
          }
          else {
            bVar62 = (*(byte *)local_4a8 & 1) == 0;
          }
          if ((bVar61 | bVar62) == 1) {
            bVar61 = (bool)(bVar61 ^ bVar62);
          }
          else {
            bVar61 = *(int *)(pdVar8 + uVar47 * 4) != *piVar45;
          }
          psVar12[(long)local_4c8] = (sel_t)uVar33;
          local_4c8 = (element_type *)((long)&local_4c8->_vptr_ExtraTypeInfo + (ulong)bVar61);
          psVar10[lVar46] = (sel_t)uVar33;
          lVar46 = lVar46 + (ulong)(bVar61 ^ 1);
          uVar47 = uVar47 + 1;
        } while (count != uVar47);
        goto LAB_00b413b3;
      }
    }
    break;
  case INT32:
    local_328 = (undefined1  [8])null_mask.ptr;
    if (sel.ptr == (SelectionVector *)0x0) {
      sel.ptr = FlatVector::IncrementalSelectionVector();
    }
    if (local_328 != (undefined1  [8])0x0) {
      optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                ((optional_ptr<duckdb::ValidityMask,_true> *)local_328);
      UpdateNullMask(left,sel.ptr,count,(ValidityMask *)local_328);
      optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                ((optional_ptr<duckdb::ValidityMask,_true> *)local_328);
      UpdateNullMask(right,sel.ptr,count,(ValidityMask *)local_328);
    }
    VVar3 = left->vector_type;
    VVar4 = right->vector_type;
    if ((VVar3 ^ CONSTANT_VECTOR) == FLAT_VECTOR && (VVar4 ^ CONSTANT_VECTOR) == FLAT_VECTOR) {
      puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if (puVar5 == (unsigned_long *)0x0) {
        bVar61 = false;
      }
      else {
        bVar61 = (*puVar5 & 1) == 0;
      }
      puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if (puVar5 == (unsigned_long *)0x0) {
        bVar62 = false;
      }
      else {
        bVar62 = (*puVar5 & 1) == 0;
      }
      if ((bool)(bVar61 | bVar62)) {
        bVar61 = (bool)(bVar61 ^ bVar62);
      }
      else {
        bVar61 = *(int *)left->data != *(int *)right->data;
      }
      if (!bVar61) {
        if (false_sel.ptr == (SelectionVector *)0x0 || count == 0) {
          return (idx_t)(element_type *)0x0;
        }
        psVar11 = (sel.ptr)->sel_vector;
        psVar12 = (false_sel.ptr)->sel_vector;
        iVar34 = 0;
        do {
          sVar44 = (sel_t)iVar34;
          if (psVar11 != (sel_t *)0x0) {
            sVar44 = psVar11[iVar34];
          }
          psVar12[iVar34] = sVar44;
          iVar34 = iVar34 + 1;
        } while (count != iVar34);
        return (idx_t)(element_type *)0x0;
      }
      if (true_sel.ptr != (SelectionVector *)0x0 && count != 0) {
        psVar11 = (sel.ptr)->sel_vector;
        psVar12 = (true_sel.ptr)->sel_vector;
        iVar34 = 0;
        do {
          sVar44 = (sel_t)iVar34;
          if (psVar11 != (sel_t *)0x0) {
            sVar44 = psVar11[iVar34];
          }
          psVar12[iVar34] = sVar44;
          iVar34 = iVar34 + 1;
        } while (count != iVar34);
        return count;
      }
      return count;
    }
    if ((VVar3 ^ CONSTANT_VECTOR) == FLAT_VECTOR && VVar4 == FLAT_VECTOR) {
      piVar45 = (int *)left->data;
      pdVar8 = right->data;
      _local_4a8 = (undefined1  [16])0x0;
      LStack_4a0.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      LStack_4a0.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
      puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar5 != (unsigned_long *)0x0) && ((*puVar5 & 1) == 0)) {
        local_2a8._0_8_ = 0x800;
        make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                  ((duckdb *)local_428,(unsigned_long *)&local_2a8);
        peVar29 = LStack_4a0.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        auVar18 = local_428;
        LStack_4a0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)LStack_420._0_8_;
        _local_428 = (undefined1  [16])0x0;
        LStack_4a0._0_8_ = auVar18;
        if (peVar29 != (element_type *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar29);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_);
        }
        pTVar25 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                            ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                             (local_4a8 + 8));
        _Var9.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
             (pTVar25->owned_data).
             super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
             super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
             super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
             super__Head_base<0UL,_unsigned_long_*,_false>;
        local_4a8 = (undefined1  [8])
                    _Var9.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
        *(undefined8 *)_Var9.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
             0xfffffffffffffffe;
      }
      FlatVector::VerifyFlatVector(right);
      local_118.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           LStack_4a0.type_info_.internal.
           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
        if (true_sel.ptr == (SelectionVector *)0x0) {
          if (count == 0) goto LAB_00b413a4;
          psVar11 = (sel.ptr)->sel_vector;
          puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          psVar12 = (false_sel.ptr)->sel_vector;
          lVar46 = 0;
          uVar47 = 0;
          do {
            uVar33 = uVar47;
            if (psVar11 != (sel_t *)0x0) {
              uVar33 = (ulong)psVar11[uVar47];
            }
            if (local_4a8 == (undefined1  [8])0x0) {
              bVar61 = false;
            }
            else {
              bVar61 = (*(byte *)local_4a8 & 1) == 0;
            }
            if (puVar5 == (unsigned_long *)0x0) {
              bVar62 = false;
            }
            else {
              bVar62 = (puVar5[uVar47 >> 6] >> (uVar47 & 0x3f) & 1) == 0;
            }
            if ((bVar61 | bVar62) == 1) {
              bVar61 = (bool)(bVar61 ^ bVar62);
            }
            else {
              bVar61 = *piVar45 != *(int *)(pdVar8 + uVar47 * 4);
            }
            psVar12[lVar46] = (sel_t)uVar33;
            lVar46 = lVar46 + (ulong)(bVar61 ^ 1);
            uVar47 = uVar47 + 1;
          } while (count != uVar47);
          goto LAB_00b413a6;
        }
        if (count != 0) {
          psVar11 = (sel.ptr)->sel_vector;
          puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          psVar12 = (true_sel.ptr)->sel_vector;
          local_4c8 = (element_type *)0x0;
          uVar47 = 0;
          do {
            uVar33 = uVar47;
            if (psVar11 != (sel_t *)0x0) {
              uVar33 = (ulong)psVar11[uVar47];
            }
            if (local_4a8 == (undefined1  [8])0x0) {
              bVar61 = false;
            }
            else {
              bVar61 = (*(byte *)local_4a8 & 1) == 0;
            }
            if (puVar5 == (unsigned_long *)0x0) {
              bVar62 = false;
            }
            else {
              bVar62 = (puVar5[uVar47 >> 6] >> (uVar47 & 0x3f) & 1) == 0;
            }
            if ((bVar61 | bVar62) == 1) {
              bVar61 = (bool)(bVar61 ^ bVar62);
            }
            else {
              bVar61 = *piVar45 != *(int *)(pdVar8 + uVar47 * 4);
            }
            psVar12[(long)local_4c8] = (sel_t)uVar33;
            local_4c8 = (element_type *)((long)&local_4c8->_vptr_ExtraTypeInfo + (ulong)bVar61);
            uVar47 = uVar47 + 1;
          } while (count != uVar47);
          goto LAB_00b413b3;
        }
      }
      else if (count != 0) {
        psVar11 = (sel.ptr)->sel_vector;
        puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        psVar12 = (true_sel.ptr)->sel_vector;
        psVar10 = (false_sel.ptr)->sel_vector;
        local_4c8 = (element_type *)0x0;
        lVar46 = 0;
        uVar47 = 0;
        do {
          uVar33 = uVar47;
          if (psVar11 != (sel_t *)0x0) {
            uVar33 = (ulong)psVar11[uVar47];
          }
          if (local_4a8 == (undefined1  [8])0x0) {
            bVar61 = false;
          }
          else {
            bVar61 = (*(byte *)local_4a8 & 1) == 0;
          }
          if (puVar5 == (unsigned_long *)0x0) {
            bVar62 = false;
          }
          else {
            bVar62 = (puVar5[uVar47 >> 6] >> (uVar47 & 0x3f) & 1) == 0;
          }
          if ((bVar61 | bVar62) == 1) {
            bVar61 = (bool)(bVar61 ^ bVar62);
          }
          else {
            bVar61 = *piVar45 != *(int *)(pdVar8 + uVar47 * 4);
          }
          psVar12[(long)local_4c8] = (sel_t)uVar33;
          local_4c8 = (element_type *)((long)&local_4c8->_vptr_ExtraTypeInfo + (ulong)bVar61);
          psVar10[lVar46] = (sel_t)uVar33;
          lVar46 = lVar46 + (ulong)(bVar61 ^ 1);
          uVar47 = uVar47 + 1;
        } while (count != uVar47);
        goto LAB_00b413b3;
      }
    }
    else {
      if ((VVar4 ^ CONSTANT_VECTOR) != FLAT_VECTOR || VVar3 != FLAT_VECTOR) {
        if (VVar3 == FLAT_VECTOR && VVar4 == FLAT_VECTOR) {
          pdVar8 = left->data;
          pdVar13 = right->data;
          FlatVector::VerifyFlatVector(left);
          FlatVector::VerifyFlatVector(right);
          if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
            if (count == 0) {
              return (idx_t)(element_type *)0x0;
            }
            psVar11 = (sel.ptr)->sel_vector;
            puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            puVar14 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            psVar12 = (true_sel.ptr)->sel_vector;
            psVar10 = (false_sel.ptr)->sel_vector;
            peVar29 = (element_type *)0x0;
            lVar46 = 0;
            uVar47 = 0;
            do {
              uVar33 = uVar47;
              if (psVar11 != (sel_t *)0x0) {
                uVar33 = (ulong)psVar11[uVar47];
              }
              if (puVar5 == (unsigned_long *)0x0) {
                bVar61 = false;
              }
              else {
                bVar61 = (puVar5[uVar47 >> 6] >> (uVar47 & 0x3f) & 1) == 0;
              }
              if (puVar14 == (unsigned_long *)0x0) {
                bVar62 = false;
              }
              else {
                bVar62 = (puVar14[uVar47 >> 6] >> (uVar47 & 0x3f) & 1) == 0;
              }
              if ((bVar61 | bVar62) == 1) {
                bVar61 = (bool)(bVar61 ^ bVar62);
              }
              else {
                bVar61 = *(int *)(pdVar8 + uVar47 * 4) != *(int *)(pdVar13 + uVar47 * 4);
              }
              psVar12[(long)peVar29] = (sel_t)uVar33;
              peVar29 = (element_type *)((long)&peVar29->_vptr_ExtraTypeInfo + (ulong)bVar61);
              psVar10[lVar46] = (sel_t)uVar33;
              lVar46 = lVar46 + (ulong)(bVar61 ^ 1);
              uVar47 = uVar47 + 1;
            } while (count != uVar47);
            return (idx_t)peVar29;
          }
          if (true_sel.ptr != (SelectionVector *)0x0) {
            if (count == 0) {
              return (idx_t)(element_type *)0x0;
            }
            psVar11 = (sel.ptr)->sel_vector;
            puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            puVar14 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            psVar12 = (true_sel.ptr)->sel_vector;
            peVar29 = (element_type *)0x0;
            uVar47 = 0;
            do {
              uVar33 = uVar47;
              if (psVar11 != (sel_t *)0x0) {
                uVar33 = (ulong)psVar11[uVar47];
              }
              if (puVar5 == (unsigned_long *)0x0) {
                bVar61 = false;
              }
              else {
                bVar61 = (puVar5[uVar47 >> 6] >> (uVar47 & 0x3f) & 1) == 0;
              }
              if (puVar14 == (unsigned_long *)0x0) {
                bVar62 = false;
              }
              else {
                bVar62 = (puVar14[uVar47 >> 6] >> (uVar47 & 0x3f) & 1) == 0;
              }
              if ((bVar61 | bVar62) == 1) {
                bVar61 = (bool)(bVar61 ^ bVar62);
              }
              else {
                bVar61 = *(int *)(pdVar8 + uVar47 * 4) != *(int *)(pdVar13 + uVar47 * 4);
              }
              psVar12[(long)peVar29] = (sel_t)uVar33;
              peVar29 = (element_type *)((long)&peVar29->_vptr_ExtraTypeInfo + (ulong)bVar61);
              uVar47 = uVar47 + 1;
            } while (count != uVar47);
            return (idx_t)peVar29;
          }
          if (count != 0) {
            psVar11 = (sel.ptr)->sel_vector;
            puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            puVar14 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            psVar12 = (false_sel.ptr)->sel_vector;
            lVar46 = 0;
            uVar47 = 0;
            do {
              uVar33 = uVar47;
              if (psVar11 != (sel_t *)0x0) {
                uVar33 = (ulong)psVar11[uVar47];
              }
              if (puVar5 == (unsigned_long *)0x0) {
                bVar61 = false;
              }
              else {
                bVar61 = (puVar5[uVar47 >> 6] >> (uVar47 & 0x3f) & 1) == 0;
              }
              if (puVar14 == (unsigned_long *)0x0) {
                bVar62 = false;
              }
              else {
                bVar62 = (puVar14[uVar47 >> 6] >> (uVar47 & 0x3f) & 1) == 0;
              }
              if ((bVar61 | bVar62) == 1) {
                bVar61 = (bool)(bVar61 ^ bVar62);
              }
              else {
                bVar61 = *(int *)(pdVar8 + uVar47 * 4) != *(int *)(pdVar13 + uVar47 * 4);
              }
              psVar12[lVar46] = (sel_t)uVar33;
              lVar46 = lVar46 + (ulong)(bVar61 ^ 1);
              uVar47 = uVar47 + 1;
            } while (count != uVar47);
            goto LAB_00b4331a;
          }
          goto LAB_00b43318;
        }
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_4a8);
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_428);
        Vector::ToUnifiedFormat(left,count,(UnifiedVectorFormat *)local_4a8);
        Vector::ToUnifiedFormat(right,count,(UnifiedVectorFormat *)local_428);
        if (LStack_4a0.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0 &&
            LStack_420.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
            if (true_sel.ptr == (SelectionVector *)0x0) {
              if (count == 0) goto LAB_00b446da;
              psVar11 = (sel.ptr)->sel_vector;
              lVar46 = *(long *)local_4a8;
              psVar12 = *(sel_t **)local_428;
              lVar48 = 0;
              iVar34 = 0;
              do {
                iVar23 = iVar34;
                if (psVar11 != (sel_t *)0x0) {
                  iVar23 = (idx_t)psVar11[iVar34];
                }
                iVar28 = iVar34;
                if (lVar46 != 0) {
                  iVar28 = (idx_t)*(uint *)(lVar46 + iVar34 * 4);
                }
                iVar35 = iVar34;
                if (psVar12 != (sel_t *)0x0) {
                  iVar35 = (idx_t)psVar12[iVar34];
                }
                if (*(int *)(LStack_4a0._0_8_ + iVar28 * 4) ==
                    *(int *)(LStack_420._0_8_ + iVar35 * 4)) {
                  (false_sel.ptr)->sel_vector[lVar48] = (sel_t)iVar23;
                  lVar48 = lVar48 + 1;
                }
                iVar34 = iVar34 + 1;
              } while (count != iVar34);
              goto LAB_00b446dc;
            }
            if (count == 0) goto LAB_00b428a4;
            psVar11 = (sel.ptr)->sel_vector;
            lVar46 = *(long *)local_4a8;
            psVar12 = *(sel_t **)local_428;
            local_4c8 = (element_type *)0x0;
            iVar34 = 0;
            do {
              iVar23 = iVar34;
              if (psVar11 != (sel_t *)0x0) {
                iVar23 = (idx_t)psVar11[iVar34];
              }
              iVar28 = iVar34;
              if (lVar46 != 0) {
                iVar28 = (idx_t)*(uint *)(lVar46 + iVar34 * 4);
              }
              iVar35 = iVar34;
              if (psVar12 != (sel_t *)0x0) {
                iVar35 = (idx_t)psVar12[iVar34];
              }
              if (*(int *)(LStack_4a0._0_8_ + iVar28 * 4) != *(int *)(LStack_420._0_8_ + iVar35 * 4)
                 ) {
                (true_sel.ptr)->sel_vector[(long)local_4c8] = (sel_t)iVar23;
                local_4c8 = (element_type *)((long)&local_4c8->_vptr_ExtraTypeInfo + 1);
              }
              iVar34 = iVar34 + 1;
            } while (count != iVar34);
          }
          else {
            if (count == 0) goto LAB_00b428a4;
            psVar11 = (sel.ptr)->sel_vector;
            lVar46 = *(long *)local_4a8;
            psVar12 = *(sel_t **)local_428;
            iVar34 = 0;
            peVar29 = (element_type *)0x0;
            peVar30 = (element_type *)0x0;
            do {
              iVar23 = iVar34;
              if (psVar11 != (sel_t *)0x0) {
                iVar23 = (idx_t)psVar11[iVar34];
              }
              iVar28 = iVar34;
              if (lVar46 != 0) {
                iVar28 = (idx_t)*(uint *)(lVar46 + iVar34 * 4);
              }
              iVar35 = iVar34;
              if (psVar12 != (sel_t *)0x0) {
                iVar35 = (idx_t)psVar12[iVar34];
              }
              if (*(int *)(LStack_4a0._0_8_ + iVar28 * 4) == *(int *)(LStack_420._0_8_ + iVar35 * 4)
                 ) {
                oVar32.ptr = false_sel.ptr;
                peVar43 = (element_type *)((long)&peVar29->_vptr_ExtraTypeInfo + 1);
                local_4c8 = peVar30;
              }
              else {
                local_4c8 = (element_type *)((long)&peVar30->_vptr_ExtraTypeInfo + 1);
                oVar32.ptr = true_sel.ptr;
                peVar43 = peVar29;
                peVar29 = peVar30;
              }
              (oVar32.ptr)->sel_vector[(long)peVar29] = (sel_t)iVar23;
              iVar34 = iVar34 + 1;
              peVar29 = peVar43;
              peVar30 = local_4c8;
            } while (count != iVar34);
          }
        }
        else if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0)
        {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            if (count == 0) goto LAB_00b447cb;
            psVar11 = (sel.ptr)->sel_vector;
            lVar46 = *(long *)local_4a8;
            psVar12 = *(sel_t **)local_428;
            lVar48 = 0;
            iVar34 = 0;
            do {
              iVar23 = iVar34;
              if (psVar11 != (sel_t *)0x0) {
                iVar23 = (idx_t)psVar11[iVar34];
              }
              iVar28 = iVar34;
              if (lVar46 != 0) {
                iVar28 = (idx_t)*(uint *)(lVar46 + iVar34 * 4);
              }
              iVar35 = iVar34;
              if (psVar12 != (sel_t *)0x0) {
                iVar35 = (idx_t)psVar12[iVar34];
              }
              if (LStack_4a0.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                  (element_type *)0x0) {
                bVar61 = false;
              }
              else {
                bVar61 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_ptr + (iVar28 >> 6) * 8) >> (iVar28 & 0x3f) & 1) == 0
                ;
              }
              if (LStack_420.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                  (element_type *)0x0) {
                bVar62 = false;
              }
              else {
                bVar62 = ((ulong)(&(LStack_420.type_info_.internal.
                                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr)->_vptr_ExtraTypeInfo)[iVar35 >> 6] >> (iVar35 & 0x3f) &
                         1) == 0;
              }
              if ((bool)(bVar61 | bVar62)) {
                bVar61 = (bool)(bVar61 ^ bVar62);
              }
              else {
                bVar61 = *(int *)(LStack_4a0._0_8_ + iVar28 * 4) !=
                         *(int *)(LStack_420._0_8_ + iVar35 * 4);
              }
              if (!bVar61) {
                (false_sel.ptr)->sel_vector[lVar48] = (sel_t)iVar23;
                lVar48 = lVar48 + 1;
              }
              iVar34 = iVar34 + 1;
            } while (count != iVar34);
            goto LAB_00b447cd;
          }
          if (count == 0) goto LAB_00b428a4;
          psVar11 = (sel.ptr)->sel_vector;
          lVar46 = *(long *)local_4a8;
          psVar12 = *(sel_t **)local_428;
          local_4c8 = (element_type *)0x0;
          iVar34 = 0;
          do {
            iVar23 = iVar34;
            if (psVar11 != (sel_t *)0x0) {
              iVar23 = (idx_t)psVar11[iVar34];
            }
            iVar28 = iVar34;
            if (lVar46 != 0) {
              iVar28 = (idx_t)*(uint *)(lVar46 + iVar34 * 4);
            }
            iVar35 = iVar34;
            if (psVar12 != (sel_t *)0x0) {
              iVar35 = (idx_t)psVar12[iVar34];
            }
            if (LStack_4a0.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar61 = false;
            }
            else {
              bVar61 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                         super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr + (iVar28 >> 6) * 8) >> (iVar28 & 0x3f) & 1) == 0;
            }
            if (LStack_420.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar62 = false;
            }
            else {
              bVar62 = ((ulong)(&(LStack_420.type_info_.internal.
                                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->_vptr_ExtraTypeInfo)[iVar35 >> 6] >> (iVar35 & 0x3f) & 1)
                       == 0;
            }
            if ((bool)(bVar61 | bVar62)) {
              bVar61 = (bool)(bVar61 ^ bVar62);
            }
            else {
              bVar61 = *(int *)(LStack_4a0._0_8_ + iVar28 * 4) !=
                       *(int *)(LStack_420._0_8_ + iVar35 * 4);
            }
            if (bVar61) {
              (true_sel.ptr)->sel_vector[(long)local_4c8] = (sel_t)iVar23;
              local_4c8 = (element_type *)((long)&local_4c8->_vptr_ExtraTypeInfo + 1);
            }
            iVar34 = iVar34 + 1;
          } while (count != iVar34);
        }
        else {
          if (count == 0) goto LAB_00b428a4;
          psVar11 = (sel.ptr)->sel_vector;
          lVar46 = *(long *)local_4a8;
          psVar12 = *(sel_t **)local_428;
          iVar34 = 0;
          peVar29 = (element_type *)0x0;
          peVar30 = (element_type *)0x0;
          do {
            iVar23 = iVar34;
            if (psVar11 != (sel_t *)0x0) {
              iVar23 = (idx_t)psVar11[iVar34];
            }
            iVar28 = iVar34;
            if (lVar46 != 0) {
              iVar28 = (idx_t)*(uint *)(lVar46 + iVar34 * 4);
            }
            iVar35 = iVar34;
            if (psVar12 != (sel_t *)0x0) {
              iVar35 = (idx_t)psVar12[iVar34];
            }
            if (LStack_4a0.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar61 = false;
            }
            else {
              bVar61 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                         super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr + (iVar28 >> 6) * 8) >> (iVar28 & 0x3f) & 1) == 0;
            }
            if (LStack_420.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar62 = false;
            }
            else {
              bVar62 = ((ulong)(&(LStack_420.type_info_.internal.
                                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->_vptr_ExtraTypeInfo)[iVar35 >> 6] >> (iVar35 & 0x3f) & 1)
                       == 0;
            }
            if ((bool)(bVar61 | bVar62)) {
              bVar61 = (bool)(bVar61 ^ bVar62);
            }
            else {
              bVar61 = *(int *)(LStack_4a0._0_8_ + iVar28 * 4) !=
                       *(int *)(LStack_420._0_8_ + iVar35 * 4);
            }
            if (bVar61) {
              local_4c8 = (element_type *)((long)&peVar30->_vptr_ExtraTypeInfo + 1);
              peVar43 = peVar29;
              peVar29 = peVar30;
              oVar32.ptr = true_sel.ptr;
            }
            else {
              peVar43 = (element_type *)((long)&peVar29->_vptr_ExtraTypeInfo + 1);
              local_4c8 = peVar30;
              oVar32.ptr = false_sel.ptr;
            }
            (oVar32.ptr)->sel_vector[(long)peVar29] = (sel_t)iVar23;
            iVar34 = iVar34 + 1;
            peVar29 = peVar43;
            peVar30 = local_4c8;
          } while (count != iVar34);
        }
        goto LAB_00b447d5;
      }
      pdVar8 = left->data;
      piVar45 = (int *)right->data;
      _local_4a8 = (undefined1  [16])0x0;
      LStack_4a0.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      LStack_4a0.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
      puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar5 != (unsigned_long *)0x0) && ((*puVar5 & 1) == 0)) {
        local_2a8._0_8_ = 0x800;
        make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                  ((duckdb *)local_428,(unsigned_long *)&local_2a8);
        peVar29 = LStack_4a0.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        auVar18 = local_428;
        LStack_4a0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)LStack_420._0_8_;
        _local_428 = (undefined1  [16])0x0;
        LStack_4a0._0_8_ = auVar18;
        if (peVar29 != (element_type *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar29);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_);
        }
        pTVar25 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                            ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                             (local_4a8 + 8));
        _Var9.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
             (pTVar25->owned_data).
             super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
             super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
             super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
             super__Head_base<0UL,_unsigned_long_*,_false>;
        local_4a8 = (undefined1  [8])
                    _Var9.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
        *(undefined8 *)_Var9.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
             0xfffffffffffffffe;
      }
      FlatVector::VerifyFlatVector(left);
      local_118.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           LStack_4a0.type_info_.internal.
           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
        if (true_sel.ptr == (SelectionVector *)0x0) {
          if (count == 0) goto LAB_00b413a4;
          psVar11 = (sel.ptr)->sel_vector;
          puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          psVar12 = (false_sel.ptr)->sel_vector;
          lVar46 = 0;
          uVar47 = 0;
          do {
            uVar33 = uVar47;
            if (psVar11 != (sel_t *)0x0) {
              uVar33 = (ulong)psVar11[uVar47];
            }
            if (puVar5 == (unsigned_long *)0x0) {
              bVar61 = false;
            }
            else {
              bVar61 = (puVar5[uVar47 >> 6] >> (uVar47 & 0x3f) & 1) == 0;
            }
            if (local_4a8 == (undefined1  [8])0x0) {
              bVar62 = false;
            }
            else {
              bVar62 = (*(byte *)local_4a8 & 1) == 0;
            }
            if ((bVar61 | bVar62) == 1) {
              bVar61 = (bool)(bVar61 ^ bVar62);
            }
            else {
              bVar61 = *(int *)(pdVar8 + uVar47 * 4) != *piVar45;
            }
            psVar12[lVar46] = (sel_t)uVar33;
            lVar46 = lVar46 + (ulong)(bVar61 ^ 1);
            uVar47 = uVar47 + 1;
          } while (count != uVar47);
          goto LAB_00b413a6;
        }
        if (count != 0) {
          psVar11 = (sel.ptr)->sel_vector;
          puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          psVar12 = (true_sel.ptr)->sel_vector;
          local_4c8 = (element_type *)0x0;
          uVar47 = 0;
          do {
            uVar33 = uVar47;
            if (psVar11 != (sel_t *)0x0) {
              uVar33 = (ulong)psVar11[uVar47];
            }
            if (puVar5 == (unsigned_long *)0x0) {
              bVar61 = false;
            }
            else {
              bVar61 = (puVar5[uVar47 >> 6] >> (uVar47 & 0x3f) & 1) == 0;
            }
            if (local_4a8 == (undefined1  [8])0x0) {
              bVar62 = false;
            }
            else {
              bVar62 = (*(byte *)local_4a8 & 1) == 0;
            }
            if ((bVar61 | bVar62) == 1) {
              bVar61 = (bool)(bVar61 ^ bVar62);
            }
            else {
              bVar61 = *(int *)(pdVar8 + uVar47 * 4) != *piVar45;
            }
            psVar12[(long)local_4c8] = (sel_t)uVar33;
            local_4c8 = (element_type *)((long)&local_4c8->_vptr_ExtraTypeInfo + (ulong)bVar61);
            uVar47 = uVar47 + 1;
          } while (count != uVar47);
          goto LAB_00b413b3;
        }
      }
      else if (count != 0) {
        psVar11 = (sel.ptr)->sel_vector;
        puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        psVar12 = (true_sel.ptr)->sel_vector;
        psVar10 = (false_sel.ptr)->sel_vector;
        local_4c8 = (element_type *)0x0;
        lVar46 = 0;
        uVar47 = 0;
        do {
          uVar33 = uVar47;
          if (psVar11 != (sel_t *)0x0) {
            uVar33 = (ulong)psVar11[uVar47];
          }
          if (puVar5 == (unsigned_long *)0x0) {
            bVar61 = false;
          }
          else {
            bVar61 = (puVar5[uVar47 >> 6] >> (uVar47 & 0x3f) & 1) == 0;
          }
          if (local_4a8 == (undefined1  [8])0x0) {
            bVar62 = false;
          }
          else {
            bVar62 = (*(byte *)local_4a8 & 1) == 0;
          }
          if ((bVar61 | bVar62) == 1) {
            bVar61 = (bool)(bVar61 ^ bVar62);
          }
          else {
            bVar61 = *(int *)(pdVar8 + uVar47 * 4) != *piVar45;
          }
          psVar12[(long)local_4c8] = (sel_t)uVar33;
          local_4c8 = (element_type *)((long)&local_4c8->_vptr_ExtraTypeInfo + (ulong)bVar61);
          psVar10[lVar46] = (sel_t)uVar33;
          lVar46 = lVar46 + (ulong)(bVar61 ^ 1);
          uVar47 = uVar47 + 1;
        } while (count != uVar47);
        goto LAB_00b413b3;
      }
    }
    break;
  case UINT64:
    local_328 = (undefined1  [8])null_mask.ptr;
    if (sel.ptr == (SelectionVector *)0x0) {
      sel.ptr = FlatVector::IncrementalSelectionVector();
    }
    if (local_328 != (undefined1  [8])0x0) {
      optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                ((optional_ptr<duckdb::ValidityMask,_true> *)local_328);
      UpdateNullMask(left,sel.ptr,count,(ValidityMask *)local_328);
      optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                ((optional_ptr<duckdb::ValidityMask,_true> *)local_328);
      UpdateNullMask(right,sel.ptr,count,(ValidityMask *)local_328);
    }
    VVar3 = left->vector_type;
    VVar4 = right->vector_type;
    if ((VVar3 ^ CONSTANT_VECTOR) == FLAT_VECTOR && (VVar4 ^ CONSTANT_VECTOR) == FLAT_VECTOR) {
      puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if (puVar5 == (unsigned_long *)0x0) {
        bVar61 = false;
      }
      else {
        bVar61 = (*puVar5 & 1) == 0;
      }
      puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if (puVar5 == (unsigned_long *)0x0) {
        bVar62 = false;
      }
      else {
        bVar62 = (*puVar5 & 1) == 0;
      }
      if ((bool)(bVar61 | bVar62)) {
        bVar61 = (bool)(bVar61 ^ bVar62);
      }
      else {
        bVar61 = *(long *)left->data != *(long *)right->data;
      }
      if (!bVar61) {
        if (false_sel.ptr == (SelectionVector *)0x0 || count == 0) {
          return (idx_t)(element_type *)0x0;
        }
        psVar11 = (sel.ptr)->sel_vector;
        psVar12 = (false_sel.ptr)->sel_vector;
        iVar34 = 0;
        do {
          sVar44 = (sel_t)iVar34;
          if (psVar11 != (sel_t *)0x0) {
            sVar44 = psVar11[iVar34];
          }
          psVar12[iVar34] = sVar44;
          iVar34 = iVar34 + 1;
        } while (count != iVar34);
        return (idx_t)(element_type *)0x0;
      }
      if (true_sel.ptr != (SelectionVector *)0x0 && count != 0) {
        psVar11 = (sel.ptr)->sel_vector;
        psVar12 = (true_sel.ptr)->sel_vector;
        iVar34 = 0;
        do {
          sVar44 = (sel_t)iVar34;
          if (psVar11 != (sel_t *)0x0) {
            sVar44 = psVar11[iVar34];
          }
          psVar12[iVar34] = sVar44;
          iVar34 = iVar34 + 1;
        } while (count != iVar34);
        return count;
      }
      return count;
    }
    if ((VVar3 ^ CONSTANT_VECTOR) == FLAT_VECTOR && VVar4 == FLAT_VECTOR) {
      plVar53 = (long *)left->data;
      pdVar8 = right->data;
      _local_4a8 = (undefined1  [16])0x0;
      LStack_4a0.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      LStack_4a0.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
      puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar5 != (unsigned_long *)0x0) && ((*puVar5 & 1) == 0)) {
        local_2a8._0_8_ = 0x800;
        make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                  ((duckdb *)local_428,(unsigned_long *)&local_2a8);
        peVar29 = LStack_4a0.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        auVar18 = local_428;
        LStack_4a0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)LStack_420._0_8_;
        _local_428 = (undefined1  [16])0x0;
        LStack_4a0._0_8_ = auVar18;
        if (peVar29 != (element_type *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar29);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_);
        }
        pTVar25 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                            ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                             (local_4a8 + 8));
        _Var9.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
             (pTVar25->owned_data).
             super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
             super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
             super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
             super__Head_base<0UL,_unsigned_long_*,_false>;
        local_4a8 = (undefined1  [8])
                    _Var9.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
        *(undefined8 *)_Var9.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
             0xfffffffffffffffe;
      }
      FlatVector::VerifyFlatVector(right);
      local_118.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           LStack_4a0.type_info_.internal.
           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
        if (true_sel.ptr == (SelectionVector *)0x0) {
          if (count == 0) goto LAB_00b413a4;
          psVar11 = (sel.ptr)->sel_vector;
          puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          psVar12 = (false_sel.ptr)->sel_vector;
          lVar46 = 0;
          uVar47 = 0;
          do {
            uVar33 = uVar47;
            if (psVar11 != (sel_t *)0x0) {
              uVar33 = (ulong)psVar11[uVar47];
            }
            if (local_4a8 == (undefined1  [8])0x0) {
              bVar61 = false;
            }
            else {
              bVar61 = (*(byte *)local_4a8 & 1) == 0;
            }
            if (puVar5 == (unsigned_long *)0x0) {
              bVar62 = false;
            }
            else {
              bVar62 = (puVar5[uVar47 >> 6] >> (uVar47 & 0x3f) & 1) == 0;
            }
            if ((bVar61 | bVar62) == 1) {
              bVar61 = (bool)(bVar61 ^ bVar62);
            }
            else {
              bVar61 = *plVar53 != *(long *)(pdVar8 + uVar47 * 8);
            }
            psVar12[lVar46] = (sel_t)uVar33;
            lVar46 = lVar46 + (ulong)(bVar61 ^ 1);
            uVar47 = uVar47 + 1;
          } while (count != uVar47);
          goto LAB_00b413a6;
        }
        if (count != 0) {
          psVar11 = (sel.ptr)->sel_vector;
          puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          psVar12 = (true_sel.ptr)->sel_vector;
          uVar47 = 0;
          local_4c8 = (element_type *)0x0;
          do {
            uVar33 = uVar47;
            if (psVar11 != (sel_t *)0x0) {
              uVar33 = (ulong)psVar11[uVar47];
            }
            if (local_4a8 == (undefined1  [8])0x0) {
              bVar61 = false;
            }
            else {
              bVar61 = (*(byte *)local_4a8 & 1) == 0;
            }
            if (puVar5 == (unsigned_long *)0x0) {
              bVar62 = false;
            }
            else {
              bVar62 = (puVar5[uVar47 >> 6] >> (uVar47 & 0x3f) & 1) == 0;
            }
            if ((bVar61 | bVar62) == 1) {
              bVar61 = (bool)(bVar61 ^ bVar62);
            }
            else {
              bVar61 = *plVar53 != *(long *)(pdVar8 + uVar47 * 8);
            }
            psVar12[(long)local_4c8] = (sel_t)uVar33;
            local_4c8 = (element_type *)((long)&local_4c8->_vptr_ExtraTypeInfo + (ulong)bVar61);
            uVar47 = uVar47 + 1;
          } while (count != uVar47);
          goto LAB_00b413b3;
        }
      }
      else if (count != 0) {
        psVar11 = (sel.ptr)->sel_vector;
        puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        psVar12 = (true_sel.ptr)->sel_vector;
        psVar10 = (false_sel.ptr)->sel_vector;
        lVar46 = 0;
        local_4c8 = (element_type *)0x0;
        uVar47 = 0;
        do {
          uVar33 = uVar47;
          if (psVar11 != (sel_t *)0x0) {
            uVar33 = (ulong)psVar11[uVar47];
          }
          if (local_4a8 == (undefined1  [8])0x0) {
            bVar61 = false;
          }
          else {
            bVar61 = (*(byte *)local_4a8 & 1) == 0;
          }
          if (puVar5 == (unsigned_long *)0x0) {
            bVar62 = false;
          }
          else {
            bVar62 = (puVar5[uVar47 >> 6] >> (uVar47 & 0x3f) & 1) == 0;
          }
          if ((bVar61 | bVar62) == 1) {
            bVar61 = (bool)(bVar61 ^ bVar62);
          }
          else {
            bVar61 = *plVar53 != *(long *)(pdVar8 + uVar47 * 8);
          }
          psVar12[(long)local_4c8] = (sel_t)uVar33;
          local_4c8 = (element_type *)((long)&local_4c8->_vptr_ExtraTypeInfo + (ulong)bVar61);
          psVar10[lVar46] = (sel_t)uVar33;
          lVar46 = lVar46 + (ulong)(bVar61 ^ 1);
          uVar47 = uVar47 + 1;
        } while (count != uVar47);
        goto LAB_00b413b3;
      }
    }
    else {
      if ((VVar4 ^ CONSTANT_VECTOR) != FLAT_VECTOR || VVar3 != FLAT_VECTOR) {
        if (VVar3 == FLAT_VECTOR && VVar4 == FLAT_VECTOR) {
          pdVar8 = left->data;
          pdVar13 = right->data;
          FlatVector::VerifyFlatVector(left);
          FlatVector::VerifyFlatVector(right);
          if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
            if (count == 0) {
              return (idx_t)(element_type *)0x0;
            }
            psVar11 = (sel.ptr)->sel_vector;
            puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            puVar14 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            psVar12 = (true_sel.ptr)->sel_vector;
            psVar10 = (false_sel.ptr)->sel_vector;
            lVar46 = 0;
            peVar29 = (element_type *)0x0;
            uVar47 = 0;
            do {
              uVar33 = uVar47;
              if (psVar11 != (sel_t *)0x0) {
                uVar33 = (ulong)psVar11[uVar47];
              }
              if (puVar5 == (unsigned_long *)0x0) {
                bVar61 = false;
              }
              else {
                bVar61 = (puVar5[uVar47 >> 6] >> (uVar47 & 0x3f) & 1) == 0;
              }
              if (puVar14 == (unsigned_long *)0x0) {
                bVar62 = false;
              }
              else {
                bVar62 = (puVar14[uVar47 >> 6] >> (uVar47 & 0x3f) & 1) == 0;
              }
              if ((bVar61 | bVar62) == 1) {
                bVar61 = (bool)(bVar61 ^ bVar62);
              }
              else {
                bVar61 = *(long *)(pdVar8 + uVar47 * 8) != *(long *)(pdVar13 + uVar47 * 8);
              }
              psVar12[(long)peVar29] = (sel_t)uVar33;
              peVar29 = (element_type *)((long)&peVar29->_vptr_ExtraTypeInfo + (ulong)bVar61);
              psVar10[lVar46] = (sel_t)uVar33;
              lVar46 = lVar46 + (ulong)(bVar61 ^ 1);
              uVar47 = uVar47 + 1;
            } while (count != uVar47);
            return (idx_t)peVar29;
          }
          if (true_sel.ptr != (SelectionVector *)0x0) {
            if (count == 0) {
              return (idx_t)(element_type *)0x0;
            }
            psVar11 = (sel.ptr)->sel_vector;
            puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            puVar14 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            psVar12 = (true_sel.ptr)->sel_vector;
            uVar47 = 0;
            peVar29 = (element_type *)0x0;
            do {
              uVar33 = uVar47;
              if (psVar11 != (sel_t *)0x0) {
                uVar33 = (ulong)psVar11[uVar47];
              }
              if (puVar5 == (unsigned_long *)0x0) {
                bVar61 = false;
              }
              else {
                bVar61 = (puVar5[uVar47 >> 6] >> (uVar47 & 0x3f) & 1) == 0;
              }
              if (puVar14 == (unsigned_long *)0x0) {
                bVar62 = false;
              }
              else {
                bVar62 = (puVar14[uVar47 >> 6] >> (uVar47 & 0x3f) & 1) == 0;
              }
              if ((bVar61 | bVar62) == 1) {
                bVar61 = (bool)(bVar61 ^ bVar62);
              }
              else {
                bVar61 = *(long *)(pdVar8 + uVar47 * 8) != *(long *)(pdVar13 + uVar47 * 8);
              }
              psVar12[(long)peVar29] = (sel_t)uVar33;
              peVar29 = (element_type *)((long)&peVar29->_vptr_ExtraTypeInfo + (ulong)bVar61);
              uVar47 = uVar47 + 1;
            } while (count != uVar47);
            return (idx_t)peVar29;
          }
          if (count != 0) {
            psVar11 = (sel.ptr)->sel_vector;
            puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            puVar14 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            psVar12 = (false_sel.ptr)->sel_vector;
            lVar46 = 0;
            uVar47 = 0;
            do {
              uVar33 = uVar47;
              if (psVar11 != (sel_t *)0x0) {
                uVar33 = (ulong)psVar11[uVar47];
              }
              if (puVar5 == (unsigned_long *)0x0) {
                bVar61 = false;
              }
              else {
                bVar61 = (puVar5[uVar47 >> 6] >> (uVar47 & 0x3f) & 1) == 0;
              }
              if (puVar14 == (unsigned_long *)0x0) {
                bVar62 = false;
              }
              else {
                bVar62 = (puVar14[uVar47 >> 6] >> (uVar47 & 0x3f) & 1) == 0;
              }
              if ((bVar61 | bVar62) == 1) {
                bVar61 = (bool)(bVar61 ^ bVar62);
              }
              else {
                bVar61 = *(long *)(pdVar8 + uVar47 * 8) != *(long *)(pdVar13 + uVar47 * 8);
              }
              psVar12[lVar46] = (sel_t)uVar33;
              lVar46 = lVar46 + (ulong)(bVar61 ^ 1);
              uVar47 = uVar47 + 1;
            } while (count != uVar47);
            goto LAB_00b4331a;
          }
          goto LAB_00b43318;
        }
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_4a8);
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_428);
        Vector::ToUnifiedFormat(left,count,(UnifiedVectorFormat *)local_4a8);
        Vector::ToUnifiedFormat(right,count,(UnifiedVectorFormat *)local_428);
        if (LStack_4a0.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0 &&
            LStack_420.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
            if (true_sel.ptr == (SelectionVector *)0x0) {
              if (count == 0) goto LAB_00b446da;
              psVar11 = (sel.ptr)->sel_vector;
              lVar46 = *(long *)local_4a8;
              psVar12 = *(sel_t **)local_428;
              lVar48 = 0;
              iVar34 = 0;
              do {
                iVar23 = iVar34;
                if (psVar11 != (sel_t *)0x0) {
                  iVar23 = (idx_t)psVar11[iVar34];
                }
                iVar28 = iVar34;
                if (lVar46 != 0) {
                  iVar28 = (idx_t)*(uint *)(lVar46 + iVar34 * 4);
                }
                iVar35 = iVar34;
                if (psVar12 != (sel_t *)0x0) {
                  iVar35 = (idx_t)psVar12[iVar34];
                }
                if (*(long *)(LStack_4a0._0_8_ + iVar28 * 8) ==
                    *(long *)(LStack_420._0_8_ + iVar35 * 8)) {
                  (false_sel.ptr)->sel_vector[lVar48] = (sel_t)iVar23;
                  lVar48 = lVar48 + 1;
                }
                iVar34 = iVar34 + 1;
              } while (count != iVar34);
              goto LAB_00b446dc;
            }
            if (count == 0) goto LAB_00b428a4;
            psVar11 = (sel.ptr)->sel_vector;
            lVar46 = *(long *)local_4a8;
            psVar12 = *(sel_t **)local_428;
            iVar34 = 0;
            local_4c8 = (element_type *)0x0;
            do {
              iVar23 = iVar34;
              if (psVar11 != (sel_t *)0x0) {
                iVar23 = (idx_t)psVar11[iVar34];
              }
              iVar28 = iVar34;
              if (lVar46 != 0) {
                iVar28 = (idx_t)*(uint *)(lVar46 + iVar34 * 4);
              }
              iVar35 = iVar34;
              if (psVar12 != (sel_t *)0x0) {
                iVar35 = (idx_t)psVar12[iVar34];
              }
              if (*(long *)(LStack_4a0._0_8_ + iVar28 * 8) !=
                  *(long *)(LStack_420._0_8_ + iVar35 * 8)) {
                (true_sel.ptr)->sel_vector[(long)local_4c8] = (sel_t)iVar23;
                local_4c8 = (element_type *)((long)&local_4c8->_vptr_ExtraTypeInfo + 1);
              }
              iVar34 = iVar34 + 1;
            } while (count != iVar34);
          }
          else {
            if (count == 0) goto LAB_00b428a4;
            psVar11 = (sel.ptr)->sel_vector;
            lVar46 = *(long *)local_4a8;
            psVar12 = *(sel_t **)local_428;
            iVar34 = 0;
            peVar29 = (element_type *)0x0;
            peVar30 = (element_type *)0x0;
            do {
              iVar23 = iVar34;
              if (psVar11 != (sel_t *)0x0) {
                iVar23 = (idx_t)psVar11[iVar34];
              }
              iVar28 = iVar34;
              if (lVar46 != 0) {
                iVar28 = (idx_t)*(uint *)(lVar46 + iVar34 * 4);
              }
              iVar35 = iVar34;
              if (psVar12 != (sel_t *)0x0) {
                iVar35 = (idx_t)psVar12[iVar34];
              }
              if (*(long *)(LStack_4a0._0_8_ + iVar28 * 8) ==
                  *(long *)(LStack_420._0_8_ + iVar35 * 8)) {
                oVar32.ptr = false_sel.ptr;
                peVar43 = (element_type *)((long)&peVar29->_vptr_ExtraTypeInfo + 1);
                local_4c8 = peVar30;
              }
              else {
                local_4c8 = (element_type *)((long)&peVar30->_vptr_ExtraTypeInfo + 1);
                oVar32.ptr = true_sel.ptr;
                peVar43 = peVar29;
                peVar29 = peVar30;
              }
              (oVar32.ptr)->sel_vector[(long)peVar29] = (sel_t)iVar23;
              iVar34 = iVar34 + 1;
              peVar29 = peVar43;
              peVar30 = local_4c8;
            } while (count != iVar34);
          }
        }
        else if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0)
        {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            if (count == 0) goto LAB_00b447cb;
            psVar11 = (sel.ptr)->sel_vector;
            lVar46 = *(long *)local_4a8;
            psVar12 = *(sel_t **)local_428;
            lVar48 = 0;
            iVar34 = 0;
            do {
              iVar23 = iVar34;
              if (psVar11 != (sel_t *)0x0) {
                iVar23 = (idx_t)psVar11[iVar34];
              }
              iVar28 = iVar34;
              if (lVar46 != 0) {
                iVar28 = (idx_t)*(uint *)(lVar46 + iVar34 * 4);
              }
              iVar35 = iVar34;
              if (psVar12 != (sel_t *)0x0) {
                iVar35 = (idx_t)psVar12[iVar34];
              }
              if (LStack_4a0.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                  (element_type *)0x0) {
                bVar61 = false;
              }
              else {
                bVar61 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_ptr + (iVar28 >> 6) * 8) >> (iVar28 & 0x3f) & 1) == 0
                ;
              }
              if (LStack_420.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                  (element_type *)0x0) {
                bVar62 = false;
              }
              else {
                bVar62 = ((ulong)(&(LStack_420.type_info_.internal.
                                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr)->_vptr_ExtraTypeInfo)[iVar35 >> 6] >> (iVar35 & 0x3f) &
                         1) == 0;
              }
              if ((bool)(bVar61 | bVar62)) {
                bVar61 = (bool)(bVar61 ^ bVar62);
              }
              else {
                bVar61 = *(long *)(LStack_4a0._0_8_ + iVar28 * 8) !=
                         *(long *)(LStack_420._0_8_ + iVar35 * 8);
              }
              if (!bVar61) {
                (false_sel.ptr)->sel_vector[lVar48] = (sel_t)iVar23;
                lVar48 = lVar48 + 1;
              }
              iVar34 = iVar34 + 1;
            } while (count != iVar34);
            goto LAB_00b447cd;
          }
          if (count == 0) goto LAB_00b428a4;
          psVar11 = (sel.ptr)->sel_vector;
          lVar46 = *(long *)local_4a8;
          psVar12 = *(sel_t **)local_428;
          iVar34 = 0;
          local_4c8 = (element_type *)0x0;
          do {
            iVar23 = iVar34;
            if (psVar11 != (sel_t *)0x0) {
              iVar23 = (idx_t)psVar11[iVar34];
            }
            iVar28 = iVar34;
            if (lVar46 != 0) {
              iVar28 = (idx_t)*(uint *)(lVar46 + iVar34 * 4);
            }
            iVar35 = iVar34;
            if (psVar12 != (sel_t *)0x0) {
              iVar35 = (idx_t)psVar12[iVar34];
            }
            if (LStack_4a0.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar61 = false;
            }
            else {
              bVar61 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                         super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr + (iVar28 >> 6) * 8) >> (iVar28 & 0x3f) & 1) == 0;
            }
            if (LStack_420.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar62 = false;
            }
            else {
              bVar62 = ((ulong)(&(LStack_420.type_info_.internal.
                                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->_vptr_ExtraTypeInfo)[iVar35 >> 6] >> (iVar35 & 0x3f) & 1)
                       == 0;
            }
            if ((bool)(bVar61 | bVar62)) {
              bVar61 = (bool)(bVar61 ^ bVar62);
            }
            else {
              bVar61 = *(long *)(LStack_4a0._0_8_ + iVar28 * 8) !=
                       *(long *)(LStack_420._0_8_ + iVar35 * 8);
            }
            if (bVar61) {
              (true_sel.ptr)->sel_vector[(long)local_4c8] = (sel_t)iVar23;
              local_4c8 = (element_type *)((long)&local_4c8->_vptr_ExtraTypeInfo + 1);
            }
            iVar34 = iVar34 + 1;
          } while (count != iVar34);
        }
        else {
          if (count == 0) goto LAB_00b428a4;
          psVar11 = (sel.ptr)->sel_vector;
          lVar46 = *(long *)local_4a8;
          psVar12 = *(sel_t **)local_428;
          iVar34 = 0;
          peVar29 = (element_type *)0x0;
          peVar30 = (element_type *)0x0;
          do {
            iVar23 = iVar34;
            if (psVar11 != (sel_t *)0x0) {
              iVar23 = (idx_t)psVar11[iVar34];
            }
            iVar28 = iVar34;
            if (lVar46 != 0) {
              iVar28 = (idx_t)*(uint *)(lVar46 + iVar34 * 4);
            }
            iVar35 = iVar34;
            if (psVar12 != (sel_t *)0x0) {
              iVar35 = (idx_t)psVar12[iVar34];
            }
            if (LStack_4a0.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar61 = false;
            }
            else {
              bVar61 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                         super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr + (iVar28 >> 6) * 8) >> (iVar28 & 0x3f) & 1) == 0;
            }
            if (LStack_420.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar62 = false;
            }
            else {
              bVar62 = ((ulong)(&(LStack_420.type_info_.internal.
                                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->_vptr_ExtraTypeInfo)[iVar35 >> 6] >> (iVar35 & 0x3f) & 1)
                       == 0;
            }
            if ((bool)(bVar61 | bVar62)) {
              bVar61 = (bool)(bVar61 ^ bVar62);
            }
            else {
              bVar61 = *(long *)(LStack_4a0._0_8_ + iVar28 * 8) !=
                       *(long *)(LStack_420._0_8_ + iVar35 * 8);
            }
            if (bVar61) {
              local_4c8 = (element_type *)((long)&peVar30->_vptr_ExtraTypeInfo + 1);
              peVar43 = peVar29;
              peVar29 = peVar30;
              oVar32.ptr = true_sel.ptr;
            }
            else {
              peVar43 = (element_type *)((long)&peVar29->_vptr_ExtraTypeInfo + 1);
              local_4c8 = peVar30;
              oVar32.ptr = false_sel.ptr;
            }
            (oVar32.ptr)->sel_vector[(long)peVar29] = (sel_t)iVar23;
            iVar34 = iVar34 + 1;
            peVar29 = peVar43;
            peVar30 = local_4c8;
          } while (count != iVar34);
        }
        goto LAB_00b447d5;
      }
      pdVar8 = left->data;
      plVar53 = (long *)right->data;
      _local_4a8 = (undefined1  [16])0x0;
      LStack_4a0.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      LStack_4a0.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
      puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar5 != (unsigned_long *)0x0) && ((*puVar5 & 1) == 0)) {
        local_2a8._0_8_ = 0x800;
        make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                  ((duckdb *)local_428,(unsigned_long *)&local_2a8);
        peVar29 = LStack_4a0.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        auVar18 = local_428;
        LStack_4a0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)LStack_420._0_8_;
        _local_428 = (undefined1  [16])0x0;
        LStack_4a0._0_8_ = auVar18;
        if (peVar29 != (element_type *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar29);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_);
        }
        pTVar25 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                            ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                             (local_4a8 + 8));
        _Var9.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
             (pTVar25->owned_data).
             super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
             super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
             super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
             super__Head_base<0UL,_unsigned_long_*,_false>;
        local_4a8 = (undefined1  [8])
                    _Var9.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
        *(undefined8 *)_Var9.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
             0xfffffffffffffffe;
      }
      FlatVector::VerifyFlatVector(left);
      local_118.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           LStack_4a0.type_info_.internal.
           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
        if (true_sel.ptr == (SelectionVector *)0x0) {
          if (count == 0) goto LAB_00b413a4;
          psVar11 = (sel.ptr)->sel_vector;
          puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          psVar12 = (false_sel.ptr)->sel_vector;
          lVar46 = 0;
          uVar47 = 0;
          do {
            uVar33 = uVar47;
            if (psVar11 != (sel_t *)0x0) {
              uVar33 = (ulong)psVar11[uVar47];
            }
            if (puVar5 == (unsigned_long *)0x0) {
              bVar61 = false;
            }
            else {
              bVar61 = (puVar5[uVar47 >> 6] >> (uVar47 & 0x3f) & 1) == 0;
            }
            if (local_4a8 == (undefined1  [8])0x0) {
              bVar62 = false;
            }
            else {
              bVar62 = (*(byte *)local_4a8 & 1) == 0;
            }
            if ((bVar61 | bVar62) == 1) {
              bVar61 = (bool)(bVar61 ^ bVar62);
            }
            else {
              bVar61 = *(long *)(pdVar8 + uVar47 * 8) != *plVar53;
            }
            psVar12[lVar46] = (sel_t)uVar33;
            lVar46 = lVar46 + (ulong)(bVar61 ^ 1);
            uVar47 = uVar47 + 1;
          } while (count != uVar47);
          goto LAB_00b413a6;
        }
        if (count != 0) {
          psVar11 = (sel.ptr)->sel_vector;
          puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          psVar12 = (true_sel.ptr)->sel_vector;
          uVar47 = 0;
          local_4c8 = (element_type *)0x0;
          do {
            uVar33 = uVar47;
            if (psVar11 != (sel_t *)0x0) {
              uVar33 = (ulong)psVar11[uVar47];
            }
            if (puVar5 == (unsigned_long *)0x0) {
              bVar61 = false;
            }
            else {
              bVar61 = (puVar5[uVar47 >> 6] >> (uVar47 & 0x3f) & 1) == 0;
            }
            if (local_4a8 == (undefined1  [8])0x0) {
              bVar62 = false;
            }
            else {
              bVar62 = (*(byte *)local_4a8 & 1) == 0;
            }
            if ((bVar61 | bVar62) == 1) {
              bVar61 = (bool)(bVar61 ^ bVar62);
            }
            else {
              bVar61 = *(long *)(pdVar8 + uVar47 * 8) != *plVar53;
            }
            psVar12[(long)local_4c8] = (sel_t)uVar33;
            local_4c8 = (element_type *)((long)&local_4c8->_vptr_ExtraTypeInfo + (ulong)bVar61);
            uVar47 = uVar47 + 1;
          } while (count != uVar47);
          goto LAB_00b413b3;
        }
      }
      else if (count != 0) {
        psVar11 = (sel.ptr)->sel_vector;
        puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        psVar12 = (true_sel.ptr)->sel_vector;
        psVar10 = (false_sel.ptr)->sel_vector;
        lVar46 = 0;
        local_4c8 = (element_type *)0x0;
        uVar47 = 0;
        do {
          uVar33 = uVar47;
          if (psVar11 != (sel_t *)0x0) {
            uVar33 = (ulong)psVar11[uVar47];
          }
          if (puVar5 == (unsigned_long *)0x0) {
            bVar61 = false;
          }
          else {
            bVar61 = (puVar5[uVar47 >> 6] >> (uVar47 & 0x3f) & 1) == 0;
          }
          if (local_4a8 == (undefined1  [8])0x0) {
            bVar62 = false;
          }
          else {
            bVar62 = (*(byte *)local_4a8 & 1) == 0;
          }
          if ((bVar61 | bVar62) == 1) {
            bVar61 = (bool)(bVar61 ^ bVar62);
          }
          else {
            bVar61 = *(long *)(pdVar8 + uVar47 * 8) != *plVar53;
          }
          psVar12[(long)local_4c8] = (sel_t)uVar33;
          local_4c8 = (element_type *)((long)&local_4c8->_vptr_ExtraTypeInfo + (ulong)bVar61);
          psVar10[lVar46] = (sel_t)uVar33;
          lVar46 = lVar46 + (ulong)(bVar61 ^ 1);
          uVar47 = uVar47 + 1;
        } while (count != uVar47);
        goto LAB_00b413b3;
      }
    }
    break;
  case INT64:
    local_328 = (undefined1  [8])null_mask.ptr;
    if (sel.ptr == (SelectionVector *)0x0) {
      sel.ptr = FlatVector::IncrementalSelectionVector();
    }
    if (local_328 != (undefined1  [8])0x0) {
      optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                ((optional_ptr<duckdb::ValidityMask,_true> *)local_328);
      UpdateNullMask(left,sel.ptr,count,(ValidityMask *)local_328);
      optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                ((optional_ptr<duckdb::ValidityMask,_true> *)local_328);
      UpdateNullMask(right,sel.ptr,count,(ValidityMask *)local_328);
    }
    VVar3 = left->vector_type;
    VVar4 = right->vector_type;
    if ((VVar3 ^ CONSTANT_VECTOR) == FLAT_VECTOR && (VVar4 ^ CONSTANT_VECTOR) == FLAT_VECTOR) {
      puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if (puVar5 == (unsigned_long *)0x0) {
        bVar61 = false;
      }
      else {
        bVar61 = (*puVar5 & 1) == 0;
      }
      puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if (puVar5 == (unsigned_long *)0x0) {
        bVar62 = false;
      }
      else {
        bVar62 = (*puVar5 & 1) == 0;
      }
      if ((bool)(bVar61 | bVar62)) {
        bVar61 = (bool)(bVar61 ^ bVar62);
      }
      else {
        bVar61 = *(long *)left->data != *(long *)right->data;
      }
      if (!bVar61) {
        if (false_sel.ptr == (SelectionVector *)0x0 || count == 0) {
          return (idx_t)(element_type *)0x0;
        }
        psVar11 = (sel.ptr)->sel_vector;
        psVar12 = (false_sel.ptr)->sel_vector;
        iVar34 = 0;
        do {
          sVar44 = (sel_t)iVar34;
          if (psVar11 != (sel_t *)0x0) {
            sVar44 = psVar11[iVar34];
          }
          psVar12[iVar34] = sVar44;
          iVar34 = iVar34 + 1;
        } while (count != iVar34);
        return (idx_t)(element_type *)0x0;
      }
      if (true_sel.ptr != (SelectionVector *)0x0 && count != 0) {
        psVar11 = (sel.ptr)->sel_vector;
        psVar12 = (true_sel.ptr)->sel_vector;
        iVar34 = 0;
        do {
          sVar44 = (sel_t)iVar34;
          if (psVar11 != (sel_t *)0x0) {
            sVar44 = psVar11[iVar34];
          }
          psVar12[iVar34] = sVar44;
          iVar34 = iVar34 + 1;
        } while (count != iVar34);
        return count;
      }
      return count;
    }
    if ((VVar3 ^ CONSTANT_VECTOR) == FLAT_VECTOR && VVar4 == FLAT_VECTOR) {
      plVar53 = (long *)left->data;
      pdVar8 = right->data;
      _local_4a8 = (undefined1  [16])0x0;
      LStack_4a0.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      LStack_4a0.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
      puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar5 != (unsigned_long *)0x0) && ((*puVar5 & 1) == 0)) {
        local_2a8._0_8_ = 0x800;
        make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                  ((duckdb *)local_428,(unsigned_long *)&local_2a8);
        peVar29 = LStack_4a0.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        auVar18 = local_428;
        LStack_4a0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)LStack_420._0_8_;
        _local_428 = (undefined1  [16])0x0;
        LStack_4a0._0_8_ = auVar18;
        if (peVar29 != (element_type *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar29);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_);
        }
        pTVar25 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                            ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                             (local_4a8 + 8));
        _Var9.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
             (pTVar25->owned_data).
             super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
             super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
             super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
             super__Head_base<0UL,_unsigned_long_*,_false>;
        local_4a8 = (undefined1  [8])
                    _Var9.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
        *(undefined8 *)_Var9.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
             0xfffffffffffffffe;
      }
      FlatVector::VerifyFlatVector(right);
      local_118.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           LStack_4a0.type_info_.internal.
           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
        if (true_sel.ptr == (SelectionVector *)0x0) {
          if (count == 0) goto LAB_00b413a4;
          psVar11 = (sel.ptr)->sel_vector;
          puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          psVar12 = (false_sel.ptr)->sel_vector;
          lVar46 = 0;
          uVar47 = 0;
          do {
            uVar33 = uVar47;
            if (psVar11 != (sel_t *)0x0) {
              uVar33 = (ulong)psVar11[uVar47];
            }
            if (local_4a8 == (undefined1  [8])0x0) {
              bVar61 = false;
            }
            else {
              bVar61 = (*(byte *)local_4a8 & 1) == 0;
            }
            if (puVar5 == (unsigned_long *)0x0) {
              bVar62 = false;
            }
            else {
              bVar62 = (puVar5[uVar47 >> 6] >> (uVar47 & 0x3f) & 1) == 0;
            }
            if ((bVar61 | bVar62) == 1) {
              bVar61 = (bool)(bVar61 ^ bVar62);
            }
            else {
              bVar61 = *plVar53 != *(long *)(pdVar8 + uVar47 * 8);
            }
            psVar12[lVar46] = (sel_t)uVar33;
            lVar46 = lVar46 + (ulong)(bVar61 ^ 1);
            uVar47 = uVar47 + 1;
          } while (count != uVar47);
          goto LAB_00b413a6;
        }
        if (count != 0) {
          psVar11 = (sel.ptr)->sel_vector;
          puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          psVar12 = (true_sel.ptr)->sel_vector;
          local_4c8 = (element_type *)0x0;
          uVar47 = 0;
          do {
            uVar33 = uVar47;
            if (psVar11 != (sel_t *)0x0) {
              uVar33 = (ulong)psVar11[uVar47];
            }
            if (local_4a8 == (undefined1  [8])0x0) {
              bVar61 = false;
            }
            else {
              bVar61 = (*(byte *)local_4a8 & 1) == 0;
            }
            if (puVar5 == (unsigned_long *)0x0) {
              bVar62 = false;
            }
            else {
              bVar62 = (puVar5[uVar47 >> 6] >> (uVar47 & 0x3f) & 1) == 0;
            }
            if ((bVar61 | bVar62) == 1) {
              bVar61 = (bool)(bVar61 ^ bVar62);
            }
            else {
              bVar61 = *plVar53 != *(long *)(pdVar8 + uVar47 * 8);
            }
            psVar12[(long)local_4c8] = (sel_t)uVar33;
            local_4c8 = (element_type *)((long)&local_4c8->_vptr_ExtraTypeInfo + (ulong)bVar61);
            uVar47 = uVar47 + 1;
          } while (count != uVar47);
          goto LAB_00b413b3;
        }
      }
      else if (count != 0) {
        psVar11 = (sel.ptr)->sel_vector;
        puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        psVar12 = (true_sel.ptr)->sel_vector;
        psVar10 = (false_sel.ptr)->sel_vector;
        local_4c8 = (element_type *)0x0;
        lVar46 = 0;
        uVar47 = 0;
        do {
          uVar33 = uVar47;
          if (psVar11 != (sel_t *)0x0) {
            uVar33 = (ulong)psVar11[uVar47];
          }
          if (local_4a8 == (undefined1  [8])0x0) {
            bVar61 = false;
          }
          else {
            bVar61 = (*(byte *)local_4a8 & 1) == 0;
          }
          if (puVar5 == (unsigned_long *)0x0) {
            bVar62 = false;
          }
          else {
            bVar62 = (puVar5[uVar47 >> 6] >> (uVar47 & 0x3f) & 1) == 0;
          }
          if ((bVar61 | bVar62) == 1) {
            bVar61 = (bool)(bVar61 ^ bVar62);
          }
          else {
            bVar61 = *plVar53 != *(long *)(pdVar8 + uVar47 * 8);
          }
          psVar12[(long)local_4c8] = (sel_t)uVar33;
          local_4c8 = (element_type *)((long)&local_4c8->_vptr_ExtraTypeInfo + (ulong)bVar61);
          psVar10[lVar46] = (sel_t)uVar33;
          lVar46 = lVar46 + (ulong)(bVar61 ^ 1);
          uVar47 = uVar47 + 1;
        } while (count != uVar47);
        goto LAB_00b413b3;
      }
    }
    else {
      if ((VVar4 ^ CONSTANT_VECTOR) != FLAT_VECTOR || VVar3 != FLAT_VECTOR) {
        if (VVar3 == FLAT_VECTOR && VVar4 == FLAT_VECTOR) {
          pdVar8 = left->data;
          pdVar13 = right->data;
          FlatVector::VerifyFlatVector(left);
          FlatVector::VerifyFlatVector(right);
          if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
            if (count == 0) {
              return (idx_t)(element_type *)0x0;
            }
            psVar11 = (sel.ptr)->sel_vector;
            puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            puVar14 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            psVar12 = (true_sel.ptr)->sel_vector;
            psVar10 = (false_sel.ptr)->sel_vector;
            peVar29 = (element_type *)0x0;
            lVar46 = 0;
            uVar47 = 0;
            do {
              uVar33 = uVar47;
              if (psVar11 != (sel_t *)0x0) {
                uVar33 = (ulong)psVar11[uVar47];
              }
              if (puVar5 == (unsigned_long *)0x0) {
                bVar61 = false;
              }
              else {
                bVar61 = (puVar5[uVar47 >> 6] >> (uVar47 & 0x3f) & 1) == 0;
              }
              if (puVar14 == (unsigned_long *)0x0) {
                bVar62 = false;
              }
              else {
                bVar62 = (puVar14[uVar47 >> 6] >> (uVar47 & 0x3f) & 1) == 0;
              }
              if ((bVar61 | bVar62) == 1) {
                bVar61 = (bool)(bVar61 ^ bVar62);
              }
              else {
                bVar61 = *(long *)(pdVar8 + uVar47 * 8) != *(long *)(pdVar13 + uVar47 * 8);
              }
              psVar12[(long)peVar29] = (sel_t)uVar33;
              peVar29 = (element_type *)((long)&peVar29->_vptr_ExtraTypeInfo + (ulong)bVar61);
              psVar10[lVar46] = (sel_t)uVar33;
              lVar46 = lVar46 + (ulong)(bVar61 ^ 1);
              uVar47 = uVar47 + 1;
            } while (count != uVar47);
            return (idx_t)peVar29;
          }
          if (true_sel.ptr != (SelectionVector *)0x0) {
            if (count == 0) {
              return (idx_t)(element_type *)0x0;
            }
            psVar11 = (sel.ptr)->sel_vector;
            puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            puVar14 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            psVar12 = (true_sel.ptr)->sel_vector;
            peVar29 = (element_type *)0x0;
            uVar47 = 0;
            do {
              uVar33 = uVar47;
              if (psVar11 != (sel_t *)0x0) {
                uVar33 = (ulong)psVar11[uVar47];
              }
              if (puVar5 == (unsigned_long *)0x0) {
                bVar61 = false;
              }
              else {
                bVar61 = (puVar5[uVar47 >> 6] >> (uVar47 & 0x3f) & 1) == 0;
              }
              if (puVar14 == (unsigned_long *)0x0) {
                bVar62 = false;
              }
              else {
                bVar62 = (puVar14[uVar47 >> 6] >> (uVar47 & 0x3f) & 1) == 0;
              }
              if ((bVar61 | bVar62) == 1) {
                bVar61 = (bool)(bVar61 ^ bVar62);
              }
              else {
                bVar61 = *(long *)(pdVar8 + uVar47 * 8) != *(long *)(pdVar13 + uVar47 * 8);
              }
              psVar12[(long)peVar29] = (sel_t)uVar33;
              peVar29 = (element_type *)((long)&peVar29->_vptr_ExtraTypeInfo + (ulong)bVar61);
              uVar47 = uVar47 + 1;
            } while (count != uVar47);
            return (idx_t)peVar29;
          }
          if (count != 0) {
            psVar11 = (sel.ptr)->sel_vector;
            puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            puVar14 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            psVar12 = (false_sel.ptr)->sel_vector;
            lVar46 = 0;
            uVar47 = 0;
            do {
              uVar33 = uVar47;
              if (psVar11 != (sel_t *)0x0) {
                uVar33 = (ulong)psVar11[uVar47];
              }
              if (puVar5 == (unsigned_long *)0x0) {
                bVar61 = false;
              }
              else {
                bVar61 = (puVar5[uVar47 >> 6] >> (uVar47 & 0x3f) & 1) == 0;
              }
              if (puVar14 == (unsigned_long *)0x0) {
                bVar62 = false;
              }
              else {
                bVar62 = (puVar14[uVar47 >> 6] >> (uVar47 & 0x3f) & 1) == 0;
              }
              if ((bVar61 | bVar62) == 1) {
                bVar61 = (bool)(bVar61 ^ bVar62);
              }
              else {
                bVar61 = *(long *)(pdVar8 + uVar47 * 8) != *(long *)(pdVar13 + uVar47 * 8);
              }
              psVar12[lVar46] = (sel_t)uVar33;
              lVar46 = lVar46 + (ulong)(bVar61 ^ 1);
              uVar47 = uVar47 + 1;
            } while (count != uVar47);
            goto LAB_00b4331a;
          }
          goto LAB_00b43318;
        }
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_4a8);
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_428);
        Vector::ToUnifiedFormat(left,count,(UnifiedVectorFormat *)local_4a8);
        Vector::ToUnifiedFormat(right,count,(UnifiedVectorFormat *)local_428);
        if (LStack_4a0.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0 &&
            LStack_420.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
            if (true_sel.ptr == (SelectionVector *)0x0) {
              if (count == 0) goto LAB_00b446da;
              psVar11 = (sel.ptr)->sel_vector;
              lVar46 = *(long *)local_4a8;
              psVar12 = *(sel_t **)local_428;
              lVar48 = 0;
              iVar34 = 0;
              do {
                iVar23 = iVar34;
                if (psVar11 != (sel_t *)0x0) {
                  iVar23 = (idx_t)psVar11[iVar34];
                }
                iVar28 = iVar34;
                if (lVar46 != 0) {
                  iVar28 = (idx_t)*(uint *)(lVar46 + iVar34 * 4);
                }
                iVar35 = iVar34;
                if (psVar12 != (sel_t *)0x0) {
                  iVar35 = (idx_t)psVar12[iVar34];
                }
                if (*(long *)(LStack_4a0._0_8_ + iVar28 * 8) ==
                    *(long *)(LStack_420._0_8_ + iVar35 * 8)) {
                  (false_sel.ptr)->sel_vector[lVar48] = (sel_t)iVar23;
                  lVar48 = lVar48 + 1;
                }
                iVar34 = iVar34 + 1;
              } while (count != iVar34);
              goto LAB_00b446dc;
            }
            if (count == 0) goto LAB_00b428a4;
            psVar11 = (sel.ptr)->sel_vector;
            lVar46 = *(long *)local_4a8;
            psVar12 = *(sel_t **)local_428;
            local_4c8 = (element_type *)0x0;
            iVar34 = 0;
            do {
              iVar23 = iVar34;
              if (psVar11 != (sel_t *)0x0) {
                iVar23 = (idx_t)psVar11[iVar34];
              }
              iVar28 = iVar34;
              if (lVar46 != 0) {
                iVar28 = (idx_t)*(uint *)(lVar46 + iVar34 * 4);
              }
              iVar35 = iVar34;
              if (psVar12 != (sel_t *)0x0) {
                iVar35 = (idx_t)psVar12[iVar34];
              }
              if (*(long *)(LStack_4a0._0_8_ + iVar28 * 8) !=
                  *(long *)(LStack_420._0_8_ + iVar35 * 8)) {
                (true_sel.ptr)->sel_vector[(long)local_4c8] = (sel_t)iVar23;
                local_4c8 = (element_type *)((long)&local_4c8->_vptr_ExtraTypeInfo + 1);
              }
              iVar34 = iVar34 + 1;
            } while (count != iVar34);
          }
          else {
            if (count == 0) goto LAB_00b428a4;
            psVar11 = (sel.ptr)->sel_vector;
            lVar46 = *(long *)local_4a8;
            psVar12 = *(sel_t **)local_428;
            iVar34 = 0;
            peVar29 = (element_type *)0x0;
            peVar30 = (element_type *)0x0;
            do {
              iVar23 = iVar34;
              if (psVar11 != (sel_t *)0x0) {
                iVar23 = (idx_t)psVar11[iVar34];
              }
              iVar28 = iVar34;
              if (lVar46 != 0) {
                iVar28 = (idx_t)*(uint *)(lVar46 + iVar34 * 4);
              }
              iVar35 = iVar34;
              if (psVar12 != (sel_t *)0x0) {
                iVar35 = (idx_t)psVar12[iVar34];
              }
              if (*(long *)(LStack_4a0._0_8_ + iVar28 * 8) ==
                  *(long *)(LStack_420._0_8_ + iVar35 * 8)) {
                oVar32.ptr = false_sel.ptr;
                peVar43 = (element_type *)((long)&peVar29->_vptr_ExtraTypeInfo + 1);
                local_4c8 = peVar30;
              }
              else {
                local_4c8 = (element_type *)((long)&peVar30->_vptr_ExtraTypeInfo + 1);
                oVar32.ptr = true_sel.ptr;
                peVar43 = peVar29;
                peVar29 = peVar30;
              }
              (oVar32.ptr)->sel_vector[(long)peVar29] = (sel_t)iVar23;
              iVar34 = iVar34 + 1;
              peVar29 = peVar43;
              peVar30 = local_4c8;
            } while (count != iVar34);
          }
        }
        else if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0)
        {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            if (count == 0) goto LAB_00b447cb;
            psVar11 = (sel.ptr)->sel_vector;
            lVar46 = *(long *)local_4a8;
            psVar12 = *(sel_t **)local_428;
            lVar48 = 0;
            iVar34 = 0;
            do {
              iVar23 = iVar34;
              if (psVar11 != (sel_t *)0x0) {
                iVar23 = (idx_t)psVar11[iVar34];
              }
              iVar28 = iVar34;
              if (lVar46 != 0) {
                iVar28 = (idx_t)*(uint *)(lVar46 + iVar34 * 4);
              }
              iVar35 = iVar34;
              if (psVar12 != (sel_t *)0x0) {
                iVar35 = (idx_t)psVar12[iVar34];
              }
              if (LStack_4a0.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                  (element_type *)0x0) {
                bVar61 = false;
              }
              else {
                bVar61 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_ptr + (iVar28 >> 6) * 8) >> (iVar28 & 0x3f) & 1) == 0
                ;
              }
              if (LStack_420.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                  (element_type *)0x0) {
                bVar62 = false;
              }
              else {
                bVar62 = ((ulong)(&(LStack_420.type_info_.internal.
                                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr)->_vptr_ExtraTypeInfo)[iVar35 >> 6] >> (iVar35 & 0x3f) &
                         1) == 0;
              }
              if ((bool)(bVar61 | bVar62)) {
                bVar61 = (bool)(bVar61 ^ bVar62);
              }
              else {
                bVar61 = *(long *)(LStack_4a0._0_8_ + iVar28 * 8) !=
                         *(long *)(LStack_420._0_8_ + iVar35 * 8);
              }
              if (!bVar61) {
                (false_sel.ptr)->sel_vector[lVar48] = (sel_t)iVar23;
                lVar48 = lVar48 + 1;
              }
              iVar34 = iVar34 + 1;
            } while (count != iVar34);
            goto LAB_00b447cd;
          }
          if (count == 0) goto LAB_00b428a4;
          psVar11 = (sel.ptr)->sel_vector;
          lVar46 = *(long *)local_4a8;
          psVar12 = *(sel_t **)local_428;
          local_4c8 = (element_type *)0x0;
          iVar34 = 0;
          do {
            iVar23 = iVar34;
            if (psVar11 != (sel_t *)0x0) {
              iVar23 = (idx_t)psVar11[iVar34];
            }
            iVar28 = iVar34;
            if (lVar46 != 0) {
              iVar28 = (idx_t)*(uint *)(lVar46 + iVar34 * 4);
            }
            iVar35 = iVar34;
            if (psVar12 != (sel_t *)0x0) {
              iVar35 = (idx_t)psVar12[iVar34];
            }
            if (LStack_4a0.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar61 = false;
            }
            else {
              bVar61 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                         super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr + (iVar28 >> 6) * 8) >> (iVar28 & 0x3f) & 1) == 0;
            }
            if (LStack_420.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar62 = false;
            }
            else {
              bVar62 = ((ulong)(&(LStack_420.type_info_.internal.
                                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->_vptr_ExtraTypeInfo)[iVar35 >> 6] >> (iVar35 & 0x3f) & 1)
                       == 0;
            }
            if ((bool)(bVar61 | bVar62)) {
              bVar61 = (bool)(bVar61 ^ bVar62);
            }
            else {
              bVar61 = *(long *)(LStack_4a0._0_8_ + iVar28 * 8) !=
                       *(long *)(LStack_420._0_8_ + iVar35 * 8);
            }
            if (bVar61) {
              (true_sel.ptr)->sel_vector[(long)local_4c8] = (sel_t)iVar23;
              local_4c8 = (element_type *)((long)&local_4c8->_vptr_ExtraTypeInfo + 1);
            }
            iVar34 = iVar34 + 1;
          } while (count != iVar34);
        }
        else {
          if (count == 0) goto LAB_00b428a4;
          psVar11 = (sel.ptr)->sel_vector;
          lVar46 = *(long *)local_4a8;
          psVar12 = *(sel_t **)local_428;
          iVar34 = 0;
          peVar29 = (element_type *)0x0;
          peVar30 = (element_type *)0x0;
          do {
            iVar23 = iVar34;
            if (psVar11 != (sel_t *)0x0) {
              iVar23 = (idx_t)psVar11[iVar34];
            }
            iVar28 = iVar34;
            if (lVar46 != 0) {
              iVar28 = (idx_t)*(uint *)(lVar46 + iVar34 * 4);
            }
            iVar35 = iVar34;
            if (psVar12 != (sel_t *)0x0) {
              iVar35 = (idx_t)psVar12[iVar34];
            }
            if (LStack_4a0.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar61 = false;
            }
            else {
              bVar61 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                         super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr + (iVar28 >> 6) * 8) >> (iVar28 & 0x3f) & 1) == 0;
            }
            if (LStack_420.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar62 = false;
            }
            else {
              bVar62 = ((ulong)(&(LStack_420.type_info_.internal.
                                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->_vptr_ExtraTypeInfo)[iVar35 >> 6] >> (iVar35 & 0x3f) & 1)
                       == 0;
            }
            if ((bool)(bVar61 | bVar62)) {
              bVar61 = (bool)(bVar61 ^ bVar62);
            }
            else {
              bVar61 = *(long *)(LStack_4a0._0_8_ + iVar28 * 8) !=
                       *(long *)(LStack_420._0_8_ + iVar35 * 8);
            }
            if (bVar61) {
              local_4c8 = (element_type *)((long)&peVar30->_vptr_ExtraTypeInfo + 1);
              peVar43 = peVar29;
              peVar29 = peVar30;
              oVar32.ptr = true_sel.ptr;
            }
            else {
              peVar43 = (element_type *)((long)&peVar29->_vptr_ExtraTypeInfo + 1);
              local_4c8 = peVar30;
              oVar32.ptr = false_sel.ptr;
            }
            (oVar32.ptr)->sel_vector[(long)peVar29] = (sel_t)iVar23;
            iVar34 = iVar34 + 1;
            peVar29 = peVar43;
            peVar30 = local_4c8;
          } while (count != iVar34);
        }
        goto LAB_00b447d5;
      }
      pdVar8 = left->data;
      plVar53 = (long *)right->data;
      _local_4a8 = (undefined1  [16])0x0;
      LStack_4a0.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      LStack_4a0.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
      puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar5 != (unsigned_long *)0x0) && ((*puVar5 & 1) == 0)) {
        local_2a8._0_8_ = 0x800;
        make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                  ((duckdb *)local_428,(unsigned_long *)&local_2a8);
        peVar29 = LStack_4a0.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        auVar18 = local_428;
        LStack_4a0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)LStack_420._0_8_;
        _local_428 = (undefined1  [16])0x0;
        LStack_4a0._0_8_ = auVar18;
        if (peVar29 != (element_type *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar29);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_);
        }
        pTVar25 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                            ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                             (local_4a8 + 8));
        _Var9.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
             (pTVar25->owned_data).
             super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
             super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
             super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
             super__Head_base<0UL,_unsigned_long_*,_false>;
        local_4a8 = (undefined1  [8])
                    _Var9.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
        *(undefined8 *)_Var9.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
             0xfffffffffffffffe;
      }
      FlatVector::VerifyFlatVector(left);
      local_118.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           LStack_4a0.type_info_.internal.
           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
        if (true_sel.ptr == (SelectionVector *)0x0) {
          if (count == 0) goto LAB_00b413a4;
          psVar11 = (sel.ptr)->sel_vector;
          puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          psVar12 = (false_sel.ptr)->sel_vector;
          lVar46 = 0;
          uVar47 = 0;
          do {
            uVar33 = uVar47;
            if (psVar11 != (sel_t *)0x0) {
              uVar33 = (ulong)psVar11[uVar47];
            }
            if (puVar5 == (unsigned_long *)0x0) {
              bVar61 = false;
            }
            else {
              bVar61 = (puVar5[uVar47 >> 6] >> (uVar47 & 0x3f) & 1) == 0;
            }
            if (local_4a8 == (undefined1  [8])0x0) {
              bVar62 = false;
            }
            else {
              bVar62 = (*(byte *)local_4a8 & 1) == 0;
            }
            if ((bVar61 | bVar62) == 1) {
              bVar61 = (bool)(bVar61 ^ bVar62);
            }
            else {
              bVar61 = *(long *)(pdVar8 + uVar47 * 8) != *plVar53;
            }
            psVar12[lVar46] = (sel_t)uVar33;
            lVar46 = lVar46 + (ulong)(bVar61 ^ 1);
            uVar47 = uVar47 + 1;
          } while (count != uVar47);
          goto LAB_00b413a6;
        }
        if (count != 0) {
          psVar11 = (sel.ptr)->sel_vector;
          puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          psVar12 = (true_sel.ptr)->sel_vector;
          local_4c8 = (element_type *)0x0;
          uVar47 = 0;
          do {
            uVar33 = uVar47;
            if (psVar11 != (sel_t *)0x0) {
              uVar33 = (ulong)psVar11[uVar47];
            }
            if (puVar5 == (unsigned_long *)0x0) {
              bVar61 = false;
            }
            else {
              bVar61 = (puVar5[uVar47 >> 6] >> (uVar47 & 0x3f) & 1) == 0;
            }
            if (local_4a8 == (undefined1  [8])0x0) {
              bVar62 = false;
            }
            else {
              bVar62 = (*(byte *)local_4a8 & 1) == 0;
            }
            if ((bVar61 | bVar62) == 1) {
              bVar61 = (bool)(bVar61 ^ bVar62);
            }
            else {
              bVar61 = *(long *)(pdVar8 + uVar47 * 8) != *plVar53;
            }
            psVar12[(long)local_4c8] = (sel_t)uVar33;
            local_4c8 = (element_type *)((long)&local_4c8->_vptr_ExtraTypeInfo + (ulong)bVar61);
            uVar47 = uVar47 + 1;
          } while (count != uVar47);
          goto LAB_00b413b3;
        }
      }
      else if (count != 0) {
        psVar11 = (sel.ptr)->sel_vector;
        puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        psVar12 = (true_sel.ptr)->sel_vector;
        psVar10 = (false_sel.ptr)->sel_vector;
        local_4c8 = (element_type *)0x0;
        lVar46 = 0;
        uVar47 = 0;
        do {
          uVar33 = uVar47;
          if (psVar11 != (sel_t *)0x0) {
            uVar33 = (ulong)psVar11[uVar47];
          }
          if (puVar5 == (unsigned_long *)0x0) {
            bVar61 = false;
          }
          else {
            bVar61 = (puVar5[uVar47 >> 6] >> (uVar47 & 0x3f) & 1) == 0;
          }
          if (local_4a8 == (undefined1  [8])0x0) {
            bVar62 = false;
          }
          else {
            bVar62 = (*(byte *)local_4a8 & 1) == 0;
          }
          if ((bVar61 | bVar62) == 1) {
            bVar61 = (bool)(bVar61 ^ bVar62);
          }
          else {
            bVar61 = *(long *)(pdVar8 + uVar47 * 8) != *plVar53;
          }
          psVar12[(long)local_4c8] = (sel_t)uVar33;
          local_4c8 = (element_type *)((long)&local_4c8->_vptr_ExtraTypeInfo + (ulong)bVar61);
          psVar10[lVar46] = (sel_t)uVar33;
          lVar46 = lVar46 + (ulong)(bVar61 ^ 1);
          uVar47 = uVar47 + 1;
        } while (count != uVar47);
        goto LAB_00b413b3;
      }
    }
    break;
  default:
switchD_00b348e8_caseD_a:
    this_02 = (InternalException *)__cxa_allocate_exception(0x10);
    local_4a8 = (undefined1  [8])&LStack_4a0.type_info_;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_4a8,"Invalid type for distinct selection","");
    InternalException::InternalException(this_02,(string *)local_4a8);
    __cxa_throw(this_02,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  case FLOAT:
    local_328 = (undefined1  [8])null_mask.ptr;
    if (sel.ptr == (SelectionVector *)0x0) {
      sel.ptr = FlatVector::IncrementalSelectionVector();
    }
    if (local_328 != (undefined1  [8])0x0) {
      optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                ((optional_ptr<duckdb::ValidityMask,_true> *)local_328);
      UpdateNullMask(left,sel.ptr,count,(ValidityMask *)local_328);
      optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                ((optional_ptr<duckdb::ValidityMask,_true> *)local_328);
      UpdateNullMask(right,sel.ptr,count,(ValidityMask *)local_328);
    }
    VVar3 = left->vector_type;
    VVar4 = right->vector_type;
    if ((VVar3 ^ CONSTANT_VECTOR) == FLAT_VECTOR && (VVar4 ^ CONSTANT_VECTOR) == FLAT_VECTOR) {
      puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if (puVar5 == (unsigned_long *)0x0) {
        bVar61 = false;
      }
      else {
        bVar61 = (*puVar5 & 1) == 0;
      }
      puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if (puVar5 == (unsigned_long *)0x0) {
        bVar62 = false;
      }
      else {
        bVar62 = (*puVar5 & 1) == 0;
      }
      if ((bool)(bVar61 | bVar62)) {
        bVar61 = (bool)(bVar61 ^ bVar62);
      }
      else {
        bVar61 = Equals::Operation<float>((float *)left->data,(float *)right->data);
        bVar61 = !bVar61;
      }
      if (!bVar61) {
        if (false_sel.ptr == (SelectionVector *)0x0 || count == 0) {
          return (idx_t)(element_type *)0x0;
        }
        psVar11 = (sel.ptr)->sel_vector;
        psVar12 = (false_sel.ptr)->sel_vector;
        iVar34 = 0;
        do {
          sVar44 = (sel_t)iVar34;
          if (psVar11 != (sel_t *)0x0) {
            sVar44 = psVar11[iVar34];
          }
          psVar12[iVar34] = sVar44;
          iVar34 = iVar34 + 1;
        } while (count != iVar34);
        return (idx_t)(element_type *)0x0;
      }
      if (true_sel.ptr != (SelectionVector *)0x0 && count != 0) {
        psVar11 = (sel.ptr)->sel_vector;
        psVar12 = (true_sel.ptr)->sel_vector;
        iVar34 = 0;
        do {
          sVar44 = (sel_t)iVar34;
          if (psVar11 != (sel_t *)0x0) {
            sVar44 = psVar11[iVar34];
          }
          psVar12[iVar34] = sVar44;
          iVar34 = iVar34 + 1;
        } while (count != iVar34);
        return count;
      }
      return count;
    }
    if ((VVar3 ^ CONSTANT_VECTOR) == FLAT_VECTOR && VVar4 == FLAT_VECTOR) {
      pfVar37 = (float *)left->data;
      pfVar55 = (float *)right->data;
      _local_4a8 = (undefined1  [16])0x0;
      LStack_4a0.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      LStack_4a0.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
      puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar5 != (unsigned_long *)0x0) && ((*puVar5 & 1) == 0)) {
        local_2a8._0_8_ = 0x800;
        make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                  ((duckdb *)local_428,(unsigned_long *)&local_2a8);
        peVar29 = LStack_4a0.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        auVar18 = local_428;
        LStack_4a0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)LStack_420._0_8_;
        _local_428 = (undefined1  [16])0x0;
        LStack_4a0._0_8_ = auVar18;
        if (peVar29 != (element_type *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar29);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_);
        }
        pTVar25 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                            ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                             (local_4a8 + 8));
        _Var9.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
             (pTVar25->owned_data).
             super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
             super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
             super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
             super__Head_base<0UL,_unsigned_long_*,_false>;
        local_4a8 = (undefined1  [8])
                    _Var9.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
        *(undefined8 *)_Var9.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
             0xfffffffffffffffe;
      }
      FlatVector::VerifyFlatVector(right);
      if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
        if (true_sel.ptr == (SelectionVector *)0x0) {
          if (count == 0) {
LAB_00b412cc:
            lVar46 = 0;
          }
          else {
            lVar46 = 0;
            uVar47 = 0;
            do {
              uVar33 = uVar47;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                uVar33 = (ulong)(sel.ptr)->sel_vector[uVar47];
              }
              if (local_4a8 == (undefined1  [8])0x0) {
                bVar61 = false;
              }
              else {
                bVar61 = (*(byte *)local_4a8 & 1) == 0;
              }
              puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
              if (puVar5 == (unsigned_long *)0x0) {
                bVar62 = false;
              }
              else {
                bVar62 = (puVar5[uVar47 >> 6] >> (uVar47 & 0x3f) & 1) == 0;
              }
              if ((bVar61 | bVar62) == 1) {
                bVar61 = (bool)(bVar61 ^ bVar62 ^ 1);
              }
              else {
                bVar61 = Equals::Operation<float>(pfVar37,pfVar55);
              }
              (false_sel.ptr)->sel_vector[lVar46] = (sel_t)uVar33;
              lVar46 = lVar46 + (ulong)bVar61;
              uVar47 = uVar47 + 1;
              pfVar55 = pfVar55 + 1;
            } while (count != uVar47);
          }
LAB_00b412d7:
          local_4c8 = (element_type *)(count - lVar46);
          local_488._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               LStack_4a0.type_info_.internal.
               super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          goto LAB_00b412e1;
        }
        if (count != 0) {
          uVar47 = 0;
          local_4c8 = (element_type *)0x0;
          do {
            uVar33 = uVar47;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              uVar33 = (ulong)(sel.ptr)->sel_vector[uVar47];
            }
            if (local_4a8 == (undefined1  [8])0x0) {
              bVar61 = false;
            }
            else {
              bVar61 = (*(byte *)local_4a8 & 1) == 0;
            }
            puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (puVar5 == (unsigned_long *)0x0) {
              bVar62 = false;
            }
            else {
              bVar62 = (puVar5[uVar47 >> 6] >> (uVar47 & 0x3f) & 1) == 0;
            }
            if ((bVar61 | bVar62) == 1) {
              bVar61 = (bool)(bVar61 ^ bVar62);
            }
            else {
              bVar61 = Equals::Operation<float>(pfVar37,pfVar55);
              bVar61 = !bVar61;
            }
            (true_sel.ptr)->sel_vector[(long)local_4c8] = (sel_t)uVar33;
            local_4c8 = (element_type *)((long)&local_4c8->_vptr_ExtraTypeInfo + (ulong)bVar61);
            uVar47 = uVar47 + 1;
            pfVar55 = pfVar55 + 1;
            local_488._M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 LStack_4a0.type_info_.internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          } while (count != uVar47);
          goto LAB_00b412e1;
        }
      }
      else if (count != 0) {
        lVar46 = 0;
        local_4c8 = (element_type *)0x0;
        uVar47 = 0;
        do {
          uVar33 = uVar47;
          if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
            uVar33 = (ulong)(sel.ptr)->sel_vector[uVar47];
          }
          if (local_4a8 == (undefined1  [8])0x0) {
            bVar61 = false;
          }
          else {
            bVar61 = (*(byte *)local_4a8 & 1) == 0;
          }
          puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if (puVar5 == (unsigned_long *)0x0) {
            bVar62 = false;
          }
          else {
            bVar62 = (puVar5[uVar47 >> 6] >> (uVar47 & 0x3f) & 1) == 0;
          }
          if ((bVar61 | bVar62) == 1) {
            bVar61 = (bool)(bVar61 ^ bVar62);
          }
          else {
            bVar61 = Equals::Operation<float>(pfVar37,pfVar55);
            bVar61 = !bVar61;
          }
          (true_sel.ptr)->sel_vector[(long)local_4c8] = (sel_t)uVar33;
          local_4c8 = (element_type *)((long)&local_4c8->_vptr_ExtraTypeInfo + (ulong)bVar61);
          (false_sel.ptr)->sel_vector[lVar46] = (sel_t)uVar33;
          lVar46 = lVar46 + (ulong)(bVar61 ^ 1);
          uVar47 = uVar47 + 1;
          pfVar55 = pfVar55 + 1;
          local_488._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               LStack_4a0.type_info_.internal.
               super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        } while (count != uVar47);
        goto LAB_00b412e1;
      }
    }
    else {
      if ((VVar4 ^ CONSTANT_VECTOR) != FLAT_VECTOR || VVar3 != FLAT_VECTOR) {
        if (VVar3 == FLAT_VECTOR && VVar4 == FLAT_VECTOR) {
          pfVar37 = (float *)left->data;
          pfVar55 = (float *)right->data;
          FlatVector::VerifyFlatVector(left);
          FlatVector::VerifyFlatVector(right);
          if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
            if (count == 0) {
              return (idx_t)(element_type *)0x0;
            }
            lVar46 = 0;
            local_4c8 = (element_type *)0x0;
            uVar47 = 0;
            do {
              uVar33 = uVar47;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                uVar33 = (ulong)(sel.ptr)->sel_vector[uVar47];
              }
              puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
              if (puVar5 == (unsigned_long *)0x0) {
                bVar61 = false;
              }
              else {
                bVar61 = (puVar5[uVar47 >> 6] >> (uVar47 & 0x3f) & 1) == 0;
              }
              puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
              if (puVar5 == (unsigned_long *)0x0) {
                bVar62 = false;
              }
              else {
                bVar62 = (puVar5[uVar47 >> 6] >> (uVar47 & 0x3f) & 1) == 0;
              }
              if ((bVar61 | bVar62) == 1) {
                bVar61 = (bool)(bVar61 ^ bVar62);
              }
              else {
                bVar61 = Equals::Operation<float>(pfVar37,pfVar55);
                bVar61 = !bVar61;
              }
              (true_sel.ptr)->sel_vector[(long)local_4c8] = (sel_t)uVar33;
              local_4c8 = (element_type *)((long)&local_4c8->_vptr_ExtraTypeInfo + (ulong)bVar61);
              (false_sel.ptr)->sel_vector[lVar46] = (sel_t)uVar33;
              lVar46 = lVar46 + (ulong)(bVar61 ^ 1);
              uVar47 = uVar47 + 1;
              pfVar37 = pfVar37 + 1;
              pfVar55 = pfVar55 + 1;
            } while (count != uVar47);
            return (idx_t)local_4c8;
          }
          if (true_sel.ptr != (SelectionVector *)0x0) {
            if (count == 0) {
              return (idx_t)(element_type *)0x0;
            }
            uVar47 = 0;
            local_4c8 = (element_type *)0x0;
            do {
              uVar33 = uVar47;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                uVar33 = (ulong)(sel.ptr)->sel_vector[uVar47];
              }
              puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
              if (puVar5 == (unsigned_long *)0x0) {
                bVar61 = false;
              }
              else {
                bVar61 = (puVar5[uVar47 >> 6] >> (uVar47 & 0x3f) & 1) == 0;
              }
              puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
              if (puVar5 == (unsigned_long *)0x0) {
                bVar62 = false;
              }
              else {
                bVar62 = (puVar5[uVar47 >> 6] >> (uVar47 & 0x3f) & 1) == 0;
              }
              if ((bVar61 | bVar62) == 1) {
                bVar61 = (bool)(bVar61 ^ bVar62);
              }
              else {
                bVar61 = Equals::Operation<float>(pfVar37,pfVar55);
                bVar61 = !bVar61;
              }
              (true_sel.ptr)->sel_vector[(long)local_4c8] = (sel_t)uVar33;
              local_4c8 = (element_type *)((long)&local_4c8->_vptr_ExtraTypeInfo + (ulong)bVar61);
              uVar47 = uVar47 + 1;
              pfVar37 = pfVar37 + 1;
              pfVar55 = pfVar55 + 1;
            } while (count != uVar47);
            return (idx_t)local_4c8;
          }
          if (count != 0) {
            lVar46 = 0;
            uVar47 = 0;
            do {
              uVar33 = uVar47;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                uVar33 = (ulong)(sel.ptr)->sel_vector[uVar47];
              }
              puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
              if (puVar5 == (unsigned_long *)0x0) {
                bVar61 = false;
              }
              else {
                bVar61 = (puVar5[uVar47 >> 6] >> (uVar47 & 0x3f) & 1) == 0;
              }
              puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
              if (puVar5 == (unsigned_long *)0x0) {
                bVar62 = false;
              }
              else {
                bVar62 = (puVar5[uVar47 >> 6] >> (uVar47 & 0x3f) & 1) == 0;
              }
              if ((bVar61 | bVar62) == 1) {
                bVar61 = (bool)(bVar61 ^ bVar62 ^ 1);
              }
              else {
                bVar61 = Equals::Operation<float>(pfVar37,pfVar55);
              }
              (false_sel.ptr)->sel_vector[lVar46] = (sel_t)uVar33;
              lVar46 = lVar46 + (ulong)bVar61;
              uVar47 = uVar47 + 1;
              pfVar37 = pfVar37 + 1;
              pfVar55 = pfVar55 + 1;
            } while (count != uVar47);
            goto LAB_00b43248;
          }
LAB_00b43245:
          lVar46 = 0;
LAB_00b43248:
          return (idx_t)(element_type *)(count - lVar46);
        }
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_4a8);
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_428);
        Vector::ToUnifiedFormat(left,count,(UnifiedVectorFormat *)local_4a8);
        Vector::ToUnifiedFormat(right,count,(UnifiedVectorFormat *)local_428);
        uVar17 = LStack_4a0._0_8_;
        uVar19 = LStack_420._0_8_;
        if (LStack_420.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0 &&
            LStack_4a0.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
            if (true_sel.ptr == (SelectionVector *)0x0) {
              if (count == 0) {
LAB_00b44617:
                lVar48 = 0;
              }
              else {
                psVar11 = (sel.ptr)->sel_vector;
                lVar46 = *(long *)local_4a8;
                psVar12 = *(sel_t **)local_428;
                lVar48 = 0;
                uVar47 = 0;
                do {
                  uVar33 = uVar47;
                  if (psVar11 != (sel_t *)0x0) {
                    uVar33 = (ulong)psVar11[uVar47];
                  }
                  uVar60 = uVar47;
                  if (lVar46 != 0) {
                    uVar60 = (ulong)*(uint *)(lVar46 + uVar47 * 4);
                  }
                  uVar31 = uVar47;
                  if (psVar12 != (sel_t *)0x0) {
                    uVar31 = (ulong)psVar12[uVar47];
                  }
                  bVar61 = Equals::Operation<float>
                                     ((float *)(uVar17 + uVar60 * 4),(float *)(uVar19 + uVar31 * 4))
                  ;
                  if (bVar61) {
                    (false_sel.ptr)->sel_vector[lVar48] = (sel_t)uVar33;
                    lVar48 = lVar48 + 1;
                  }
                  uVar47 = uVar47 + 1;
                } while (count != uVar47);
              }
LAB_00b44619:
              local_4c8 = (element_type *)(count - lVar48);
            }
            else {
              if (count == 0) goto LAB_00b4271b;
              psVar11 = (sel.ptr)->sel_vector;
              lVar46 = *(long *)local_4a8;
              psVar12 = *(sel_t **)local_428;
              uVar47 = 0;
              local_4c8 = (element_type *)0x0;
              do {
                uVar33 = uVar47;
                if (psVar11 != (sel_t *)0x0) {
                  uVar33 = (ulong)psVar11[uVar47];
                }
                uVar60 = uVar47;
                if (lVar46 != 0) {
                  uVar60 = (ulong)*(uint *)(lVar46 + uVar47 * 4);
                }
                uVar31 = uVar47;
                if (psVar12 != (sel_t *)0x0) {
                  uVar31 = (ulong)psVar12[uVar47];
                }
                bVar61 = Equals::Operation<float>
                                   ((float *)(uVar17 + uVar60 * 4),(float *)(uVar19 + uVar31 * 4));
                if (!bVar61) {
                  (true_sel.ptr)->sel_vector[(long)local_4c8] = (sel_t)uVar33;
                  local_4c8 = (element_type *)((long)&local_4c8->_vptr_ExtraTypeInfo + 1);
                }
                uVar47 = uVar47 + 1;
              } while (count != uVar47);
            }
          }
          else if (count == 0) {
LAB_00b4271b:
            local_4c8 = (element_type *)0x0;
          }
          else {
            psVar11 = (sel.ptr)->sel_vector;
            lVar46 = *(long *)local_4a8;
            psVar12 = *(sel_t **)local_428;
            peVar29 = (element_type *)0x0;
            local_4c8 = (element_type *)0x0;
            uVar47 = 0;
            do {
              uVar33 = uVar47;
              if (psVar11 != (sel_t *)0x0) {
                uVar33 = (ulong)psVar11[uVar47];
              }
              uVar60 = uVar47;
              if (lVar46 != 0) {
                uVar60 = (ulong)*(uint *)(lVar46 + uVar47 * 4);
              }
              uVar31 = uVar47;
              if (psVar12 != (sel_t *)0x0) {
                uVar31 = (ulong)psVar12[uVar47];
              }
              bVar61 = Equals::Operation<float>
                                 ((float *)(uVar17 + uVar60 * 4),(float *)(uVar19 + uVar31 * 4));
              if (bVar61) {
                peVar30 = peVar29;
                oVar32.ptr = false_sel.ptr;
                peVar29 = (element_type *)((long)&peVar29->_vptr_ExtraTypeInfo + 1);
              }
              else {
                peVar30 = local_4c8;
                oVar32.ptr = true_sel.ptr;
                local_4c8 = (element_type *)((long)&local_4c8->_vptr_ExtraTypeInfo + 1);
              }
              (oVar32.ptr)->sel_vector[(long)peVar30] = (sel_t)uVar33;
              uVar47 = uVar47 + 1;
            } while (count != uVar47);
          }
        }
        else if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0)
        {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            if (count == 0) goto LAB_00b44617;
            psVar11 = (sel.ptr)->sel_vector;
            lVar46 = *(long *)local_4a8;
            psVar12 = *(sel_t **)local_428;
            lVar48 = 0;
            iVar34 = 0;
            do {
              iVar23 = iVar34;
              if (psVar11 != (sel_t *)0x0) {
                iVar23 = (idx_t)psVar11[iVar34];
              }
              iVar28 = iVar34;
              if (lVar46 != 0) {
                iVar28 = (idx_t)*(uint *)(lVar46 + iVar34 * 4);
              }
              iVar35 = iVar34;
              if (psVar12 != (sel_t *)0x0) {
                iVar35 = (idx_t)psVar12[iVar34];
              }
              if (LStack_4a0.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                  (element_type *)0x0) {
                bVar61 = false;
              }
              else {
                bVar61 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_ptr + (iVar28 >> 6) * 8) >> (iVar28 & 0x3f) & 1) == 0
                ;
              }
              if (LStack_420.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                  (element_type *)0x0) {
                bVar62 = false;
              }
              else {
                bVar62 = ((ulong)(&(LStack_420.type_info_.internal.
                                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr)->_vptr_ExtraTypeInfo)[iVar35 >> 6] >> (iVar35 & 0x3f) &
                         1) == 0;
              }
              if ((bool)(bVar61 | bVar62)) {
                bVar61 = (bool)(bVar61 ^ bVar62);
              }
              else {
                bVar61 = Equals::Operation<float>
                                   ((float *)(uVar17 + iVar28 * 4),(float *)(uVar19 + iVar35 * 4));
                bVar61 = !bVar61;
              }
              if (!bVar61) {
                (false_sel.ptr)->sel_vector[lVar48] = (sel_t)iVar23;
                lVar48 = lVar48 + 1;
              }
              iVar34 = iVar34 + 1;
            } while (count != iVar34);
            goto LAB_00b44619;
          }
          if (count == 0) goto LAB_00b4271b;
          psVar11 = (sel.ptr)->sel_vector;
          lVar46 = *(long *)local_4a8;
          psVar12 = *(sel_t **)local_428;
          iVar34 = 0;
          local_4c8 = (element_type *)0x0;
          do {
            iVar23 = iVar34;
            if (psVar11 != (sel_t *)0x0) {
              iVar23 = (idx_t)psVar11[iVar34];
            }
            iVar28 = iVar34;
            if (lVar46 != 0) {
              iVar28 = (idx_t)*(uint *)(lVar46 + iVar34 * 4);
            }
            iVar35 = iVar34;
            if (psVar12 != (sel_t *)0x0) {
              iVar35 = (idx_t)psVar12[iVar34];
            }
            if (LStack_4a0.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar61 = false;
            }
            else {
              bVar61 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                         super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr + (iVar28 >> 6) * 8) >> (iVar28 & 0x3f) & 1) == 0;
            }
            if (LStack_420.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar62 = false;
            }
            else {
              bVar62 = ((ulong)(&(LStack_420.type_info_.internal.
                                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->_vptr_ExtraTypeInfo)[iVar35 >> 6] >> (iVar35 & 0x3f) & 1)
                       == 0;
            }
            if ((bool)(bVar61 | bVar62)) {
              bVar61 = (bool)(bVar61 ^ bVar62);
            }
            else {
              bVar61 = Equals::Operation<float>
                                 ((float *)(uVar17 + iVar28 * 4),(float *)(uVar19 + iVar35 * 4));
              bVar61 = !bVar61;
            }
            if (bVar61) {
              (true_sel.ptr)->sel_vector[(long)local_4c8] = (sel_t)iVar23;
              local_4c8 = (element_type *)((long)&local_4c8->_vptr_ExtraTypeInfo + 1);
            }
            iVar34 = iVar34 + 1;
          } while (count != iVar34);
        }
        else {
          if (count == 0) goto LAB_00b4271b;
          psVar11 = (sel.ptr)->sel_vector;
          lVar46 = *(long *)local_4a8;
          psVar12 = *(sel_t **)local_428;
          local_4c8 = (element_type *)0x0;
          iVar34 = 0;
          peVar29 = (element_type *)0x0;
          do {
            iVar23 = iVar34;
            if (psVar11 != (sel_t *)0x0) {
              iVar23 = (idx_t)psVar11[iVar34];
            }
            iVar28 = iVar34;
            if (lVar46 != 0) {
              iVar28 = (idx_t)*(uint *)(lVar46 + iVar34 * 4);
            }
            iVar35 = iVar34;
            if (psVar12 != (sel_t *)0x0) {
              iVar35 = (idx_t)psVar12[iVar34];
            }
            if (LStack_4a0.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar61 = false;
            }
            else {
              bVar61 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                         super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr + (iVar28 >> 6) * 8) >> (iVar28 & 0x3f) & 1) == 0;
            }
            if (LStack_420.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar62 = false;
            }
            else {
              bVar62 = ((ulong)(&(LStack_420.type_info_.internal.
                                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->_vptr_ExtraTypeInfo)[iVar35 >> 6] >> (iVar35 & 0x3f) & 1)
                       == 0;
            }
            if ((bool)(bVar61 | bVar62)) {
              bVar61 = (bool)(bVar61 ^ bVar62);
            }
            else {
              bVar61 = Equals::Operation<float>
                                 ((float *)(uVar17 + iVar28 * 4),(float *)(uVar19 + iVar35 * 4));
              bVar61 = !bVar61;
            }
            if (bVar61) {
              peVar30 = local_4c8;
              oVar32.ptr = true_sel.ptr;
              peVar43 = peVar29;
              local_4c8 = (element_type *)((long)&local_4c8->_vptr_ExtraTypeInfo + 1);
            }
            else {
              peVar43 = (element_type *)((long)&peVar29->_vptr_ExtraTypeInfo + 1);
              peVar30 = peVar29;
              oVar32.ptr = false_sel.ptr;
            }
            (oVar32.ptr)->sel_vector[(long)peVar30] = (sel_t)iVar23;
            iVar34 = iVar34 + 1;
            peVar29 = peVar43;
          } while (count != iVar34);
        }
LAB_00b44626:
        if (local_3e8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3e8._M_pi);
        }
        if (local_408._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_408._M_pi);
        }
        if (local_468._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_468._M_pi);
        }
        goto LAB_00b412e1;
      }
      pfVar37 = (float *)left->data;
      pfVar55 = (float *)right->data;
      _local_4a8 = (undefined1  [16])0x0;
      LStack_4a0.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      LStack_4a0.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
      puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar5 != (unsigned_long *)0x0) && ((*puVar5 & 1) == 0)) {
        local_2a8._0_8_ = 0x800;
        make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                  ((duckdb *)local_428,(unsigned_long *)&local_2a8);
        peVar29 = LStack_4a0.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        auVar18 = local_428;
        LStack_4a0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)LStack_420._0_8_;
        _local_428 = (undefined1  [16])0x0;
        LStack_4a0._0_8_ = auVar18;
        if (peVar29 != (element_type *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar29);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_);
        }
        pTVar25 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                            ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                             (local_4a8 + 8));
        _Var9.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
             (pTVar25->owned_data).
             super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
             super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
             super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
             super__Head_base<0UL,_unsigned_long_*,_false>;
        local_4a8 = (undefined1  [8])
                    _Var9.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
        *(undefined8 *)_Var9.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
             0xfffffffffffffffe;
      }
      FlatVector::VerifyFlatVector(left);
      if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
        if (true_sel.ptr == (SelectionVector *)0x0) {
          if (count == 0) goto LAB_00b412cc;
          lVar46 = 0;
          uVar47 = 0;
          do {
            uVar33 = uVar47;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              uVar33 = (ulong)(sel.ptr)->sel_vector[uVar47];
            }
            puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (puVar5 == (unsigned_long *)0x0) {
              bVar61 = false;
            }
            else {
              bVar61 = (puVar5[uVar47 >> 6] >> (uVar47 & 0x3f) & 1) == 0;
            }
            if (local_4a8 == (undefined1  [8])0x0) {
              bVar62 = false;
            }
            else {
              bVar62 = (*(byte *)local_4a8 & 1) == 0;
            }
            if ((bVar61 | bVar62) == 1) {
              bVar61 = (bool)(bVar61 ^ bVar62 ^ 1);
            }
            else {
              bVar61 = Equals::Operation<float>(pfVar37,pfVar55);
            }
            (false_sel.ptr)->sel_vector[lVar46] = (sel_t)uVar33;
            lVar46 = lVar46 + (ulong)bVar61;
            uVar47 = uVar47 + 1;
            pfVar37 = pfVar37 + 1;
          } while (count != uVar47);
          goto LAB_00b412d7;
        }
        if (count != 0) {
          uVar47 = 0;
          local_4c8 = (element_type *)0x0;
          do {
            uVar33 = uVar47;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              uVar33 = (ulong)(sel.ptr)->sel_vector[uVar47];
            }
            puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (puVar5 == (unsigned_long *)0x0) {
              bVar61 = false;
            }
            else {
              bVar61 = (puVar5[uVar47 >> 6] >> (uVar47 & 0x3f) & 1) == 0;
            }
            if (local_4a8 == (undefined1  [8])0x0) {
              bVar62 = false;
            }
            else {
              bVar62 = (*(byte *)local_4a8 & 1) == 0;
            }
            if ((bVar61 | bVar62) == 1) {
              bVar61 = (bool)(bVar61 ^ bVar62);
            }
            else {
              bVar61 = Equals::Operation<float>(pfVar37,pfVar55);
              bVar61 = !bVar61;
            }
            (true_sel.ptr)->sel_vector[(long)local_4c8] = (sel_t)uVar33;
            local_4c8 = (element_type *)((long)&local_4c8->_vptr_ExtraTypeInfo + (ulong)bVar61);
            uVar47 = uVar47 + 1;
            pfVar37 = pfVar37 + 1;
            local_488._M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 LStack_4a0.type_info_.internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          } while (count != uVar47);
          goto LAB_00b412e1;
        }
      }
      else if (count != 0) {
        lVar46 = 0;
        local_4c8 = (element_type *)0x0;
        uVar47 = 0;
        do {
          uVar33 = uVar47;
          if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
            uVar33 = (ulong)(sel.ptr)->sel_vector[uVar47];
          }
          puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if (puVar5 == (unsigned_long *)0x0) {
            bVar61 = false;
          }
          else {
            bVar61 = (puVar5[uVar47 >> 6] >> (uVar47 & 0x3f) & 1) == 0;
          }
          if (local_4a8 == (undefined1  [8])0x0) {
            bVar62 = false;
          }
          else {
            bVar62 = (*(byte *)local_4a8 & 1) == 0;
          }
          if ((bVar61 | bVar62) == 1) {
            bVar61 = (bool)(bVar61 ^ bVar62);
          }
          else {
            bVar61 = Equals::Operation<float>(pfVar37,pfVar55);
            bVar61 = !bVar61;
          }
          (true_sel.ptr)->sel_vector[(long)local_4c8] = (sel_t)uVar33;
          local_4c8 = (element_type *)((long)&local_4c8->_vptr_ExtraTypeInfo + (ulong)bVar61);
          (false_sel.ptr)->sel_vector[lVar46] = (sel_t)uVar33;
          lVar46 = lVar46 + (ulong)(bVar61 ^ 1);
          uVar47 = uVar47 + 1;
          pfVar37 = pfVar37 + 1;
          local_488._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               LStack_4a0.type_info_.internal.
               super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        } while (count != uVar47);
        goto LAB_00b412e1;
      }
    }
    goto LAB_00b3e25c;
  case DOUBLE:
    local_328 = (undefined1  [8])null_mask.ptr;
    if (sel.ptr == (SelectionVector *)0x0) {
      sel.ptr = FlatVector::IncrementalSelectionVector();
    }
    if (local_328 != (undefined1  [8])0x0) {
      optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                ((optional_ptr<duckdb::ValidityMask,_true> *)local_328);
      UpdateNullMask(left,sel.ptr,count,(ValidityMask *)local_328);
      optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                ((optional_ptr<duckdb::ValidityMask,_true> *)local_328);
      UpdateNullMask(right,sel.ptr,count,(ValidityMask *)local_328);
    }
    VVar3 = left->vector_type;
    VVar4 = right->vector_type;
    if ((VVar3 ^ CONSTANT_VECTOR) == FLAT_VECTOR && (VVar4 ^ CONSTANT_VECTOR) == FLAT_VECTOR) {
      puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if (puVar5 == (unsigned_long *)0x0) {
        bVar61 = false;
      }
      else {
        bVar61 = (*puVar5 & 1) == 0;
      }
      puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if (puVar5 == (unsigned_long *)0x0) {
        bVar62 = false;
      }
      else {
        bVar62 = (*puVar5 & 1) == 0;
      }
      if ((bool)(bVar61 | bVar62)) {
        bVar61 = (bool)(bVar61 ^ bVar62);
      }
      else {
        bVar61 = Equals::Operation<double>((double *)left->data,(double *)right->data);
        bVar61 = !bVar61;
      }
      if (!bVar61) {
        if (false_sel.ptr == (SelectionVector *)0x0 || count == 0) {
          return (idx_t)(element_type *)0x0;
        }
        psVar11 = (sel.ptr)->sel_vector;
        psVar12 = (false_sel.ptr)->sel_vector;
        iVar34 = 0;
        do {
          sVar44 = (sel_t)iVar34;
          if (psVar11 != (sel_t *)0x0) {
            sVar44 = psVar11[iVar34];
          }
          psVar12[iVar34] = sVar44;
          iVar34 = iVar34 + 1;
        } while (count != iVar34);
        return (idx_t)(element_type *)0x0;
      }
      if (true_sel.ptr != (SelectionVector *)0x0 && count != 0) {
        psVar11 = (sel.ptr)->sel_vector;
        psVar12 = (true_sel.ptr)->sel_vector;
        iVar34 = 0;
        do {
          sVar44 = (sel_t)iVar34;
          if (psVar11 != (sel_t *)0x0) {
            sVar44 = psVar11[iVar34];
          }
          psVar12[iVar34] = sVar44;
          iVar34 = iVar34 + 1;
        } while (count != iVar34);
        return count;
      }
      return count;
    }
    if ((VVar3 ^ CONSTANT_VECTOR) == FLAT_VECTOR && VVar4 == FLAT_VECTOR) {
      pdVar38 = (double *)left->data;
      pdVar56 = (double *)right->data;
      _local_4a8 = (undefined1  [16])0x0;
      LStack_4a0.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      LStack_4a0.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
      puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar5 != (unsigned_long *)0x0) && ((*puVar5 & 1) == 0)) {
        local_2a8._0_8_ = 0x800;
        make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                  ((duckdb *)local_428,(unsigned_long *)&local_2a8);
        peVar29 = LStack_4a0.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        auVar18 = local_428;
        LStack_4a0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)LStack_420._0_8_;
        _local_428 = (undefined1  [16])0x0;
        LStack_4a0._0_8_ = auVar18;
        if (peVar29 != (element_type *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar29);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_);
        }
        pTVar25 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                            ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                             (local_4a8 + 8));
        _Var9.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
             (pTVar25->owned_data).
             super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
             super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
             super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
             super__Head_base<0UL,_unsigned_long_*,_false>;
        local_4a8 = (undefined1  [8])
                    _Var9.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
        *(undefined8 *)_Var9.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
             0xfffffffffffffffe;
      }
      FlatVector::VerifyFlatVector(right);
      if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
        if (true_sel.ptr == (SelectionVector *)0x0) {
          if (count == 0) goto LAB_00b412cc;
          lVar46 = 0;
          uVar47 = 0;
          do {
            uVar33 = uVar47;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              uVar33 = (ulong)(sel.ptr)->sel_vector[uVar47];
            }
            if (local_4a8 == (undefined1  [8])0x0) {
              bVar61 = false;
            }
            else {
              bVar61 = (*(byte *)local_4a8 & 1) == 0;
            }
            puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (puVar5 == (unsigned_long *)0x0) {
              bVar62 = false;
            }
            else {
              bVar62 = (puVar5[uVar47 >> 6] >> (uVar47 & 0x3f) & 1) == 0;
            }
            if ((bVar61 | bVar62) == 1) {
              bVar61 = (bool)(bVar61 ^ bVar62 ^ 1);
            }
            else {
              bVar61 = Equals::Operation<double>(pdVar38,pdVar56);
            }
            (false_sel.ptr)->sel_vector[lVar46] = (sel_t)uVar33;
            lVar46 = lVar46 + (ulong)bVar61;
            uVar47 = uVar47 + 1;
            pdVar56 = pdVar56 + 1;
          } while (count != uVar47);
          goto LAB_00b412d7;
        }
        if (count != 0) {
          uVar47 = 0;
          local_4c8 = (element_type *)0x0;
          do {
            uVar33 = uVar47;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              uVar33 = (ulong)(sel.ptr)->sel_vector[uVar47];
            }
            if (local_4a8 == (undefined1  [8])0x0) {
              bVar61 = false;
            }
            else {
              bVar61 = (*(byte *)local_4a8 & 1) == 0;
            }
            puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (puVar5 == (unsigned_long *)0x0) {
              bVar62 = false;
            }
            else {
              bVar62 = (puVar5[uVar47 >> 6] >> (uVar47 & 0x3f) & 1) == 0;
            }
            if ((bVar61 | bVar62) == 1) {
              bVar61 = (bool)(bVar61 ^ bVar62);
            }
            else {
              bVar61 = Equals::Operation<double>(pdVar38,pdVar56);
              bVar61 = !bVar61;
            }
            (true_sel.ptr)->sel_vector[(long)local_4c8] = (sel_t)uVar33;
            local_4c8 = (element_type *)((long)&local_4c8->_vptr_ExtraTypeInfo + (ulong)bVar61);
            uVar47 = uVar47 + 1;
            pdVar56 = pdVar56 + 1;
            local_488._M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 LStack_4a0.type_info_.internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          } while (count != uVar47);
          goto LAB_00b412e1;
        }
      }
      else if (count != 0) {
        lVar46 = 0;
        local_4c8 = (element_type *)0x0;
        uVar47 = 0;
        do {
          uVar33 = uVar47;
          if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
            uVar33 = (ulong)(sel.ptr)->sel_vector[uVar47];
          }
          if (local_4a8 == (undefined1  [8])0x0) {
            bVar61 = false;
          }
          else {
            bVar61 = (*(byte *)local_4a8 & 1) == 0;
          }
          puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if (puVar5 == (unsigned_long *)0x0) {
            bVar62 = false;
          }
          else {
            bVar62 = (puVar5[uVar47 >> 6] >> (uVar47 & 0x3f) & 1) == 0;
          }
          if ((bVar61 | bVar62) == 1) {
            bVar61 = (bool)(bVar61 ^ bVar62);
          }
          else {
            bVar61 = Equals::Operation<double>(pdVar38,pdVar56);
            bVar61 = !bVar61;
          }
          (true_sel.ptr)->sel_vector[(long)local_4c8] = (sel_t)uVar33;
          local_4c8 = (element_type *)((long)&local_4c8->_vptr_ExtraTypeInfo + (ulong)bVar61);
          (false_sel.ptr)->sel_vector[lVar46] = (sel_t)uVar33;
          lVar46 = lVar46 + (ulong)(bVar61 ^ 1);
          uVar47 = uVar47 + 1;
          pdVar56 = pdVar56 + 1;
          local_488._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               LStack_4a0.type_info_.internal.
               super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        } while (count != uVar47);
        goto LAB_00b412e1;
      }
    }
    else {
      if ((VVar4 ^ CONSTANT_VECTOR) != FLAT_VECTOR || VVar3 != FLAT_VECTOR) {
        if (VVar3 == FLAT_VECTOR && VVar4 == FLAT_VECTOR) {
          pdVar38 = (double *)left->data;
          pdVar56 = (double *)right->data;
          FlatVector::VerifyFlatVector(left);
          FlatVector::VerifyFlatVector(right);
          if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
            if (count == 0) {
              return (idx_t)(element_type *)0x0;
            }
            lVar46 = 0;
            local_4c8 = (element_type *)0x0;
            uVar47 = 0;
            do {
              uVar33 = uVar47;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                uVar33 = (ulong)(sel.ptr)->sel_vector[uVar47];
              }
              puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
              if (puVar5 == (unsigned_long *)0x0) {
                bVar61 = false;
              }
              else {
                bVar61 = (puVar5[uVar47 >> 6] >> (uVar47 & 0x3f) & 1) == 0;
              }
              puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
              if (puVar5 == (unsigned_long *)0x0) {
                bVar62 = false;
              }
              else {
                bVar62 = (puVar5[uVar47 >> 6] >> (uVar47 & 0x3f) & 1) == 0;
              }
              if ((bVar61 | bVar62) == 1) {
                bVar61 = (bool)(bVar61 ^ bVar62);
              }
              else {
                bVar61 = Equals::Operation<double>(pdVar38,pdVar56);
                bVar61 = !bVar61;
              }
              (true_sel.ptr)->sel_vector[(long)local_4c8] = (sel_t)uVar33;
              local_4c8 = (element_type *)((long)&local_4c8->_vptr_ExtraTypeInfo + (ulong)bVar61);
              (false_sel.ptr)->sel_vector[lVar46] = (sel_t)uVar33;
              lVar46 = lVar46 + (ulong)(bVar61 ^ 1);
              uVar47 = uVar47 + 1;
              pdVar38 = pdVar38 + 1;
              pdVar56 = pdVar56 + 1;
            } while (count != uVar47);
            return (idx_t)local_4c8;
          }
          if (true_sel.ptr != (SelectionVector *)0x0) {
            if (count == 0) {
              return (idx_t)(element_type *)0x0;
            }
            uVar47 = 0;
            local_4c8 = (element_type *)0x0;
            do {
              uVar33 = uVar47;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                uVar33 = (ulong)(sel.ptr)->sel_vector[uVar47];
              }
              puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
              if (puVar5 == (unsigned_long *)0x0) {
                bVar61 = false;
              }
              else {
                bVar61 = (puVar5[uVar47 >> 6] >> (uVar47 & 0x3f) & 1) == 0;
              }
              puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
              if (puVar5 == (unsigned_long *)0x0) {
                bVar62 = false;
              }
              else {
                bVar62 = (puVar5[uVar47 >> 6] >> (uVar47 & 0x3f) & 1) == 0;
              }
              if ((bVar61 | bVar62) == 1) {
                bVar61 = (bool)(bVar61 ^ bVar62);
              }
              else {
                bVar61 = Equals::Operation<double>(pdVar38,pdVar56);
                bVar61 = !bVar61;
              }
              (true_sel.ptr)->sel_vector[(long)local_4c8] = (sel_t)uVar33;
              local_4c8 = (element_type *)((long)&local_4c8->_vptr_ExtraTypeInfo + (ulong)bVar61);
              uVar47 = uVar47 + 1;
              pdVar38 = pdVar38 + 1;
              pdVar56 = pdVar56 + 1;
            } while (count != uVar47);
            return (idx_t)local_4c8;
          }
          if (count != 0) {
            lVar46 = 0;
            uVar47 = 0;
            do {
              uVar33 = uVar47;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                uVar33 = (ulong)(sel.ptr)->sel_vector[uVar47];
              }
              puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
              if (puVar5 == (unsigned_long *)0x0) {
                bVar61 = false;
              }
              else {
                bVar61 = (puVar5[uVar47 >> 6] >> (uVar47 & 0x3f) & 1) == 0;
              }
              puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
              if (puVar5 == (unsigned_long *)0x0) {
                bVar62 = false;
              }
              else {
                bVar62 = (puVar5[uVar47 >> 6] >> (uVar47 & 0x3f) & 1) == 0;
              }
              if ((bVar61 | bVar62) == 1) {
                bVar61 = (bool)(bVar61 ^ bVar62 ^ 1);
              }
              else {
                bVar61 = Equals::Operation<double>(pdVar38,pdVar56);
              }
              (false_sel.ptr)->sel_vector[lVar46] = (sel_t)uVar33;
              lVar46 = lVar46 + (ulong)bVar61;
              uVar47 = uVar47 + 1;
              pdVar38 = pdVar38 + 1;
              pdVar56 = pdVar56 + 1;
            } while (count != uVar47);
            goto LAB_00b43248;
          }
          goto LAB_00b43245;
        }
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_4a8);
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_428);
        Vector::ToUnifiedFormat(left,count,(UnifiedVectorFormat *)local_4a8);
        Vector::ToUnifiedFormat(right,count,(UnifiedVectorFormat *)local_428);
        uVar17 = LStack_4a0._0_8_;
        uVar19 = LStack_420._0_8_;
        if (LStack_420.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0 &&
            LStack_4a0.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
            if (true_sel.ptr == (SelectionVector *)0x0) {
              if (count == 0) goto LAB_00b44617;
              psVar11 = (sel.ptr)->sel_vector;
              lVar46 = *(long *)local_4a8;
              psVar12 = *(sel_t **)local_428;
              lVar48 = 0;
              uVar47 = 0;
              do {
                uVar33 = uVar47;
                if (psVar11 != (sel_t *)0x0) {
                  uVar33 = (ulong)psVar11[uVar47];
                }
                uVar60 = uVar47;
                if (lVar46 != 0) {
                  uVar60 = (ulong)*(uint *)(lVar46 + uVar47 * 4);
                }
                uVar31 = uVar47;
                if (psVar12 != (sel_t *)0x0) {
                  uVar31 = (ulong)psVar12[uVar47];
                }
                bVar61 = Equals::Operation<double>
                                   ((double *)(uVar17 + uVar60 * 8),(double *)(uVar19 + uVar31 * 8))
                ;
                if (bVar61) {
                  (false_sel.ptr)->sel_vector[lVar48] = (sel_t)uVar33;
                  lVar48 = lVar48 + 1;
                }
                uVar47 = uVar47 + 1;
              } while (count != uVar47);
              goto LAB_00b44619;
            }
            if (count == 0) goto LAB_00b4271b;
            psVar11 = (sel.ptr)->sel_vector;
            lVar46 = *(long *)local_4a8;
            psVar12 = *(sel_t **)local_428;
            uVar47 = 0;
            local_4c8 = (element_type *)0x0;
            do {
              uVar33 = uVar47;
              if (psVar11 != (sel_t *)0x0) {
                uVar33 = (ulong)psVar11[uVar47];
              }
              uVar60 = uVar47;
              if (lVar46 != 0) {
                uVar60 = (ulong)*(uint *)(lVar46 + uVar47 * 4);
              }
              uVar31 = uVar47;
              if (psVar12 != (sel_t *)0x0) {
                uVar31 = (ulong)psVar12[uVar47];
              }
              bVar61 = Equals::Operation<double>
                                 ((double *)(uVar17 + uVar60 * 8),(double *)(uVar19 + uVar31 * 8));
              if (!bVar61) {
                (true_sel.ptr)->sel_vector[(long)local_4c8] = (sel_t)uVar33;
                local_4c8 = (element_type *)((long)&local_4c8->_vptr_ExtraTypeInfo + 1);
              }
              uVar47 = uVar47 + 1;
            } while (count != uVar47);
          }
          else {
            if (count == 0) goto LAB_00b4271b;
            psVar11 = (sel.ptr)->sel_vector;
            lVar46 = *(long *)local_4a8;
            psVar12 = *(sel_t **)local_428;
            peVar29 = (element_type *)0x0;
            local_4c8 = (element_type *)0x0;
            uVar47 = 0;
            do {
              uVar33 = uVar47;
              if (psVar11 != (sel_t *)0x0) {
                uVar33 = (ulong)psVar11[uVar47];
              }
              uVar60 = uVar47;
              if (lVar46 != 0) {
                uVar60 = (ulong)*(uint *)(lVar46 + uVar47 * 4);
              }
              uVar31 = uVar47;
              if (psVar12 != (sel_t *)0x0) {
                uVar31 = (ulong)psVar12[uVar47];
              }
              bVar61 = Equals::Operation<double>
                                 ((double *)(uVar17 + uVar60 * 8),(double *)(uVar19 + uVar31 * 8));
              if (bVar61) {
                peVar30 = peVar29;
                oVar32.ptr = false_sel.ptr;
                peVar29 = (element_type *)((long)&peVar29->_vptr_ExtraTypeInfo + 1);
              }
              else {
                peVar30 = local_4c8;
                oVar32.ptr = true_sel.ptr;
                local_4c8 = (element_type *)((long)&local_4c8->_vptr_ExtraTypeInfo + 1);
              }
              (oVar32.ptr)->sel_vector[(long)peVar30] = (sel_t)uVar33;
              uVar47 = uVar47 + 1;
            } while (count != uVar47);
          }
        }
        else if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0)
        {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            if (count == 0) goto LAB_00b44617;
            psVar11 = (sel.ptr)->sel_vector;
            lVar46 = *(long *)local_4a8;
            psVar12 = *(sel_t **)local_428;
            lVar48 = 0;
            iVar34 = 0;
            do {
              iVar23 = iVar34;
              if (psVar11 != (sel_t *)0x0) {
                iVar23 = (idx_t)psVar11[iVar34];
              }
              iVar28 = iVar34;
              if (lVar46 != 0) {
                iVar28 = (idx_t)*(uint *)(lVar46 + iVar34 * 4);
              }
              iVar35 = iVar34;
              if (psVar12 != (sel_t *)0x0) {
                iVar35 = (idx_t)psVar12[iVar34];
              }
              if (LStack_4a0.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                  (element_type *)0x0) {
                bVar61 = false;
              }
              else {
                bVar61 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_ptr + (iVar28 >> 6) * 8) >> (iVar28 & 0x3f) & 1) == 0
                ;
              }
              if (LStack_420.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                  (element_type *)0x0) {
                bVar62 = false;
              }
              else {
                bVar62 = ((ulong)(&(LStack_420.type_info_.internal.
                                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr)->_vptr_ExtraTypeInfo)[iVar35 >> 6] >> (iVar35 & 0x3f) &
                         1) == 0;
              }
              if ((bool)(bVar61 | bVar62)) {
                bVar61 = (bool)(bVar61 ^ bVar62);
              }
              else {
                bVar61 = Equals::Operation<double>
                                   ((double *)(uVar17 + iVar28 * 8),(double *)(uVar19 + iVar35 * 8))
                ;
                bVar61 = !bVar61;
              }
              if (!bVar61) {
                (false_sel.ptr)->sel_vector[lVar48] = (sel_t)iVar23;
                lVar48 = lVar48 + 1;
              }
              iVar34 = iVar34 + 1;
            } while (count != iVar34);
            goto LAB_00b44619;
          }
          if (count == 0) goto LAB_00b4271b;
          psVar11 = (sel.ptr)->sel_vector;
          lVar46 = *(long *)local_4a8;
          psVar12 = *(sel_t **)local_428;
          iVar34 = 0;
          local_4c8 = (element_type *)0x0;
          do {
            iVar23 = iVar34;
            if (psVar11 != (sel_t *)0x0) {
              iVar23 = (idx_t)psVar11[iVar34];
            }
            iVar28 = iVar34;
            if (lVar46 != 0) {
              iVar28 = (idx_t)*(uint *)(lVar46 + iVar34 * 4);
            }
            iVar35 = iVar34;
            if (psVar12 != (sel_t *)0x0) {
              iVar35 = (idx_t)psVar12[iVar34];
            }
            if (LStack_4a0.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar61 = false;
            }
            else {
              bVar61 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                         super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr + (iVar28 >> 6) * 8) >> (iVar28 & 0x3f) & 1) == 0;
            }
            if (LStack_420.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar62 = false;
            }
            else {
              bVar62 = ((ulong)(&(LStack_420.type_info_.internal.
                                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->_vptr_ExtraTypeInfo)[iVar35 >> 6] >> (iVar35 & 0x3f) & 1)
                       == 0;
            }
            if ((bool)(bVar61 | bVar62)) {
              bVar61 = (bool)(bVar61 ^ bVar62);
            }
            else {
              bVar61 = Equals::Operation<double>
                                 ((double *)(uVar17 + iVar28 * 8),(double *)(uVar19 + iVar35 * 8));
              bVar61 = !bVar61;
            }
            if (bVar61) {
              (true_sel.ptr)->sel_vector[(long)local_4c8] = (sel_t)iVar23;
              local_4c8 = (element_type *)((long)&local_4c8->_vptr_ExtraTypeInfo + 1);
            }
            iVar34 = iVar34 + 1;
          } while (count != iVar34);
        }
        else {
          if (count == 0) goto LAB_00b4271b;
          psVar11 = (sel.ptr)->sel_vector;
          lVar46 = *(long *)local_4a8;
          psVar12 = *(sel_t **)local_428;
          local_4c8 = (element_type *)0x0;
          iVar34 = 0;
          peVar29 = (element_type *)0x0;
          do {
            iVar23 = iVar34;
            if (psVar11 != (sel_t *)0x0) {
              iVar23 = (idx_t)psVar11[iVar34];
            }
            iVar28 = iVar34;
            if (lVar46 != 0) {
              iVar28 = (idx_t)*(uint *)(lVar46 + iVar34 * 4);
            }
            iVar35 = iVar34;
            if (psVar12 != (sel_t *)0x0) {
              iVar35 = (idx_t)psVar12[iVar34];
            }
            if (LStack_4a0.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar61 = false;
            }
            else {
              bVar61 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                         super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr + (iVar28 >> 6) * 8) >> (iVar28 & 0x3f) & 1) == 0;
            }
            if (LStack_420.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar62 = false;
            }
            else {
              bVar62 = ((ulong)(&(LStack_420.type_info_.internal.
                                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->_vptr_ExtraTypeInfo)[iVar35 >> 6] >> (iVar35 & 0x3f) & 1)
                       == 0;
            }
            if ((bool)(bVar61 | bVar62)) {
              bVar61 = (bool)(bVar61 ^ bVar62);
            }
            else {
              bVar61 = Equals::Operation<double>
                                 ((double *)(uVar17 + iVar28 * 8),(double *)(uVar19 + iVar35 * 8));
              bVar61 = !bVar61;
            }
            if (bVar61) {
              peVar30 = local_4c8;
              oVar32.ptr = true_sel.ptr;
              peVar43 = peVar29;
              local_4c8 = (element_type *)((long)&local_4c8->_vptr_ExtraTypeInfo + 1);
            }
            else {
              peVar43 = (element_type *)((long)&peVar29->_vptr_ExtraTypeInfo + 1);
              peVar30 = peVar29;
              oVar32.ptr = false_sel.ptr;
            }
            (oVar32.ptr)->sel_vector[(long)peVar30] = (sel_t)iVar23;
            iVar34 = iVar34 + 1;
            peVar29 = peVar43;
          } while (count != iVar34);
        }
        goto LAB_00b44626;
      }
      pdVar38 = (double *)left->data;
      pdVar56 = (double *)right->data;
      _local_4a8 = (undefined1  [16])0x0;
      LStack_4a0.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      LStack_4a0.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
      puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar5 != (unsigned_long *)0x0) && ((*puVar5 & 1) == 0)) {
        local_2a8._0_8_ = 0x800;
        make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                  ((duckdb *)local_428,(unsigned_long *)&local_2a8);
        peVar29 = LStack_4a0.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        auVar18 = local_428;
        LStack_4a0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)LStack_420._0_8_;
        _local_428 = (undefined1  [16])0x0;
        LStack_4a0._0_8_ = auVar18;
        if (peVar29 != (element_type *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar29);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_);
        }
        pTVar25 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                            ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                             (local_4a8 + 8));
        _Var9.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
             (pTVar25->owned_data).
             super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
             super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
             super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
             super__Head_base<0UL,_unsigned_long_*,_false>;
        local_4a8 = (undefined1  [8])
                    _Var9.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
        *(undefined8 *)_Var9.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
             0xfffffffffffffffe;
      }
      FlatVector::VerifyFlatVector(left);
      if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
        if (true_sel.ptr == (SelectionVector *)0x0) {
          if (count == 0) goto LAB_00b412cc;
          lVar46 = 0;
          uVar47 = 0;
          do {
            uVar33 = uVar47;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              uVar33 = (ulong)(sel.ptr)->sel_vector[uVar47];
            }
            puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (puVar5 == (unsigned_long *)0x0) {
              bVar61 = false;
            }
            else {
              bVar61 = (puVar5[uVar47 >> 6] >> (uVar47 & 0x3f) & 1) == 0;
            }
            if (local_4a8 == (undefined1  [8])0x0) {
              bVar62 = false;
            }
            else {
              bVar62 = (*(byte *)local_4a8 & 1) == 0;
            }
            if ((bVar61 | bVar62) == 1) {
              bVar61 = (bool)(bVar61 ^ bVar62 ^ 1);
            }
            else {
              bVar61 = Equals::Operation<double>(pdVar38,pdVar56);
            }
            (false_sel.ptr)->sel_vector[lVar46] = (sel_t)uVar33;
            lVar46 = lVar46 + (ulong)bVar61;
            uVar47 = uVar47 + 1;
            pdVar38 = pdVar38 + 1;
          } while (count != uVar47);
          goto LAB_00b412d7;
        }
        if (count != 0) {
          uVar47 = 0;
          local_4c8 = (element_type *)0x0;
          do {
            uVar33 = uVar47;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              uVar33 = (ulong)(sel.ptr)->sel_vector[uVar47];
            }
            puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (puVar5 == (unsigned_long *)0x0) {
              bVar61 = false;
            }
            else {
              bVar61 = (puVar5[uVar47 >> 6] >> (uVar47 & 0x3f) & 1) == 0;
            }
            if (local_4a8 == (undefined1  [8])0x0) {
              bVar62 = false;
            }
            else {
              bVar62 = (*(byte *)local_4a8 & 1) == 0;
            }
            if ((bVar61 | bVar62) == 1) {
              bVar61 = (bool)(bVar61 ^ bVar62);
            }
            else {
              bVar61 = Equals::Operation<double>(pdVar38,pdVar56);
              bVar61 = !bVar61;
            }
            (true_sel.ptr)->sel_vector[(long)local_4c8] = (sel_t)uVar33;
            local_4c8 = (element_type *)((long)&local_4c8->_vptr_ExtraTypeInfo + (ulong)bVar61);
            uVar47 = uVar47 + 1;
            pdVar38 = pdVar38 + 1;
            local_488._M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 LStack_4a0.type_info_.internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          } while (count != uVar47);
          goto LAB_00b412e1;
        }
      }
      else if (count != 0) {
        lVar46 = 0;
        local_4c8 = (element_type *)0x0;
        uVar47 = 0;
        do {
          uVar33 = uVar47;
          if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
            uVar33 = (ulong)(sel.ptr)->sel_vector[uVar47];
          }
          puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if (puVar5 == (unsigned_long *)0x0) {
            bVar61 = false;
          }
          else {
            bVar61 = (puVar5[uVar47 >> 6] >> (uVar47 & 0x3f) & 1) == 0;
          }
          if (local_4a8 == (undefined1  [8])0x0) {
            bVar62 = false;
          }
          else {
            bVar62 = (*(byte *)local_4a8 & 1) == 0;
          }
          if ((bVar61 | bVar62) == 1) {
            bVar61 = (bool)(bVar61 ^ bVar62);
          }
          else {
            bVar61 = Equals::Operation<double>(pdVar38,pdVar56);
            bVar61 = !bVar61;
          }
          (true_sel.ptr)->sel_vector[(long)local_4c8] = (sel_t)uVar33;
          local_4c8 = (element_type *)((long)&local_4c8->_vptr_ExtraTypeInfo + (ulong)bVar61);
          (false_sel.ptr)->sel_vector[lVar46] = (sel_t)uVar33;
          lVar46 = lVar46 + (ulong)(bVar61 ^ 1);
          uVar47 = uVar47 + 1;
          pdVar38 = pdVar38 + 1;
          local_488._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               LStack_4a0.type_info_.internal.
               super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        } while (count != uVar47);
        goto LAB_00b412e1;
      }
    }
    goto LAB_00b3e25c;
  case INTERVAL:
    local_328 = (undefined1  [8])null_mask.ptr;
    if (sel.ptr == (SelectionVector *)0x0) {
      sel.ptr = FlatVector::IncrementalSelectionVector();
    }
    if (local_328 != (undefined1  [8])0x0) {
      optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                ((optional_ptr<duckdb::ValidityMask,_true> *)local_328);
      UpdateNullMask(left,sel.ptr,count,(ValidityMask *)local_328);
      optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                ((optional_ptr<duckdb::ValidityMask,_true> *)local_328);
      UpdateNullMask(right,sel.ptr,count,(ValidityMask *)local_328);
    }
    VVar3 = left->vector_type;
    VVar4 = right->vector_type;
    if ((VVar3 ^ CONSTANT_VECTOR) == FLAT_VECTOR && (VVar4 ^ CONSTANT_VECTOR) == FLAT_VECTOR) {
      puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if (puVar5 == (unsigned_long *)0x0) {
        bVar61 = false;
      }
      else {
        bVar61 = (*puVar5 & 1) == 0;
      }
      puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if (puVar5 == (unsigned_long *)0x0) {
        bVar62 = false;
      }
      else {
        bVar62 = (*puVar5 & 1) == 0;
      }
      if ((bool)(bVar61 | bVar62)) {
        bVar61 = (bool)(bVar61 ^ bVar62);
      }
      else {
        piVar45 = (int *)left->data;
        piVar51 = (int *)right->data;
        if (((*piVar45 == *piVar51) && (piVar45[1] == piVar51[1])) &&
           (*(long *)(piVar45 + 2) == *(long *)(piVar51 + 2))) goto LAB_00b3a3eb;
        lVar46 = (long)piVar45[1] + *(long *)(piVar45 + 2) / 86400000000;
        lVar48 = (long)piVar51[1] + *(long *)(piVar51 + 2) / 86400000000;
        if (((long)*piVar45 + lVar46 / 0x1e != (long)*piVar51 + lVar48 / 0x1e) ||
           (lVar46 % 0x1e != lVar48 % 0x1e)) goto LAB_00b3a3a7;
        bVar61 = *(long *)(piVar45 + 2) % 86400000000 != *(long *)(piVar51 + 2) % 86400000000;
      }
      if (bVar61) {
LAB_00b3a3a7:
        if (count != 0 && true_sel.ptr != (SelectionVector *)0x0) {
          psVar11 = (sel.ptr)->sel_vector;
          psVar12 = (true_sel.ptr)->sel_vector;
          iVar34 = 0;
          do {
            sVar44 = (sel_t)iVar34;
            if (psVar11 != (sel_t *)0x0) {
              sVar44 = psVar11[iVar34];
            }
            psVar12[iVar34] = sVar44;
            iVar34 = iVar34 + 1;
          } while (count != iVar34);
          return count;
        }
        return count;
      }
LAB_00b3a3eb:
      if (count != 0 && false_sel.ptr != (SelectionVector *)0x0) {
        psVar11 = (sel.ptr)->sel_vector;
        psVar12 = (false_sel.ptr)->sel_vector;
        iVar34 = 0;
        do {
          sVar44 = (sel_t)iVar34;
          if (psVar11 != (sel_t *)0x0) {
            sVar44 = psVar11[iVar34];
          }
          psVar12[iVar34] = sVar44;
          iVar34 = iVar34 + 1;
        } while (count != iVar34);
      }
      return (idx_t)(element_type *)0x0;
    }
    if ((VVar3 ^ CONSTANT_VECTOR) == FLAT_VECTOR && VVar4 == FLAT_VECTOR) {
      piVar45 = (int *)left->data;
      pdVar8 = right->data;
      _local_4a8 = (undefined1  [16])0x0;
      LStack_4a0.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      LStack_4a0.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
      puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar5 != (unsigned_long *)0x0) && ((*puVar5 & 1) == 0)) {
        local_2a8._0_8_ = 0x800;
        make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                  ((duckdb *)local_428,(unsigned_long *)&local_2a8);
        peVar29 = LStack_4a0.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        auVar18 = local_428;
        LStack_4a0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)LStack_420._0_8_;
        _local_428 = (undefined1  [16])0x0;
        LStack_4a0._0_8_ = auVar18;
        if (peVar29 != (element_type *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar29);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_);
        }
        pTVar25 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                            ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                             (local_4a8 + 8));
        _Var9.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
             (pTVar25->owned_data).
             super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
             super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
             super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
             super__Head_base<0UL,_unsigned_long_*,_false>;
        local_4a8 = (undefined1  [8])
                    _Var9.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
        *(undefined8 *)_Var9.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
             0xfffffffffffffffe;
      }
      FlatVector::VerifyFlatVector(right);
      local_488._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           LStack_4a0.type_info_.internal.
           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
        if (true_sel.ptr == (SelectionVector *)0x0) {
          if (count == 0) {
LAB_00b40c7c:
            lVar46 = 0;
          }
          else {
            psVar11 = (sel.ptr)->sel_vector;
            puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            psVar12 = (false_sel.ptr)->sel_vector;
            plVar53 = (long *)(pdVar8 + 8);
            lVar46 = 0;
            uVar47 = 0;
            do {
              uVar33 = uVar47;
              if (psVar11 != (sel_t *)0x0) {
                uVar33 = (ulong)psVar11[uVar47];
              }
              if (local_4a8 == (undefined1  [8])0x0) {
                bVar61 = false;
              }
              else {
                bVar61 = (*(byte *)local_4a8 & 1) == 0;
              }
              if (puVar5 == (unsigned_long *)0x0) {
                bVar62 = false;
              }
              else {
                bVar62 = (puVar5[uVar47 >> 6] >> (uVar47 & 0x3f) & 1) == 0;
              }
              if ((bVar61 | bVar62) == 1) {
                bVar61 = (bool)(bVar61 ^ bVar62);
              }
              else if (((*piVar45 == (int)plVar53[-1]) &&
                       (piVar45[1] == *(int *)((long)plVar53 + -4))) &&
                      (*(long *)(piVar45 + 2) == *plVar53)) {
                bVar61 = false;
              }
              else {
                lVar48 = (long)piVar45[1] + *(long *)(piVar45 + 2) / 86400000000;
                lVar59 = (long)*(int *)((long)plVar53 + -4) + *plVar53 / 86400000000;
                bVar61 = true;
                if (((long)*piVar45 + lVar48 / 0x1e == (long)(int)plVar53[-1] + lVar59 / 0x1e) &&
                   (lVar48 % 0x1e == lVar59 % 0x1e)) {
                  bVar61 = *(long *)(piVar45 + 2) % 86400000000 != *plVar53 % 86400000000;
                }
              }
              psVar12[lVar46] = (sel_t)uVar33;
              lVar46 = lVar46 + (ulong)(bVar61 ^ 1);
              uVar47 = uVar47 + 1;
              plVar53 = plVar53 + 2;
            } while (count != uVar47);
          }
          goto LAB_00b412d7;
        }
        if (count != 0) {
          local_438.ptr = (ValidityMask *)(sel.ptr)->sel_vector;
          puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          psVar11 = (true_sel.ptr)->sel_vector;
          plVar53 = (long *)(pdVar8 + 8);
          uVar47 = 0;
          local_4c8 = (element_type *)0x0;
          do {
            uVar33 = uVar47;
            if ((element_type *)local_438.ptr != (element_type *)0x0) {
              uVar33 = (ulong)*(uint *)((long)&((element_type *)local_438.ptr)->_vptr_ExtraTypeInfo
                                       + uVar47 * 4);
            }
            if (local_4a8 == (undefined1  [8])0x0) {
              bVar61 = false;
            }
            else {
              bVar61 = (*(byte *)local_4a8 & 1) == 0;
            }
            if (puVar5 == (unsigned_long *)0x0) {
              bVar62 = false;
            }
            else {
              bVar62 = (puVar5[uVar47 >> 6] >> (uVar47 & 0x3f) & 1) == 0;
            }
            if ((bVar61 | bVar62) == 1) {
              bVar61 = (bool)(bVar61 ^ bVar62);
            }
            else if (((*piVar45 == (int)plVar53[-1]) && (piVar45[1] == *(int *)((long)plVar53 + -4))
                     ) && (*(long *)(piVar45 + 2) == *plVar53)) {
              bVar61 = false;
            }
            else {
              lVar46 = (long)piVar45[1] + *(long *)(piVar45 + 2) / 86400000000;
              lVar48 = (long)*(int *)((long)plVar53 + -4) + *plVar53 / 86400000000;
              bVar61 = true;
              if (((long)*piVar45 + lVar46 / 0x1e == (long)(int)plVar53[-1] + lVar48 / 0x1e) &&
                 (lVar46 % 0x1e == lVar48 % 0x1e)) {
                bVar61 = *(long *)(piVar45 + 2) % 86400000000 != *plVar53 % 86400000000;
              }
            }
            psVar11[(long)local_4c8] = (sel_t)uVar33;
            local_4c8 = (element_type *)((long)&local_4c8->_vptr_ExtraTypeInfo + (ulong)bVar61);
            uVar47 = uVar47 + 1;
            plVar53 = plVar53 + 2;
          } while (count != uVar47);
          goto LAB_00b412e1;
        }
      }
      else if (count != 0) {
        local_438.ptr = (ValidityMask *)(sel.ptr)->sel_vector;
        puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        psVar11 = (true_sel.ptr)->sel_vector;
        psVar12 = (false_sel.ptr)->sel_vector;
        plVar53 = (long *)(pdVar8 + 8);
        lVar46 = 0;
        local_4c8 = (element_type *)0x0;
        uVar47 = 0;
        local_430 = (element_type *)local_4a8;
        do {
          uVar33 = uVar47;
          if ((element_type *)local_438.ptr != (element_type *)0x0) {
            uVar33 = (ulong)*(uint *)((long)&((element_type *)local_438.ptr)->_vptr_ExtraTypeInfo +
                                     uVar47 * 4);
          }
          if (local_4a8 == (undefined1  [8])0x0) {
            bVar61 = false;
          }
          else {
            bVar61 = (*(byte *)local_4a8 & 1) == 0;
          }
          if (puVar5 == (unsigned_long *)0x0) {
            bVar62 = false;
          }
          else {
            bVar62 = (puVar5[uVar47 >> 6] >> (uVar47 & 0x3f) & 1) == 0;
          }
          if ((bVar61 | bVar62) == 1) {
            bVar61 = (bool)(bVar61 ^ bVar62);
          }
          else if (((*piVar45 == (int)plVar53[-1]) && (piVar45[1] == *(int *)((long)plVar53 + -4)))
                  && (*(long *)(piVar45 + 2) == *plVar53)) {
            bVar61 = false;
          }
          else {
            lVar48 = (long)piVar45[1] + *(long *)(piVar45 + 2) / 86400000000;
            lVar59 = (long)*(int *)((long)plVar53 + -4) + *plVar53 / 86400000000;
            bVar61 = true;
            if (((long)*piVar45 + lVar48 / 0x1e == (long)(int)plVar53[-1] + lVar59 / 0x1e) &&
               (lVar48 % 0x1e == lVar59 % 0x1e)) {
              bVar61 = *(long *)(piVar45 + 2) % 86400000000 != *plVar53 % 86400000000;
            }
          }
          psVar11[(long)local_4c8] = (sel_t)uVar33;
          local_4c8 = (element_type *)((long)&local_4c8->_vptr_ExtraTypeInfo + (ulong)bVar61);
          psVar12[lVar46] = (sel_t)uVar33;
          lVar46 = lVar46 + (ulong)(bVar61 ^ 1);
          uVar47 = uVar47 + 1;
          plVar53 = plVar53 + 2;
        } while (count != uVar47);
        goto LAB_00b412e1;
      }
    }
    else {
      if ((VVar4 ^ CONSTANT_VECTOR) != FLAT_VECTOR || VVar3 != FLAT_VECTOR) {
        if (VVar3 == FLAT_VECTOR && VVar4 == FLAT_VECTOR) {
          pdVar8 = left->data;
          local_438.ptr = (ValidityMask *)right->data;
          FlatVector::VerifyFlatVector(left);
          FlatVector::VerifyFlatVector(right);
          if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
            if (count == 0) {
              return (idx_t)(element_type *)0x0;
            }
            psVar11 = (sel.ptr)->sel_vector;
            puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            puVar14 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            psVar12 = (true_sel.ptr)->sel_vector;
            psVar10 = (false_sel.ptr)->sel_vector;
            lVar48 = 8;
            lVar46 = 0;
            local_4c8 = (element_type *)0x0;
            uVar47 = 0;
            do {
              uVar33 = uVar47;
              if (psVar11 != (sel_t *)0x0) {
                uVar33 = (ulong)psVar11[uVar47];
              }
              if (puVar5 == (unsigned_long *)0x0) {
                bVar61 = false;
              }
              else {
                bVar61 = (puVar5[uVar47 >> 6] >> (uVar47 & 0x3f) & 1) == 0;
              }
              if (puVar14 == (unsigned_long *)0x0) {
                bVar62 = false;
              }
              else {
                bVar62 = (puVar14[uVar47 >> 6] >> (uVar47 & 0x3f) & 1) == 0;
              }
              if ((bVar61 | bVar62) == 1) {
                bVar61 = (bool)(bVar61 ^ bVar62);
              }
              else if (((*(int *)(pdVar8 + lVar48 + -8) ==
                         *(int *)((long)local_438.ptr + lVar48 + -8)) &&
                       (*(int *)(pdVar8 + lVar48 + -4) ==
                        *(int *)((long)local_438.ptr + lVar48 + -4))) &&
                      (*(long *)(pdVar8 + lVar48) == *(long *)((long)local_438.ptr + lVar48))) {
                bVar61 = false;
              }
              else {
                lVar59 = (long)*(int *)(pdVar8 + lVar48 + -4) +
                         *(long *)(pdVar8 + lVar48) / 86400000000;
                lVar50 = (long)*(int *)((long)local_438.ptr + lVar48 + -4) +
                         *(long *)((long)local_438.ptr + lVar48) / 86400000000;
                bVar61 = true;
                if (((long)*(int *)(pdVar8 + lVar48 + -8) + lVar59 / 0x1e ==
                     (long)*(int *)((long)local_438.ptr + lVar48 + -8) + lVar50 / 0x1e) &&
                   (lVar59 % 0x1e == lVar50 % 0x1e)) {
                  bVar61 = *(long *)(pdVar8 + lVar48) % 86400000000 !=
                           *(long *)((long)local_438.ptr + lVar48) % 86400000000;
                }
              }
              psVar12[(long)local_4c8] = (sel_t)uVar33;
              local_4c8 = (element_type *)((long)&local_4c8->_vptr_ExtraTypeInfo + (ulong)bVar61);
              psVar10[lVar46] = (sel_t)uVar33;
              lVar46 = lVar46 + (ulong)(bVar61 ^ 1);
              uVar47 = uVar47 + 1;
              lVar48 = lVar48 + 0x10;
            } while (count != uVar47);
            return (idx_t)local_4c8;
          }
          if (true_sel.ptr == (SelectionVector *)0x0) {
            if (count == 0) {
              lVar46 = 0;
            }
            else {
              psVar11 = (sel.ptr)->sel_vector;
              puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
              puVar14 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
              psVar12 = (false_sel.ptr)->sel_vector;
              lVar48 = 8;
              lVar46 = 0;
              uVar47 = 0;
              do {
                uVar33 = uVar47;
                if (psVar11 != (sel_t *)0x0) {
                  uVar33 = (ulong)psVar11[uVar47];
                }
                if (puVar5 == (unsigned_long *)0x0) {
                  bVar61 = false;
                }
                else {
                  bVar61 = (puVar5[uVar47 >> 6] >> (uVar47 & 0x3f) & 1) == 0;
                }
                if (puVar14 == (unsigned_long *)0x0) {
                  bVar62 = false;
                }
                else {
                  bVar62 = (puVar14[uVar47 >> 6] >> (uVar47 & 0x3f) & 1) == 0;
                }
                if ((bVar61 | bVar62) == 1) {
                  bVar61 = (bool)(bVar61 ^ bVar62);
                }
                else if (((*(int *)(pdVar8 + lVar48 + -8) ==
                           *(int *)((long)local_438.ptr + lVar48 + -8)) &&
                         (*(int *)(pdVar8 + lVar48 + -4) ==
                          *(int *)((long)local_438.ptr + lVar48 + -4))) &&
                        (*(long *)(pdVar8 + lVar48) == *(long *)((long)local_438.ptr + lVar48))) {
                  bVar61 = false;
                }
                else {
                  lVar59 = (long)*(int *)(pdVar8 + lVar48 + -4) +
                           *(long *)(pdVar8 + lVar48) / 86400000000;
                  lVar50 = (long)*(int *)((long)local_438.ptr + lVar48 + -4) +
                           *(long *)((long)local_438.ptr + lVar48) / 86400000000;
                  bVar61 = true;
                  if (((long)*(int *)(pdVar8 + lVar48 + -8) + lVar59 / 0x1e ==
                       (long)*(int *)((long)local_438.ptr + lVar48 + -8) + lVar50 / 0x1e) &&
                     (lVar59 % 0x1e == lVar50 % 0x1e)) {
                    bVar61 = *(long *)(pdVar8 + lVar48) % 86400000000 !=
                             *(long *)((long)local_438.ptr + lVar48) % 86400000000;
                  }
                }
                psVar12[lVar46] = (sel_t)uVar33;
                lVar46 = lVar46 + (ulong)(bVar61 ^ 1);
                uVar47 = uVar47 + 1;
                lVar48 = lVar48 + 0x10;
              } while (count != uVar47);
            }
            return (idx_t)(element_type *)(count - lVar46);
          }
          if (count == 0) {
            return (idx_t)(element_type *)0x0;
          }
          psVar11 = (sel.ptr)->sel_vector;
          puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          puVar14 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          psVar12 = (true_sel.ptr)->sel_vector;
          lVar46 = 8;
          uVar47 = 0;
          local_4c8 = (element_type *)0x0;
          do {
            uVar33 = uVar47;
            if (psVar11 != (sel_t *)0x0) {
              uVar33 = (ulong)psVar11[uVar47];
            }
            if (puVar5 == (unsigned_long *)0x0) {
              bVar61 = false;
            }
            else {
              bVar61 = (puVar5[uVar47 >> 6] >> (uVar47 & 0x3f) & 1) == 0;
            }
            if (puVar14 == (unsigned_long *)0x0) {
              bVar62 = false;
            }
            else {
              bVar62 = (puVar14[uVar47 >> 6] >> (uVar47 & 0x3f) & 1) == 0;
            }
            if ((bVar61 | bVar62) == 1) {
              bVar61 = (bool)(bVar61 ^ bVar62);
            }
            else if (((*(int *)(pdVar8 + lVar46 + -8) == *(int *)((long)local_438.ptr + lVar46 + -8)
                      ) && (*(int *)(pdVar8 + lVar46 + -4) ==
                            *(int *)((long)local_438.ptr + lVar46 + -4))) &&
                    (*(long *)(pdVar8 + lVar46) == *(long *)((long)local_438.ptr + lVar46))) {
              bVar61 = false;
            }
            else {
              lVar48 = (long)*(int *)(pdVar8 + lVar46 + -4) +
                       *(long *)(pdVar8 + lVar46) / 86400000000;
              lVar59 = (long)*(int *)((long)local_438.ptr + lVar46 + -4) +
                       *(long *)((long)local_438.ptr + lVar46) / 86400000000;
              bVar61 = true;
              if (((long)*(int *)(pdVar8 + lVar46 + -8) + lVar48 / 0x1e ==
                   (long)*(int *)((long)local_438.ptr + lVar46 + -8) + lVar59 / 0x1e) &&
                 (lVar48 % 0x1e == lVar59 % 0x1e)) {
                bVar61 = *(long *)(pdVar8 + lVar46) % 86400000000 !=
                         *(long *)((long)local_438.ptr + lVar46) % 86400000000;
              }
            }
            psVar12[(long)local_4c8] = (sel_t)uVar33;
            local_4c8 = (element_type *)((long)&local_4c8->_vptr_ExtraTypeInfo + (ulong)bVar61);
            uVar47 = uVar47 + 1;
            lVar46 = lVar46 + 0x10;
          } while (count != uVar47);
          return (idx_t)local_4c8;
        }
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_4a8);
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_428);
        Vector::ToUnifiedFormat(left,count,(UnifiedVectorFormat *)local_4a8);
        Vector::ToUnifiedFormat(right,count,(UnifiedVectorFormat *)local_428);
        if (LStack_4a0.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0 &&
            LStack_420.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
            if (true_sel.ptr == (SelectionVector *)0x0) {
              if (count == 0) {
                local_4c8 = (element_type *)0x0;
              }
              else {
                psVar11 = (sel.ptr)->sel_vector;
                lVar46 = *(long *)local_4a8;
                psVar12 = *(sel_t **)local_428;
                local_4c8 = (element_type *)0x0;
                uVar47 = 0;
                do {
                  uVar33 = uVar47;
                  if (psVar11 != (sel_t *)0x0) {
                    uVar33 = (ulong)psVar11[uVar47];
                  }
                  uVar60 = uVar47;
                  if (lVar46 != 0) {
                    uVar60 = (ulong)*(uint *)(lVar46 + uVar47 * 4);
                  }
                  uVar31 = uVar47;
                  if (psVar12 != (sel_t *)0x0) {
                    uVar31 = (ulong)psVar12[uVar47];
                  }
                  lVar48 = uVar31 * 0x10;
                  if (((*(int *)(LStack_4a0._0_8_ + uVar60 * 0x10) ==
                        *(int *)(LStack_420._0_8_ + lVar48)) &&
                      (*(int *)(LStack_4a0._0_8_ + uVar60 * 0x10 + 4) ==
                       *(int *)(LStack_420._0_8_ + lVar48 + 4))) &&
                     (*(long *)(LStack_4a0._0_8_ + (uVar60 * 2 + 1) * 8) ==
                      *(long *)(LStack_420._0_8_ + lVar48 + 8))) {
LAB_00b43724:
                    (false_sel.ptr)->sel_vector[(long)local_4c8] = (sel_t)uVar33;
                    local_4c8 = (element_type *)((long)local_4c8 + 1);
                  }
                  else {
                    lVar59 = (long)*(int *)(LStack_4a0._0_8_ + uVar60 * 0x10 + 4) +
                             *(long *)(LStack_4a0._0_8_ + (uVar60 * 2 + 1) * 8) / 86400000000;
                    lVar50 = (long)*(int *)(LStack_420._0_8_ + lVar48 + 4) +
                             *(long *)(LStack_420._0_8_ + lVar48 + 8) / 86400000000;
                    if ((((long)*(int *)(LStack_4a0._0_8_ + uVar60 * 0x10) + lVar59 / 0x1e ==
                          (long)*(int *)(LStack_420._0_8_ + lVar48) + lVar50 / 0x1e) &&
                        (lVar59 % 0x1e == lVar50 % 0x1e)) &&
                       (*(long *)(LStack_4a0._0_8_ + (uVar60 * 2 + 1) * 8) % 86400000000 ==
                        *(long *)(LStack_420._0_8_ + lVar48 + 8) % 86400000000)) goto LAB_00b43724;
                  }
                  uVar47 = uVar47 + 1;
                } while (count != uVar47);
              }
              local_4c8 = (element_type *)(count - (long)local_4c8);
            }
            else {
              if (count == 0) goto LAB_00b4271b;
              psVar11 = (sel.ptr)->sel_vector;
              lVar46 = *(long *)local_4a8;
              psVar12 = *(sel_t **)local_428;
              uVar47 = 0;
              local_4c8 = (element_type *)0x0;
              do {
                uVar33 = uVar47;
                if (psVar11 != (sel_t *)0x0) {
                  uVar33 = (ulong)psVar11[uVar47];
                }
                uVar60 = uVar47;
                if (lVar46 != 0) {
                  uVar60 = (ulong)*(uint *)(lVar46 + uVar47 * 4);
                }
                uVar31 = uVar47;
                if (psVar12 != (sel_t *)0x0) {
                  uVar31 = (ulong)psVar12[uVar47];
                }
                lVar48 = uVar31 * 0x10;
                if (((*(int *)(LStack_4a0._0_8_ + uVar60 * 0x10) !=
                      *(int *)(LStack_420._0_8_ + lVar48)) ||
                    (*(int *)(LStack_4a0._0_8_ + uVar60 * 0x10 + 4) !=
                     *(int *)(LStack_420._0_8_ + lVar48 + 4))) ||
                   (*(long *)(LStack_4a0._0_8_ + (uVar60 * 2 + 1) * 8) !=
                    *(long *)(LStack_420._0_8_ + lVar48 + 8))) {
                  lVar59 = (long)*(int *)(LStack_4a0._0_8_ + uVar60 * 0x10 + 4) +
                           *(long *)(LStack_4a0._0_8_ + (uVar60 * 2 + 1) * 8) / 86400000000;
                  lVar50 = (long)*(int *)(LStack_420._0_8_ + lVar48 + 4) +
                           *(long *)(LStack_420._0_8_ + lVar48 + 8) / 86400000000;
                  if ((((long)*(int *)(LStack_4a0._0_8_ + uVar60 * 0x10) + lVar59 / 0x1e !=
                        (long)*(int *)(LStack_420._0_8_ + lVar48) + lVar50 / 0x1e) ||
                      (lVar59 % 0x1e != lVar50 % 0x1e)) ||
                     (*(long *)(LStack_4a0._0_8_ + (uVar60 * 2 + 1) * 8) % 86400000000 !=
                      *(long *)(LStack_420._0_8_ + lVar48 + 8) % 86400000000)) {
                    (true_sel.ptr)->sel_vector[(long)local_4c8] = (sel_t)uVar33;
                    local_4c8 = (element_type *)((long)&local_4c8->_vptr_ExtraTypeInfo + 1);
                  }
                }
                uVar47 = uVar47 + 1;
              } while (count != uVar47);
            }
          }
          else {
            if (count == 0) goto LAB_00b4271b;
            local_438.ptr = (ValidityMask *)(sel.ptr)->sel_vector;
            lVar46 = *(long *)local_4a8;
            psVar11 = *(sel_t **)local_428;
            local_430 = (element_type *)0x0;
            local_4c8 = (element_type *)0x0;
            uVar47 = 0;
            do {
              uVar33 = uVar47;
              if ((element_type *)local_438.ptr != (element_type *)0x0) {
                uVar33 = (ulong)*(uint *)((long)&((element_type *)local_438.ptr)->
                                                 _vptr_ExtraTypeInfo + uVar47 * 4);
              }
              uVar60 = uVar47;
              if (lVar46 != 0) {
                uVar60 = (ulong)*(uint *)(lVar46 + uVar47 * 4);
              }
              uVar31 = uVar47;
              if (psVar11 != (sel_t *)0x0) {
                uVar31 = (ulong)psVar11[uVar47];
              }
              lVar48 = uVar31 * 0x10;
              if (((*(int *)(LStack_4a0._0_8_ + uVar60 * 0x10) ==
                    *(int *)(LStack_420._0_8_ + lVar48)) &&
                  (*(int *)(LStack_4a0._0_8_ + uVar60 * 0x10 + 4) ==
                   *(int *)(LStack_420._0_8_ + lVar48 + 4))) &&
                 (*(long *)(LStack_4a0._0_8_ + (uVar60 * 2 + 1) * 8) ==
                  *(long *)(LStack_420._0_8_ + lVar48 + 8))) {
LAB_00b3cb50:
                peVar29 = local_430;
                oVar32.ptr = false_sel.ptr;
                local_430 = (element_type *)((long)&local_430->_vptr_ExtraTypeInfo + 1);
              }
              else {
                lVar59 = (long)*(int *)(LStack_4a0._0_8_ + uVar60 * 0x10 + 4) +
                         *(long *)(LStack_4a0._0_8_ + (uVar60 * 2 + 1) * 8) / 86400000000;
                lVar50 = (long)*(int *)(LStack_420._0_8_ + lVar48 + 4) +
                         *(long *)(LStack_420._0_8_ + lVar48 + 8) / 86400000000;
                if ((((long)*(int *)(LStack_4a0._0_8_ + uVar60 * 0x10) + lVar59 / 0x1e ==
                      (long)*(int *)(LStack_420._0_8_ + lVar48) + lVar50 / 0x1e) &&
                    (lVar59 % 0x1e == lVar50 % 0x1e)) &&
                   (*(long *)(LStack_4a0._0_8_ + (uVar60 * 2 + 1) * 8) % 86400000000 ==
                    *(long *)(LStack_420._0_8_ + lVar48 + 8) % 86400000000)) goto LAB_00b3cb50;
                peVar29 = local_4c8;
                oVar32.ptr = true_sel.ptr;
                local_4c8 = (element_type *)((long)&local_4c8->_vptr_ExtraTypeInfo + 1);
              }
              (oVar32.ptr)->sel_vector[(long)peVar29] = (sel_t)uVar33;
              uVar47 = uVar47 + 1;
            } while (count != uVar47);
          }
        }
        else {
          local_438.ptr =
               (ValidityMask *)
               LStack_4a0.type_info_.internal.
               super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          local_430 = LStack_420.type_info_.internal.
                      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
            if (true_sel.ptr == (SelectionVector *)0x0) {
              if (count == 0) {
                lVar46 = 0;
              }
              else {
                psVar11 = (sel.ptr)->sel_vector;
                lVar48 = *(long *)local_4a8;
                psVar12 = *(sel_t **)local_428;
                lVar46 = 0;
                iVar34 = 0;
                do {
                  iVar23 = iVar34;
                  if (psVar11 != (sel_t *)0x0) {
                    iVar23 = (idx_t)psVar11[iVar34];
                  }
                  iVar28 = iVar34;
                  if (lVar48 != 0) {
                    iVar28 = (idx_t)*(uint *)(lVar48 + iVar34 * 4);
                  }
                  iVar35 = iVar34;
                  if (psVar12 != (sel_t *)0x0) {
                    iVar35 = (idx_t)psVar12[iVar34];
                  }
                  if (LStack_4a0.type_info_.internal.
                      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                      == (element_type *)0x0) {
                    bVar61 = false;
                  }
                  else {
                    bVar61 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                               super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                               ._M_ptr + (iVar28 >> 6) * 8) >> (iVar28 & 0x3f) & 1)
                             == 0;
                  }
                  if (LStack_420.type_info_.internal.
                      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                      == (element_type *)0x0) {
                    bVar62 = false;
                  }
                  else {
                    bVar62 = ((ulong)(&(LStack_420.type_info_.internal.
                                        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr)->_vptr_ExtraTypeInfo)[iVar35 >> 6] >>
                              (iVar35 & 0x3f) & 1) == 0;
                  }
                  if ((bool)(bVar61 | bVar62)) {
                    bVar61 = (bool)(bVar61 ^ bVar62);
LAB_00b43914:
                    if (!bVar61) {
LAB_00b43918:
                      (false_sel.ptr)->sel_vector[lVar46] = (sel_t)iVar23;
                      lVar46 = lVar46 + 1;
                    }
                  }
                  else {
                    piVar45 = (int *)(LStack_4a0._0_8_ + iVar28 * 0x10);
                    piVar51 = (int *)(LStack_420._0_8_ + iVar35 * 0x10);
                    if (((*piVar45 == *piVar51) && (piVar45[1] == piVar51[1])) &&
                       (*(long *)(piVar45 + 2) == *(long *)(piVar51 + 2))) goto LAB_00b43918;
                    lVar59 = (long)piVar45[1] + *(long *)(piVar45 + 2) / 86400000000;
                    lVar50 = (long)piVar51[1] + *(long *)(piVar51 + 2) / 86400000000;
                    if (((long)*piVar45 + lVar59 / 0x1e == (long)*piVar51 + lVar50 / 0x1e) &&
                       (lVar59 % 0x1e == lVar50 % 0x1e)) {
                      bVar61 = *(long *)(piVar45 + 2) % 86400000000 !=
                               *(long *)(piVar51 + 2) % 86400000000;
                      goto LAB_00b43914;
                    }
                  }
                  iVar34 = iVar34 + 1;
                } while (count != iVar34);
              }
              local_4c8 = (element_type *)(count - lVar46);
            }
            else {
              if (count == 0) goto LAB_00b4271b;
              psVar11 = (sel.ptr)->sel_vector;
              lVar46 = *(long *)local_4a8;
              psVar12 = *(sel_t **)local_428;
              iVar34 = 0;
              local_4c8 = (element_type *)0x0;
              do {
                iVar23 = iVar34;
                if (psVar11 != (sel_t *)0x0) {
                  iVar23 = (idx_t)psVar11[iVar34];
                }
                iVar28 = iVar34;
                if (lVar46 != 0) {
                  iVar28 = (idx_t)*(uint *)(lVar46 + iVar34 * 4);
                }
                iVar35 = iVar34;
                if (psVar12 != (sel_t *)0x0) {
                  iVar35 = (idx_t)psVar12[iVar34];
                }
                if (LStack_4a0.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                    (element_type *)0x0) {
                  bVar61 = false;
                }
                else {
                  bVar61 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                             ._M_ptr + (iVar28 >> 6) * 8) >> (iVar28 & 0x3f) & 1) ==
                           0;
                }
                if (LStack_420.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                    (element_type *)0x0) {
                  bVar62 = false;
                }
                else {
                  bVar62 = ((ulong)(&(LStack_420.type_info_.internal.
                                      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr)->_vptr_ExtraTypeInfo)[iVar35 >> 6] >> (iVar35 & 0x3f)
                           & 1) == 0;
                }
                if ((bool)(bVar61 | bVar62)) {
                  bVar61 = (bool)(bVar61 ^ bVar62);
LAB_00b418a8:
                  if (bVar61) {
LAB_00b418ac:
                    (true_sel.ptr)->sel_vector[(long)local_4c8] = (sel_t)iVar23;
                    local_4c8 = (element_type *)((long)&local_4c8->_vptr_ExtraTypeInfo + 1);
                  }
                }
                else {
                  piVar45 = (int *)(LStack_4a0._0_8_ + iVar28 * 0x10);
                  piVar51 = (int *)(LStack_420._0_8_ + iVar35 * 0x10);
                  if (((*piVar45 != *piVar51) || (piVar45[1] != piVar51[1])) ||
                     (*(long *)(piVar45 + 2) != *(long *)(piVar51 + 2))) {
                    lVar48 = (long)piVar45[1] + *(long *)(piVar45 + 2) / 86400000000;
                    lVar59 = (long)piVar51[1] + *(long *)(piVar51 + 2) / 86400000000;
                    if (((long)*piVar45 + lVar48 / 0x1e == (long)*piVar51 + lVar59 / 0x1e) &&
                       (lVar48 % 0x1e == lVar59 % 0x1e)) {
                      bVar61 = *(long *)(piVar45 + 2) % 86400000000 !=
                               *(long *)(piVar51 + 2) % 86400000000;
                      goto LAB_00b418a8;
                    }
                    goto LAB_00b418ac;
                  }
                }
                iVar34 = iVar34 + 1;
              } while (count != iVar34);
            }
          }
          else {
            if (count == 0) goto LAB_00b4271b;
            psVar11 = (sel.ptr)->sel_vector;
            lVar46 = *(long *)local_4a8;
            psVar12 = *(sel_t **)local_428;
            local_3b8 = (element_type *)0x0;
            local_4c8 = (element_type *)0x0;
            iVar34 = 0;
            do {
              iVar23 = iVar34;
              if (psVar11 != (sel_t *)0x0) {
                iVar23 = (idx_t)psVar11[iVar34];
              }
              iVar28 = iVar34;
              if (lVar46 != 0) {
                iVar28 = (idx_t)*(uint *)(lVar46 + iVar34 * 4);
              }
              iVar35 = iVar34;
              if (psVar12 != (sel_t *)0x0) {
                iVar35 = (idx_t)psVar12[iVar34];
              }
              if (LStack_4a0.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                  (element_type *)0x0) {
                bVar61 = false;
              }
              else {
                bVar61 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_ptr + (iVar28 >> 6) * 8) >> (iVar28 & 0x3f) & 1) == 0
                ;
              }
              if (LStack_420.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                  (element_type *)0x0) {
                bVar62 = false;
              }
              else {
                bVar62 = ((ulong)(&(LStack_420.type_info_.internal.
                                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr)->_vptr_ExtraTypeInfo)[iVar35 >> 6] >> (iVar35 & 0x3f) &
                         1) == 0;
              }
              if ((bool)(bVar61 | bVar62)) {
                bVar61 = (bool)(bVar61 ^ bVar62);
LAB_00b3fbef:
                if (bVar61) goto LAB_00b3fbf3;
LAB_00b3fc0b:
                peVar29 = local_3b8;
                oVar32.ptr = false_sel.ptr;
                local_3b8 = (element_type *)((long)&local_3b8->_vptr_ExtraTypeInfo + 1);
              }
              else {
                piVar45 = (int *)(LStack_4a0._0_8_ + iVar28 * 0x10);
                piVar51 = (int *)(LStack_420._0_8_ + iVar35 * 0x10);
                if (((*piVar45 == *piVar51) && (piVar45[1] == piVar51[1])) &&
                   (*(long *)(piVar45 + 2) == *(long *)(piVar51 + 2))) goto LAB_00b3fc0b;
                local_138 = *(long *)(piVar45 + 2);
                lVar48 = (long)piVar45[1] + local_138 / 86400000000;
                lVar59 = (long)piVar51[1] + *(long *)(piVar51 + 2) / 86400000000;
                if (((long)*piVar45 + lVar48 / 0x1e == (long)*piVar51 + lVar59 / 0x1e) &&
                   (lVar48 % 0x1e == lVar59 % 0x1e)) {
                  bVar61 = local_138 % 86400000000 != *(long *)(piVar51 + 2) % 86400000000;
                  goto LAB_00b3fbef;
                }
LAB_00b3fbf3:
                peVar29 = local_4c8;
                oVar32.ptr = true_sel.ptr;
                local_4c8 = (element_type *)((long)&local_4c8->_vptr_ExtraTypeInfo + 1);
              }
              (oVar32.ptr)->sel_vector[(long)peVar29] = (sel_t)iVar23;
              iVar34 = iVar34 + 1;
            } while (count != iVar34);
          }
        }
        goto LAB_00b44626;
      }
      pdVar8 = left->data;
      piVar45 = (int *)right->data;
      _local_4a8 = (undefined1  [16])0x0;
      LStack_4a0.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      LStack_4a0.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
      puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar5 != (unsigned_long *)0x0) && ((*puVar5 & 1) == 0)) {
        local_2a8._0_8_ = 0x800;
        make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                  ((duckdb *)local_428,(unsigned_long *)&local_2a8);
        peVar29 = LStack_4a0.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        auVar18 = local_428;
        LStack_4a0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)LStack_420._0_8_;
        _local_428 = (undefined1  [16])0x0;
        LStack_4a0._0_8_ = auVar18;
        if (peVar29 != (element_type *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar29);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_);
        }
        pTVar25 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                            ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                             (local_4a8 + 8));
        _Var9.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
             (pTVar25->owned_data).
             super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
             super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
             super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
             super__Head_base<0UL,_unsigned_long_*,_false>;
        local_4a8 = (undefined1  [8])
                    _Var9.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
        *(undefined8 *)_Var9.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
             0xfffffffffffffffe;
      }
      FlatVector::VerifyFlatVector(left);
      local_488._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           LStack_4a0.type_info_.internal.
           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
        if (true_sel.ptr == (SelectionVector *)0x0) {
          if (count == 0) goto LAB_00b40c7c;
          psVar11 = (sel.ptr)->sel_vector;
          puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          psVar12 = (false_sel.ptr)->sel_vector;
          plVar53 = (long *)(pdVar8 + 8);
          lVar46 = 0;
          uVar47 = 0;
          do {
            uVar33 = uVar47;
            if (psVar11 != (sel_t *)0x0) {
              uVar33 = (ulong)psVar11[uVar47];
            }
            if (puVar5 == (unsigned_long *)0x0) {
              bVar61 = false;
            }
            else {
              bVar61 = (puVar5[uVar47 >> 6] >> (uVar47 & 0x3f) & 1) == 0;
            }
            if (local_4a8 == (undefined1  [8])0x0) {
              bVar62 = false;
            }
            else {
              bVar62 = (*(byte *)local_4a8 & 1) == 0;
            }
            if ((bVar61 | bVar62) == 1) {
              bVar61 = (bool)(bVar61 ^ bVar62);
            }
            else if ((((int)plVar53[-1] == *piVar45) && (*(int *)((long)plVar53 + -4) == piVar45[1])
                     ) && (*plVar53 == *(long *)(piVar45 + 2))) {
              bVar61 = false;
            }
            else {
              lVar48 = (long)*(int *)((long)plVar53 + -4) + *plVar53 / 86400000000;
              lVar59 = (long)piVar45[1] + *(long *)(piVar45 + 2) / 86400000000;
              bVar61 = true;
              if (((long)(int)plVar53[-1] + lVar48 / 0x1e == (long)*piVar45 + lVar59 / 0x1e) &&
                 (lVar48 % 0x1e == lVar59 % 0x1e)) {
                bVar61 = *plVar53 % 86400000000 != *(long *)(piVar45 + 2) % 86400000000;
              }
            }
            psVar12[lVar46] = (sel_t)uVar33;
            lVar46 = lVar46 + (ulong)(bVar61 ^ 1);
            uVar47 = uVar47 + 1;
            plVar53 = plVar53 + 2;
          } while (count != uVar47);
          goto LAB_00b412d7;
        }
        if (count != 0) {
          local_438.ptr = (ValidityMask *)(sel.ptr)->sel_vector;
          puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          psVar11 = (true_sel.ptr)->sel_vector;
          plVar53 = (long *)(pdVar8 + 8);
          uVar47 = 0;
          local_4c8 = (element_type *)0x0;
          do {
            uVar33 = uVar47;
            if ((element_type *)local_438.ptr != (element_type *)0x0) {
              uVar33 = (ulong)*(uint *)((long)&((element_type *)local_438.ptr)->_vptr_ExtraTypeInfo
                                       + uVar47 * 4);
            }
            if (puVar5 == (unsigned_long *)0x0) {
              bVar61 = false;
            }
            else {
              bVar61 = (puVar5[uVar47 >> 6] >> (uVar47 & 0x3f) & 1) == 0;
            }
            if (local_4a8 == (undefined1  [8])0x0) {
              bVar62 = false;
            }
            else {
              bVar62 = (*(byte *)local_4a8 & 1) == 0;
            }
            if ((bVar61 | bVar62) == 1) {
              bVar61 = (bool)(bVar61 ^ bVar62);
            }
            else if ((((int)plVar53[-1] == *piVar45) && (*(int *)((long)plVar53 + -4) == piVar45[1])
                     ) && (*plVar53 == *(long *)(piVar45 + 2))) {
              bVar61 = false;
            }
            else {
              lVar46 = (long)*(int *)((long)plVar53 + -4) + *plVar53 / 86400000000;
              lVar48 = (long)piVar45[1] + *(long *)(piVar45 + 2) / 86400000000;
              bVar61 = true;
              if (((long)(int)plVar53[-1] + lVar46 / 0x1e == (long)*piVar45 + lVar48 / 0x1e) &&
                 (lVar46 % 0x1e == lVar48 % 0x1e)) {
                bVar61 = *plVar53 % 86400000000 != *(long *)(piVar45 + 2) % 86400000000;
              }
            }
            psVar11[(long)local_4c8] = (sel_t)uVar33;
            local_4c8 = (element_type *)((long)&local_4c8->_vptr_ExtraTypeInfo + (ulong)bVar61);
            uVar47 = uVar47 + 1;
            plVar53 = plVar53 + 2;
          } while (count != uVar47);
          goto LAB_00b412e1;
        }
      }
      else if (count != 0) {
        local_438.ptr = (ValidityMask *)(sel.ptr)->sel_vector;
        local_430 = (element_type *)
                    (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        psVar11 = (true_sel.ptr)->sel_vector;
        psVar12 = (false_sel.ptr)->sel_vector;
        plVar53 = (long *)(pdVar8 + 8);
        lVar46 = 0;
        local_4c8 = (element_type *)0x0;
        uVar47 = 0;
        do {
          uVar33 = uVar47;
          if ((element_type *)local_438.ptr != (element_type *)0x0) {
            uVar33 = (ulong)*(uint *)((long)&((element_type *)local_438.ptr)->_vptr_ExtraTypeInfo +
                                     uVar47 * 4);
          }
          if (local_430 == (element_type *)0x0) {
            bVar61 = false;
          }
          else {
            bVar61 = ((ulong)(&local_430->_vptr_ExtraTypeInfo)[uVar47 >> 6] >> (uVar47 & 0x3f) & 1)
                     == 0;
          }
          if (local_4a8 == (undefined1  [8])0x0) {
            bVar62 = false;
          }
          else {
            bVar62 = (*(byte *)local_4a8 & 1) == 0;
          }
          if ((bVar61 | bVar62) == 1) {
            bVar61 = (bool)(bVar61 ^ bVar62);
          }
          else if ((((int)plVar53[-1] == *piVar45) && (*(int *)((long)plVar53 + -4) == piVar45[1]))
                  && (*plVar53 == *(long *)(piVar45 + 2))) {
            bVar61 = false;
          }
          else {
            lVar48 = (long)*(int *)((long)plVar53 + -4) + *plVar53 / 86400000000;
            lVar59 = (long)piVar45[1] + *(long *)(piVar45 + 2) / 86400000000;
            bVar61 = true;
            if (((long)(int)plVar53[-1] + lVar48 / 0x1e == (long)*piVar45 + lVar59 / 0x1e) &&
               (lVar48 % 0x1e == lVar59 % 0x1e)) {
              bVar61 = *plVar53 % 86400000000 != *(long *)(piVar45 + 2) % 86400000000;
            }
          }
          psVar11[(long)local_4c8] = (sel_t)uVar33;
          local_4c8 = (element_type *)((long)&local_4c8->_vptr_ExtraTypeInfo + (ulong)bVar61);
          psVar12[lVar46] = (sel_t)uVar33;
          lVar46 = lVar46 + (ulong)(bVar61 ^ 1);
          uVar47 = uVar47 + 1;
          plVar53 = plVar53 + 2;
        } while (count != uVar47);
        goto LAB_00b412e1;
      }
    }
LAB_00b3e25c:
    local_4c8 = (element_type *)0x0;
    local_488._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         LStack_4a0.type_info_.internal.
         super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
LAB_00b412e1:
    if ((element_type *)local_488._M_pi != (element_type *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_488._M_pi);
      return (idx_t)local_4c8;
    }
    return (idx_t)local_4c8;
  case LIST:
  case STRUCT:
  case ARRAY:
    local_240.ptr = false_sel.ptr;
    local_238.ptr = true_sel.ptr;
    local_230.ptr = sel.ptr;
    if (sel.ptr == (SelectionVector *)0x0) {
      local_230.ptr = FlatVector::IncrementalSelectionVector();
    }
    SelectionVector::SelectionVector(&local_118,count);
    OptionalSelection::OptionalSelection(&local_158,&local_118);
    SelectionVector::SelectionVector(&local_130,count);
    OptionalSelection::OptionalSelection(&local_1c8,&local_130);
    SelectionVector::SelectionVector((SelectionVector *)(local_368 + 0x28),count);
    Vector::Vector(&local_100,left);
    Vector::Vector(&local_98,right);
    optional_ptr<const_duckdb::SelectionVector,_true>::CheckValid(&local_230);
    oVar41.ptr = local_230.ptr;
    local_210.sel = (SelectionVector *)null_mask.ptr;
    UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_4a8);
    UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_428);
    Vector::ToUnifiedFormat(&local_100,count,(UnifiedVectorFormat *)local_4a8);
    Vector::ToUnifiedFormat(&local_98,count,(UnifiedVectorFormat *)local_428);
    if (LStack_420.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0 &&
        LStack_4a0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      if (count == 0) {
        local_4b8 = 0;
        uVar47 = 0;
      }
      else {
        psVar11 = (oVar41.ptr)->sel_vector;
        iVar34 = 0;
        do {
          sVar44 = (sel_t)iVar34;
          if (psVar11 != (sel_t *)0x0) {
            sVar44 = psVar11[iVar34];
          }
          *(sel_t *)(local_368._40_8_ + iVar34 * 4) = sVar44;
          iVar34 = iVar34 + 1;
        } while (count != iVar34);
        local_4b8 = 0;
        uVar47 = count;
      }
    }
    else {
      SelectionVector::SelectionVector((SelectionVector *)&local_2a8,count);
      if (count == 0) {
        local_4b8 = 0;
        lVar46 = 0;
        uVar47 = 0;
      }
      else {
        local_4b8 = 0;
        uVar47 = 0;
        uVar33 = 0;
        lVar46 = 0;
        do {
          psVar11 = (oVar41.ptr)->sel_vector;
          uVar60 = uVar33;
          if (psVar11 != (sel_t *)0x0) {
            uVar60 = (ulong)psVar11[uVar33];
          }
          uVar31 = uVar33;
          if (*(long *)local_4a8 != 0) {
            uVar31 = (ulong)*(uint *)(*(long *)local_4a8 + uVar33 * 4);
          }
          uVar21 = uVar33;
          if (*(sel_t **)local_428 != (sel_t *)0x0) {
            uVar21 = (ulong)(*(sel_t **)local_428)[uVar33];
          }
          if (LStack_4a0.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
              (element_type *)0x0) {
            bVar61 = false;
          }
          else {
            bVar61 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                       super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr + (uVar31 >> 6) * 8) >> (uVar31 & 0x3f) & 1) == 0;
          }
          if (LStack_420.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
              (element_type *)0x0) {
            bVar62 = false;
          }
          else {
            bVar62 = ((ulong)(&(LStack_420.type_info_.internal.
                                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr)->_vptr_ExtraTypeInfo)[uVar21 >> 6] >> (uVar21 & 0x3f) & 1)
                     == 0;
          }
          sVar44 = (sel_t)uVar60;
          if ((bVar61 | bVar62) == 1) {
            if (local_210.sel != (SelectionVector *)0x0) {
              optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                        ((optional_ptr<duckdb::ValidityMask,_true> *)&local_210);
              pSVar20 = local_210.sel;
              if (((TemplatedValidityMask<unsigned_long> *)&(local_210.sel)->sel_vector)->
                  validity_mask == (unsigned_long *)0x0) {
                local_1a8.sel = (SelectionVector *)local_210.sel[1].sel_vector;
                make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                          ((duckdb *)local_328,(unsigned_long *)&local_1a8);
                auVar18 = local_328;
                uVar17 = aLStack_320[0]._0_8_;
                _local_328 = (undefined1  [16])0x0;
                p_Var24 = (pSVar20->selection_data).internal.
                          super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi;
                (pSVar20->selection_data).internal.
                super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                     (element_type *)auVar18;
                (pSVar20->selection_data).internal.
                super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar17;
                if (p_Var24 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var24);
                }
                if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)aLStack_320[0]._0_8_ !=
                    (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)aLStack_320[0]._0_8_);
                }
                pTVar25 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                    ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>
                                      *)&pSVar20->selection_data);
                ((TemplatedValidityMask<unsigned_long> *)&pSVar20->sel_vector)->validity_mask =
                     (unsigned_long *)
                     (pTVar25->owned_data).
                     super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                     super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                     super__Head_base<0UL,_unsigned_long_*,_false>;
              }
              bVar15 = (byte)uVar60 & 0x3f;
              puVar1 = ((TemplatedValidityMask<unsigned_long> *)&pSVar20->sel_vector)->validity_mask
                       + (uVar60 >> 6);
              *puVar1 = *puVar1 & (-2L << bVar15 | 0xfffffffffffffffeU >> 0x40 - bVar15);
            }
            if (bVar61 == bVar62) {
              if (local_1c8.sel != (SelectionVector *)0x0) {
                (local_1c8.sel)->sel_vector[lVar46] = sVar44;
              }
              lVar46 = lVar46 + 1;
            }
            else {
              if (local_158.sel != (SelectionVector *)0x0) {
                (local_158.sel)->sel_vector[local_4b8] = sVar44;
              }
              local_4b8 = local_4b8 + 1;
            }
          }
          else {
            *(sel_t *)(local_2a8._0_8_ + uVar47 * 4) = (sel_t)uVar33;
            *(sel_t *)(local_368._40_8_ + uVar47 * 4) = sVar44;
            uVar47 = uVar47 + 1;
          }
          uVar33 = uVar33 + 1;
        } while (count != uVar33);
      }
      pSVar20 = local_158.sel;
      if (local_158.sel != (SelectionVector *)0x0) {
        psVar11 = (local_158.sel)->sel_vector;
        p_Var24 = ((local_158.sel)->selection_data).internal.
                  super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi;
        ((local_158.sel)->selection_data).internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2> =
             (__shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>)0x0;
        if (p_Var24 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var24);
        }
        pSVar20->sel_vector = psVar11 + local_4b8;
      }
      pSVar20 = local_1c8.sel;
      if (local_1c8.sel != (SelectionVector *)0x0) {
        psVar11 = (local_1c8.sel)->sel_vector;
        p_Var24 = ((local_1c8.sel)->selection_data).internal.
                  super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi;
        ((local_1c8.sel)->selection_data).internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2> =
             (__shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>)0x0;
        if (p_Var24 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var24);
        }
        pSVar20->sel_vector = psVar11 + lVar46;
      }
      if (uVar47 < count && uVar47 != 0) {
        Vector::Slice(&local_100,(SelectionVector *)&local_2a8,uVar47);
        Vector::Slice(&local_98,(SelectionVector *)&local_2a8,uVar47);
      }
      if (local_2a8.type.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_2a8.type.type_info_.internal.
                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      }
    }
    if (local_3e8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3e8._M_pi);
    }
    if (local_408._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_408._M_pi);
    }
    if (local_468._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_468._M_pi);
    }
    if (local_488._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_488._M_pi);
    }
    PVar2 = (left->type).physical_type_;
    if (PVar2 == LIST) {
      local_3c0 = (optional_ptr<duckdb::ValidityMask,_true>)
                  (optional_ptr<duckdb::ValidityMask,_true>)null_mask.ptr;
      if (uVar47 == 0) goto LAB_00b36015;
      SelectionVector::SelectionVector(&local_398,uVar47);
      SelectionVector::SelectionVector(&local_3b0,uVar47);
      pVVar22 = ListVector::GetEntry(&local_100);
      Vector::Vector((Vector *)local_4a8,pVVar22);
      pVVar22 = ListVector::GetEntry(&local_98);
      Vector::Vector((Vector *)local_428,pVVar22);
      iVar34 = ListVector::GetListSize(&local_100);
      Vector::Flatten((Vector *)local_4a8,iVar34);
      iVar34 = ListVector::GetListSize(&local_98);
      Vector::Flatten((Vector *)local_428,iVar34);
      Vector::Vector(&local_2a8,(Vector *)local_4a8,&local_398,uVar47);
      Vector::Vector((Vector *)local_328,(Vector *)local_428,&local_3b0,uVar47);
      UnifiedVectorFormat::UnifiedVectorFormat(&local_1a8);
      Vector::ToUnifiedFormat(&local_100,uVar47,&local_1a8);
      pdVar13 = local_1a8.data;
      UnifiedVectorFormat::UnifiedVectorFormat(&local_210);
      Vector::ToUnifiedFormat(&local_98,uVar47,&local_210);
      pdVar8 = local_210.data;
      SelectionVector::SelectionVector(&local_380,uVar47);
      auVar16 = _DAT_01352200;
      lVar46 = uVar47 - 1;
      auVar65._8_4_ = (int)lVar46;
      auVar65._0_8_ = lVar46;
      auVar65._12_4_ = (int)((ulong)lVar46 >> 0x20);
      uVar33 = 0;
      auVar65 = auVar65 ^ _DAT_01352200;
      auVar67 = _DAT_0135a310;
      do {
        auVar68 = auVar67 ^ auVar16;
        if ((bool)(~(auVar68._4_4_ == auVar65._4_4_ && auVar65._0_4_ < auVar68._0_4_ ||
                    auVar65._4_4_ < auVar68._4_4_) & 1)) {
          local_380.sel_vector[uVar33] = (sel_t)uVar33;
        }
        if ((auVar68._12_4_ != auVar65._12_4_ || auVar68._8_4_ <= auVar65._8_4_) &&
            auVar68._12_4_ <= auVar65._12_4_) {
          local_380.sel_vector[uVar33 + 1] = (sel_t)uVar33 + 1;
        }
        uVar33 = uVar33 + 2;
        lVar46 = auVar67._8_8_;
        auVar67._0_8_ = auVar67._0_8_ + 2;
        auVar67._8_8_ = lVar46 + 2;
      } while ((uVar47 + 1 & 0xfffffffffffffffe) != uVar33);
      SelectionVector::SelectionVector(&local_2c0,uVar47);
      SelectionVector::SelectionVector(&local_228,uVar47);
      local_368._0_16_ = (undefined1  [16])0x0;
      local_368._16_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_368._24_8_ = 0x800;
      if (local_3c0.ptr == (ValidityMask *)0x0) {
        local_438.ptr = (ValidityMask *)0x0;
      }
      else {
        optional_ptr<duckdb::ValidityMask,_true>::CheckValid(&local_3c0);
        iVar34 = ValidityMask::Capacity(local_3c0.ptr);
        uVar17 = local_368._16_8_;
        local_368._0_16_ = (undefined1  [16])0x0;
        local_368._16_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar17 !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar17);
        }
        local_438.ptr = (ValidityMask *)local_368;
        local_368._24_8_ = iVar34;
      }
      local_4c8 = (element_type *)0x0;
      lVar46 = 0;
      do {
        pSVar20 = local_158.sel;
        psVar11 = (local_1a8.sel)->sel_vector;
        uVar33 = 0;
        do {
          uVar60 = uVar33;
          if (local_380.sel_vector != (sel_t *)0x0) {
            uVar60 = (ulong)local_380.sel_vector[uVar33];
          }
          if (psVar11 != (sel_t *)0x0) {
            uVar60 = (ulong)psVar11[uVar60];
          }
          iVar36 = (int)lVar46;
          local_398.sel_vector[uVar33] = *(int *)((long)local_1a8.data + uVar60 * 2 * 8) + iVar36;
          uVar33 = uVar33 + 1;
        } while (uVar47 != uVar33);
        puVar5 = ((TemplatedValidityMask<unsigned_long> *)&(local_210.sel)->sel_vector)->
                 validity_mask;
        uVar33 = 0;
        do {
          uVar60 = uVar33;
          if (local_380.sel_vector != (sel_t *)0x0) {
            uVar60 = (ulong)local_380.sel_vector[uVar33];
          }
          if (puVar5 != (unsigned_long *)0x0) {
            uVar60 = (ulong)*(uint *)((long)puVar5 + uVar60 * 4);
          }
          *(int *)((long)&((TemplatedValidityMask<unsigned_long> *)local_3b0.sel_vector)->
                          validity_mask + uVar33 * 4) =
               *(int *)(local_210.data + uVar60 * 0x10) + iVar36;
          uVar33 = uVar33 + 1;
        } while (uVar47 != uVar33);
        uVar33 = 0;
        uVar60 = 0;
        lVar48 = 0;
        lVar59 = 0;
        do {
          uVar31 = uVar33;
          if (local_380.sel_vector != (sel_t *)0x0) {
            uVar31 = (ulong)local_380.sel_vector[uVar33];
          }
          uVar21 = uVar31;
          if (psVar11 != (sel_t *)0x0) {
            uVar21 = (ulong)psVar11[uVar31];
          }
          uVar49 = uVar31;
          if (puVar5 != (unsigned_long *)0x0) {
            uVar49 = (ulong)*(uint *)((long)puVar5 + uVar31 * 4);
          }
          if ((*(long *)((long)pdVar13 + (uVar21 * 2 + 1) * 8) == lVar46) ||
             (*(long *)(pdVar8 + uVar49 * 0x10 + 8) == lVar46)) {
            if (local_368._40_8_ != 0) {
              uVar31 = (ulong)*(uint *)(local_368._40_8_ + uVar31 * 4);
            }
            if (*(long *)((long)pdVar13 + (uVar21 * 2 + 1) * 8) ==
                *(long *)(pdVar8 + uVar49 * 0x10 + 8)) {
              if (local_1c8.sel != (SelectionVector *)0x0) {
                (local_1c8.sel)->sel_vector[lVar59] = (sel_t)uVar31;
              }
              lVar59 = lVar59 + 1;
            }
            else {
              if (local_158.sel != (SelectionVector *)0x0) {
                (local_158.sel)->sel_vector[lVar48] = (sel_t)uVar31;
              }
              lVar48 = lVar48 + 1;
            }
          }
          else {
            local_2c0.sel_vector[uVar60] = (sel_t)uVar31;
            uVar60 = uVar60 + 1;
          }
          uVar33 = uVar33 + 1;
        } while (uVar47 != uVar33);
        if (local_158.sel != (SelectionVector *)0x0) {
          psVar11 = (local_158.sel)->sel_vector;
          p_Var24 = ((local_158.sel)->selection_data).internal.
                    super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
          ((local_158.sel)->selection_data).internal.
          super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2> =
               (__shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>)0x0;
          if (p_Var24 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var24);
          }
          pSVar20->sel_vector = psVar11 + lVar48;
        }
        pSVar20 = local_1c8.sel;
        if (local_1c8.sel != (SelectionVector *)0x0) {
          psVar11 = (local_1c8.sel)->sel_vector;
          p_Var24 = ((local_1c8.sel)->selection_data).internal.
                    super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
          ((local_1c8.sel)->selection_data).internal.
          super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2> =
               (__shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>)0x0;
          if (p_Var24 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var24);
          }
          pSVar20->sel_vector = psVar11 + lVar59;
        }
        oVar42.ptr = local_438.ptr;
        if (uVar60 < uVar47) {
          if (uVar60 != 0) {
            uVar47 = 0;
            do {
              sVar44 = (sel_t)uVar47;
              if (local_2c0.sel_vector != (sel_t *)0x0) {
                sVar44 = local_2c0.sel_vector[uVar47];
              }
              local_380.sel_vector[uVar47] = sVar44;
              uVar47 = uVar47 + 1;
            } while (uVar60 != uVar47);
          }
          if (uVar60 != 0) {
            psVar11 = (local_1a8.sel)->sel_vector;
            uVar47 = 0;
            do {
              uVar33 = uVar47;
              if (local_380.sel_vector != (sel_t *)0x0) {
                uVar33 = (ulong)local_380.sel_vector[uVar47];
              }
              if (psVar11 != (sel_t *)0x0) {
                uVar33 = (ulong)psVar11[uVar33];
              }
              local_398.sel_vector[uVar47] =
                   *(int *)((long)local_1a8.data + uVar33 * 2 * 8) + iVar36;
              uVar47 = uVar47 + 1;
            } while (uVar60 != uVar47);
          }
          uVar47 = uVar60;
          if (uVar60 != 0) {
            puVar5 = ((TemplatedValidityMask<unsigned_long> *)&(local_210.sel)->sel_vector)->
                     validity_mask;
            uVar33 = 0;
            do {
              uVar31 = uVar33;
              if (local_380.sel_vector != (sel_t *)0x0) {
                uVar31 = (ulong)local_380.sel_vector[uVar33];
              }
              if (puVar5 != (unsigned_long *)0x0) {
                uVar31 = (ulong)*(uint *)((long)puVar5 + uVar31 * 4);
              }
              *(int *)((long)&((TemplatedValidityMask<unsigned_long> *)local_3b0.sel_vector)->
                              validity_mask + uVar33 * 4) =
                   *(int *)(local_210.data + uVar31 * 0x10) + iVar36;
              uVar33 = uVar33 + 1;
            } while (uVar60 != uVar33);
          }
        }
        iVar34 = TemplatedDistinctSelectOperation<duckdb::DistinctFrom>
                           (&local_2a8,(Vector *)local_328,&local_380,uVar47,&local_2c0,&local_228,
                            local_438);
        ExtractNestedMask(&local_380,uVar47,(SelectionVector *)(local_368 + 0x28),oVar42.ptr,
                          local_3c0);
        local_4c8 = (element_type *)((long)local_4c8 + lVar48);
        if (iVar34 != 0) {
          oVar41.ptr = &local_2c0;
          if (uVar47 == iVar34) {
            oVar41.ptr = &local_380;
          }
          ExtractNestedSelection(oVar41.ptr,iVar34,(SelectionVector *)(local_368 + 0x28),&local_158)
          ;
          uVar47 = uVar47 - iVar34;
          if (uVar47 != 0) {
            uVar33 = 0;
            do {
              sVar44 = (sel_t)uVar33;
              if (local_228.sel_vector != (sel_t *)0x0) {
                sVar44 = local_228.sel_vector[uVar33];
              }
              local_380.sel_vector[uVar33] = sVar44;
              uVar33 = uVar33 + 1;
            } while (uVar47 != uVar33);
          }
          if (uVar47 != 0) {
            psVar11 = (local_1a8.sel)->sel_vector;
            uVar33 = 0;
            do {
              uVar60 = uVar33;
              if (local_380.sel_vector != (sel_t *)0x0) {
                uVar60 = (ulong)local_380.sel_vector[uVar33];
              }
              if (psVar11 != (sel_t *)0x0) {
                uVar60 = (ulong)psVar11[uVar60];
              }
              local_398.sel_vector[uVar33] =
                   *(int *)((long)local_1a8.data + uVar60 * 2 * 8) + iVar36;
              uVar33 = uVar33 + 1;
            } while (uVar47 != uVar33);
          }
          local_4c8 = (element_type *)((long)local_4c8 + iVar34);
          if (uVar47 != 0) {
            puVar5 = ((TemplatedValidityMask<unsigned_long> *)&(local_210.sel)->sel_vector)->
                     validity_mask;
            uVar33 = 0;
            do {
              uVar60 = uVar33;
              if (local_380.sel_vector != (sel_t *)0x0) {
                uVar60 = (ulong)local_380.sel_vector[uVar33];
              }
              if (puVar5 != (unsigned_long *)0x0) {
                uVar60 = (ulong)*(uint *)((long)puVar5 + uVar60 * 4);
              }
              *(int *)((long)&((TemplatedValidityMask<unsigned_long> *)local_3b0.sel_vector)->
                              validity_mask + uVar33 * 4) =
                   *(int *)(local_210.data + uVar60 * 0x10) + iVar36;
              uVar33 = uVar33 + 1;
            } while (uVar47 != uVar33);
          }
        }
        ExtractNestedMask(&local_380,uVar47,(SelectionVector *)(local_368 + 0x28),oVar42.ptr,
                          local_3c0);
        pSVar20 = local_1c8.sel;
        if (local_1c8.sel != (SelectionVector *)0x0) {
          psVar11 = (local_1c8.sel)->sel_vector;
          p_Var24 = ((local_1c8.sel)->selection_data).internal.
                    super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
          ((local_1c8.sel)->selection_data).internal.
          super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2> =
               (__shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>)0x0;
          if (p_Var24 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var24);
          }
          pSVar20->sel_vector = psVar11;
        }
        lVar46 = lVar46 + 1;
      } while (uVar47 != 0);
LAB_00b39e8f:
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_368._16_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_368._16_8_);
      }
      if (local_228.selection_data.internal.
          super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_228.selection_data.internal.
                   super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi);
      }
      if (local_2c0.selection_data.internal.
          super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_2c0.selection_data.internal.
                   super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi);
      }
      if (local_380.selection_data.internal.
          super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_380.selection_data.internal.
                   super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi);
      }
      if (local_210.owned_sel.selection_data.internal.
          super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_210.owned_sel.selection_data.internal.
                   super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi);
      }
      if (local_210.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_210.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
                   internal.
                   super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      if (local_1a8.owned_sel.selection_data.internal.
          super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_1a8.owned_sel.selection_data.internal.
                   super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi);
      }
      if (local_1a8.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_1a8.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
                   internal.
                   super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      if (local_2c8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_2c8._M_pi);
      }
      if (local_2d8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_2d8._M_pi);
      }
      if (local_2f0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_2f0._M_pi);
      }
      LogicalType::~LogicalType((LogicalType *)(local_328 + 8));
      if (local_2a8.auxiliary.internal.
          super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_2a8.auxiliary.internal.
                   super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi);
      }
      if (local_2a8.buffer.internal.
          super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_2a8.buffer.internal.
                   super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi);
      }
      if (local_2a8.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_2a8.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
                   internal.
                   super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      LogicalType::~LogicalType((LogicalType *)((long)&local_2a8 + 8));
      if (local_3c8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3c8._M_pi);
      }
      if (local_3d8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3d8._M_pi);
      }
      if (local_3f0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3f0._M_pi);
      }
      LogicalType::~LogicalType((LogicalType *)(local_428 + 8));
      if (local_448._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_448._M_pi);
      }
      if (local_458._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_458._M_pi);
      }
      if (local_470._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_470._M_pi);
      }
      LogicalType::~LogicalType((LogicalType *)(local_4a8 + 8));
      if (local_3b0.selection_data.internal.
          super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_3b0.selection_data.internal.
                   super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi);
      }
      if (local_398.selection_data.internal.
          super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_398.selection_data.internal.
                   super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi);
      }
    }
    else {
      if (PVar2 == STRUCT) {
        local_3b0.sel_vector = (sel_t *)null_mask.ptr;
        if (uVar47 != 0) {
          _local_328 = (undefined1  [16])0x0;
          aLStack_320[0].type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          local_1a8.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask =
               (unsigned_long *)0x0;
          local_1a8.sel = (SelectionVector *)0x0;
          local_1a8.data = (data_ptr_t)0x0;
          this = StructVector::GetEntries(&local_100);
          this_00 = StructVector::GetEntries(&local_98);
          SelectionVector::SelectionVector((SelectionVector *)&local_210,uVar47);
          auVar16 = _DAT_01352200;
          lVar46 = uVar47 - 1;
          auVar64._8_4_ = (int)lVar46;
          auVar64._0_8_ = lVar46;
          auVar64._12_4_ = (int)((ulong)lVar46 >> 0x20);
          uVar33 = 0;
          auVar64 = auVar64 ^ _DAT_01352200;
          auVar68 = _DAT_0135a310;
          do {
            auVar67 = auVar68 ^ auVar16;
            if ((bool)(~(auVar67._4_4_ == auVar64._4_4_ && auVar64._0_4_ < auVar67._0_4_ ||
                        auVar64._4_4_ < auVar67._4_4_) & 1)) {
              *(int *)((long)&((TemplatedValidityMask<unsigned_long> *)&(local_210.sel)->sel_vector)
                              ->validity_mask + uVar33 * 4) = (int)uVar33;
            }
            if ((auVar67._12_4_ != auVar64._12_4_ || auVar67._8_4_ <= auVar64._8_4_) &&
                auVar67._12_4_ <= auVar64._12_4_) {
              *(int *)((long)&((TemplatedValidityMask<unsigned_long> *)&(local_210.sel)->sel_vector)
                              ->validity_mask + uVar33 * 4 + 4) = (int)uVar33 + 1;
            }
            uVar33 = uVar33 + 2;
            lVar46 = auVar68._8_8_;
            auVar68._0_8_ = auVar68._0_8_ + 2;
            auVar68._8_8_ = lVar46 + 2;
          } while ((uVar47 + 1 & 0xfffffffffffffffe) != uVar33);
          SelectionVector::SelectionVector((SelectionVector *)local_368,uVar47);
          SelectionVector::SelectionVector(&local_398,uVar47);
          local_2a8.vector_type = FLAT_VECTOR;
          local_2a8._1_7_ = 0;
          local_2a8.type.id_ = INVALID;
          local_2a8.type.physical_type_ = ~INVALID;
          local_2a8.type._2_6_ = 0;
          local_2a8.type.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          local_2a8.type.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
          if ((ValidityMask *)local_3b0.sel_vector == (ValidityMask *)0x0) {
            oVar42.ptr = (ValidityMask *)0x0;
          }
          else {
            optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                      ((optional_ptr<duckdb::ValidityMask,_true> *)&local_3b0);
            p_Var24 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                      ValidityMask::Capacity((ValidityMask *)local_3b0.sel_vector);
            peVar29 = local_2a8.type.type_info_.internal.
                      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            local_2a8.vector_type = FLAT_VECTOR;
            local_2a8._1_7_ = 0;
            local_2a8.type.id_ = INVALID;
            local_2a8.type.physical_type_ = ~INVALID;
            local_2a8.type._2_6_ = 0;
            local_2a8.type.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)0x0;
            if (peVar29 != (element_type *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar29);
            }
            oVar42.ptr = (ValidityMask *)&local_2a8;
            local_2a8.type.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                 = p_Var24;
          }
          if ((this->
              super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
              ).
              super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_finish ==
              (this->
              super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
              ).
              super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_start) {
            local_4c8 = (element_type *)0x0;
          }
          else {
            __n = 0;
            local_4c8 = (element_type *)0x0;
            iVar34 = uVar47;
            do {
              pvVar26 = vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
                        ::operator[](this,__n);
              pVVar27 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::
                        operator*(pvVar26);
              Vector::Vector((Vector *)local_4a8,pVVar27);
              Vector::Flatten((Vector *)local_4a8,uVar47);
              Vector::Slice((Vector *)local_4a8,(SelectionVector *)&local_210,iVar34);
              pvVar26 = vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
                        ::operator[](this_00,__n);
              pVVar27 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::
                        operator*(pvVar26);
              Vector::Vector((Vector *)local_428,pVVar27);
              Vector::Flatten((Vector *)local_428,uVar47);
              Vector::Slice((Vector *)local_428,(SelectionVector *)&local_210,iVar34);
              iVar23 = TemplatedDistinctSelectOperation<duckdb::DistinctFrom>
                                 ((Vector *)local_4a8,(Vector *)local_428,
                                  (SelectionVector *)&local_210,iVar34,(SelectionVector *)local_368,
                                  &local_398,oVar42);
              ExtractNestedMask((SelectionVector *)&local_210,iVar34,
                                (SelectionVector *)(local_368 + 0x28),oVar42.ptr,
                                (optional_ptr<duckdb::ValidityMask,_true>)local_3b0.sel_vector);
              if (iVar23 != 0) {
                oVar41.ptr = (SelectionVector *)local_368;
                if (iVar34 == iVar23) {
                  oVar41.ptr = (SelectionVector *)&local_210;
                }
                ExtractNestedSelection
                          (oVar41.ptr,iVar23,(SelectionVector *)(local_368 + 0x28),&local_158);
                iVar34 = iVar34 - iVar23;
                if (iVar34 != 0) {
                  iVar28 = 0;
                  do {
                    sVar44 = (sel_t)iVar28;
                    if (local_398.sel_vector != (sel_t *)0x0) {
                      sVar44 = local_398.sel_vector[iVar28];
                    }
                    *(sel_t *)((long)&((TemplatedValidityMask<unsigned_long> *)
                                      &(local_210.sel)->sel_vector)->validity_mask + iVar28 * 4) =
                         sVar44;
                    iVar28 = iVar28 + 1;
                  } while (iVar34 != iVar28);
                }
                local_4c8 = (element_type *)((long)local_4c8 + iVar23);
              }
              if (__n == ((long)(this->
                                super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                ).
                                super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(this->
                                super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                ).
                                super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 3) - 1U) {
                iVar23 = TemplatedDistinctSelectOperation<duckdb::DistinctFrom>
                                   ((Vector *)local_4a8,(Vector *)local_428,
                                    (SelectionVector *)&local_210,iVar34,
                                    (SelectionVector *)local_368,&local_398,oVar42);
                ExtractNestedMask((SelectionVector *)&local_210,iVar34,
                                  (SelectionVector *)(local_368 + 0x28),oVar42.ptr,
                                  (optional_ptr<duckdb::ValidityMask,_true>)local_3b0.sel_vector);
                oVar41.ptr = (SelectionVector *)local_368;
                if (iVar34 - iVar23 == 0) {
                  oVar41.ptr = (SelectionVector *)&local_210;
                }
                ExtractNestedSelection
                          (oVar41.ptr,iVar23,(SelectionVector *)(local_368 + 0x28),&local_158);
                oVar41.ptr = &local_398;
                if (iVar23 == 0) {
                  oVar41.ptr = (SelectionVector *)&local_210;
                }
                ExtractNestedSelection
                          (oVar41.ptr,iVar34 - iVar23,(SelectionVector *)(local_368 + 0x28),
                           &local_1c8);
                local_4c8 = (element_type *)((long)local_4c8 + iVar23);
              }
              else {
                ExtractNestedMask((SelectionVector *)&local_210,iVar34,
                                  (SelectionVector *)(local_368 + 0x28),oVar42.ptr,
                                  (optional_ptr<duckdb::ValidityMask,_true>)local_3b0.sel_vector);
                pSVar20 = local_1c8.sel;
                if (local_1c8.sel != (SelectionVector *)0x0) {
                  psVar11 = (local_1c8.sel)->sel_vector;
                  p_Var24 = ((local_1c8.sel)->selection_data).internal.
                            super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi;
                  ((local_1c8.sel)->selection_data).internal.
                  super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2> =
                       (__shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>)0x0;
                  if (p_Var24 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var24);
                  }
                  pSVar20->sel_vector = psVar11;
                }
              }
              if (local_3c8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3c8._M_pi);
              }
              if (local_3d8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3d8._M_pi);
              }
              if (local_3f0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3f0._M_pi);
              }
              LogicalType::~LogicalType((LogicalType *)(local_428 + 8));
              if (local_448._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_448._M_pi);
              }
              if (local_458._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_458._M_pi);
              }
              if (local_470._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_470._M_pi);
              }
              LogicalType::~LogicalType((LogicalType *)(local_4a8 + 8));
              __n = __n + 1;
            } while (__n < (ulong)((long)(this->
                                         super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                         ).
                                         super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)(this->
                                         super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                         ).
                                         super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start >> 3));
          }
          if (local_2a8.type.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
              (element_type *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       local_2a8.type.type_info_.internal.
                       super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
            ;
          }
          if (local_398.selection_data.internal.
              super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_398.selection_data.internal.
                       super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_368._16_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_368._16_8_);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              local_210.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       local_210.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask);
          }
          ::std::
          vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
          ::~vector((vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                     *)&local_1a8);
          ::std::
          vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
          ::~vector((vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                     *)local_328);
          goto LAB_00b3a04e;
        }
      }
      else {
        if (PVar2 != ARRAY) {
          this_01 = (NotImplementedException *)__cxa_allocate_exception(0x10);
          local_4a8 = (undefined1  [8])&LStack_4a0.type_info_;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_4a8,"Unimplemented type for DISTINCT","");
          NotImplementedException::NotImplementedException(this_01,(string *)local_4a8);
          __cxa_throw(this_01,&NotImplementedException::typeinfo,
                      ::std::runtime_error::~runtime_error);
        }
        local_3c0 = (optional_ptr<duckdb::ValidityMask,_true>)
                    (optional_ptr<duckdb::ValidityMask,_true>)null_mask.ptr;
        if (uVar47 != 0) {
          iVar34 = ArrayType::GetSize(&local_100.type);
          SelectionVector::SelectionVector(&local_398,uVar47);
          SelectionVector::SelectionVector(&local_3b0,uVar47);
          pVVar22 = ArrayVector::GetEntry(&local_100);
          Vector::Vector((Vector *)local_4a8,pVVar22);
          pVVar22 = ArrayVector::GetEntry(&local_98);
          Vector::Vector((Vector *)local_428,pVVar22);
          iVar23 = ArrayVector::GetTotalSize(&local_100);
          Vector::Flatten((Vector *)local_4a8,iVar23);
          iVar23 = ArrayVector::GetTotalSize(&local_98);
          Vector::Flatten((Vector *)local_428,iVar23);
          Vector::Vector(&local_2a8,(Vector *)local_4a8,&local_398,uVar47);
          Vector::Vector((Vector *)local_328,(Vector *)local_428,&local_3b0,uVar47);
          UnifiedVectorFormat::UnifiedVectorFormat(&local_1a8);
          Vector::ToUnifiedFormat(&local_100,uVar47,&local_1a8);
          UnifiedVectorFormat::UnifiedVectorFormat(&local_210);
          Vector::ToUnifiedFormat(&local_98,uVar47,&local_210);
          SelectionVector::SelectionVector(&local_380,uVar47);
          auVar16 = _DAT_01352200;
          lVar46 = uVar47 - 1;
          auVar63._8_4_ = (int)lVar46;
          auVar63._0_8_ = lVar46;
          auVar63._12_4_ = (int)((ulong)lVar46 >> 0x20);
          uVar33 = 0;
          auVar63 = auVar63 ^ _DAT_01352200;
          auVar66 = _DAT_0135a310;
          do {
            auVar67 = auVar66 ^ auVar16;
            if ((bool)(~(auVar67._4_4_ == auVar63._4_4_ && auVar63._0_4_ < auVar67._0_4_ ||
                        auVar63._4_4_ < auVar67._4_4_) & 1)) {
              local_380.sel_vector[uVar33] = (sel_t)uVar33;
            }
            if ((auVar67._12_4_ != auVar63._12_4_ || auVar67._8_4_ <= auVar63._8_4_) &&
                auVar67._12_4_ <= auVar63._12_4_) {
              local_380.sel_vector[uVar33 + 1] = (sel_t)uVar33 + 1;
            }
            uVar33 = uVar33 + 2;
            lVar46 = auVar66._8_8_;
            auVar66._0_8_ = auVar66._0_8_ + 2;
            auVar66._8_8_ = lVar46 + 2;
          } while ((uVar47 + 1 & 0xfffffffffffffffe) != uVar33);
          SelectionVector::SelectionVector(&local_2c0,uVar47);
          SelectionVector::SelectionVector(&local_228,uVar47);
          local_368._0_16_ = (undefined1  [16])0x0;
          local_368._16_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_368._24_8_ = 0x800;
          if (local_3c0.ptr == (ValidityMask *)0x0) {
            oVar42.ptr = (ValidityMask *)0x0;
          }
          else {
            optional_ptr<duckdb::ValidityMask,_true>::CheckValid(&local_3c0);
            iVar23 = ValidityMask::Capacity(local_3c0.ptr);
            uVar17 = local_368._16_8_;
            local_368._0_16_ = (undefined1  [16])0x0;
            local_368._16_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar17 !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar17);
            }
            oVar42.ptr = (ValidityMask *)local_368;
            local_368._24_8_ = iVar23;
          }
          iVar23 = 0;
          local_4c8 = (element_type *)0x0;
          do {
            pSVar20 = local_158.sel;
            psVar11 = (local_1a8.sel)->sel_vector;
            uVar33 = 0;
            do {
              uVar60 = uVar33;
              if (local_380.sel_vector != (sel_t *)0x0) {
                uVar60 = (ulong)local_380.sel_vector[uVar33];
              }
              if (psVar11 != (sel_t *)0x0) {
                uVar60 = (ulong)psVar11[uVar60];
              }
              iVar52 = (int)iVar34;
              iVar36 = (int)iVar23;
              local_398.sel_vector[uVar33] = (int)uVar60 * iVar52 + iVar36;
              uVar33 = uVar33 + 1;
            } while (uVar47 != uVar33);
            puVar5 = ((TemplatedValidityMask<unsigned_long> *)&(local_210.sel)->sel_vector)->
                     validity_mask;
            uVar33 = 0;
            do {
              uVar60 = uVar33;
              if (local_380.sel_vector != (sel_t *)0x0) {
                uVar60 = (ulong)local_380.sel_vector[uVar33];
              }
              if (puVar5 != (unsigned_long *)0x0) {
                uVar60 = (ulong)*(uint *)((long)puVar5 + uVar60 * 4);
              }
              *(int *)((long)&((TemplatedValidityMask<unsigned_long> *)local_3b0.sel_vector)->
                              validity_mask + uVar33 * 4) = (int)uVar60 * iVar52 + iVar36;
              uVar33 = uVar33 + 1;
            } while (uVar47 != uVar33);
            uVar33 = 0;
            uVar60 = 0;
            lVar46 = 0;
            do {
              uVar31 = uVar33;
              if (local_380.sel_vector != (sel_t *)0x0) {
                uVar31 = (ulong)local_380.sel_vector[uVar33];
              }
              if (iVar34 == iVar23) {
                if (local_368._40_8_ != 0) {
                  uVar31 = (ulong)*(uint *)(local_368._40_8_ + uVar31 * 4);
                }
                if (local_1c8.sel != (SelectionVector *)0x0) {
                  (local_1c8.sel)->sel_vector[lVar46] = (sel_t)uVar31;
                }
                lVar46 = lVar46 + 1;
              }
              else {
                local_2c0.sel_vector[uVar60] = (sel_t)uVar31;
                uVar60 = uVar60 + 1;
              }
              uVar33 = uVar33 + 1;
            } while (uVar47 != uVar33);
            if (local_158.sel != (SelectionVector *)0x0) {
              psVar11 = (local_158.sel)->sel_vector;
              p_Var24 = ((local_158.sel)->selection_data).internal.
                        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi;
              ((local_158.sel)->selection_data).internal.
              super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2> =
                   (__shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>)0x0;
              if (p_Var24 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var24);
              }
              pSVar20->sel_vector = psVar11;
            }
            pSVar20 = local_1c8.sel;
            if (local_1c8.sel != (SelectionVector *)0x0) {
              psVar11 = (local_1c8.sel)->sel_vector;
              p_Var24 = ((local_1c8.sel)->selection_data).internal.
                        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi;
              ((local_1c8.sel)->selection_data).internal.
              super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2> =
                   (__shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>)0x0;
              if (p_Var24 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var24);
              }
              pSVar20->sel_vector = psVar11 + lVar46;
            }
            if ((uVar60 < uVar47) && (uVar47 = uVar60, uVar60 != 0)) {
              uVar33 = 0;
              do {
                sVar44 = (sel_t)uVar33;
                if (local_2c0.sel_vector != (sel_t *)0x0) {
                  sVar44 = local_2c0.sel_vector[uVar33];
                }
                local_380.sel_vector[uVar33] = sVar44;
                uVar33 = uVar33 + 1;
              } while (uVar60 != uVar33);
              psVar11 = (local_1a8.sel)->sel_vector;
              uVar33 = 0;
              do {
                uVar31 = uVar33;
                if (local_380.sel_vector != (sel_t *)0x0) {
                  uVar31 = (ulong)local_380.sel_vector[uVar33];
                }
                if (psVar11 != (sel_t *)0x0) {
                  uVar31 = (ulong)psVar11[uVar31];
                }
                local_398.sel_vector[uVar33] = (int)uVar31 * iVar52 + iVar36;
                uVar33 = uVar33 + 1;
              } while (uVar60 != uVar33);
              puVar5 = ((TemplatedValidityMask<unsigned_long> *)&(local_210.sel)->sel_vector)->
                       validity_mask;
              uVar33 = 0;
              do {
                uVar31 = uVar33;
                if (local_380.sel_vector != (sel_t *)0x0) {
                  uVar31 = (ulong)local_380.sel_vector[uVar33];
                }
                if (puVar5 != (unsigned_long *)0x0) {
                  uVar31 = (ulong)*(uint *)((long)puVar5 + uVar31 * 4);
                }
                *(int *)((long)&((TemplatedValidityMask<unsigned_long> *)local_3b0.sel_vector)->
                                validity_mask + uVar33 * 4) = (int)uVar31 * iVar52 + iVar36;
                uVar33 = uVar33 + 1;
              } while (uVar60 != uVar33);
            }
            iVar28 = TemplatedDistinctSelectOperation<duckdb::DistinctFrom>
                               (&local_2a8,(Vector *)local_328,&local_380,uVar47,&local_2c0,
                                &local_228,oVar42);
            ExtractNestedMask(&local_380,uVar47,(SelectionVector *)(local_368 + 0x28),oVar42.ptr,
                              local_3c0);
            if (iVar28 != 0) {
              oVar41.ptr = &local_2c0;
              if (uVar47 == iVar28) {
                oVar41.ptr = &local_380;
              }
              ExtractNestedSelection
                        (oVar41.ptr,iVar28,(SelectionVector *)(local_368 + 0x28),&local_158);
              local_4c8 = (element_type *)((long)local_4c8 + iVar28);
              uVar47 = uVar47 - iVar28;
              if (uVar47 != 0) {
                uVar33 = 0;
                do {
                  sVar44 = (sel_t)uVar33;
                  if (local_228.sel_vector != (sel_t *)0x0) {
                    sVar44 = local_228.sel_vector[uVar33];
                  }
                  local_380.sel_vector[uVar33] = sVar44;
                  uVar33 = uVar33 + 1;
                } while (uVar47 != uVar33);
                psVar11 = (local_1a8.sel)->sel_vector;
                uVar33 = 0;
                do {
                  uVar60 = uVar33;
                  if (local_380.sel_vector != (sel_t *)0x0) {
                    uVar60 = (ulong)local_380.sel_vector[uVar33];
                  }
                  if (psVar11 != (sel_t *)0x0) {
                    uVar60 = (ulong)psVar11[uVar60];
                  }
                  local_398.sel_vector[uVar33] = (int)uVar60 * iVar52 + iVar36;
                  uVar33 = uVar33 + 1;
                } while (uVar47 != uVar33);
                puVar5 = ((TemplatedValidityMask<unsigned_long> *)&(local_210.sel)->sel_vector)->
                         validity_mask;
                uVar33 = 0;
                do {
                  uVar60 = uVar33;
                  if (local_380.sel_vector != (sel_t *)0x0) {
                    uVar60 = (ulong)local_380.sel_vector[uVar33];
                  }
                  if (puVar5 != (unsigned_long *)0x0) {
                    uVar60 = (ulong)*(uint *)((long)puVar5 + uVar60 * 4);
                  }
                  *(int *)((long)&((TemplatedValidityMask<unsigned_long> *)local_3b0.sel_vector)->
                                  validity_mask + uVar33 * 4) = (int)uVar60 * iVar52 + iVar36;
                  uVar33 = uVar33 + 1;
                } while (uVar47 != uVar33);
              }
            }
            ExtractNestedMask(&local_380,uVar47,(SelectionVector *)(local_368 + 0x28),oVar42.ptr,
                              local_3c0);
            pSVar20 = local_1c8.sel;
            if (local_1c8.sel != (SelectionVector *)0x0) {
              psVar11 = (local_1c8.sel)->sel_vector;
              p_Var24 = ((local_1c8.sel)->selection_data).internal.
                        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi;
              ((local_1c8.sel)->selection_data).internal.
              super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2> =
                   (__shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>)0x0;
              if (p_Var24 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var24);
              }
              pSVar20->sel_vector = psVar11;
            }
            iVar23 = iVar23 + 1;
          } while (uVar47 != 0);
          goto LAB_00b39e8f;
        }
      }
LAB_00b36015:
      local_4c8 = (element_type *)0x0;
    }
LAB_00b3a04e:
    local_4c8 = (element_type *)((long)local_4c8 + local_4b8);
    if ((local_238.ptr != (SelectionVector *)0x0) &&
       (optional_ptr<duckdb::SelectionVector,_true>::CheckValid(&local_238),
       local_4c8 != (element_type *)0x0)) {
      psVar11 = (local_238.ptr)->sel_vector;
      peVar29 = (element_type *)0x0;
      do {
        sVar44 = (sel_t)peVar29;
        if (local_118.sel_vector != (sel_t *)0x0) {
          sVar44 = local_118.sel_vector[(long)peVar29];
        }
        psVar11[(long)peVar29] = sVar44;
        peVar29 = (element_type *)((long)&peVar29->_vptr_ExtraTypeInfo + 1);
      } while (local_4c8 != peVar29);
    }
    if (local_240.ptr != (SelectionVector *)0x0) {
      optional_ptr<duckdb::SelectionVector,_true>::CheckValid(&local_240);
      if ((element_type *)count != local_4c8) {
        psVar11 = (local_240.ptr)->sel_vector;
        lVar46 = 0;
        do {
          sVar44 = (sel_t)lVar46;
          if (local_130.sel_vector != (sel_t *)0x0) {
            sVar44 = local_130.sel_vector[lVar46];
          }
          psVar11[lVar46] = sVar44;
          lVar46 = lVar46 + 1;
        } while (count - (long)local_4c8 != lVar46);
      }
    }
    if (local_98.auxiliary.internal.
        super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_98.auxiliary.internal.
                 super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_98.buffer.internal.
        super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_98.buffer.internal.
                 super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_98.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_98.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                 .
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    LogicalType::~LogicalType(&local_98.type);
    if (local_100.auxiliary.internal.
        super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_100.auxiliary.internal.
                 super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_100.buffer.internal.
        super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_100.buffer.internal.
                 super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_100.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_100.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
                 internal.
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    LogicalType::~LogicalType(&local_100.type);
    if (local_330 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_330);
    }
    if (local_1c8.vec.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_1c8.vec.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_130.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_130.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_158.vec.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_158.vec.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    goto LAB_00b413b3;
  }
LAB_00b3e322:
  local_4c8 = (element_type *)0x0;
  local_118.selection_data.internal.
  super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       LStack_4a0.type_info_.internal.
       super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
LAB_00b413b3:
  if ((element_type *)
      local_118.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (element_type *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_118.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
    return (idx_t)local_4c8;
  }
  return (idx_t)local_4c8;
}

Assistant:

static idx_t TemplatedDistinctSelectOperation(Vector &left, Vector &right, optional_ptr<const SelectionVector> sel,
                                              idx_t count, optional_ptr<SelectionVector> true_sel,
                                              optional_ptr<SelectionVector> false_sel,
                                              optional_ptr<ValidityMask> null_mask) {

	switch (left.GetType().InternalType()) {
	case PhysicalType::BOOL:
	case PhysicalType::INT8:
		return DistinctSelect<int8_t, int8_t, OP>(left, right, sel.get(), count, true_sel.get(), false_sel.get(),
		                                          null_mask);
	case PhysicalType::INT16:
		return DistinctSelect<int16_t, int16_t, OP>(left, right, sel.get(), count, true_sel.get(), false_sel.get(),
		                                            null_mask);
	case PhysicalType::INT32:
		return DistinctSelect<int32_t, int32_t, OP>(left, right, sel.get(), count, true_sel.get(), false_sel.get(),
		                                            null_mask);
	case PhysicalType::INT64:
		return DistinctSelect<int64_t, int64_t, OP>(left, right, sel.get(), count, true_sel.get(), false_sel.get(),
		                                            null_mask);
	case PhysicalType::UINT8:
		return DistinctSelect<uint8_t, uint8_t, OP>(left, right, sel.get(), count, true_sel.get(), false_sel.get(),
		                                            null_mask);
	case PhysicalType::UINT16:
		return DistinctSelect<uint16_t, uint16_t, OP>(left, right, sel.get(), count, true_sel.get(), false_sel.get(),
		                                              null_mask);
	case PhysicalType::UINT32:
		return DistinctSelect<uint32_t, uint32_t, OP>(left, right, sel.get(), count, true_sel.get(), false_sel.get(),
		                                              null_mask);
	case PhysicalType::UINT64:
		return DistinctSelect<uint64_t, uint64_t, OP>(left, right, sel.get(), count, true_sel.get(), false_sel.get(),
		                                              null_mask);
	case PhysicalType::INT128:
		return DistinctSelect<hugeint_t, hugeint_t, OP>(left, right, sel.get(), count, true_sel.get(), false_sel.get(),
		                                                null_mask);
	case PhysicalType::UINT128:
		return DistinctSelect<uhugeint_t, uhugeint_t, OP>(left, right, sel.get(), count, true_sel.get(),
		                                                  false_sel.get(), null_mask);
	case PhysicalType::FLOAT:
		return DistinctSelect<float, float, OP>(left, right, sel.get(), count, true_sel.get(), false_sel.get(),
		                                        null_mask);
	case PhysicalType::DOUBLE:
		return DistinctSelect<double, double, OP>(left, right, sel.get(), count, true_sel.get(), false_sel.get(),
		                                          null_mask);
	case PhysicalType::INTERVAL:
		return DistinctSelect<interval_t, interval_t, OP>(left, right, sel.get(), count, true_sel.get(),
		                                                  false_sel.get(), null_mask);
	case PhysicalType::VARCHAR:
		return DistinctSelect<string_t, string_t, OP>(left, right, sel.get(), count, true_sel.get(), false_sel.get(),
		                                              null_mask);
	case PhysicalType::STRUCT:
	case PhysicalType::LIST:
	case PhysicalType::ARRAY:
		return DistinctSelectNested<OP>(left, right, sel, count, true_sel, false_sel, null_mask);
	default:
		throw InternalException("Invalid type for distinct selection");
	}
}